

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O2

void fillRow2<float>(Matrix<float,_60,_84,_0,_60,_84> *M1,int row,
                    vector<float,_std::allocator<float>_> (*m0) [3],
                    vector<float,_std::allocator<float>_> (*m1) [3],
                    vector<float,_std::allocator<float>_> (*m2) [3])

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float *pfVar73;
  float *pfVar74;
  float *pfVar75;
  float *pfVar76;
  float *pfVar77;
  pointer pfVar78;
  pointer pfVar79;
  pointer pfVar80;
  pointer pfVar81;
  pointer pfVar82;
  Scalar *pSVar83;
  long row_00;
  
  fVar1 = *(*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar2 = *(*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar3 = *(*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar4 = *(*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar5 = *(*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar6 = *(*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar7 = *(*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar8 = *(*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar9 = *(*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  row_00 = (long)row;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0);
  *pSVar83 = (fVar7 * fVar9 * fVar5 +
             fVar4 * fVar6 * fVar8 +
             ((fVar1 * fVar2 * fVar3 - fVar4 * fVar1 * fVar5) - fVar7 * fVar6 * fVar3)) -
             fVar2 * fVar9 * fVar8;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = *pfVar73;
  fVar2 = pfVar73[1];
  pfVar73 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = *pfVar74;
  fVar4 = pfVar74[1];
  pfVar74 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar73;
  fVar6 = pfVar73[1];
  fVar7 = *pfVar75;
  fVar8 = pfVar75[1];
  fVar9 = *pfVar74;
  fVar10 = pfVar74[1];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = *pfVar74;
  fVar14 = pfVar74[1];
  pfVar74 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = *pfVar74;
  fVar16 = pfVar74[1];
  fVar17 = *pfVar73;
  fVar18 = pfVar73[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,1);
  *pSVar83 = ((fVar13 * fVar17 * fVar8 +
              fVar14 * fVar17 * fVar7 +
              ((fVar13 * fVar18 * fVar7 +
               fVar5 * fVar11 * fVar16 +
               fVar6 * fVar11 * fVar15 +
               (((fVar12 * fVar5 * fVar15 +
                 ((((fVar3 * fVar1 * fVar10 +
                    fVar1 * fVar4 * fVar9 + (fVar2 * fVar3 * fVar9 - fVar5 * fVar2 * fVar7)) -
                   fVar6 * fVar1 * fVar7) - fVar1 * fVar5 * fVar8) - fVar13 * fVar12 * fVar9)) -
                fVar14 * fVar11 * fVar9) - fVar13 * fVar11 * fVar10)) - fVar18 * fVar3 * fVar15)) -
             fVar4 * fVar17 * fVar15) - fVar3 * fVar17 * fVar16;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[2];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar74;
  fVar5 = pfVar74[1];
  fVar6 = *pfVar77;
  fVar7 = pfVar77[1];
  fVar8 = *pfVar76;
  fVar9 = pfVar76[1];
  fVar10 = *pfVar73;
  fVar11 = pfVar73[1];
  fVar12 = pfVar75[2];
  fVar13 = pfVar76[2];
  fVar14 = pfVar74[2];
  fVar15 = pfVar77[2];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[2];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar18 = *pfVar75;
  fVar19 = pfVar74[1];
  fVar20 = pfVar73[1];
  fVar21 = pfVar75[1];
  fVar22 = *pfVar73;
  fVar23 = pfVar74[2];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar75[2];
  fVar25 = pfVar73[2];
  fVar26 = pfVar73[1];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,2);
  *pSVar83 = (((fVar17 * fVar27 * fVar15 +
               fVar19 * fVar27 * fVar7 +
               fVar23 * fVar27 * fVar6 +
               (((fVar17 * fVar26 * fVar7 +
                 fVar19 * fVar26 * fVar6 +
                 ((fVar17 * fVar25 * fVar6 +
                  fVar4 * fVar22 * fVar24 +
                  fVar5 * fVar22 * fVar21 +
                  fVar14 * fVar22 * fVar18 +
                  ((((fVar20 * fVar4 * fVar21 +
                     fVar5 * fVar20 * fVar18 +
                     (((fVar16 * fVar4 * fVar18 +
                       (((((fVar2 * fVar10 * fVar13 +
                           fVar3 * fVar10 * fVar9 +
                           fVar10 * fVar12 * fVar8 +
                           (((fVar2 * fVar11 * fVar9 +
                             fVar11 * fVar3 * fVar8 +
                             (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                            fVar5 * fVar11 * fVar6) - fVar11 * fVar4 * fVar7)) -
                          fVar14 * fVar10 * fVar6) - fVar5 * fVar10 * fVar7) -
                        fVar10 * fVar4 * fVar15) - fVar17 * fVar16 * fVar8)) -
                      fVar19 * fVar20 * fVar8) - fVar17 * fVar20 * fVar9)) - fVar23 * fVar22 * fVar8
                    ) - fVar19 * fVar22 * fVar9) - fVar17 * fVar22 * fVar13)) -
                 fVar25 * fVar2 * fVar18)) - fVar3 * fVar26 * fVar18) - fVar26 * fVar2 * fVar21)) -
              fVar12 * fVar27 * fVar18) - fVar3 * fVar27 * fVar21) - fVar2 * fVar27 * fVar24;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[2];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[1];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[1];
  fVar10 = *pfVar73;
  fVar11 = pfVar73[1];
  fVar12 = pfVar75[2];
  fVar13 = pfVar76[2];
  fVar14 = pfVar74[2];
  fVar15 = pfVar77[2];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[2];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar74[1];
  fVar18 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar19 = *pfVar75;
  fVar20 = pfVar75[1];
  fVar21 = pfVar73[1];
  fVar22 = pfVar74[2];
  fVar23 = pfVar75[2];
  fVar24 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar73[2];
  fVar26 = pfVar73[1];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,3);
  *pSVar83 = ((fVar17 * fVar27 * fVar15 +
              fVar22 * fVar27 * fVar9 +
              ((((fVar18 * fVar26 * fVar15 +
                 fVar17 * fVar26 * fVar9 +
                 fVar22 * fVar26 * fVar8 +
                 (((fVar18 * fVar25 * fVar9 +
                   fVar17 * fVar25 * fVar8 +
                   fVar7 * fVar24 * fVar23 +
                   fVar14 * fVar24 * fVar20 +
                   (((fVar6 * fVar21 * fVar23 +
                     fVar7 * fVar21 * fVar20 +
                     fVar14 * fVar21 * fVar19 +
                     ((((fVar16 * fVar6 * fVar20 +
                        fVar7 * fVar16 * fVar19 +
                        (((((fVar3 * fVar10 * fVar13 +
                            fVar12 * fVar10 * fVar5 +
                            ((((fVar2 * fVar11 * fVar13 +
                               fVar3 * fVar11 * fVar5 +
                               fVar11 * fVar12 * fVar4 +
                               (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                              fVar14 * fVar11 * fVar8) - fVar7 * fVar11 * fVar9) -
                            fVar11 * fVar6 * fVar15)) - fVar14 * fVar10 * fVar9) -
                          fVar10 * fVar7 * fVar15) - fVar17 * fVar16 * fVar4) -
                        fVar18 * fVar16 * fVar5)) - fVar22 * fVar21 * fVar4) -
                      fVar17 * fVar21 * fVar5) - fVar18 * fVar21 * fVar13)) -
                    fVar22 * fVar24 * fVar5) - fVar17 * fVar24 * fVar13)) - fVar3 * fVar25 * fVar19)
                 - fVar25 * fVar2 * fVar20)) - fVar12 * fVar26 * fVar19) - fVar3 * fVar26 * fVar20)
              - fVar2 * fVar26 * fVar23)) - fVar12 * fVar27 * fVar20) - fVar3 * fVar27 * fVar23;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[2];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[2];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[1];
  pfVar75 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar76 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar75;
  fVar6 = pfVar75[1];
  fVar7 = pfVar75[2];
  fVar8 = pfVar74[2];
  fVar9 = *pfVar76;
  fVar10 = pfVar76[1];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  fVar13 = pfVar76[2];
  fVar14 = *pfVar73;
  fVar15 = pfVar73[1];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[2];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar74[2];
  fVar18 = pfVar74[1];
  fVar19 = *pfVar74;
  pfVar74 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar20 = *pfVar74;
  fVar21 = pfVar74[1];
  fVar22 = pfVar74[2];
  fVar23 = pfVar73[1];
  fVar24 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar73[2];
  fVar26 = pfVar73[1];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,4);
  *pSVar83 = (fVar17 * fVar27 * fVar13 +
             (((fVar18 * fVar26 * fVar13 +
               fVar17 * fVar26 * fVar10 +
               ((((fVar19 * fVar25 * fVar13 +
                  fVar18 * fVar25 * fVar10 +
                  fVar17 * fVar25 * fVar9 +
                  fVar8 * fVar24 * fVar22 +
                  ((fVar12 * fVar23 * fVar22 +
                   fVar8 * fVar23 * fVar21 +
                   (((fVar11 * fVar16 * fVar22 +
                     fVar12 * fVar16 * fVar21 +
                     fVar8 * fVar16 * fVar20 +
                     (((((fVar2 * fVar14 * fVar7 +
                         (((fVar4 * fVar15 * fVar7 +
                           fVar2 * fVar15 * fVar6 +
                           ((((fVar1 * fVar3 * fVar7 + fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6
                              ) - fVar8 * fVar1 * fVar9) - fVar12 * fVar1 * fVar10) -
                           fVar1 * fVar11 * fVar13)) - fVar8 * fVar15 * fVar10) -
                         fVar15 * fVar12 * fVar13)) - fVar14 * fVar8 * fVar13) -
                       fVar17 * fVar16 * fVar5) - fVar18 * fVar16 * fVar6) - fVar19 * fVar16 * fVar7
                     )) - fVar17 * fVar23 * fVar6) - fVar18 * fVar23 * fVar7)) -
                  fVar17 * fVar24 * fVar7)) - fVar2 * fVar25 * fVar20) - fVar4 * fVar25 * fVar21) -
               fVar3 * fVar25 * fVar22)) - fVar2 * fVar26 * fVar21) - fVar4 * fVar26 * fVar22)) -
             fVar2 * fVar27 * fVar22;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[1];
  fVar2 = pfVar78[2];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[1];
  fVar4 = pfVar79[2];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar79[1];
  fVar6 = pfVar79[2];
  fVar7 = pfVar78[1];
  fVar8 = pfVar78[2];
  fVar9 = pfVar80[1];
  fVar10 = pfVar80[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[1];
  fVar12 = pfVar79[2];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[1];
  fVar14 = pfVar79[2];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[1];
  fVar16 = pfVar79[2];
  fVar17 = pfVar78[1];
  fVar18 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,5);
  *pSVar83 = (fVar14 * fVar17 * fVar10 +
             (((fVar13 * fVar18 * fVar10 +
               fVar14 * fVar18 * fVar9 +
               fVar8 * fVar11 * fVar16 +
               ((fVar7 * fVar12 * fVar16 +
                fVar8 * fVar12 * fVar15 +
                ((((fVar4 * fVar1 * fVar6 +
                   (((fVar2 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6) - fVar8 * fVar2 * fVar9) -
                   fVar2 * fVar7 * fVar10)) - fVar1 * fVar8 * fVar10) - fVar14 * fVar12 * fVar5) -
                fVar13 * fVar12 * fVar6)) - fVar14 * fVar11 * fVar6)) - fVar4 * fVar18 * fVar15) -
             fVar3 * fVar18 * fVar16)) - fVar4 * fVar17 * fVar16;
  fVar1 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar2 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar3 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar4 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar5 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar6 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar7 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar8 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  fVar9 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,6);
  *pSVar83 = (fVar7 * fVar9 * fVar5 +
             fVar4 * fVar6 * fVar8 +
             ((fVar1 * fVar2 * fVar3 - fVar4 * fVar1 * fVar5) - fVar7 * fVar6 * fVar3)) -
             fVar2 * fVar9 * fVar8;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = *pfVar73;
  fVar2 = pfVar73[3];
  pfVar73 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = *pfVar74;
  fVar4 = pfVar74[3];
  pfVar74 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar73;
  fVar6 = pfVar73[3];
  fVar7 = *pfVar75;
  fVar8 = pfVar75[3];
  fVar9 = *pfVar74;
  fVar10 = pfVar74[3];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = *pfVar74;
  fVar12 = pfVar74[3];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = *pfVar74;
  fVar14 = pfVar74[3];
  pfVar74 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = *pfVar74;
  fVar16 = pfVar74[3];
  fVar17 = *pfVar73;
  fVar18 = pfVar73[3];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,7);
  *pSVar83 = ((fVar13 * fVar17 * fVar8 +
              fVar14 * fVar17 * fVar7 +
              ((fVar13 * fVar18 * fVar7 +
               fVar5 * fVar11 * fVar16 +
               fVar6 * fVar11 * fVar15 +
               (((fVar12 * fVar5 * fVar15 +
                 ((((fVar3 * fVar1 * fVar10 +
                    fVar1 * fVar4 * fVar9 + (fVar2 * fVar3 * fVar9 - fVar5 * fVar2 * fVar7)) -
                   fVar6 * fVar1 * fVar7) - fVar1 * fVar5 * fVar8) - fVar13 * fVar12 * fVar9)) -
                fVar14 * fVar11 * fVar9) - fVar13 * fVar11 * fVar10)) - fVar18 * fVar3 * fVar15)) -
             fVar4 * fVar17 * fVar15) - fVar3 * fVar17 * fVar16;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[4];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar74;
  fVar5 = pfVar74[1];
  fVar6 = *pfVar77;
  fVar7 = pfVar77[1];
  fVar8 = *pfVar76;
  fVar9 = pfVar76[1];
  fVar10 = pfVar73[3];
  fVar11 = *pfVar73;
  fVar12 = pfVar73[1];
  fVar13 = pfVar75[3];
  fVar14 = pfVar76[3];
  fVar15 = pfVar74[3];
  fVar16 = pfVar77[3];
  fVar17 = pfVar75[4];
  fVar18 = pfVar76[4];
  fVar19 = pfVar74[4];
  fVar20 = pfVar77[4];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar73[4];
  fVar22 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar23 = *pfVar75;
  fVar24 = pfVar74[1];
  fVar25 = pfVar73[3];
  fVar26 = pfVar75[1];
  fVar27 = pfVar73[1];
  fVar28 = pfVar74[3];
  fVar29 = pfVar75[3];
  fVar30 = *pfVar73;
  fVar31 = pfVar74[4];
  fVar32 = pfVar75[4];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar73[4];
  fVar34 = pfVar73[3];
  fVar35 = pfVar73[1];
  fVar36 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,8);
  *pSVar83 = ((((fVar22 * fVar36 * fVar20 +
                fVar24 * fVar36 * fVar16 +
                fVar28 * fVar36 * fVar7 +
                fVar31 * fVar36 * fVar6 +
                (((fVar22 * fVar35 * fVar16 +
                  fVar28 * fVar35 * fVar6 +
                  (((fVar22 * fVar34 * fVar7 +
                    fVar24 * fVar34 * fVar6 +
                    ((fVar22 * fVar33 * fVar6 +
                     fVar4 * fVar30 * fVar32 +
                     fVar5 * fVar30 * fVar29 +
                     fVar15 * fVar30 * fVar26 +
                     fVar19 * fVar30 * fVar23 +
                     (((((fVar27 * fVar4 * fVar29 +
                         fVar15 * fVar27 * fVar23 +
                         (((fVar25 * fVar4 * fVar26 +
                           fVar5 * fVar25 * fVar23 +
                           (((fVar21 * fVar4 * fVar23 +
                             ((((((fVar2 * fVar11 * fVar18 +
                                  fVar3 * fVar11 * fVar14 +
                                  fVar13 * fVar11 * fVar9 +
                                  fVar11 * fVar17 * fVar8 +
                                  (((fVar2 * fVar12 * fVar14 +
                                    fVar12 * fVar13 * fVar8 +
                                    (((fVar2 * fVar10 * fVar9 +
                                      fVar10 * fVar3 * fVar8 +
                                      (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                                     fVar5 * fVar10 * fVar6) - fVar10 * fVar4 * fVar7)) -
                                   fVar15 * fVar12 * fVar6) - fVar12 * fVar4 * fVar16)) -
                                 fVar19 * fVar11 * fVar6) - fVar15 * fVar11 * fVar7) -
                               fVar5 * fVar11 * fVar16) - fVar11 * fVar4 * fVar20) -
                             fVar22 * fVar21 * fVar8)) - fVar24 * fVar25 * fVar8) -
                           fVar22 * fVar25 * fVar9)) - fVar28 * fVar27 * fVar8) -
                         fVar22 * fVar27 * fVar14)) - fVar31 * fVar30 * fVar8) -
                       fVar28 * fVar30 * fVar9) - fVar24 * fVar30 * fVar14) -
                     fVar22 * fVar30 * fVar18)) - fVar33 * fVar2 * fVar23)) -
                   fVar3 * fVar34 * fVar23) - fVar34 * fVar2 * fVar26)) - fVar13 * fVar35 * fVar23)
                - fVar35 * fVar2 * fVar29)) - fVar17 * fVar36 * fVar23) - fVar13 * fVar36 * fVar26)
             - fVar3 * fVar36 * fVar29) - fVar2 * fVar36 * fVar32;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[4];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[1];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[1];
  fVar10 = pfVar73[3];
  fVar11 = pfVar75[2];
  fVar12 = pfVar76[2];
  fVar13 = pfVar74[2];
  fVar14 = pfVar77[2];
  fVar15 = pfVar73[2];
  fVar16 = pfVar75[3];
  fVar17 = pfVar76[3];
  fVar18 = pfVar74[3];
  fVar19 = pfVar77[3];
  fVar20 = pfVar73[1];
  fVar21 = pfVar75[4];
  fVar22 = pfVar76[4];
  fVar23 = pfVar74[4];
  fVar24 = pfVar77[4];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[4];
  fVar27 = pfVar74[1];
  fVar28 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = *pfVar75;
  fVar30 = pfVar75[1];
  fVar31 = pfVar73[3];
  fVar32 = pfVar74[2];
  fVar33 = pfVar75[2];
  fVar34 = pfVar73[2];
  fVar35 = pfVar74[3];
  fVar36 = pfVar75[3];
  fVar37 = pfVar73[1];
  fVar38 = pfVar74[4];
  fVar39 = pfVar75[4];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[4];
  fVar42 = pfVar73[3];
  fVar43 = pfVar73[2];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,9);
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                (((((fVar28 * fVar44 * fVar24 +
                    fVar27 * fVar44 * fVar19 +
                    fVar35 * fVar44 * fVar9 +
                    fVar38 * fVar44 * fVar8 +
                    (((fVar28 * fVar43 * fVar19 +
                      fVar35 * fVar43 * fVar8 +
                      ((((fVar28 * fVar42 * fVar14 +
                         fVar27 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar7 * fVar37 * fVar36 +
                               fVar18 * fVar37 * fVar30 +
                               fVar23 * fVar37 * fVar29 +
                               (((((fVar34 * fVar6 * fVar36 +
                                   fVar18 * fVar34 * fVar29 +
                                   (((fVar31 * fVar6 * fVar33 +
                                     fVar7 * fVar31 * fVar30 +
                                     fVar13 * fVar31 * fVar29 +
                                     ((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              (((((fVar2 * fVar20 * fVar22 +
                                                  fVar3 * fVar20 * fVar17 +
                                                  fVar16 * fVar20 * fVar5 +
                                                  fVar20 * fVar21 * fVar4 +
                                                  (((fVar2 * fVar15 * fVar17 +
                                                    fVar15 * fVar16 * fVar4 +
                                                    ((((fVar2 * fVar10 * fVar12 +
                                                       fVar3 * fVar10 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar7 * fVar10 * fVar9) -
                                                    fVar10 * fVar6 * fVar14)) -
                                                   fVar18 * fVar15 * fVar8) -
                                                  fVar15 * fVar6 * fVar19)) -
                                                 fVar23 * fVar20 * fVar8) - fVar18 * fVar20 * fVar9)
                                               - fVar7 * fVar20 * fVar19) - fVar20 * fVar6 * fVar24)
                                              ) - fVar23 * fVar25 * fVar9) -
                                            fVar18 * fVar25 * fVar14) - fVar13 * fVar25 * fVar19) -
                                          fVar25 * fVar7 * fVar24) - fVar27 * fVar26 * fVar4) -
                                        fVar28 * fVar26 * fVar5)) - fVar32 * fVar31 * fVar4) -
                                      fVar27 * fVar31 * fVar5) - fVar28 * fVar31 * fVar12)) -
                                    fVar35 * fVar34 * fVar4) - fVar28 * fVar34 * fVar17)) -
                                  fVar38 * fVar37 * fVar4) - fVar35 * fVar37 * fVar5) -
                                fVar27 * fVar37 * fVar17) - fVar28 * fVar37 * fVar22)) -
                              fVar38 * fVar40 * fVar5) - fVar35 * fVar40 * fVar12) -
                            fVar32 * fVar40 * fVar17) - fVar27 * fVar40 * fVar22)) -
                          fVar3 * fVar41 * fVar29) - fVar41 * fVar2 * fVar30)) -
                        fVar11 * fVar42 * fVar29) - fVar3 * fVar42 * fVar30) -
                      fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                    fVar43 * fVar2 * fVar36)) - fVar21 * fVar44 * fVar29) - fVar16 * fVar44 * fVar30
                  ) - fVar3 * fVar44 * fVar36) - fVar2 * fVar44 * fVar39)) -
               fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) - fVar11 * fVar45 * fVar36) -
             fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[4];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[2];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[1];
  fVar7 = pfVar76[2];
  fVar8 = pfVar74[2];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[1];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  fVar13 = pfVar77[2];
  fVar14 = pfVar73[3];
  fVar15 = pfVar73[2];
  fVar16 = pfVar75[4];
  fVar17 = pfVar75[3];
  fVar18 = pfVar76[3];
  fVar19 = pfVar76[4];
  fVar20 = pfVar74[4];
  fVar21 = pfVar74[3];
  fVar22 = pfVar77[3];
  fVar23 = pfVar77[4];
  fVar24 = pfVar73[1];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[4];
  fVar27 = pfVar74[2];
  fVar28 = pfVar74[1];
  fVar29 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar30 = *pfVar75;
  fVar31 = pfVar75[1];
  fVar32 = pfVar75[2];
  fVar33 = pfVar73[3];
  fVar34 = pfVar73[2];
  fVar35 = pfVar74[4];
  fVar36 = pfVar74[3];
  fVar37 = pfVar75[3];
  fVar38 = pfVar75[4];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[4];
  fVar42 = pfVar73[3];
  fVar43 = pfVar73[2];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,10);
  *pSVar83 = ((fVar27 * fVar45 * fVar23 +
              fVar35 * fVar45 * fVar13 +
              (((((fVar28 * fVar44 * fVar23 +
                  fVar27 * fVar44 * fVar22 +
                  fVar36 * fVar44 * fVar13 +
                  fVar35 * fVar44 * fVar10 +
                  (((((fVar29 * fVar43 * fVar23 +
                      fVar28 * fVar43 * fVar22 +
                      fVar36 * fVar43 * fVar10 +
                      fVar35 * fVar43 * fVar9 +
                      (((fVar28 * fVar42 * fVar13 +
                        fVar27 * fVar42 * fVar10 +
                        ((((fVar29 * fVar41 * fVar13 +
                           fVar28 * fVar41 * fVar10 +
                           fVar27 * fVar41 * fVar9 +
                           fVar8 * fVar40 * fVar38 +
                           fVar20 * fVar40 * fVar32 +
                           (((fVar12 * fVar39 * fVar38 +
                             fVar8 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar32 +
                             fVar20 * fVar39 * fVar31 +
                             (((((fVar11 * fVar34 * fVar38 +
                                 fVar12 * fVar34 * fVar37 +
                                 fVar21 * fVar34 * fVar31 +
                                 fVar20 * fVar34 * fVar30 +
                                 (((((fVar33 * fVar12 * fVar32 +
                                     fVar8 * fVar33 * fVar31 +
                                     (((fVar26 * fVar11 * fVar32 +
                                       fVar12 * fVar26 * fVar31 +
                                       fVar8 * fVar26 * fVar30 +
                                       ((((((fVar2 * fVar25 * fVar19 +
                                            fVar16 * fVar25 * fVar7 +
                                            (((((fVar4 * fVar24 * fVar19 +
                                                fVar2 * fVar24 * fVar18 +
                                                fVar17 * fVar24 * fVar7 +
                                                fVar16 * fVar24 * fVar6 +
                                                (((((fVar3 * fVar15 * fVar19 +
                                                    fVar4 * fVar15 * fVar18 +
                                                    fVar15 * fVar17 * fVar6 +
                                                    fVar15 * fVar16 * fVar5 +
                                                    (((fVar4 * fVar14 * fVar7 +
                                                      fVar2 * fVar14 * fVar6 +
                                                      ((((fVar1 * fVar3 * fVar7 +
                                                         fVar1 * fVar2 * fVar5 +
                                                         fVar1 * fVar4 * fVar6) -
                                                        fVar8 * fVar1 * fVar9) -
                                                       fVar12 * fVar1 * fVar10) -
                                                      fVar1 * fVar11 * fVar13)) -
                                                     fVar8 * fVar14 * fVar10) -
                                                    fVar14 * fVar12 * fVar13)) -
                                                   fVar20 * fVar15 * fVar9) -
                                                  fVar21 * fVar15 * fVar10) -
                                                 fVar12 * fVar15 * fVar22) -
                                                fVar15 * fVar11 * fVar23)) -
                                               fVar20 * fVar24 * fVar10) - fVar21 * fVar24 * fVar13)
                                             - fVar8 * fVar24 * fVar22) - fVar24 * fVar12 * fVar23))
                                           - fVar20 * fVar25 * fVar13) - fVar25 * fVar8 * fVar23) -
                                         fVar27 * fVar26 * fVar5) - fVar28 * fVar26 * fVar6) -
                                       fVar29 * fVar26 * fVar7)) - fVar27 * fVar33 * fVar6) -
                                     fVar28 * fVar33 * fVar7)) - fVar35 * fVar34 * fVar5) -
                                   fVar36 * fVar34 * fVar6) - fVar28 * fVar34 * fVar18) -
                                 fVar29 * fVar34 * fVar19)) - fVar35 * fVar39 * fVar6) -
                               fVar36 * fVar39 * fVar7) - fVar27 * fVar39 * fVar18) -
                             fVar28 * fVar39 * fVar19)) - fVar35 * fVar40 * fVar7) -
                           fVar27 * fVar40 * fVar19)) - fVar2 * fVar41 * fVar30) -
                         fVar4 * fVar41 * fVar31) - fVar41 * fVar3 * fVar32)) -
                       fVar2 * fVar42 * fVar31) - fVar42 * fVar4 * fVar32)) -
                     fVar16 * fVar43 * fVar30) - fVar17 * fVar43 * fVar31) - fVar4 * fVar43 * fVar37
                   ) - fVar3 * fVar43 * fVar38)) - fVar16 * fVar44 * fVar31) -
                fVar17 * fVar44 * fVar32) - fVar2 * fVar44 * fVar37) - fVar4 * fVar44 * fVar38)) -
             fVar16 * fVar45 * fVar32) - fVar2 * fVar45 * fVar38;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[4];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[1];
  fVar3 = pfVar80[2];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar79[1];
  fVar7 = pfVar79[2];
  fVar8 = pfVar82[1];
  fVar9 = pfVar82[2];
  fVar10 = pfVar78[3];
  fVar11 = pfVar78[2];
  fVar12 = pfVar80[4];
  fVar13 = pfVar80[3];
  fVar14 = pfVar81[3];
  fVar15 = pfVar81[4];
  fVar16 = pfVar79[4];
  fVar17 = pfVar79[3];
  fVar18 = pfVar82[3];
  fVar19 = pfVar82[4];
  fVar20 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[4];
  fVar22 = pfVar79[2];
  fVar23 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[1];
  fVar25 = pfVar80[2];
  fVar26 = pfVar78[3];
  fVar27 = pfVar78[2];
  fVar28 = pfVar79[4];
  fVar29 = pfVar79[3];
  fVar30 = pfVar80[3];
  fVar31 = pfVar80[4];
  fVar32 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[4];
  fVar34 = pfVar78[3];
  fVar35 = pfVar78[2];
  fVar36 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0xb)
  ;
  *pSVar83 = ((fVar22 * fVar36 * fVar19 +
              fVar28 * fVar36 * fVar9 +
              (((((fVar23 * fVar35 * fVar19 +
                  fVar22 * fVar35 * fVar18 +
                  fVar29 * fVar35 * fVar9 +
                  fVar28 * fVar35 * fVar8 +
                  ((fVar22 * fVar34 * fVar9 +
                   (((fVar23 * fVar33 * fVar9 +
                     fVar22 * fVar33 * fVar8 +
                     fVar7 * fVar32 * fVar31 +
                     fVar16 * fVar32 * fVar25 +
                     (((fVar6 * fVar27 * fVar31 +
                       fVar7 * fVar27 * fVar30 +
                       fVar17 * fVar27 * fVar25 +
                       fVar16 * fVar27 * fVar24 +
                       (((((fVar26 * fVar7 * fVar25 +
                           ((fVar21 * fVar6 * fVar25 +
                            fVar7 * fVar21 * fVar24 +
                            (((((fVar3 * fVar20 * fVar15 +
                                fVar12 * fVar20 * fVar5 +
                                (((((fVar2 * fVar11 * fVar15 +
                                    fVar3 * fVar11 * fVar14 +
                                    fVar11 * fVar13 * fVar5 +
                                    fVar11 * fVar12 * fVar4 +
                                    ((fVar3 * fVar10 * fVar5 +
                                     (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                      fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                                    fVar10 * fVar7 * fVar9)) - fVar16 * fVar11 * fVar8) -
                                  fVar17 * fVar11 * fVar9) - fVar7 * fVar11 * fVar18) -
                                fVar11 * fVar6 * fVar19)) - fVar16 * fVar20 * fVar9) -
                              fVar20 * fVar7 * fVar19) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5)) - fVar22 * fVar26 * fVar5)) -
                          fVar28 * fVar27 * fVar4) - fVar29 * fVar27 * fVar5) -
                        fVar22 * fVar27 * fVar14) - fVar23 * fVar27 * fVar15)) -
                      fVar28 * fVar32 * fVar5) - fVar22 * fVar32 * fVar15)) -
                    fVar3 * fVar33 * fVar24) - fVar33 * fVar2 * fVar25)) - fVar34 * fVar3 * fVar25))
                 - fVar12 * fVar35 * fVar24) - fVar13 * fVar35 * fVar25) - fVar3 * fVar35 * fVar30)
              - fVar2 * fVar35 * fVar31)) - fVar12 * fVar36 * fVar25) - fVar3 * fVar36 * fVar31;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[2];
  fVar2 = pfVar78[4];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[2];
  fVar4 = pfVar79[4];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar78[2];
  fVar6 = pfVar78[4];
  fVar7 = pfVar80[2];
  fVar8 = pfVar80[4];
  fVar9 = pfVar79[2];
  fVar10 = pfVar79[4];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[2];
  fVar12 = pfVar79[4];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[2];
  fVar14 = pfVar79[4];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[2];
  fVar16 = pfVar79[4];
  fVar17 = pfVar78[2];
  fVar18 = pfVar78[4];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0xc)
  ;
  *pSVar83 = ((fVar13 * fVar17 * fVar8 +
              fVar14 * fVar17 * fVar7 +
              ((fVar13 * fVar18 * fVar7 +
               fVar5 * fVar11 * fVar16 +
               fVar6 * fVar11 * fVar15 +
               (((fVar12 * fVar5 * fVar15 +
                 ((((fVar3 * fVar1 * fVar10 +
                    fVar1 * fVar4 * fVar9 + (fVar2 * fVar3 * fVar9 - fVar5 * fVar2 * fVar7)) -
                   fVar6 * fVar1 * fVar7) - fVar1 * fVar5 * fVar8) - fVar13 * fVar12 * fVar9)) -
                fVar14 * fVar11 * fVar9) - fVar13 * fVar11 * fVar10)) - fVar18 * fVar3 * fVar15)) -
             fVar4 * fVar17 * fVar15) - fVar3 * fVar17 * fVar16;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[5];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar74;
  fVar5 = pfVar74[3];
  fVar6 = *pfVar77;
  fVar7 = pfVar77[3];
  fVar8 = *pfVar76;
  fVar9 = pfVar76[3];
  fVar10 = *pfVar73;
  fVar11 = pfVar73[3];
  fVar12 = pfVar75[5];
  fVar13 = pfVar76[5];
  fVar14 = pfVar74[5];
  fVar15 = pfVar77[5];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[5];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar18 = *pfVar75;
  fVar19 = pfVar74[3];
  fVar20 = pfVar73[3];
  fVar21 = pfVar75[3];
  fVar22 = *pfVar73;
  fVar23 = pfVar74[5];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar75[5];
  fVar25 = pfVar73[5];
  fVar26 = pfVar73[3];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0xd)
  ;
  *pSVar83 = (((fVar17 * fVar27 * fVar15 +
               fVar19 * fVar27 * fVar7 +
               fVar23 * fVar27 * fVar6 +
               (((fVar17 * fVar26 * fVar7 +
                 fVar19 * fVar26 * fVar6 +
                 ((fVar17 * fVar25 * fVar6 +
                  fVar4 * fVar22 * fVar24 +
                  fVar5 * fVar22 * fVar21 +
                  fVar14 * fVar22 * fVar18 +
                  ((((fVar20 * fVar4 * fVar21 +
                     fVar5 * fVar20 * fVar18 +
                     (((fVar16 * fVar4 * fVar18 +
                       (((((fVar2 * fVar10 * fVar13 +
                           fVar3 * fVar10 * fVar9 +
                           fVar10 * fVar12 * fVar8 +
                           (((fVar2 * fVar11 * fVar9 +
                             fVar11 * fVar3 * fVar8 +
                             (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                            fVar5 * fVar11 * fVar6) - fVar11 * fVar4 * fVar7)) -
                          fVar14 * fVar10 * fVar6) - fVar5 * fVar10 * fVar7) -
                        fVar10 * fVar4 * fVar15) - fVar17 * fVar16 * fVar8)) -
                      fVar19 * fVar20 * fVar8) - fVar17 * fVar20 * fVar9)) - fVar23 * fVar22 * fVar8
                    ) - fVar19 * fVar22 * fVar9) - fVar17 * fVar22 * fVar13)) -
                 fVar25 * fVar2 * fVar18)) - fVar3 * fVar26 * fVar18) - fVar26 * fVar2 * fVar21)) -
              fVar12 * fVar27 * fVar18) - fVar3 * fVar27 * fVar21) - fVar2 * fVar27 * fVar24;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[5];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[1];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[1];
  fVar10 = pfVar73[4];
  fVar11 = pfVar75[3];
  fVar12 = pfVar76[3];
  fVar13 = pfVar74[3];
  fVar14 = pfVar77[3];
  fVar15 = pfVar73[3];
  fVar16 = pfVar75[4];
  fVar17 = pfVar76[4];
  fVar18 = pfVar74[4];
  fVar19 = pfVar77[4];
  fVar20 = pfVar73[1];
  fVar21 = pfVar75[5];
  fVar22 = pfVar76[5];
  fVar23 = pfVar74[5];
  fVar24 = pfVar77[5];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[5];
  fVar27 = pfVar74[1];
  fVar28 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = *pfVar75;
  fVar30 = pfVar75[1];
  fVar31 = pfVar73[4];
  fVar32 = pfVar74[3];
  fVar33 = pfVar75[3];
  fVar34 = pfVar73[3];
  fVar35 = pfVar74[4];
  fVar36 = pfVar75[4];
  fVar37 = pfVar73[1];
  fVar38 = pfVar74[5];
  fVar39 = pfVar75[5];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[5];
  fVar42 = pfVar73[4];
  fVar43 = pfVar73[3];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0xe)
  ;
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                ((((fVar28 * fVar44 * fVar24 +
                   fVar32 * fVar44 * fVar14 +
                   fVar38 * fVar44 * fVar8 +
                   (((((fVar28 * fVar43 * fVar19 +
                       fVar27 * fVar43 * fVar14 +
                       fVar32 * fVar43 * fVar9 +
                       fVar35 * fVar43 * fVar8 +
                       (((fVar28 * fVar42 * fVar14 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar13 * fVar37 * fVar33 +
                               fVar23 * fVar37 * fVar29 +
                               ((((fVar34 * fVar6 * fVar36 +
                                  fVar7 * fVar34 * fVar33 +
                                  fVar13 * fVar34 * fVar30 +
                                  fVar18 * fVar34 * fVar29 +
                                  (((((fVar31 * fVar6 * fVar33 +
                                      fVar13 * fVar31 * fVar29 +
                                      (((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              ((((fVar2 * fVar20 * fVar22 +
                                                 fVar11 * fVar20 * fVar12 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((((fVar2 * fVar15 * fVar17 +
                                                     fVar3 * fVar15 * fVar12 +
                                                     fVar11 * fVar15 * fVar5 +
                                                     fVar15 * fVar16 * fVar4 +
                                                     (((fVar2 * fVar10 * fVar12 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar10 * fVar6 * fVar14)) -
                                                    fVar18 * fVar15 * fVar8) -
                                                   fVar13 * fVar15 * fVar9) -
                                                  fVar7 * fVar15 * fVar14) - fVar15 * fVar6 * fVar19
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar13 * fVar20 * fVar14) - fVar20 * fVar6 * fVar24))
                                             - fVar23 * fVar25 * fVar9) - fVar18 * fVar25 * fVar14)
                                           - fVar13 * fVar25 * fVar19) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar28 * fVar31 * fVar12)) -
                                     fVar35 * fVar34 * fVar4) - fVar32 * fVar34 * fVar5) -
                                   fVar27 * fVar34 * fVar12) - fVar28 * fVar34 * fVar17)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar12) -
                               fVar28 * fVar37 * fVar22)) - fVar38 * fVar40 * fVar5) -
                             fVar35 * fVar40 * fVar12) - fVar32 * fVar40 * fVar17) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                     fVar11 * fVar43 * fVar30) - fVar3 * fVar43 * fVar33) - fVar43 * fVar2 * fVar36)
                   ) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar33) -
                fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) -
             fVar11 * fVar45 * fVar36) - fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[5];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[2];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[1];
  fVar7 = pfVar76[2];
  fVar8 = pfVar74[2];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[1];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  fVar13 = pfVar77[2];
  fVar14 = pfVar73[4];
  fVar15 = pfVar75[4];
  fVar16 = pfVar75[3];
  fVar17 = pfVar76[3];
  fVar18 = pfVar76[4];
  fVar19 = pfVar74[4];
  fVar20 = pfVar74[3];
  fVar21 = pfVar77[3];
  fVar22 = pfVar77[4];
  fVar23 = pfVar73[3];
  fVar24 = pfVar73[2];
  fVar25 = pfVar75[5];
  fVar26 = pfVar76[5];
  fVar27 = pfVar74[5];
  fVar28 = pfVar77[5];
  fVar29 = pfVar73[1];
  fVar30 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar73[5];
  fVar32 = pfVar74[2];
  fVar33 = pfVar74[1];
  fVar34 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar35 = *pfVar75;
  fVar36 = pfVar75[1];
  fVar37 = pfVar75[2];
  fVar38 = pfVar73[4];
  fVar39 = pfVar74[4];
  fVar40 = pfVar74[3];
  fVar41 = pfVar75[3];
  fVar42 = pfVar75[4];
  fVar43 = pfVar73[3];
  fVar44 = pfVar73[2];
  fVar45 = pfVar74[5];
  fVar46 = pfVar75[5];
  fVar47 = pfVar73[1];
  fVar48 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar49 = pfVar73[5];
  fVar50 = pfVar73[4];
  fVar51 = pfVar73[3];
  fVar52 = pfVar73[2];
  fVar53 = pfVar73[1];
  fVar54 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0xf)
  ;
  *pSVar83 = (((fVar32 * fVar54 * fVar28 +
               fVar39 * fVar54 * fVar22 +
               fVar45 * fVar54 * fVar13 +
               (((((fVar33 * fVar53 * fVar28 +
                   fVar40 * fVar53 * fVar22 +
                   fVar39 * fVar53 * fVar21 +
                   fVar45 * fVar53 * fVar10 +
                   ((((fVar34 * fVar52 * fVar28 +
                      fVar40 * fVar52 * fVar21 +
                      fVar45 * fVar52 * fVar9 +
                      (((((fVar33 * fVar51 * fVar22 +
                          fVar32 * fVar51 * fVar21 +
                          fVar40 * fVar51 * fVar13 +
                          fVar39 * fVar51 * fVar10 +
                          (((((fVar34 * fVar50 * fVar22 +
                              fVar33 * fVar50 * fVar21 +
                              fVar40 * fVar50 * fVar10 +
                              fVar39 * fVar50 * fVar9 +
                              ((((fVar34 * fVar49 * fVar13 +
                                 fVar33 * fVar49 * fVar10 +
                                 fVar32 * fVar49 * fVar9 +
                                 fVar8 * fVar48 * fVar46 +
                                 fVar19 * fVar48 * fVar42 +
                                 fVar27 * fVar48 * fVar37 +
                                 ((((fVar12 * fVar47 * fVar46 +
                                    fVar20 * fVar47 * fVar42 +
                                    fVar19 * fVar47 * fVar41 +
                                    fVar27 * fVar47 * fVar36 +
                                    (((((fVar11 * fVar44 * fVar46 +
                                        fVar20 * fVar44 * fVar41 +
                                        fVar27 * fVar44 * fVar35 +
                                        ((((fVar43 * fVar12 * fVar42 +
                                           fVar8 * fVar43 * fVar41 +
                                           fVar20 * fVar43 * fVar37 +
                                           fVar19 * fVar43 * fVar36 +
                                           (((((fVar38 * fVar11 * fVar42 +
                                               fVar12 * fVar38 * fVar41 +
                                               fVar20 * fVar38 * fVar36 +
                                               fVar19 * fVar38 * fVar35 +
                                               (((((fVar31 * fVar11 * fVar37 +
                                                   fVar12 * fVar31 * fVar36 +
                                                   fVar8 * fVar31 * fVar35 +
                                                   (((((((fVar2 * fVar30 * fVar26 +
                                                         fVar15 * fVar30 * fVar18 +
                                                         fVar25 * fVar30 * fVar7 +
                                                         (((((fVar4 * fVar29 * fVar26 +
                                                             fVar16 * fVar29 * fVar18 +
                                                             fVar15 * fVar29 * fVar17 +
                                                             fVar25 * fVar29 * fVar6 +
                                                             ((((fVar3 * fVar24 * fVar26 +
                                                                fVar16 * fVar24 * fVar17 +
                                                                fVar24 * fVar25 * fVar5 +
                                                                (((((fVar4 * fVar23 * fVar18 +
                                                                    fVar2 * fVar23 * fVar17 +
                                                                    fVar16 * fVar23 * fVar7 +
                                                                    fVar15 * fVar23 * fVar6 +
                                                                    (((((fVar3 * fVar14 * fVar18 +
                                                                        fVar4 * fVar14 * fVar17 +
                                                                        fVar14 * fVar16 * fVar6 +
                                                                        fVar14 * fVar15 * fVar5 +
                                                                        ((((fVar1 * fVar3 * fVar7 +
                                                                           fVar1 * fVar2 * fVar5 +
                                                                           fVar1 * fVar4 * fVar6) -
                                                                          fVar8 * fVar1 * fVar9) -
                                                                         fVar12 * fVar1 * fVar10) -
                                                                        fVar1 * fVar11 * fVar13)) -
                                                                       fVar19 * fVar14 * fVar9) -
                                                                      fVar20 * fVar14 * fVar10) -
                                                                     fVar12 * fVar14 * fVar21) -
                                                                    fVar14 * fVar11 * fVar22)) -
                                                                   fVar19 * fVar23 * fVar10) -
                                                                  fVar20 * fVar23 * fVar13) -
                                                                 fVar8 * fVar23 * fVar21) -
                                                                fVar23 * fVar12 * fVar22)) -
                                                               fVar27 * fVar24 * fVar9) -
                                                              fVar20 * fVar24 * fVar21) -
                                                             fVar24 * fVar11 * fVar28)) -
                                                            fVar27 * fVar29 * fVar10) -
                                                           fVar19 * fVar29 * fVar21) -
                                                          fVar20 * fVar29 * fVar22) -
                                                         fVar29 * fVar12 * fVar28)) -
                                                        fVar27 * fVar30 * fVar13) -
                                                       fVar19 * fVar30 * fVar22) -
                                                      fVar30 * fVar8 * fVar28) -
                                                     fVar32 * fVar31 * fVar5) -
                                                    fVar33 * fVar31 * fVar6) -
                                                   fVar34 * fVar31 * fVar7)) -
                                                  fVar39 * fVar38 * fVar5) - fVar40 * fVar38 * fVar6
                                                 ) - fVar33 * fVar38 * fVar17) -
                                               fVar34 * fVar38 * fVar18)) - fVar39 * fVar43 * fVar6)
                                             - fVar40 * fVar43 * fVar7) - fVar32 * fVar43 * fVar17)
                                           - fVar33 * fVar43 * fVar18)) - fVar45 * fVar44 * fVar5) -
                                         fVar40 * fVar44 * fVar17) - fVar34 * fVar44 * fVar26)) -
                                       fVar45 * fVar47 * fVar6) - fVar39 * fVar47 * fVar17) -
                                     fVar40 * fVar47 * fVar18) - fVar33 * fVar47 * fVar26)) -
                                   fVar45 * fVar48 * fVar7) - fVar39 * fVar48 * fVar18) -
                                 fVar32 * fVar48 * fVar26)) - fVar2 * fVar49 * fVar35) -
                               fVar4 * fVar49 * fVar36) - fVar49 * fVar3 * fVar37)) -
                             fVar15 * fVar50 * fVar35) - fVar16 * fVar50 * fVar36) -
                           fVar4 * fVar50 * fVar41) - fVar50 * fVar3 * fVar42)) -
                         fVar15 * fVar51 * fVar36) - fVar16 * fVar51 * fVar37) -
                       fVar2 * fVar51 * fVar41) - fVar51 * fVar4 * fVar42)) -
                     fVar25 * fVar52 * fVar35) - fVar16 * fVar52 * fVar41) - fVar3 * fVar52 * fVar46
                   )) - fVar25 * fVar53 * fVar36) - fVar15 * fVar53 * fVar41) -
                fVar16 * fVar53 * fVar42) - fVar4 * fVar53 * fVar46)) - fVar25 * fVar54 * fVar37) -
             fVar15 * fVar54 * fVar42) - fVar2 * fVar54 * fVar46;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[1];
  fVar3 = pfVar80[2];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar79[1];
  fVar7 = pfVar79[2];
  fVar8 = pfVar82[1];
  fVar9 = pfVar82[2];
  fVar10 = pfVar78[4];
  fVar11 = pfVar80[4];
  fVar12 = pfVar80[3];
  fVar13 = pfVar81[3];
  fVar14 = pfVar81[4];
  fVar15 = pfVar79[4];
  fVar16 = pfVar79[3];
  fVar17 = pfVar82[3];
  fVar18 = pfVar82[4];
  fVar19 = pfVar78[3];
  fVar20 = pfVar78[2];
  fVar21 = pfVar80[5];
  fVar22 = pfVar81[5];
  fVar23 = pfVar79[5];
  fVar24 = pfVar82[5];
  fVar25 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[5];
  fVar27 = pfVar79[2];
  fVar28 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = pfVar80[1];
  fVar30 = pfVar80[2];
  fVar31 = pfVar78[4];
  fVar32 = pfVar79[4];
  fVar33 = pfVar79[3];
  fVar34 = pfVar80[3];
  fVar35 = pfVar80[4];
  fVar36 = pfVar78[3];
  fVar37 = pfVar78[2];
  fVar38 = pfVar79[5];
  fVar39 = pfVar80[5];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[5];
  fVar42 = pfVar78[4];
  fVar43 = pfVar78[3];
  fVar44 = pfVar78[2];
  fVar45 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x10
                      );
  *pSVar83 = (((fVar27 * fVar45 * fVar24 +
               fVar32 * fVar45 * fVar18 +
               fVar38 * fVar45 * fVar9 +
               (((((fVar28 * fVar44 * fVar24 +
                   fVar33 * fVar44 * fVar18 +
                   fVar32 * fVar44 * fVar17 +
                   fVar38 * fVar44 * fVar8 +
                   (((fVar27 * fVar43 * fVar18 +
                     fVar32 * fVar43 * fVar9 +
                     (((((fVar28 * fVar42 * fVar18 +
                         fVar27 * fVar42 * fVar17 +
                         fVar33 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar15 * fVar40 * fVar35 +
                           fVar23 * fVar40 * fVar30 +
                           ((((fVar6 * fVar37 * fVar39 +
                              fVar16 * fVar37 * fVar35 +
                              fVar15 * fVar37 * fVar34 +
                              fVar23 * fVar37 * fVar29 +
                              (((((fVar36 * fVar7 * fVar35 +
                                  fVar15 * fVar36 * fVar30 +
                                  (((fVar31 * fVar6 * fVar35 +
                                    fVar7 * fVar31 * fVar34 +
                                    fVar16 * fVar31 * fVar30 +
                                    fVar15 * fVar31 * fVar29 +
                                    (((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        ((((((fVar3 * fVar25 * fVar22 +
                                             fVar11 * fVar25 * fVar14 +
                                             fVar21 * fVar25 * fVar5 +
                                             (((((fVar2 * fVar20 * fVar22 +
                                                 fVar12 * fVar20 * fVar14 +
                                                 fVar11 * fVar20 * fVar13 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((fVar3 * fVar19 * fVar14 +
                                                   fVar11 * fVar19 * fVar5 +
                                                   (((((fVar2 * fVar10 * fVar14 +
                                                       fVar3 * fVar10 * fVar13 +
                                                       fVar10 * fVar12 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar15 * fVar10 * fVar8) -
                                                     fVar16 * fVar10 * fVar9) -
                                                    fVar7 * fVar10 * fVar17) -
                                                   fVar10 * fVar6 * fVar18)) -
                                                  fVar15 * fVar19 * fVar9) - fVar19 * fVar7 * fVar18
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar15 * fVar20 * fVar17) - fVar16 * fVar20 * fVar18)
                                             - fVar20 * fVar6 * fVar24)) - fVar23 * fVar25 * fVar9)
                                           - fVar15 * fVar25 * fVar18) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar33 * fVar31 * fVar5) -
                                     fVar27 * fVar31 * fVar13) - fVar28 * fVar31 * fVar14)) -
                                   fVar32 * fVar36 * fVar5) - fVar27 * fVar36 * fVar14)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar13) -
                               fVar33 * fVar37 * fVar14) - fVar28 * fVar37 * fVar22)) -
                             fVar38 * fVar40 * fVar5) - fVar32 * fVar40 * fVar14) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar12 * fVar42 * fVar30) - fVar3 * fVar42 * fVar34) -
                     fVar42 * fVar2 * fVar35)) - fVar11 * fVar43 * fVar30) - fVar43 * fVar3 * fVar35
                   )) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar34) -
                fVar12 * fVar44 * fVar35) - fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) -
             fVar11 * fVar45 * fVar35) - fVar3 * fVar45 * fVar39;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar79[2];
  fVar5 = pfVar79[4];
  fVar6 = pfVar82[2];
  fVar7 = pfVar82[4];
  fVar8 = pfVar81[2];
  fVar9 = pfVar81[4];
  fVar10 = pfVar78[2];
  fVar11 = pfVar78[4];
  fVar12 = pfVar80[5];
  fVar13 = pfVar81[5];
  fVar14 = pfVar79[5];
  fVar15 = pfVar82[5];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[5];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar18 = pfVar80[2];
  fVar19 = pfVar79[4];
  fVar20 = pfVar78[4];
  fVar21 = pfVar80[4];
  fVar22 = pfVar78[2];
  fVar23 = pfVar79[5];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[5];
  fVar25 = pfVar78[5];
  fVar26 = pfVar78[4];
  fVar27 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x11
                      );
  *pSVar83 = (((fVar17 * fVar27 * fVar15 +
               fVar19 * fVar27 * fVar7 +
               fVar23 * fVar27 * fVar6 +
               (((fVar17 * fVar26 * fVar7 +
                 fVar19 * fVar26 * fVar6 +
                 ((fVar17 * fVar25 * fVar6 +
                  fVar4 * fVar22 * fVar24 +
                  fVar5 * fVar22 * fVar21 +
                  fVar14 * fVar22 * fVar18 +
                  ((((fVar20 * fVar4 * fVar21 +
                     fVar5 * fVar20 * fVar18 +
                     (((fVar16 * fVar4 * fVar18 +
                       (((((fVar2 * fVar10 * fVar13 +
                           fVar3 * fVar10 * fVar9 +
                           fVar10 * fVar12 * fVar8 +
                           (((fVar2 * fVar11 * fVar9 +
                             fVar11 * fVar3 * fVar8 +
                             (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                            fVar5 * fVar11 * fVar6) - fVar11 * fVar4 * fVar7)) -
                          fVar14 * fVar10 * fVar6) - fVar5 * fVar10 * fVar7) -
                        fVar10 * fVar4 * fVar15) - fVar17 * fVar16 * fVar8)) -
                      fVar19 * fVar20 * fVar8) - fVar17 * fVar20 * fVar9)) - fVar23 * fVar22 * fVar8
                    ) - fVar19 * fVar22 * fVar9) - fVar17 * fVar22 * fVar13)) -
                 fVar25 * fVar2 * fVar18)) - fVar3 * fVar26 * fVar18) - fVar26 * fVar2 * fVar21)) -
              fVar12 * fVar27 * fVar18) - fVar3 * fVar27 * fVar21) - fVar2 * fVar27 * fVar24;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[5];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[3];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[3];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[3];
  fVar10 = *pfVar73;
  fVar11 = pfVar73[3];
  fVar12 = pfVar75[5];
  fVar13 = pfVar76[5];
  fVar14 = pfVar74[5];
  fVar15 = pfVar77[5];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[5];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar74[3];
  fVar18 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar19 = *pfVar75;
  fVar20 = pfVar75[3];
  fVar21 = pfVar73[3];
  fVar22 = pfVar74[5];
  fVar23 = pfVar75[5];
  fVar24 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar73[5];
  fVar26 = pfVar73[3];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x12
                      );
  *pSVar83 = ((fVar17 * fVar27 * fVar15 +
              fVar22 * fVar27 * fVar9 +
              ((((fVar18 * fVar26 * fVar15 +
                 fVar17 * fVar26 * fVar9 +
                 fVar22 * fVar26 * fVar8 +
                 (((fVar18 * fVar25 * fVar9 +
                   fVar17 * fVar25 * fVar8 +
                   fVar7 * fVar24 * fVar23 +
                   fVar14 * fVar24 * fVar20 +
                   (((fVar6 * fVar21 * fVar23 +
                     fVar7 * fVar21 * fVar20 +
                     fVar14 * fVar21 * fVar19 +
                     ((((fVar16 * fVar6 * fVar20 +
                        fVar7 * fVar16 * fVar19 +
                        (((((fVar3 * fVar10 * fVar13 +
                            fVar12 * fVar10 * fVar5 +
                            ((((fVar2 * fVar11 * fVar13 +
                               fVar3 * fVar11 * fVar5 +
                               fVar11 * fVar12 * fVar4 +
                               (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                              fVar14 * fVar11 * fVar8) - fVar7 * fVar11 * fVar9) -
                            fVar11 * fVar6 * fVar15)) - fVar14 * fVar10 * fVar9) -
                          fVar10 * fVar7 * fVar15) - fVar17 * fVar16 * fVar4) -
                        fVar18 * fVar16 * fVar5)) - fVar22 * fVar21 * fVar4) -
                      fVar17 * fVar21 * fVar5) - fVar18 * fVar21 * fVar13)) -
                    fVar22 * fVar24 * fVar5) - fVar17 * fVar24 * fVar13)) - fVar3 * fVar25 * fVar19)
                 - fVar25 * fVar2 * fVar20)) - fVar12 * fVar26 * fVar19) - fVar3 * fVar26 * fVar20)
              - fVar2 * fVar26 * fVar23)) - fVar12 * fVar27 * fVar20) - fVar3 * fVar27 * fVar23;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[5];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[4];
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar75;
  fVar7 = pfVar75[1];
  fVar8 = pfVar76[3];
  fVar9 = pfVar76[4];
  fVar10 = pfVar74[4];
  fVar11 = *pfVar77;
  fVar12 = pfVar77[1];
  fVar13 = pfVar74[3];
  fVar14 = pfVar74[1];
  fVar15 = pfVar77[3];
  fVar16 = *pfVar74;
  fVar17 = pfVar77[4];
  fVar18 = pfVar73[4];
  fVar19 = pfVar75[5];
  fVar20 = pfVar76[5];
  fVar21 = pfVar74[5];
  fVar22 = pfVar77[5];
  fVar23 = pfVar73[3];
  fVar24 = pfVar73[1];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[5];
  fVar27 = pfVar74[4];
  fVar28 = pfVar74[3];
  fVar29 = pfVar74[1];
  fVar30 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = *pfVar75;
  fVar32 = pfVar75[1];
  fVar33 = pfVar75[3];
  fVar34 = pfVar75[4];
  fVar35 = pfVar73[4];
  fVar36 = pfVar74[5];
  fVar37 = pfVar75[5];
  fVar38 = pfVar73[3];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[5];
  fVar42 = pfVar73[4];
  fVar43 = pfVar73[3];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x13
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                (((((fVar29 * fVar43 * fVar22 +
                    fVar28 * fVar43 * fVar17 +
                    fVar27 * fVar43 * fVar15 +
                    fVar36 * fVar43 * fVar12 +
                    ((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar13 * fVar38 * fVar34 +
                               fVar10 * fVar38 * fVar33 +
                               fVar21 * fVar38 * fVar32 +
                               (((((fVar16 * fVar35 * fVar37 +
                                   fVar13 * fVar35 * fVar33 +
                                   fVar21 * fVar35 * fVar31 +
                                   ((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              (((((fVar7 * fVar23 * fVar20 +
                                                  fVar3 * fVar23 * fVar9 +
                                                  fVar2 * fVar23 * fVar8 +
                                                  fVar19 * fVar23 * fVar5 +
                                                  ((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar13 * fVar18 * fVar15) -
                                                  fVar18 * fVar16 * fVar22)) -
                                                 fVar21 * fVar23 * fVar12) -
                                                fVar10 * fVar23 * fVar15) - fVar13 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar28 * fVar35 * fVar8) -
                                   fVar30 * fVar35 * fVar20)) - fVar36 * fVar38 * fVar5) -
                                 fVar27 * fVar38 * fVar8) - fVar28 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar3 * fVar42 * fVar33) - fVar6 * fVar42 * fVar37)) - fVar19 * fVar43 * fVar32
                   ) - fVar2 * fVar43 * fVar33) - fVar3 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37
                )) - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) -
             fVar19 * fVar45 * fVar34) - fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[4];
  fVar3 = pfVar80[3];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[2];
  fVar8 = pfVar81[3];
  fVar9 = pfVar81[4];
  fVar10 = pfVar79[4];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[2];
  fVar13 = pfVar79[3];
  fVar14 = pfVar79[2];
  fVar15 = pfVar82[3];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[4];
  fVar18 = pfVar78[4];
  fVar19 = pfVar80[5];
  fVar20 = pfVar81[5];
  fVar21 = pfVar79[5];
  fVar22 = pfVar82[5];
  fVar23 = pfVar78[3];
  fVar24 = pfVar78[2];
  fVar25 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[5];
  fVar27 = pfVar79[4];
  fVar28 = pfVar79[3];
  fVar29 = pfVar79[2];
  fVar30 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar80[1];
  fVar32 = pfVar80[2];
  fVar33 = pfVar80[3];
  fVar34 = pfVar80[4];
  fVar35 = pfVar78[4];
  fVar36 = pfVar79[5];
  fVar37 = pfVar80[5];
  fVar38 = pfVar78[3];
  fVar39 = pfVar78[2];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[5];
  fVar42 = pfVar78[4];
  fVar43 = pfVar78[3];
  fVar44 = pfVar78[2];
  fVar45 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x14
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                ((((fVar29 * fVar43 * fVar22 +
                   fVar27 * fVar43 * fVar17 +
                   fVar36 * fVar43 * fVar12 +
                   (((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar17 +
                       fVar27 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar10 * fVar38 * fVar34 +
                               fVar21 * fVar38 * fVar32 +
                               ((((fVar16 * fVar35 * fVar37 +
                                  fVar13 * fVar35 * fVar34 +
                                  fVar10 * fVar35 * fVar33 +
                                  fVar21 * fVar35 * fVar31 +
                                  (((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              ((((fVar7 * fVar23 * fVar20 +
                                                 fVar2 * fVar23 * fVar9 +
                                                 fVar19 * fVar23 * fVar5 +
                                                 (((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar9 +
                                                     fVar2 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar10 * fVar18 * fVar15) -
                                                  fVar13 * fVar18 * fVar17) -
                                                 fVar18 * fVar16 * fVar22)) -
                                                fVar21 * fVar23 * fVar12) - fVar10 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar27 * fVar35 * fVar8) -
                                   fVar28 * fVar35 * fVar9) - fVar30 * fVar35 * fVar20)) -
                                 fVar36 * fVar38 * fVar5) - fVar27 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar2 * fVar42 * fVar33) - fVar3 * fVar42 * fVar34) - fVar6 * fVar42 * fVar37))
                  - fVar19 * fVar43 * fVar32) - fVar2 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37))
               - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) - fVar19 * fVar45 * fVar34) -
             fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[2];
  fVar5 = pfVar81[4];
  fVar6 = pfVar79[2];
  fVar7 = pfVar79[4];
  fVar8 = pfVar82[2];
  fVar9 = pfVar82[4];
  fVar10 = pfVar78[2];
  fVar11 = pfVar78[4];
  fVar12 = pfVar80[5];
  fVar13 = pfVar81[5];
  fVar14 = pfVar79[5];
  fVar15 = pfVar82[5];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[5];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[4];
  fVar18 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar19 = pfVar80[2];
  fVar20 = pfVar80[4];
  fVar21 = pfVar78[4];
  fVar22 = pfVar79[5];
  fVar23 = pfVar80[5];
  fVar24 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar78[5];
  fVar26 = pfVar78[4];
  fVar27 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x15
                      );
  *pSVar83 = ((fVar17 * fVar27 * fVar15 +
              fVar22 * fVar27 * fVar9 +
              ((((fVar18 * fVar26 * fVar15 +
                 fVar17 * fVar26 * fVar9 +
                 fVar22 * fVar26 * fVar8 +
                 (((fVar18 * fVar25 * fVar9 +
                   fVar17 * fVar25 * fVar8 +
                   fVar7 * fVar24 * fVar23 +
                   fVar14 * fVar24 * fVar20 +
                   (((fVar6 * fVar21 * fVar23 +
                     fVar7 * fVar21 * fVar20 +
                     fVar14 * fVar21 * fVar19 +
                     ((((fVar16 * fVar6 * fVar20 +
                        fVar7 * fVar16 * fVar19 +
                        (((((fVar3 * fVar10 * fVar13 +
                            fVar12 * fVar10 * fVar5 +
                            ((((fVar2 * fVar11 * fVar13 +
                               fVar3 * fVar11 * fVar5 +
                               fVar11 * fVar12 * fVar4 +
                               (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                              fVar14 * fVar11 * fVar8) - fVar7 * fVar11 * fVar9) -
                            fVar11 * fVar6 * fVar15)) - fVar14 * fVar10 * fVar9) -
                          fVar10 * fVar7 * fVar15) - fVar17 * fVar16 * fVar4) -
                        fVar18 * fVar16 * fVar5)) - fVar22 * fVar21 * fVar4) -
                      fVar17 * fVar21 * fVar5) - fVar18 * fVar21 * fVar13)) -
                    fVar22 * fVar24 * fVar5) - fVar17 * fVar24 * fVar13)) - fVar3 * fVar25 * fVar19)
                 - fVar25 * fVar2 * fVar20)) - fVar12 * fVar26 * fVar19) - fVar3 * fVar26 * fVar20)
              - fVar2 * fVar26 * fVar23)) - fVar12 * fVar27 * fVar20) - fVar3 * fVar27 * fVar23;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[5];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[5];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[3];
  pfVar75 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar76 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar75;
  fVar6 = pfVar75[3];
  fVar7 = pfVar75[5];
  fVar8 = pfVar74[5];
  fVar9 = *pfVar76;
  fVar10 = pfVar76[3];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[3];
  fVar13 = pfVar76[5];
  fVar14 = *pfVar73;
  fVar15 = pfVar73[3];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[5];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar74[5];
  fVar18 = pfVar74[3];
  fVar19 = *pfVar74;
  pfVar74 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar20 = *pfVar74;
  fVar21 = pfVar74[3];
  fVar22 = pfVar74[5];
  fVar23 = pfVar73[3];
  fVar24 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar73[5];
  fVar26 = pfVar73[3];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x16
                      );
  *pSVar83 = (fVar17 * fVar27 * fVar13 +
             (((fVar18 * fVar26 * fVar13 +
               fVar17 * fVar26 * fVar10 +
               ((((fVar19 * fVar25 * fVar13 +
                  fVar18 * fVar25 * fVar10 +
                  fVar17 * fVar25 * fVar9 +
                  fVar8 * fVar24 * fVar22 +
                  ((fVar12 * fVar23 * fVar22 +
                   fVar8 * fVar23 * fVar21 +
                   (((fVar11 * fVar16 * fVar22 +
                     fVar12 * fVar16 * fVar21 +
                     fVar8 * fVar16 * fVar20 +
                     (((((fVar2 * fVar14 * fVar7 +
                         (((fVar4 * fVar15 * fVar7 +
                           fVar2 * fVar15 * fVar6 +
                           ((((fVar1 * fVar3 * fVar7 + fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6
                              ) - fVar8 * fVar1 * fVar9) - fVar12 * fVar1 * fVar10) -
                           fVar1 * fVar11 * fVar13)) - fVar8 * fVar15 * fVar10) -
                         fVar15 * fVar12 * fVar13)) - fVar14 * fVar8 * fVar13) -
                       fVar17 * fVar16 * fVar5) - fVar18 * fVar16 * fVar6) - fVar19 * fVar16 * fVar7
                     )) - fVar17 * fVar23 * fVar6) - fVar18 * fVar23 * fVar7)) -
                  fVar17 * fVar24 * fVar7)) - fVar2 * fVar25 * fVar20) - fVar4 * fVar25 * fVar21) -
               fVar3 * fVar25 * fVar22)) - fVar2 * fVar26 * fVar21) - fVar4 * fVar26 * fVar22)) -
             fVar2 * fVar27 * fVar22;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[3];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[3];
  fVar8 = pfVar81[4];
  fVar9 = pfVar81[5];
  fVar10 = pfVar79[5];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[3];
  fVar13 = pfVar79[4];
  fVar14 = pfVar79[3];
  fVar15 = pfVar82[4];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[5];
  fVar18 = pfVar78[4];
  fVar19 = pfVar78[3];
  fVar20 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[5];
  fVar22 = pfVar79[5];
  fVar23 = pfVar79[4];
  fVar24 = pfVar79[3];
  fVar25 = pfVar79[1];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar79[1];
  fVar27 = pfVar79[3];
  fVar28 = pfVar79[4];
  fVar29 = pfVar79[5];
  fVar30 = pfVar78[4];
  fVar31 = pfVar78[3];
  fVar32 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[5];
  fVar34 = pfVar78[4];
  fVar35 = pfVar78[3];
  fVar36 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x17
                      );
  *pSVar83 = (fVar22 * fVar36 * fVar17 +
             (((fVar23 * fVar35 * fVar17 +
               fVar22 * fVar35 * fVar15 +
               (((fVar24 * fVar34 * fVar17 +
                 fVar22 * fVar34 * fVar12 +
                 (((((fVar25 * fVar33 * fVar17 +
                     fVar24 * fVar33 * fVar15 +
                     fVar23 * fVar33 * fVar12 +
                     fVar22 * fVar33 * fVar11 +
                     fVar10 * fVar32 * fVar29 +
                     ((fVar13 * fVar31 * fVar29 +
                      fVar10 * fVar31 * fVar28 +
                      (((fVar14 * fVar30 * fVar29 +
                        fVar10 * fVar30 * fVar27 +
                        (((fVar16 * fVar21 * fVar29 +
                          fVar14 * fVar21 * fVar28 +
                          fVar13 * fVar21 * fVar27 +
                          fVar10 * fVar21 * fVar26 +
                          ((((((fVar2 * fVar20 * fVar9 +
                               (((fVar3 * fVar19 * fVar9 +
                                 fVar2 * fVar19 * fVar8 +
                                 (((fVar7 * fVar18 * fVar9 +
                                   fVar2 * fVar18 * fVar5 +
                                   (((((fVar1 * fVar6 * fVar9 +
                                       fVar1 * fVar7 * fVar8 +
                                       fVar1 * fVar2 * fVar4 + fVar1 * fVar3 * fVar5) -
                                      fVar10 * fVar1 * fVar11) - fVar13 * fVar1 * fVar12) -
                                    fVar14 * fVar1 * fVar15) - fVar1 * fVar16 * fVar17)) -
                                  fVar10 * fVar18 * fVar12) - fVar18 * fVar14 * fVar17)) -
                                fVar10 * fVar19 * fVar15) - fVar19 * fVar13 * fVar17)) -
                              fVar20 * fVar10 * fVar17) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5) - fVar24 * fVar21 * fVar8) -
                          fVar25 * fVar21 * fVar9)) - fVar22 * fVar30 * fVar5) -
                        fVar24 * fVar30 * fVar9)) - fVar22 * fVar31 * fVar8) -
                      fVar23 * fVar31 * fVar9)) - fVar22 * fVar32 * fVar9)) -
                    fVar2 * fVar33 * fVar26) - fVar3 * fVar33 * fVar27) - fVar7 * fVar33 * fVar28) -
                 fVar6 * fVar33 * fVar29)) - fVar2 * fVar34 * fVar27) - fVar7 * fVar34 * fVar29)) -
              fVar2 * fVar35 * fVar28) - fVar3 * fVar35 * fVar29)) - fVar2 * fVar36 * fVar29;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[2];
  fVar4 = pfVar80[4];
  pfVar80 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar81 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar80[2];
  fVar6 = pfVar80[4];
  fVar7 = pfVar80[5];
  fVar8 = pfVar79[5];
  fVar9 = pfVar81[2];
  fVar10 = pfVar81[4];
  fVar11 = pfVar79[2];
  fVar12 = pfVar79[4];
  fVar13 = pfVar81[5];
  fVar14 = pfVar78[2];
  fVar15 = pfVar78[4];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[5];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[5];
  fVar18 = pfVar79[4];
  fVar19 = pfVar79[2];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar20 = pfVar79[2];
  fVar21 = pfVar79[4];
  fVar22 = pfVar79[5];
  fVar23 = pfVar78[4];
  fVar24 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar78[5];
  fVar26 = pfVar78[4];
  fVar27 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x18
                      );
  *pSVar83 = (fVar17 * fVar27 * fVar13 +
             (((fVar18 * fVar26 * fVar13 +
               fVar17 * fVar26 * fVar10 +
               ((((fVar19 * fVar25 * fVar13 +
                  fVar18 * fVar25 * fVar10 +
                  fVar17 * fVar25 * fVar9 +
                  fVar8 * fVar24 * fVar22 +
                  ((fVar12 * fVar23 * fVar22 +
                   fVar8 * fVar23 * fVar21 +
                   (((fVar11 * fVar16 * fVar22 +
                     fVar12 * fVar16 * fVar21 +
                     fVar8 * fVar16 * fVar20 +
                     (((((fVar2 * fVar14 * fVar7 +
                         (((fVar4 * fVar15 * fVar7 +
                           fVar2 * fVar15 * fVar6 +
                           ((((fVar1 * fVar3 * fVar7 + fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6
                              ) - fVar8 * fVar1 * fVar9) - fVar12 * fVar1 * fVar10) -
                           fVar1 * fVar11 * fVar13)) - fVar8 * fVar15 * fVar10) -
                         fVar15 * fVar12 * fVar13)) - fVar14 * fVar8 * fVar13) -
                       fVar17 * fVar16 * fVar5) - fVar18 * fVar16 * fVar6) - fVar19 * fVar16 * fVar7
                     )) - fVar17 * fVar23 * fVar6) - fVar18 * fVar23 * fVar7)) -
                  fVar17 * fVar24 * fVar7)) - fVar2 * fVar25 * fVar20) - fVar4 * fVar25 * fVar21) -
               fVar3 * fVar25 * fVar22)) - fVar2 * fVar26 * fVar21) - fVar4 * fVar26 * fVar22)) -
             fVar2 * fVar27 * fVar22;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[3];
  fVar2 = pfVar78[5];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[3];
  fVar4 = pfVar79[5];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar79[3];
  fVar6 = pfVar79[5];
  fVar7 = pfVar78[3];
  fVar8 = pfVar78[5];
  fVar9 = pfVar80[3];
  fVar10 = pfVar80[5];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[3];
  fVar12 = pfVar79[5];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[3];
  fVar14 = pfVar79[5];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[3];
  fVar16 = pfVar79[5];
  fVar17 = pfVar78[3];
  fVar18 = pfVar78[5];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x19
                      );
  *pSVar83 = (fVar14 * fVar17 * fVar10 +
             (((fVar13 * fVar18 * fVar10 +
               fVar14 * fVar18 * fVar9 +
               fVar8 * fVar11 * fVar16 +
               ((fVar7 * fVar12 * fVar16 +
                fVar8 * fVar12 * fVar15 +
                ((((fVar4 * fVar1 * fVar6 +
                   (((fVar2 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6) - fVar8 * fVar2 * fVar9) -
                   fVar2 * fVar7 * fVar10)) - fVar1 * fVar8 * fVar10) - fVar14 * fVar12 * fVar5) -
                fVar13 * fVar12 * fVar6)) - fVar14 * fVar11 * fVar6)) - fVar4 * fVar18 * fVar15) -
             fVar3 * fVar18 * fVar16)) - fVar4 * fVar17 * fVar16;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[4];
  fVar2 = pfVar78[5];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[4];
  fVar4 = pfVar79[5];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar79[4];
  fVar6 = pfVar79[5];
  fVar7 = pfVar78[4];
  fVar8 = pfVar78[5];
  fVar9 = pfVar80[4];
  fVar10 = pfVar80[5];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[4];
  fVar12 = pfVar79[5];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[4];
  fVar14 = pfVar79[5];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[4];
  fVar16 = pfVar79[5];
  fVar17 = pfVar78[4];
  fVar18 = pfVar78[5];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x1a
                      );
  *pSVar83 = (fVar14 * fVar17 * fVar10 +
             (((fVar13 * fVar18 * fVar10 +
               fVar14 * fVar18 * fVar9 +
               fVar8 * fVar11 * fVar16 +
               ((fVar7 * fVar12 * fVar16 +
                fVar8 * fVar12 * fVar15 +
                ((((fVar4 * fVar1 * fVar6 +
                   (((fVar2 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6) - fVar8 * fVar2 * fVar9) -
                   fVar2 * fVar7 * fVar10)) - fVar1 * fVar8 * fVar10) - fVar14 * fVar12 * fVar5) -
                fVar13 * fVar12 * fVar6)) - fVar14 * fVar11 * fVar6)) - fVar4 * fVar18 * fVar15) -
             fVar3 * fVar18 * fVar16)) - fVar4 * fVar17 * fVar16;
  fVar1 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar2 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar3 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar4 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar5 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar6 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar7 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar8 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  fVar9 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[5];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x1b
                      );
  *pSVar83 = (fVar7 * fVar9 * fVar5 +
             fVar4 * fVar6 * fVar8 +
             ((fVar1 * fVar2 * fVar3 - fVar4 * fVar1 * fVar5) - fVar7 * fVar6 * fVar3)) -
             fVar2 * fVar9 * fVar8;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = *pfVar73;
  fVar2 = pfVar73[6];
  pfVar73 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = *pfVar74;
  fVar4 = pfVar74[6];
  pfVar74 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar73;
  fVar6 = pfVar73[6];
  fVar7 = *pfVar75;
  fVar8 = pfVar75[6];
  fVar9 = *pfVar74;
  fVar10 = pfVar74[6];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = *pfVar74;
  fVar12 = pfVar74[6];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = *pfVar74;
  fVar14 = pfVar74[6];
  pfVar74 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = *pfVar74;
  fVar16 = pfVar74[6];
  fVar17 = *pfVar73;
  fVar18 = pfVar73[6];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x1c
                      );
  *pSVar83 = ((fVar13 * fVar17 * fVar8 +
              fVar14 * fVar17 * fVar7 +
              ((fVar13 * fVar18 * fVar7 +
               fVar5 * fVar11 * fVar16 +
               fVar6 * fVar11 * fVar15 +
               (((fVar12 * fVar5 * fVar15 +
                 ((((fVar3 * fVar1 * fVar10 +
                    fVar1 * fVar4 * fVar9 + (fVar2 * fVar3 * fVar9 - fVar5 * fVar2 * fVar7)) -
                   fVar6 * fVar1 * fVar7) - fVar1 * fVar5 * fVar8) - fVar13 * fVar12 * fVar9)) -
                fVar14 * fVar11 * fVar9) - fVar13 * fVar11 * fVar10)) - fVar18 * fVar3 * fVar15)) -
             fVar4 * fVar17 * fVar15) - fVar3 * fVar17 * fVar16;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[7];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar74;
  fVar5 = pfVar74[1];
  fVar6 = *pfVar77;
  fVar7 = pfVar77[1];
  fVar8 = *pfVar76;
  fVar9 = pfVar76[1];
  fVar10 = pfVar73[6];
  fVar11 = *pfVar73;
  fVar12 = pfVar73[1];
  fVar13 = pfVar75[6];
  fVar14 = pfVar76[6];
  fVar15 = pfVar74[6];
  fVar16 = pfVar77[6];
  fVar17 = pfVar75[7];
  fVar18 = pfVar76[7];
  fVar19 = pfVar74[7];
  fVar20 = pfVar77[7];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar73[7];
  fVar22 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar23 = *pfVar75;
  fVar24 = pfVar74[1];
  fVar25 = pfVar73[6];
  fVar26 = pfVar75[1];
  fVar27 = pfVar73[1];
  fVar28 = pfVar74[6];
  fVar29 = pfVar75[6];
  fVar30 = *pfVar73;
  fVar31 = pfVar74[7];
  fVar32 = pfVar75[7];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar73[7];
  fVar34 = pfVar73[6];
  fVar35 = pfVar73[1];
  fVar36 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x1d
                      );
  *pSVar83 = ((((fVar22 * fVar36 * fVar20 +
                fVar24 * fVar36 * fVar16 +
                fVar28 * fVar36 * fVar7 +
                fVar31 * fVar36 * fVar6 +
                (((fVar22 * fVar35 * fVar16 +
                  fVar28 * fVar35 * fVar6 +
                  (((fVar22 * fVar34 * fVar7 +
                    fVar24 * fVar34 * fVar6 +
                    ((fVar22 * fVar33 * fVar6 +
                     fVar4 * fVar30 * fVar32 +
                     fVar5 * fVar30 * fVar29 +
                     fVar15 * fVar30 * fVar26 +
                     fVar19 * fVar30 * fVar23 +
                     (((((fVar27 * fVar4 * fVar29 +
                         fVar15 * fVar27 * fVar23 +
                         (((fVar25 * fVar4 * fVar26 +
                           fVar5 * fVar25 * fVar23 +
                           (((fVar21 * fVar4 * fVar23 +
                             ((((((fVar2 * fVar11 * fVar18 +
                                  fVar3 * fVar11 * fVar14 +
                                  fVar13 * fVar11 * fVar9 +
                                  fVar11 * fVar17 * fVar8 +
                                  (((fVar2 * fVar12 * fVar14 +
                                    fVar12 * fVar13 * fVar8 +
                                    (((fVar2 * fVar10 * fVar9 +
                                      fVar10 * fVar3 * fVar8 +
                                      (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                                     fVar5 * fVar10 * fVar6) - fVar10 * fVar4 * fVar7)) -
                                   fVar15 * fVar12 * fVar6) - fVar12 * fVar4 * fVar16)) -
                                 fVar19 * fVar11 * fVar6) - fVar15 * fVar11 * fVar7) -
                               fVar5 * fVar11 * fVar16) - fVar11 * fVar4 * fVar20) -
                             fVar22 * fVar21 * fVar8)) - fVar24 * fVar25 * fVar8) -
                           fVar22 * fVar25 * fVar9)) - fVar28 * fVar27 * fVar8) -
                         fVar22 * fVar27 * fVar14)) - fVar31 * fVar30 * fVar8) -
                       fVar28 * fVar30 * fVar9) - fVar24 * fVar30 * fVar14) -
                     fVar22 * fVar30 * fVar18)) - fVar33 * fVar2 * fVar23)) -
                   fVar3 * fVar34 * fVar23) - fVar34 * fVar2 * fVar26)) - fVar13 * fVar35 * fVar23)
                - fVar35 * fVar2 * fVar29)) - fVar17 * fVar36 * fVar23) - fVar13 * fVar36 * fVar26)
             - fVar3 * fVar36 * fVar29) - fVar2 * fVar36 * fVar32;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[7];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[1];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[1];
  fVar10 = pfVar73[6];
  fVar11 = pfVar75[2];
  fVar12 = pfVar76[2];
  fVar13 = pfVar74[2];
  fVar14 = pfVar77[2];
  fVar15 = pfVar73[2];
  fVar16 = pfVar75[6];
  fVar17 = pfVar76[6];
  fVar18 = pfVar74[6];
  fVar19 = pfVar77[6];
  fVar20 = pfVar73[1];
  fVar21 = pfVar75[7];
  fVar22 = pfVar76[7];
  fVar23 = pfVar74[7];
  fVar24 = pfVar77[7];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[7];
  fVar27 = pfVar74[1];
  fVar28 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = *pfVar75;
  fVar30 = pfVar75[1];
  fVar31 = pfVar73[6];
  fVar32 = pfVar74[2];
  fVar33 = pfVar75[2];
  fVar34 = pfVar73[2];
  fVar35 = pfVar74[6];
  fVar36 = pfVar75[6];
  fVar37 = pfVar73[1];
  fVar38 = pfVar74[7];
  fVar39 = pfVar75[7];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[7];
  fVar42 = pfVar73[6];
  fVar43 = pfVar73[2];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x1e
                      );
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                (((((fVar28 * fVar44 * fVar24 +
                    fVar27 * fVar44 * fVar19 +
                    fVar35 * fVar44 * fVar9 +
                    fVar38 * fVar44 * fVar8 +
                    (((fVar28 * fVar43 * fVar19 +
                      fVar35 * fVar43 * fVar8 +
                      ((((fVar28 * fVar42 * fVar14 +
                         fVar27 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar7 * fVar37 * fVar36 +
                               fVar18 * fVar37 * fVar30 +
                               fVar23 * fVar37 * fVar29 +
                               (((((fVar34 * fVar6 * fVar36 +
                                   fVar18 * fVar34 * fVar29 +
                                   (((fVar31 * fVar6 * fVar33 +
                                     fVar7 * fVar31 * fVar30 +
                                     fVar13 * fVar31 * fVar29 +
                                     ((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              (((((fVar2 * fVar20 * fVar22 +
                                                  fVar3 * fVar20 * fVar17 +
                                                  fVar16 * fVar20 * fVar5 +
                                                  fVar20 * fVar21 * fVar4 +
                                                  (((fVar2 * fVar15 * fVar17 +
                                                    fVar15 * fVar16 * fVar4 +
                                                    ((((fVar2 * fVar10 * fVar12 +
                                                       fVar3 * fVar10 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar7 * fVar10 * fVar9) -
                                                    fVar10 * fVar6 * fVar14)) -
                                                   fVar18 * fVar15 * fVar8) -
                                                  fVar15 * fVar6 * fVar19)) -
                                                 fVar23 * fVar20 * fVar8) - fVar18 * fVar20 * fVar9)
                                               - fVar7 * fVar20 * fVar19) - fVar20 * fVar6 * fVar24)
                                              ) - fVar23 * fVar25 * fVar9) -
                                            fVar18 * fVar25 * fVar14) - fVar13 * fVar25 * fVar19) -
                                          fVar25 * fVar7 * fVar24) - fVar27 * fVar26 * fVar4) -
                                        fVar28 * fVar26 * fVar5)) - fVar32 * fVar31 * fVar4) -
                                      fVar27 * fVar31 * fVar5) - fVar28 * fVar31 * fVar12)) -
                                    fVar35 * fVar34 * fVar4) - fVar28 * fVar34 * fVar17)) -
                                  fVar38 * fVar37 * fVar4) - fVar35 * fVar37 * fVar5) -
                                fVar27 * fVar37 * fVar17) - fVar28 * fVar37 * fVar22)) -
                              fVar38 * fVar40 * fVar5) - fVar35 * fVar40 * fVar12) -
                            fVar32 * fVar40 * fVar17) - fVar27 * fVar40 * fVar22)) -
                          fVar3 * fVar41 * fVar29) - fVar41 * fVar2 * fVar30)) -
                        fVar11 * fVar42 * fVar29) - fVar3 * fVar42 * fVar30) -
                      fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                    fVar43 * fVar2 * fVar36)) - fVar21 * fVar44 * fVar29) - fVar16 * fVar44 * fVar30
                  ) - fVar3 * fVar44 * fVar36) - fVar2 * fVar44 * fVar39)) -
               fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) - fVar11 * fVar45 * fVar36) -
             fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[7];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[2];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[1];
  fVar7 = pfVar76[2];
  fVar8 = pfVar74[2];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[1];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  fVar13 = pfVar77[2];
  fVar14 = pfVar73[6];
  fVar15 = pfVar73[2];
  fVar16 = pfVar75[7];
  fVar17 = pfVar75[6];
  fVar18 = pfVar76[6];
  fVar19 = pfVar76[7];
  fVar20 = pfVar74[7];
  fVar21 = pfVar74[6];
  fVar22 = pfVar77[6];
  fVar23 = pfVar77[7];
  fVar24 = pfVar73[1];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[7];
  fVar27 = pfVar74[2];
  fVar28 = pfVar74[1];
  fVar29 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar30 = *pfVar75;
  fVar31 = pfVar75[1];
  fVar32 = pfVar75[2];
  fVar33 = pfVar73[6];
  fVar34 = pfVar73[2];
  fVar35 = pfVar74[7];
  fVar36 = pfVar74[6];
  fVar37 = pfVar75[6];
  fVar38 = pfVar75[7];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[7];
  fVar42 = pfVar73[6];
  fVar43 = pfVar73[2];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x1f
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar23 +
              fVar35 * fVar45 * fVar13 +
              (((((fVar28 * fVar44 * fVar23 +
                  fVar27 * fVar44 * fVar22 +
                  fVar36 * fVar44 * fVar13 +
                  fVar35 * fVar44 * fVar10 +
                  (((((fVar29 * fVar43 * fVar23 +
                      fVar28 * fVar43 * fVar22 +
                      fVar36 * fVar43 * fVar10 +
                      fVar35 * fVar43 * fVar9 +
                      (((fVar28 * fVar42 * fVar13 +
                        fVar27 * fVar42 * fVar10 +
                        ((((fVar29 * fVar41 * fVar13 +
                           fVar28 * fVar41 * fVar10 +
                           fVar27 * fVar41 * fVar9 +
                           fVar8 * fVar40 * fVar38 +
                           fVar20 * fVar40 * fVar32 +
                           (((fVar12 * fVar39 * fVar38 +
                             fVar8 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar32 +
                             fVar20 * fVar39 * fVar31 +
                             (((((fVar11 * fVar34 * fVar38 +
                                 fVar12 * fVar34 * fVar37 +
                                 fVar21 * fVar34 * fVar31 +
                                 fVar20 * fVar34 * fVar30 +
                                 (((((fVar33 * fVar12 * fVar32 +
                                     fVar8 * fVar33 * fVar31 +
                                     (((fVar26 * fVar11 * fVar32 +
                                       fVar12 * fVar26 * fVar31 +
                                       fVar8 * fVar26 * fVar30 +
                                       ((((((fVar2 * fVar25 * fVar19 +
                                            fVar16 * fVar25 * fVar7 +
                                            (((((fVar4 * fVar24 * fVar19 +
                                                fVar2 * fVar24 * fVar18 +
                                                fVar17 * fVar24 * fVar7 +
                                                fVar16 * fVar24 * fVar6 +
                                                (((((fVar3 * fVar15 * fVar19 +
                                                    fVar4 * fVar15 * fVar18 +
                                                    fVar15 * fVar17 * fVar6 +
                                                    fVar15 * fVar16 * fVar5 +
                                                    (((fVar4 * fVar14 * fVar7 +
                                                      fVar2 * fVar14 * fVar6 +
                                                      ((((fVar1 * fVar3 * fVar7 +
                                                         fVar1 * fVar2 * fVar5 +
                                                         fVar1 * fVar4 * fVar6) -
                                                        fVar8 * fVar1 * fVar9) -
                                                       fVar12 * fVar1 * fVar10) -
                                                      fVar1 * fVar11 * fVar13)) -
                                                     fVar8 * fVar14 * fVar10) -
                                                    fVar14 * fVar12 * fVar13)) -
                                                   fVar20 * fVar15 * fVar9) -
                                                  fVar21 * fVar15 * fVar10) -
                                                 fVar12 * fVar15 * fVar22) -
                                                fVar15 * fVar11 * fVar23)) -
                                               fVar20 * fVar24 * fVar10) - fVar21 * fVar24 * fVar13)
                                             - fVar8 * fVar24 * fVar22) - fVar24 * fVar12 * fVar23))
                                           - fVar20 * fVar25 * fVar13) - fVar25 * fVar8 * fVar23) -
                                         fVar27 * fVar26 * fVar5) - fVar28 * fVar26 * fVar6) -
                                       fVar29 * fVar26 * fVar7)) - fVar27 * fVar33 * fVar6) -
                                     fVar28 * fVar33 * fVar7)) - fVar35 * fVar34 * fVar5) -
                                   fVar36 * fVar34 * fVar6) - fVar28 * fVar34 * fVar18) -
                                 fVar29 * fVar34 * fVar19)) - fVar35 * fVar39 * fVar6) -
                               fVar36 * fVar39 * fVar7) - fVar27 * fVar39 * fVar18) -
                             fVar28 * fVar39 * fVar19)) - fVar35 * fVar40 * fVar7) -
                           fVar27 * fVar40 * fVar19)) - fVar2 * fVar41 * fVar30) -
                         fVar4 * fVar41 * fVar31) - fVar41 * fVar3 * fVar32)) -
                       fVar2 * fVar42 * fVar31) - fVar42 * fVar4 * fVar32)) -
                     fVar16 * fVar43 * fVar30) - fVar17 * fVar43 * fVar31) - fVar4 * fVar43 * fVar37
                   ) - fVar3 * fVar43 * fVar38)) - fVar16 * fVar44 * fVar31) -
                fVar17 * fVar44 * fVar32) - fVar2 * fVar44 * fVar37) - fVar4 * fVar44 * fVar38)) -
             fVar16 * fVar45 * fVar32) - fVar2 * fVar45 * fVar38;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[7];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[1];
  fVar3 = pfVar80[2];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar79[1];
  fVar7 = pfVar79[2];
  fVar8 = pfVar82[1];
  fVar9 = pfVar82[2];
  fVar10 = pfVar78[6];
  fVar11 = pfVar78[2];
  fVar12 = pfVar80[7];
  fVar13 = pfVar80[6];
  fVar14 = pfVar81[6];
  fVar15 = pfVar81[7];
  fVar16 = pfVar79[7];
  fVar17 = pfVar79[6];
  fVar18 = pfVar82[6];
  fVar19 = pfVar82[7];
  fVar20 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[7];
  fVar22 = pfVar79[2];
  fVar23 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[1];
  fVar25 = pfVar80[2];
  fVar26 = pfVar78[6];
  fVar27 = pfVar78[2];
  fVar28 = pfVar79[7];
  fVar29 = pfVar79[6];
  fVar30 = pfVar80[6];
  fVar31 = pfVar80[7];
  fVar32 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[7];
  fVar34 = pfVar78[6];
  fVar35 = pfVar78[2];
  fVar36 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x20
                      );
  *pSVar83 = ((fVar22 * fVar36 * fVar19 +
              fVar28 * fVar36 * fVar9 +
              (((((fVar23 * fVar35 * fVar19 +
                  fVar22 * fVar35 * fVar18 +
                  fVar29 * fVar35 * fVar9 +
                  fVar28 * fVar35 * fVar8 +
                  ((fVar22 * fVar34 * fVar9 +
                   (((fVar23 * fVar33 * fVar9 +
                     fVar22 * fVar33 * fVar8 +
                     fVar7 * fVar32 * fVar31 +
                     fVar16 * fVar32 * fVar25 +
                     (((fVar6 * fVar27 * fVar31 +
                       fVar7 * fVar27 * fVar30 +
                       fVar17 * fVar27 * fVar25 +
                       fVar16 * fVar27 * fVar24 +
                       (((((fVar26 * fVar7 * fVar25 +
                           ((fVar21 * fVar6 * fVar25 +
                            fVar7 * fVar21 * fVar24 +
                            (((((fVar3 * fVar20 * fVar15 +
                                fVar12 * fVar20 * fVar5 +
                                (((((fVar2 * fVar11 * fVar15 +
                                    fVar3 * fVar11 * fVar14 +
                                    fVar11 * fVar13 * fVar5 +
                                    fVar11 * fVar12 * fVar4 +
                                    ((fVar3 * fVar10 * fVar5 +
                                     (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                      fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                                    fVar10 * fVar7 * fVar9)) - fVar16 * fVar11 * fVar8) -
                                  fVar17 * fVar11 * fVar9) - fVar7 * fVar11 * fVar18) -
                                fVar11 * fVar6 * fVar19)) - fVar16 * fVar20 * fVar9) -
                              fVar20 * fVar7 * fVar19) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5)) - fVar22 * fVar26 * fVar5)) -
                          fVar28 * fVar27 * fVar4) - fVar29 * fVar27 * fVar5) -
                        fVar22 * fVar27 * fVar14) - fVar23 * fVar27 * fVar15)) -
                      fVar28 * fVar32 * fVar5) - fVar22 * fVar32 * fVar15)) -
                    fVar3 * fVar33 * fVar24) - fVar33 * fVar2 * fVar25)) - fVar34 * fVar3 * fVar25))
                 - fVar12 * fVar35 * fVar24) - fVar13 * fVar35 * fVar25) - fVar3 * fVar35 * fVar30)
              - fVar2 * fVar35 * fVar31)) - fVar12 * fVar36 * fVar25) - fVar3 * fVar36 * fVar31;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[2];
  fVar2 = pfVar78[7];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[2];
  fVar4 = pfVar79[7];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar78[2];
  fVar6 = pfVar78[7];
  fVar7 = pfVar80[2];
  fVar8 = pfVar80[7];
  fVar9 = pfVar79[2];
  fVar10 = pfVar79[7];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[2];
  fVar12 = pfVar79[7];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[2];
  fVar14 = pfVar79[7];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[2];
  fVar16 = pfVar79[7];
  fVar17 = pfVar78[2];
  fVar18 = pfVar78[7];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x21
                      );
  *pSVar83 = ((fVar13 * fVar17 * fVar8 +
              fVar14 * fVar17 * fVar7 +
              ((fVar13 * fVar18 * fVar7 +
               fVar5 * fVar11 * fVar16 +
               fVar6 * fVar11 * fVar15 +
               (((fVar12 * fVar5 * fVar15 +
                 ((((fVar3 * fVar1 * fVar10 +
                    fVar1 * fVar4 * fVar9 + (fVar2 * fVar3 * fVar9 - fVar5 * fVar2 * fVar7)) -
                   fVar6 * fVar1 * fVar7) - fVar1 * fVar5 * fVar8) - fVar13 * fVar12 * fVar9)) -
                fVar14 * fVar11 * fVar9) - fVar13 * fVar11 * fVar10)) - fVar18 * fVar3 * fVar15)) -
             fVar4 * fVar17 * fVar15) - fVar3 * fVar17 * fVar16;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[8];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar74;
  fVar5 = pfVar74[3];
  fVar6 = *pfVar77;
  fVar7 = pfVar77[3];
  fVar8 = *pfVar76;
  fVar9 = pfVar76[3];
  fVar10 = pfVar73[6];
  fVar11 = *pfVar73;
  fVar12 = pfVar73[3];
  fVar13 = pfVar75[6];
  fVar14 = pfVar76[6];
  fVar15 = pfVar74[6];
  fVar16 = pfVar77[6];
  fVar17 = pfVar75[8];
  fVar18 = pfVar76[8];
  fVar19 = pfVar74[8];
  fVar20 = pfVar77[8];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar73[8];
  fVar22 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar23 = *pfVar75;
  fVar24 = pfVar74[3];
  fVar25 = pfVar73[6];
  fVar26 = pfVar75[3];
  fVar27 = pfVar73[3];
  fVar28 = pfVar74[6];
  fVar29 = pfVar75[6];
  fVar30 = *pfVar73;
  fVar31 = pfVar74[8];
  fVar32 = pfVar75[8];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar73[8];
  fVar34 = pfVar73[6];
  fVar35 = pfVar73[3];
  fVar36 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x22
                      );
  *pSVar83 = ((((fVar22 * fVar36 * fVar20 +
                fVar24 * fVar36 * fVar16 +
                fVar28 * fVar36 * fVar7 +
                fVar31 * fVar36 * fVar6 +
                (((fVar22 * fVar35 * fVar16 +
                  fVar28 * fVar35 * fVar6 +
                  (((fVar22 * fVar34 * fVar7 +
                    fVar24 * fVar34 * fVar6 +
                    ((fVar22 * fVar33 * fVar6 +
                     fVar4 * fVar30 * fVar32 +
                     fVar5 * fVar30 * fVar29 +
                     fVar15 * fVar30 * fVar26 +
                     fVar19 * fVar30 * fVar23 +
                     (((((fVar27 * fVar4 * fVar29 +
                         fVar15 * fVar27 * fVar23 +
                         (((fVar25 * fVar4 * fVar26 +
                           fVar5 * fVar25 * fVar23 +
                           (((fVar21 * fVar4 * fVar23 +
                             ((((((fVar2 * fVar11 * fVar18 +
                                  fVar3 * fVar11 * fVar14 +
                                  fVar13 * fVar11 * fVar9 +
                                  fVar11 * fVar17 * fVar8 +
                                  (((fVar2 * fVar12 * fVar14 +
                                    fVar12 * fVar13 * fVar8 +
                                    (((fVar2 * fVar10 * fVar9 +
                                      fVar10 * fVar3 * fVar8 +
                                      (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                                     fVar5 * fVar10 * fVar6) - fVar10 * fVar4 * fVar7)) -
                                   fVar15 * fVar12 * fVar6) - fVar12 * fVar4 * fVar16)) -
                                 fVar19 * fVar11 * fVar6) - fVar15 * fVar11 * fVar7) -
                               fVar5 * fVar11 * fVar16) - fVar11 * fVar4 * fVar20) -
                             fVar22 * fVar21 * fVar8)) - fVar24 * fVar25 * fVar8) -
                           fVar22 * fVar25 * fVar9)) - fVar28 * fVar27 * fVar8) -
                         fVar22 * fVar27 * fVar14)) - fVar31 * fVar30 * fVar8) -
                       fVar28 * fVar30 * fVar9) - fVar24 * fVar30 * fVar14) -
                     fVar22 * fVar30 * fVar18)) - fVar33 * fVar2 * fVar23)) -
                   fVar3 * fVar34 * fVar23) - fVar34 * fVar2 * fVar26)) - fVar13 * fVar35 * fVar23)
                - fVar35 * fVar2 * fVar29)) - fVar17 * fVar36 * fVar23) - fVar13 * fVar36 * fVar26)
             - fVar3 * fVar36 * fVar29) - fVar2 * fVar36 * fVar32;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[8];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[1];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[1];
  fVar10 = pfVar73[7];
  fVar11 = pfVar75[3];
  fVar12 = pfVar76[3];
  fVar13 = pfVar74[3];
  fVar14 = pfVar77[3];
  fVar15 = pfVar73[6];
  fVar16 = pfVar75[4];
  fVar17 = pfVar76[4];
  fVar18 = pfVar74[4];
  fVar19 = pfVar77[4];
  fVar20 = pfVar73[4];
  fVar21 = pfVar75[6];
  fVar22 = pfVar76[6];
  fVar23 = pfVar74[6];
  fVar24 = pfVar77[6];
  fVar25 = pfVar73[3];
  fVar26 = pfVar75[7];
  fVar27 = pfVar76[7];
  fVar28 = pfVar74[7];
  fVar29 = pfVar77[7];
  fVar30 = pfVar73[1];
  fVar31 = pfVar75[8];
  fVar32 = pfVar76[8];
  fVar33 = pfVar74[8];
  fVar34 = pfVar77[8];
  fVar35 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar36 = pfVar73[8];
  fVar37 = pfVar74[1];
  fVar38 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar39 = *pfVar75;
  fVar40 = pfVar75[1];
  fVar41 = pfVar73[7];
  fVar42 = pfVar74[3];
  fVar43 = pfVar75[3];
  fVar44 = pfVar73[6];
  fVar45 = pfVar74[4];
  fVar46 = pfVar75[4];
  fVar47 = pfVar73[4];
  fVar48 = pfVar74[6];
  fVar49 = pfVar75[6];
  fVar50 = pfVar73[3];
  fVar51 = pfVar74[7];
  fVar52 = pfVar75[7];
  fVar53 = pfVar73[1];
  fVar54 = pfVar74[8];
  fVar55 = pfVar75[8];
  fVar56 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar57 = pfVar73[8];
  fVar58 = pfVar73[7];
  fVar59 = pfVar73[6];
  fVar60 = pfVar73[4];
  fVar61 = pfVar73[3];
  fVar62 = pfVar73[1];
  fVar63 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x23
                      );
  *pSVar83 = ((((((fVar37 * fVar63 * fVar34 +
                  fVar42 * fVar63 * fVar29 +
                  fVar45 * fVar63 * fVar24 +
                  fVar48 * fVar63 * fVar19 +
                  fVar51 * fVar63 * fVar14 +
                  fVar54 * fVar63 * fVar9 +
                  (((((fVar38 * fVar62 * fVar34 +
                      fVar42 * fVar62 * fVar24 +
                      fVar48 * fVar62 * fVar14 +
                      fVar54 * fVar62 * fVar8 +
                      (((((fVar38 * fVar61 * fVar29 +
                          fVar37 * fVar61 * fVar24 +
                          fVar48 * fVar61 * fVar9 +
                          fVar51 * fVar61 * fVar8 +
                          (((fVar38 * fVar60 * fVar24 +
                            fVar48 * fVar60 * fVar8 +
                            (((((fVar38 * fVar59 * fVar19 +
                                fVar37 * fVar59 * fVar14 +
                                fVar42 * fVar59 * fVar9 +
                                fVar45 * fVar59 * fVar8 +
                                (((fVar38 * fVar58 * fVar14 +
                                  fVar42 * fVar58 * fVar8 +
                                  (((fVar38 * fVar57 * fVar9 +
                                    fVar37 * fVar57 * fVar8 +
                                    fVar7 * fVar56 * fVar55 +
                                    fVar13 * fVar56 * fVar52 +
                                    fVar18 * fVar56 * fVar49 +
                                    fVar23 * fVar56 * fVar46 +
                                    fVar28 * fVar56 * fVar43 +
                                    fVar33 * fVar56 * fVar40 +
                                    (((((((fVar6 * fVar53 * fVar55 +
                                          fVar13 * fVar53 * fVar49 +
                                          fVar23 * fVar53 * fVar43 +
                                          fVar33 * fVar53 * fVar39 +
                                          (((((fVar50 * fVar6 * fVar52 +
                                              fVar7 * fVar50 * fVar49 +
                                              fVar23 * fVar50 * fVar40 +
                                              fVar28 * fVar50 * fVar39 +
                                              (((((fVar47 * fVar6 * fVar49 +
                                                  fVar23 * fVar47 * fVar39 +
                                                  (((fVar44 * fVar6 * fVar46 +
                                                    fVar7 * fVar44 * fVar43 +
                                                    fVar13 * fVar44 * fVar40 +
                                                    fVar18 * fVar44 * fVar39 +
                                                    (((((fVar41 * fVar6 * fVar43 +
                                                        fVar13 * fVar41 * fVar39 +
                                                        (((fVar36 * fVar6 * fVar40 +
                                                          fVar7 * fVar36 * fVar39 +
                                                          (((((((((fVar3 * fVar35 * fVar32 +
                                                                  fVar11 * fVar35 * fVar27 +
                                                                  fVar16 * fVar35 * fVar22 +
                                                                  fVar21 * fVar35 * fVar17 +
                                                                  fVar26 * fVar35 * fVar12 +
                                                                  fVar31 * fVar35 * fVar5 +
                                                                  (((((fVar2 * fVar30 * fVar32 +
                                                                      fVar11 * fVar30 * fVar22 +
                                                                      fVar21 * fVar30 * fVar12 +
                                                                      fVar30 * fVar31 * fVar4 +
                                                                      (((((fVar2 * fVar25 * fVar27 +
                                                                          fVar3 * fVar25 * fVar22 +
                                                                          fVar21 * fVar25 * fVar5 +
                                                                          fVar25 * fVar26 * fVar4 +
                                                                          (((fVar2 * fVar20 * fVar22
                                                                            + fVar20 * fVar21 *
                                                                              fVar4 + (((((fVar2 * 
                                                  fVar15 * fVar17 +
                                                  fVar3 * fVar15 * fVar12 +
                                                  fVar11 * fVar15 * fVar5 +
                                                  fVar15 * fVar16 * fVar4 +
                                                  (((fVar2 * fVar10 * fVar12 +
                                                    fVar10 * fVar11 * fVar4 +
                                                    (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5
                                                      ) - fVar7 * fVar1 * fVar8) -
                                                    fVar1 * fVar6 * fVar9)) -
                                                   fVar13 * fVar10 * fVar8) -
                                                  fVar10 * fVar6 * fVar14)) -
                                                  fVar18 * fVar15 * fVar8) - fVar13 * fVar15 * fVar9
                                                  ) - fVar7 * fVar15 * fVar14) -
                                                  fVar15 * fVar6 * fVar19)) -
                                                  fVar23 * fVar20 * fVar8) - fVar20 * fVar6 * fVar24
                                                  )) - fVar28 * fVar25 * fVar8) -
                                                  fVar23 * fVar25 * fVar9) - fVar7 * fVar25 * fVar24
                                                  ) - fVar25 * fVar6 * fVar29)) -
                                                  fVar33 * fVar30 * fVar8) -
                                                  fVar23 * fVar30 * fVar14) -
                                                  fVar13 * fVar30 * fVar24) -
                                                  fVar30 * fVar6 * fVar34)) -
                                                  fVar33 * fVar35 * fVar9) -
                                                  fVar28 * fVar35 * fVar14) -
                                                  fVar23 * fVar35 * fVar19) -
                                                  fVar18 * fVar35 * fVar24) -
                                                  fVar13 * fVar35 * fVar29) -
                                                  fVar35 * fVar7 * fVar34) - fVar37 * fVar36 * fVar4
                                                  ) - fVar38 * fVar36 * fVar5)) -
                                                  fVar42 * fVar41 * fVar4) -
                                                  fVar38 * fVar41 * fVar12)) -
                                                  fVar45 * fVar44 * fVar4) - fVar42 * fVar44 * fVar5
                                                  ) - fVar37 * fVar44 * fVar12) -
                                                  fVar38 * fVar44 * fVar17)) -
                                                  fVar48 * fVar47 * fVar4) -
                                                  fVar38 * fVar47 * fVar22)) -
                                                 fVar51 * fVar50 * fVar4) - fVar48 * fVar50 * fVar5)
                                               - fVar37 * fVar50 * fVar22) -
                                              fVar38 * fVar50 * fVar27)) - fVar54 * fVar53 * fVar4)
                                            - fVar48 * fVar53 * fVar12) - fVar42 * fVar53 * fVar22)
                                          - fVar38 * fVar53 * fVar32)) - fVar54 * fVar56 * fVar5) -
                                        fVar51 * fVar56 * fVar12) - fVar48 * fVar56 * fVar17) -
                                      fVar45 * fVar56 * fVar22) - fVar42 * fVar56 * fVar27) -
                                    fVar37 * fVar56 * fVar32)) - fVar3 * fVar57 * fVar39) -
                                  fVar57 * fVar2 * fVar40)) - fVar11 * fVar58 * fVar39) -
                                fVar58 * fVar2 * fVar43)) - fVar16 * fVar59 * fVar39) -
                              fVar11 * fVar59 * fVar40) - fVar3 * fVar59 * fVar43) -
                            fVar59 * fVar2 * fVar46)) - fVar21 * fVar60 * fVar39) -
                          fVar60 * fVar2 * fVar49)) - fVar26 * fVar61 * fVar39) -
                        fVar21 * fVar61 * fVar40) - fVar3 * fVar61 * fVar49) -
                      fVar61 * fVar2 * fVar52)) - fVar31 * fVar62 * fVar39) -
                    fVar21 * fVar62 * fVar43) - fVar11 * fVar62 * fVar49) - fVar2 * fVar62 * fVar55)
                  ) - fVar31 * fVar63 * fVar40) - fVar26 * fVar63 * fVar43) -
               fVar21 * fVar63 * fVar46) - fVar16 * fVar63 * fVar49) - fVar11 * fVar63 * fVar52) -
             fVar3 * fVar63 * fVar55;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[8];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[2];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[1];
  fVar7 = pfVar76[2];
  fVar8 = pfVar74[2];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[1];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  fVar13 = pfVar77[2];
  fVar14 = pfVar73[7];
  fVar15 = pfVar75[4];
  fVar16 = pfVar75[3];
  fVar17 = pfVar76[3];
  fVar18 = pfVar76[4];
  fVar19 = pfVar74[4];
  fVar20 = pfVar74[3];
  fVar21 = pfVar77[3];
  fVar22 = pfVar77[4];
  fVar23 = pfVar73[6];
  fVar24 = pfVar73[4];
  fVar25 = pfVar75[7];
  fVar26 = pfVar75[6];
  fVar27 = pfVar76[6];
  fVar28 = pfVar76[7];
  fVar29 = pfVar74[7];
  fVar30 = pfVar74[6];
  fVar31 = pfVar77[6];
  fVar32 = pfVar77[7];
  fVar33 = pfVar73[3];
  fVar34 = pfVar73[2];
  fVar35 = pfVar75[8];
  fVar36 = pfVar76[8];
  fVar37 = pfVar74[8];
  fVar38 = pfVar77[8];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[8];
  fVar42 = pfVar74[2];
  fVar43 = pfVar74[1];
  fVar44 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar45 = *pfVar75;
  fVar46 = pfVar75[1];
  fVar47 = pfVar75[2];
  fVar48 = pfVar73[7];
  fVar49 = pfVar74[4];
  fVar50 = pfVar74[3];
  fVar51 = pfVar75[3];
  fVar52 = pfVar75[4];
  fVar53 = pfVar73[6];
  fVar54 = pfVar73[4];
  fVar55 = pfVar74[7];
  fVar56 = pfVar74[6];
  fVar57 = pfVar75[6];
  fVar58 = pfVar75[7];
  fVar59 = pfVar73[3];
  fVar60 = pfVar73[2];
  fVar61 = pfVar74[8];
  fVar62 = pfVar75[8];
  fVar63 = pfVar73[1];
  fVar64 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar65 = pfVar73[8];
  fVar66 = pfVar73[7];
  fVar67 = pfVar73[6];
  fVar68 = pfVar73[4];
  fVar69 = pfVar73[3];
  fVar70 = pfVar73[2];
  fVar71 = pfVar73[1];
  fVar72 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x24
                      );
  *pSVar83 = ((((fVar42 * fVar72 * fVar38 +
                fVar49 * fVar72 * fVar32 +
                fVar55 * fVar72 * fVar22 +
                fVar61 * fVar72 * fVar13 +
                (((((((fVar43 * fVar71 * fVar38 +
                      fVar50 * fVar71 * fVar32 +
                      fVar49 * fVar71 * fVar31 +
                      fVar56 * fVar71 * fVar22 +
                      fVar55 * fVar71 * fVar21 +
                      fVar61 * fVar71 * fVar10 +
                      (((((fVar44 * fVar70 * fVar38 +
                          fVar50 * fVar70 * fVar31 +
                          fVar56 * fVar70 * fVar21 +
                          fVar61 * fVar70 * fVar9 +
                          (((((fVar43 * fVar69 * fVar32 +
                              fVar42 * fVar69 * fVar31 +
                              fVar56 * fVar69 * fVar13 +
                              fVar55 * fVar69 * fVar10 +
                              (((((fVar44 * fVar68 * fVar32 +
                                  fVar43 * fVar68 * fVar31 +
                                  fVar56 * fVar68 * fVar10 +
                                  fVar55 * fVar68 * fVar9 +
                                  (((((fVar43 * fVar67 * fVar22 +
                                      fVar42 * fVar67 * fVar21 +
                                      fVar50 * fVar67 * fVar13 +
                                      fVar49 * fVar67 * fVar10 +
                                      (((((fVar44 * fVar66 * fVar22 +
                                          fVar43 * fVar66 * fVar21 +
                                          fVar50 * fVar66 * fVar10 +
                                          fVar49 * fVar66 * fVar9 +
                                          ((((fVar44 * fVar65 * fVar13 +
                                             fVar43 * fVar65 * fVar10 +
                                             fVar42 * fVar65 * fVar9 +
                                             fVar8 * fVar64 * fVar62 +
                                             fVar19 * fVar64 * fVar58 +
                                             fVar29 * fVar64 * fVar52 +
                                             fVar37 * fVar64 * fVar47 +
                                             (((((fVar12 * fVar63 * fVar62 +
                                                 fVar20 * fVar63 * fVar58 +
                                                 fVar19 * fVar63 * fVar57 +
                                                 fVar30 * fVar63 * fVar52 +
                                                 fVar29 * fVar63 * fVar51 +
                                                 fVar37 * fVar63 * fVar46 +
                                                 (((((((fVar11 * fVar60 * fVar62 +
                                                       fVar20 * fVar60 * fVar57 +
                                                       fVar30 * fVar60 * fVar51 +
                                                       fVar37 * fVar60 * fVar45 +
                                                       (((((fVar59 * fVar12 * fVar58 +
                                                           fVar8 * fVar59 * fVar57 +
                                                           fVar30 * fVar59 * fVar47 +
                                                           fVar29 * fVar59 * fVar46 +
                                                           (((((fVar54 * fVar11 * fVar58 +
                                                               fVar12 * fVar54 * fVar57 +
                                                               fVar30 * fVar54 * fVar46 +
                                                               fVar29 * fVar54 * fVar45 +
                                                               (((((fVar53 * fVar12 * fVar52 +
                                                                   fVar8 * fVar53 * fVar51 +
                                                                   fVar20 * fVar53 * fVar47 +
                                                                   fVar19 * fVar53 * fVar46 +
                                                                   (((((fVar48 * fVar11 * fVar52 +
                                                                       fVar12 * fVar48 * fVar51 +
                                                                       fVar20 * fVar48 * fVar46 +
                                                                       fVar19 * fVar48 * fVar45 +
                                                                       (((((fVar41 * fVar11 * fVar47
                                                                           + fVar12 * fVar41 *
                                                                             fVar46 + fVar8 * fVar41
                                                                                      * fVar45 +
                                                                                      ((((((((fVar2 
                                                  * fVar40 * fVar36 +
                                                  fVar15 * fVar40 * fVar28 +
                                                  fVar25 * fVar40 * fVar18 +
                                                  fVar35 * fVar40 * fVar7 +
                                                  (((((((fVar4 * fVar39 * fVar36 +
                                                        fVar16 * fVar39 * fVar28 +
                                                        fVar15 * fVar39 * fVar27 +
                                                        fVar26 * fVar39 * fVar18 +
                                                        fVar25 * fVar39 * fVar17 +
                                                        fVar35 * fVar39 * fVar6 +
                                                        (((((fVar3 * fVar34 * fVar36 +
                                                            fVar16 * fVar34 * fVar27 +
                                                            fVar26 * fVar34 * fVar17 +
                                                            fVar34 * fVar35 * fVar5 +
                                                            (((((fVar4 * fVar33 * fVar28 +
                                                                fVar2 * fVar33 * fVar27 +
                                                                fVar26 * fVar33 * fVar7 +
                                                                fVar25 * fVar33 * fVar6 +
                                                                (((((fVar3 * fVar24 * fVar28 +
                                                                    fVar4 * fVar24 * fVar27 +
                                                                    fVar24 * fVar26 * fVar6 +
                                                                    fVar24 * fVar25 * fVar5 +
                                                                    (((((fVar4 * fVar23 * fVar18 +
                                                                        fVar2 * fVar23 * fVar17 +
                                                                        fVar16 * fVar23 * fVar7 +
                                                                        fVar15 * fVar23 * fVar6 +
                                                                        (((((fVar3 * fVar14 * fVar18
                                                                            + fVar4 * fVar14 *
                                                                              fVar17 + fVar14 * 
                                                  fVar16 * fVar6 +
                                                  fVar14 * fVar15 * fVar5 +
                                                  ((((fVar1 * fVar3 * fVar7 +
                                                     fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6)
                                                    - fVar8 * fVar1 * fVar9) -
                                                   fVar12 * fVar1 * fVar10) -
                                                  fVar1 * fVar11 * fVar13)) -
                                                  fVar19 * fVar14 * fVar9) -
                                                  fVar20 * fVar14 * fVar10) -
                                                  fVar12 * fVar14 * fVar21) -
                                                  fVar14 * fVar11 * fVar22)) -
                                                  fVar19 * fVar23 * fVar10) -
                                                  fVar20 * fVar23 * fVar13) -
                                                  fVar8 * fVar23 * fVar21) -
                                                  fVar23 * fVar12 * fVar22)) -
                                                  fVar29 * fVar24 * fVar9) -
                                                  fVar30 * fVar24 * fVar10) -
                                                  fVar12 * fVar24 * fVar31) -
                                                  fVar24 * fVar11 * fVar32)) -
                                                  fVar29 * fVar33 * fVar10) -
                                                  fVar30 * fVar33 * fVar13) -
                                                  fVar8 * fVar33 * fVar31) -
                                                  fVar33 * fVar12 * fVar32)) -
                                                  fVar37 * fVar34 * fVar9) -
                                                  fVar30 * fVar34 * fVar21) -
                                                  fVar20 * fVar34 * fVar31) -
                                                  fVar34 * fVar11 * fVar38)) -
                                                  fVar37 * fVar39 * fVar10) -
                                                  fVar29 * fVar39 * fVar21) -
                                                  fVar30 * fVar39 * fVar22) -
                                                  fVar19 * fVar39 * fVar31) -
                                                  fVar20 * fVar39 * fVar32) -
                                                  fVar39 * fVar12 * fVar38)) -
                                                  fVar37 * fVar40 * fVar13) -
                                                  fVar29 * fVar40 * fVar22) -
                                                  fVar19 * fVar40 * fVar32) -
                                                  fVar40 * fVar8 * fVar38) - fVar42 * fVar41 * fVar5
                                                  ) - fVar43 * fVar41 * fVar6) -
                                                  fVar44 * fVar41 * fVar7)) -
                                                  fVar49 * fVar48 * fVar5) - fVar50 * fVar48 * fVar6
                                                  ) - fVar43 * fVar48 * fVar17) -
                                                  fVar44 * fVar48 * fVar18)) -
                                                  fVar49 * fVar53 * fVar6) - fVar50 * fVar53 * fVar7
                                                  ) - fVar42 * fVar53 * fVar17) -
                                                  fVar43 * fVar53 * fVar18)) -
                                                  fVar55 * fVar54 * fVar5) - fVar56 * fVar54 * fVar6
                                                  ) - fVar43 * fVar54 * fVar27) -
                                                  fVar44 * fVar54 * fVar28)) -
                                                  fVar55 * fVar59 * fVar6) - fVar56 * fVar59 * fVar7
                                                  ) - fVar42 * fVar59 * fVar27) -
                                                  fVar43 * fVar59 * fVar28)) -
                                                  fVar61 * fVar60 * fVar5) -
                                                  fVar56 * fVar60 * fVar17) -
                                                  fVar50 * fVar60 * fVar27) -
                                                  fVar44 * fVar60 * fVar36)) -
                                                  fVar61 * fVar63 * fVar6) -
                                                  fVar55 * fVar63 * fVar17) -
                                                  fVar56 * fVar63 * fVar18) -
                                                  fVar49 * fVar63 * fVar27) -
                                                  fVar50 * fVar63 * fVar28) -
                                                 fVar43 * fVar63 * fVar36)) -
                                                fVar61 * fVar64 * fVar7) - fVar55 * fVar64 * fVar18)
                                              - fVar49 * fVar64 * fVar28) - fVar42 * fVar64 * fVar36
                                             )) - fVar2 * fVar65 * fVar45) - fVar4 * fVar65 * fVar46
                                           ) - fVar65 * fVar3 * fVar47)) - fVar15 * fVar66 * fVar45)
                                        - fVar16 * fVar66 * fVar46) - fVar4 * fVar66 * fVar51) -
                                      fVar66 * fVar3 * fVar52)) - fVar15 * fVar67 * fVar46) -
                                    fVar16 * fVar67 * fVar47) - fVar2 * fVar67 * fVar51) -
                                  fVar67 * fVar4 * fVar52)) - fVar25 * fVar68 * fVar45) -
                                fVar26 * fVar68 * fVar46) - fVar4 * fVar68 * fVar57) -
                              fVar68 * fVar3 * fVar58)) - fVar25 * fVar69 * fVar46) -
                            fVar26 * fVar69 * fVar47) - fVar2 * fVar69 * fVar57) -
                          fVar69 * fVar4 * fVar58)) - fVar35 * fVar70 * fVar45) -
                        fVar26 * fVar70 * fVar51) - fVar16 * fVar70 * fVar57) -
                      fVar3 * fVar70 * fVar62)) - fVar35 * fVar71 * fVar46) -
                    fVar25 * fVar71 * fVar51) - fVar26 * fVar71 * fVar52) - fVar15 * fVar71 * fVar57
                  ) - fVar16 * fVar71 * fVar58) - fVar4 * fVar71 * fVar62)) -
               fVar35 * fVar72 * fVar47) - fVar25 * fVar72 * fVar52) - fVar15 * fVar72 * fVar58) -
             fVar2 * fVar72 * fVar62;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[1];
  fVar3 = pfVar80[2];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar79[1];
  fVar7 = pfVar79[2];
  fVar8 = pfVar82[1];
  fVar9 = pfVar82[2];
  fVar10 = pfVar78[7];
  fVar11 = pfVar80[4];
  fVar12 = pfVar80[3];
  fVar13 = pfVar81[3];
  fVar14 = pfVar81[4];
  fVar15 = pfVar79[4];
  fVar16 = pfVar79[3];
  fVar17 = pfVar82[3];
  fVar18 = pfVar82[4];
  fVar19 = pfVar78[6];
  fVar20 = pfVar78[4];
  fVar21 = pfVar80[7];
  fVar22 = pfVar80[6];
  fVar23 = pfVar81[6];
  fVar24 = pfVar81[7];
  fVar25 = pfVar79[7];
  fVar26 = pfVar79[6];
  fVar27 = pfVar82[6];
  fVar28 = pfVar82[7];
  fVar29 = pfVar78[3];
  fVar30 = pfVar78[2];
  fVar31 = pfVar80[8];
  fVar32 = pfVar81[8];
  fVar33 = pfVar79[8];
  fVar34 = pfVar82[8];
  fVar35 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar36 = pfVar78[8];
  fVar37 = pfVar79[2];
  fVar38 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar39 = pfVar80[1];
  fVar40 = pfVar80[2];
  fVar41 = pfVar78[7];
  fVar42 = pfVar79[4];
  fVar43 = pfVar79[3];
  fVar44 = pfVar80[3];
  fVar45 = pfVar80[4];
  fVar46 = pfVar78[6];
  fVar47 = pfVar78[4];
  fVar48 = pfVar79[7];
  fVar49 = pfVar79[6];
  fVar50 = pfVar80[6];
  fVar51 = pfVar80[7];
  fVar52 = pfVar78[3];
  fVar53 = pfVar78[2];
  fVar54 = pfVar79[8];
  fVar55 = pfVar80[8];
  fVar56 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar57 = pfVar78[8];
  fVar58 = pfVar78[7];
  fVar59 = pfVar78[6];
  fVar60 = pfVar78[4];
  fVar61 = pfVar78[3];
  fVar62 = pfVar78[2];
  fVar63 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x25
                      );
  *pSVar83 = ((((fVar37 * fVar63 * fVar34 +
                fVar42 * fVar63 * fVar28 +
                fVar48 * fVar63 * fVar18 +
                fVar54 * fVar63 * fVar9 +
                (((((((fVar38 * fVar62 * fVar34 +
                      fVar43 * fVar62 * fVar28 +
                      fVar42 * fVar62 * fVar27 +
                      fVar49 * fVar62 * fVar18 +
                      fVar48 * fVar62 * fVar17 +
                      fVar54 * fVar62 * fVar8 +
                      (((fVar37 * fVar61 * fVar28 +
                        fVar48 * fVar61 * fVar9 +
                        (((((fVar38 * fVar60 * fVar28 +
                            fVar37 * fVar60 * fVar27 +
                            fVar49 * fVar60 * fVar9 +
                            fVar48 * fVar60 * fVar8 +
                            (((fVar37 * fVar59 * fVar18 +
                              fVar42 * fVar59 * fVar9 +
                              (((((fVar38 * fVar58 * fVar18 +
                                  fVar37 * fVar58 * fVar17 +
                                  fVar43 * fVar58 * fVar9 +
                                  fVar42 * fVar58 * fVar8 +
                                  (((fVar38 * fVar57 * fVar9 +
                                    fVar37 * fVar57 * fVar8 +
                                    fVar7 * fVar56 * fVar55 +
                                    fVar15 * fVar56 * fVar51 +
                                    fVar25 * fVar56 * fVar45 +
                                    fVar33 * fVar56 * fVar40 +
                                    (((((fVar6 * fVar53 * fVar55 +
                                        fVar16 * fVar53 * fVar51 +
                                        fVar15 * fVar53 * fVar50 +
                                        fVar26 * fVar53 * fVar45 +
                                        fVar25 * fVar53 * fVar44 +
                                        fVar33 * fVar53 * fVar39 +
                                        (((((((fVar52 * fVar7 * fVar51 +
                                              fVar25 * fVar52 * fVar40 +
                                              (((fVar47 * fVar6 * fVar51 +
                                                fVar7 * fVar47 * fVar50 +
                                                fVar26 * fVar47 * fVar40 +
                                                fVar25 * fVar47 * fVar39 +
                                                (((((fVar46 * fVar7 * fVar45 +
                                                    fVar15 * fVar46 * fVar40 +
                                                    (((fVar41 * fVar6 * fVar45 +
                                                      fVar7 * fVar41 * fVar44 +
                                                      fVar16 * fVar41 * fVar40 +
                                                      fVar15 * fVar41 * fVar39 +
                                                      (((((fVar36 * fVar6 * fVar40 +
                                                          fVar7 * fVar36 * fVar39 +
                                                          (((((((fVar3 * fVar35 * fVar32 +
                                                                fVar11 * fVar35 * fVar24 +
                                                                fVar21 * fVar35 * fVar14 +
                                                                fVar31 * fVar35 * fVar5 +
                                                                (((((((fVar2 * fVar30 * fVar32 +
                                                                      fVar12 * fVar30 * fVar24 +
                                                                      fVar11 * fVar30 * fVar23 +
                                                                      fVar22 * fVar30 * fVar14 +
                                                                      fVar21 * fVar30 * fVar13 +
                                                                      fVar30 * fVar31 * fVar4 +
                                                                      (((fVar3 * fVar29 * fVar24 +
                                                                        fVar21 * fVar29 * fVar5 +
                                                                        (((((fVar2 * fVar20 * fVar24
                                                                            + fVar3 * fVar20 *
                                                                              fVar23 + fVar20 * 
                                                  fVar22 * fVar5 +
                                                  fVar20 * fVar21 * fVar4 +
                                                  (((fVar3 * fVar19 * fVar14 +
                                                    fVar11 * fVar19 * fVar5 +
                                                    (((((fVar2 * fVar10 * fVar14 +
                                                        fVar3 * fVar10 * fVar13 +
                                                        fVar10 * fVar12 * fVar5 +
                                                        fVar10 * fVar11 * fVar4 +
                                                        (((fVar1 * fVar3 * fVar4 +
                                                          fVar1 * fVar2 * fVar5) -
                                                         fVar7 * fVar1 * fVar8) -
                                                        fVar1 * fVar6 * fVar9)) -
                                                       fVar15 * fVar10 * fVar8) -
                                                      fVar16 * fVar10 * fVar9) -
                                                     fVar7 * fVar10 * fVar17) -
                                                    fVar10 * fVar6 * fVar18)) -
                                                   fVar15 * fVar19 * fVar9) -
                                                  fVar19 * fVar7 * fVar18)) -
                                                  fVar25 * fVar20 * fVar8) - fVar26 * fVar20 * fVar9
                                                  ) - fVar7 * fVar20 * fVar27) -
                                                  fVar20 * fVar6 * fVar28)) -
                                                  fVar25 * fVar29 * fVar9) - fVar29 * fVar7 * fVar28
                                                  )) - fVar33 * fVar30 * fVar8) -
                                                  fVar25 * fVar30 * fVar17) -
                                                  fVar26 * fVar30 * fVar18) -
                                                  fVar15 * fVar30 * fVar27) -
                                                  fVar16 * fVar30 * fVar28) -
                                                  fVar30 * fVar6 * fVar34)) -
                                                  fVar33 * fVar35 * fVar9) -
                                                  fVar25 * fVar35 * fVar18) -
                                                  fVar15 * fVar35 * fVar28) -
                                                  fVar35 * fVar7 * fVar34) - fVar37 * fVar36 * fVar4
                                                  ) - fVar38 * fVar36 * fVar5)) -
                                                  fVar42 * fVar41 * fVar4) - fVar43 * fVar41 * fVar5
                                                  ) - fVar37 * fVar41 * fVar13) -
                                                  fVar38 * fVar41 * fVar14)) -
                                                  fVar42 * fVar46 * fVar5) -
                                                  fVar37 * fVar46 * fVar14)) -
                                                  fVar48 * fVar47 * fVar4) - fVar49 * fVar47 * fVar5
                                                  ) - fVar37 * fVar47 * fVar23) -
                                                fVar38 * fVar47 * fVar24)) - fVar48 * fVar52 * fVar5
                                               ) - fVar37 * fVar52 * fVar24)) -
                                             fVar54 * fVar53 * fVar4) - fVar48 * fVar53 * fVar13) -
                                           fVar49 * fVar53 * fVar14) - fVar42 * fVar53 * fVar23) -
                                         fVar43 * fVar53 * fVar24) - fVar38 * fVar53 * fVar32)) -
                                       fVar54 * fVar56 * fVar5) - fVar48 * fVar56 * fVar14) -
                                     fVar42 * fVar56 * fVar24) - fVar37 * fVar56 * fVar32)) -
                                   fVar3 * fVar57 * fVar39) - fVar57 * fVar2 * fVar40)) -
                                 fVar11 * fVar58 * fVar39) - fVar12 * fVar58 * fVar40) -
                               fVar3 * fVar58 * fVar44) - fVar58 * fVar2 * fVar45)) -
                             fVar11 * fVar59 * fVar40) - fVar59 * fVar3 * fVar45)) -
                           fVar21 * fVar60 * fVar39) - fVar22 * fVar60 * fVar40) -
                         fVar3 * fVar60 * fVar50) - fVar60 * fVar2 * fVar51)) -
                       fVar21 * fVar61 * fVar40) - fVar61 * fVar3 * fVar51)) -
                     fVar31 * fVar62 * fVar39) - fVar21 * fVar62 * fVar44) -
                   fVar22 * fVar62 * fVar45) - fVar11 * fVar62 * fVar50) - fVar12 * fVar62 * fVar51)
                - fVar2 * fVar62 * fVar55)) - fVar31 * fVar63 * fVar40) - fVar21 * fVar63 * fVar45)
             - fVar11 * fVar63 * fVar51) - fVar3 * fVar63 * fVar55;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar79[2];
  fVar5 = pfVar79[4];
  fVar6 = pfVar82[2];
  fVar7 = pfVar82[4];
  fVar8 = pfVar81[2];
  fVar9 = pfVar81[4];
  fVar10 = pfVar78[7];
  fVar11 = pfVar78[2];
  fVar12 = pfVar78[4];
  fVar13 = pfVar80[7];
  fVar14 = pfVar81[7];
  fVar15 = pfVar79[7];
  fVar16 = pfVar82[7];
  fVar17 = pfVar80[8];
  fVar18 = pfVar81[8];
  fVar19 = pfVar79[8];
  fVar20 = pfVar82[8];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[8];
  fVar22 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar23 = pfVar80[2];
  fVar24 = pfVar79[4];
  fVar25 = pfVar78[7];
  fVar26 = pfVar80[4];
  fVar27 = pfVar78[4];
  fVar28 = pfVar79[7];
  fVar29 = pfVar80[7];
  fVar30 = pfVar78[2];
  fVar31 = pfVar79[8];
  fVar32 = pfVar80[8];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[8];
  fVar34 = pfVar78[7];
  fVar35 = pfVar78[4];
  fVar36 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x26
                      );
  *pSVar83 = ((((fVar22 * fVar36 * fVar20 +
                fVar24 * fVar36 * fVar16 +
                fVar28 * fVar36 * fVar7 +
                fVar31 * fVar36 * fVar6 +
                (((fVar22 * fVar35 * fVar16 +
                  fVar28 * fVar35 * fVar6 +
                  (((fVar22 * fVar34 * fVar7 +
                    fVar24 * fVar34 * fVar6 +
                    ((fVar22 * fVar33 * fVar6 +
                     fVar4 * fVar30 * fVar32 +
                     fVar5 * fVar30 * fVar29 +
                     fVar15 * fVar30 * fVar26 +
                     fVar19 * fVar30 * fVar23 +
                     (((((fVar27 * fVar4 * fVar29 +
                         fVar15 * fVar27 * fVar23 +
                         (((fVar25 * fVar4 * fVar26 +
                           fVar5 * fVar25 * fVar23 +
                           (((fVar21 * fVar4 * fVar23 +
                             ((((((fVar2 * fVar11 * fVar18 +
                                  fVar3 * fVar11 * fVar14 +
                                  fVar13 * fVar11 * fVar9 +
                                  fVar11 * fVar17 * fVar8 +
                                  (((fVar2 * fVar12 * fVar14 +
                                    fVar12 * fVar13 * fVar8 +
                                    (((fVar2 * fVar10 * fVar9 +
                                      fVar10 * fVar3 * fVar8 +
                                      (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                                     fVar5 * fVar10 * fVar6) - fVar10 * fVar4 * fVar7)) -
                                   fVar15 * fVar12 * fVar6) - fVar12 * fVar4 * fVar16)) -
                                 fVar19 * fVar11 * fVar6) - fVar15 * fVar11 * fVar7) -
                               fVar5 * fVar11 * fVar16) - fVar11 * fVar4 * fVar20) -
                             fVar22 * fVar21 * fVar8)) - fVar24 * fVar25 * fVar8) -
                           fVar22 * fVar25 * fVar9)) - fVar28 * fVar27 * fVar8) -
                         fVar22 * fVar27 * fVar14)) - fVar31 * fVar30 * fVar8) -
                       fVar28 * fVar30 * fVar9) - fVar24 * fVar30 * fVar14) -
                     fVar22 * fVar30 * fVar18)) - fVar33 * fVar2 * fVar23)) -
                   fVar3 * fVar34 * fVar23) - fVar34 * fVar2 * fVar26)) - fVar13 * fVar35 * fVar23)
                - fVar35 * fVar2 * fVar29)) - fVar17 * fVar36 * fVar23) - fVar13 * fVar36 * fVar26)
             - fVar3 * fVar36 * fVar29) - fVar2 * fVar36 * fVar32;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[8];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[3];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[3];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[3];
  fVar10 = pfVar73[6];
  fVar11 = pfVar75[5];
  fVar12 = pfVar76[5];
  fVar13 = pfVar74[5];
  fVar14 = pfVar77[5];
  fVar15 = pfVar73[5];
  fVar16 = pfVar75[6];
  fVar17 = pfVar76[6];
  fVar18 = pfVar74[6];
  fVar19 = pfVar77[6];
  fVar20 = pfVar73[3];
  fVar21 = pfVar75[8];
  fVar22 = pfVar76[8];
  fVar23 = pfVar74[8];
  fVar24 = pfVar77[8];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[8];
  fVar27 = pfVar74[3];
  fVar28 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = *pfVar75;
  fVar30 = pfVar75[3];
  fVar31 = pfVar73[6];
  fVar32 = pfVar74[5];
  fVar33 = pfVar75[5];
  fVar34 = pfVar73[5];
  fVar35 = pfVar74[6];
  fVar36 = pfVar75[6];
  fVar37 = pfVar73[3];
  fVar38 = pfVar74[8];
  fVar39 = pfVar75[8];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[8];
  fVar42 = pfVar73[6];
  fVar43 = pfVar73[5];
  fVar44 = pfVar73[3];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x27
                      );
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                (((((fVar28 * fVar44 * fVar24 +
                    fVar27 * fVar44 * fVar19 +
                    fVar35 * fVar44 * fVar9 +
                    fVar38 * fVar44 * fVar8 +
                    (((fVar28 * fVar43 * fVar19 +
                      fVar35 * fVar43 * fVar8 +
                      ((((fVar28 * fVar42 * fVar14 +
                         fVar27 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar7 * fVar37 * fVar36 +
                               fVar18 * fVar37 * fVar30 +
                               fVar23 * fVar37 * fVar29 +
                               (((((fVar34 * fVar6 * fVar36 +
                                   fVar18 * fVar34 * fVar29 +
                                   (((fVar31 * fVar6 * fVar33 +
                                     fVar7 * fVar31 * fVar30 +
                                     fVar13 * fVar31 * fVar29 +
                                     ((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              (((((fVar2 * fVar20 * fVar22 +
                                                  fVar3 * fVar20 * fVar17 +
                                                  fVar16 * fVar20 * fVar5 +
                                                  fVar20 * fVar21 * fVar4 +
                                                  (((fVar2 * fVar15 * fVar17 +
                                                    fVar15 * fVar16 * fVar4 +
                                                    ((((fVar2 * fVar10 * fVar12 +
                                                       fVar3 * fVar10 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar7 * fVar10 * fVar9) -
                                                    fVar10 * fVar6 * fVar14)) -
                                                   fVar18 * fVar15 * fVar8) -
                                                  fVar15 * fVar6 * fVar19)) -
                                                 fVar23 * fVar20 * fVar8) - fVar18 * fVar20 * fVar9)
                                               - fVar7 * fVar20 * fVar19) - fVar20 * fVar6 * fVar24)
                                              ) - fVar23 * fVar25 * fVar9) -
                                            fVar18 * fVar25 * fVar14) - fVar13 * fVar25 * fVar19) -
                                          fVar25 * fVar7 * fVar24) - fVar27 * fVar26 * fVar4) -
                                        fVar28 * fVar26 * fVar5)) - fVar32 * fVar31 * fVar4) -
                                      fVar27 * fVar31 * fVar5) - fVar28 * fVar31 * fVar12)) -
                                    fVar35 * fVar34 * fVar4) - fVar28 * fVar34 * fVar17)) -
                                  fVar38 * fVar37 * fVar4) - fVar35 * fVar37 * fVar5) -
                                fVar27 * fVar37 * fVar17) - fVar28 * fVar37 * fVar22)) -
                              fVar38 * fVar40 * fVar5) - fVar35 * fVar40 * fVar12) -
                            fVar32 * fVar40 * fVar17) - fVar27 * fVar40 * fVar22)) -
                          fVar3 * fVar41 * fVar29) - fVar41 * fVar2 * fVar30)) -
                        fVar11 * fVar42 * fVar29) - fVar3 * fVar42 * fVar30) -
                      fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                    fVar43 * fVar2 * fVar36)) - fVar21 * fVar44 * fVar29) - fVar16 * fVar44 * fVar30
                  ) - fVar3 * fVar44 * fVar36) - fVar2 * fVar44 * fVar39)) -
               fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) - fVar11 * fVar45 * fVar36) -
             fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[8];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[4];
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar75;
  fVar7 = pfVar75[1];
  fVar8 = pfVar76[3];
  fVar9 = pfVar76[4];
  fVar10 = pfVar74[4];
  fVar11 = *pfVar77;
  fVar12 = pfVar77[1];
  fVar13 = pfVar74[3];
  fVar14 = pfVar74[1];
  fVar15 = pfVar77[3];
  fVar16 = *pfVar74;
  fVar17 = pfVar77[4];
  fVar18 = pfVar73[7];
  fVar19 = pfVar75[5];
  fVar20 = pfVar76[5];
  fVar21 = pfVar74[5];
  fVar22 = pfVar77[5];
  fVar23 = pfVar73[6];
  fVar24 = pfVar73[5];
  fVar25 = pfVar75[7];
  fVar26 = pfVar75[6];
  fVar27 = pfVar76[6];
  fVar28 = pfVar76[7];
  fVar29 = pfVar74[7];
  fVar30 = pfVar74[6];
  fVar31 = pfVar77[6];
  fVar32 = pfVar77[7];
  fVar33 = pfVar73[4];
  fVar34 = pfVar75[8];
  fVar35 = pfVar76[8];
  fVar36 = pfVar74[8];
  fVar37 = pfVar77[8];
  fVar38 = pfVar73[3];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[8];
  fVar42 = pfVar74[4];
  fVar43 = pfVar74[3];
  fVar44 = pfVar74[1];
  fVar45 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar46 = *pfVar75;
  fVar47 = pfVar75[1];
  fVar48 = pfVar75[3];
  fVar49 = pfVar75[4];
  fVar50 = pfVar73[7];
  fVar51 = pfVar74[5];
  fVar52 = pfVar75[5];
  fVar53 = pfVar73[6];
  fVar54 = pfVar73[5];
  fVar55 = pfVar74[7];
  fVar56 = pfVar74[6];
  fVar57 = pfVar75[6];
  fVar58 = pfVar75[7];
  fVar59 = pfVar73[4];
  fVar60 = pfVar74[8];
  fVar61 = pfVar75[8];
  fVar62 = pfVar73[3];
  fVar63 = pfVar73[1];
  fVar64 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar65 = pfVar73[8];
  fVar66 = pfVar73[7];
  fVar67 = pfVar73[6];
  fVar68 = pfVar73[5];
  fVar69 = pfVar73[4];
  fVar70 = pfVar73[3];
  fVar71 = pfVar73[1];
  fVar72 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x28
                      );
  *pSVar83 = ((((fVar42 * fVar72 * fVar37 +
                fVar51 * fVar72 * fVar32 +
                fVar55 * fVar72 * fVar22 +
                fVar60 * fVar72 * fVar17 +
                (((((fVar43 * fVar71 * fVar37 +
                    fVar51 * fVar71 * fVar31 +
                    fVar56 * fVar71 * fVar22 +
                    fVar60 * fVar71 * fVar15 +
                    (((((((fVar44 * fVar70 * fVar37 +
                          fVar43 * fVar70 * fVar32 +
                          fVar42 * fVar70 * fVar31 +
                          fVar56 * fVar70 * fVar17 +
                          fVar55 * fVar70 * fVar15 +
                          fVar60 * fVar70 * fVar12 +
                          (((((fVar45 * fVar69 * fVar37 +
                              fVar43 * fVar69 * fVar31 +
                              fVar56 * fVar69 * fVar15 +
                              fVar60 * fVar69 * fVar11 +
                              (((((fVar45 * fVar68 * fVar32 +
                                  fVar44 * fVar68 * fVar31 +
                                  fVar56 * fVar68 * fVar12 +
                                  fVar55 * fVar68 * fVar11 +
                                  (((((fVar44 * fVar67 * fVar22 +
                                      fVar43 * fVar67 * fVar17 +
                                      fVar42 * fVar67 * fVar15 +
                                      fVar51 * fVar67 * fVar12 +
                                      ((((fVar45 * fVar66 * fVar22 +
                                         fVar43 * fVar66 * fVar15 +
                                         fVar51 * fVar66 * fVar11 +
                                         (((((fVar45 * fVar65 * fVar17 +
                                             fVar44 * fVar65 * fVar15 +
                                             fVar43 * fVar65 * fVar12 +
                                             fVar42 * fVar65 * fVar11 +
                                             fVar10 * fVar64 * fVar61 +
                                             fVar21 * fVar64 * fVar58 +
                                             fVar29 * fVar64 * fVar52 +
                                             fVar36 * fVar64 * fVar49 +
                                             (((((fVar13 * fVar63 * fVar61 +
                                                 fVar21 * fVar63 * fVar57 +
                                                 fVar30 * fVar63 * fVar52 +
                                                 fVar36 * fVar63 * fVar48 +
                                                 (((((fVar14 * fVar62 * fVar61 +
                                                     fVar13 * fVar62 * fVar58 +
                                                     fVar10 * fVar62 * fVar57 +
                                                     fVar30 * fVar62 * fVar49 +
                                                     fVar29 * fVar62 * fVar48 +
                                                     fVar36 * fVar62 * fVar47 +
                                                     (((((((fVar16 * fVar59 * fVar61 +
                                                           fVar13 * fVar59 * fVar57 +
                                                           fVar30 * fVar59 * fVar48 +
                                                           fVar36 * fVar59 * fVar46 +
                                                           (((((fVar54 * fVar16 * fVar58 +
                                                               fVar14 * fVar54 * fVar57 +
                                                               fVar30 * fVar54 * fVar47 +
                                                               fVar29 * fVar54 * fVar46 +
                                                               (((((fVar53 * fVar14 * fVar52 +
                                                                   fVar13 * fVar53 * fVar49 +
                                                                   fVar10 * fVar53 * fVar48 +
                                                                   fVar21 * fVar53 * fVar47 +
                                                                   (((((fVar50 * fVar16 * fVar52 +
                                                                       fVar13 * fVar50 * fVar48 +
                                                                       fVar21 * fVar50 * fVar46 +
                                                                       ((((fVar41 * fVar16 * fVar49
                                                                          + fVar14 * fVar41 * fVar48
                                                                            + fVar13 * fVar41 *
                                                                              fVar47 + fVar10 * 
                                                  fVar41 * fVar46 +
                                                  (((((((((fVar2 * fVar40 * fVar35 +
                                                          fVar19 * fVar40 * fVar28 +
                                                          fVar25 * fVar40 * fVar20 +
                                                          fVar34 * fVar40 * fVar9 +
                                                          (((((fVar3 * fVar39 * fVar35 +
                                                              fVar19 * fVar39 * fVar27 +
                                                              fVar26 * fVar39 * fVar20 +
                                                              fVar34 * fVar39 * fVar8 +
                                                              (((((((fVar7 * fVar38 * fVar35 +
                                                                    fVar3 * fVar38 * fVar28 +
                                                                    fVar2 * fVar38 * fVar27 +
                                                                    fVar26 * fVar38 * fVar9 +
                                                                    fVar25 * fVar38 * fVar8 +
                                                                    fVar34 * fVar38 * fVar5 +
                                                                    (((((fVar6 * fVar33 * fVar35 +
                                                                        fVar3 * fVar33 * fVar27 +
                                                                        fVar26 * fVar33 * fVar8 +
                                                                        fVar33 * fVar34 * fVar4 +
                                                                        (((((fVar6 * fVar24 * fVar28
                                                                            + fVar7 * fVar24 *
                                                                              fVar27 + fVar24 * 
                                                  fVar26 * fVar5 +
                                                  fVar24 * fVar25 * fVar4 +
                                                  (((((fVar7 * fVar23 * fVar20 +
                                                      fVar3 * fVar23 * fVar9 +
                                                      fVar2 * fVar23 * fVar8 +
                                                      fVar19 * fVar23 * fVar5 +
                                                      ((((fVar6 * fVar18 * fVar20 +
                                                         fVar3 * fVar18 * fVar8 +
                                                         fVar18 * fVar19 * fVar4 +
                                                         (((((fVar1 * fVar6 * fVar9 +
                                                             fVar1 * fVar7 * fVar8 +
                                                             fVar1 * fVar2 * fVar4 +
                                                             fVar1 * fVar3 * fVar5) -
                                                            fVar10 * fVar1 * fVar11) -
                                                           fVar13 * fVar1 * fVar12) -
                                                          fVar14 * fVar1 * fVar15) -
                                                         fVar1 * fVar16 * fVar17)) -
                                                        fVar21 * fVar18 * fVar11) -
                                                       fVar13 * fVar18 * fVar15) -
                                                      fVar18 * fVar16 * fVar22)) -
                                                     fVar21 * fVar23 * fVar12) -
                                                    fVar10 * fVar23 * fVar15) -
                                                   fVar13 * fVar23 * fVar17) -
                                                  fVar23 * fVar14 * fVar22)) -
                                                  fVar29 * fVar24 * fVar11) -
                                                  fVar30 * fVar24 * fVar12) -
                                                  fVar14 * fVar24 * fVar31) -
                                                  fVar24 * fVar16 * fVar32)) -
                                                  fVar36 * fVar33 * fVar11) -
                                                  fVar30 * fVar33 * fVar15) -
                                                  fVar13 * fVar33 * fVar31) -
                                                  fVar33 * fVar16 * fVar37)) -
                                                  fVar36 * fVar38 * fVar12) -
                                                  fVar29 * fVar38 * fVar15) -
                                                  fVar30 * fVar38 * fVar17) -
                                                  fVar10 * fVar38 * fVar31) -
                                                  fVar13 * fVar38 * fVar32) -
                                                  fVar38 * fVar14 * fVar37)) -
                                                  fVar36 * fVar39 * fVar15) -
                                                  fVar30 * fVar39 * fVar22) -
                                                  fVar21 * fVar39 * fVar31) -
                                                  fVar39 * fVar13 * fVar37)) -
                                                  fVar36 * fVar40 * fVar17) -
                                                  fVar29 * fVar40 * fVar22) -
                                                  fVar21 * fVar40 * fVar32) -
                                                  fVar40 * fVar10 * fVar37) -
                                                  fVar42 * fVar41 * fVar4) - fVar43 * fVar41 * fVar5
                                                  ) - fVar44 * fVar41 * fVar8) -
                                                  fVar45 * fVar41 * fVar9)) -
                                                  fVar51 * fVar50 * fVar4) - fVar43 * fVar50 * fVar8
                                                  ) - fVar45 * fVar50 * fVar20)) -
                                                  fVar51 * fVar53 * fVar5) - fVar42 * fVar53 * fVar8
                                                  ) - fVar43 * fVar53 * fVar9) -
                                                  fVar44 * fVar53 * fVar20)) -
                                                  fVar55 * fVar54 * fVar4) - fVar56 * fVar54 * fVar5
                                                  ) - fVar44 * fVar54 * fVar27) -
                                                  fVar45 * fVar54 * fVar28)) -
                                                  fVar60 * fVar59 * fVar4) - fVar56 * fVar59 * fVar8
                                                  ) - fVar43 * fVar59 * fVar27) -
                                                  fVar45 * fVar59 * fVar35)) -
                                                  fVar60 * fVar62 * fVar5) - fVar55 * fVar62 * fVar8
                                                  ) - fVar56 * fVar62 * fVar9) -
                                                  fVar42 * fVar62 * fVar27) -
                                                  fVar43 * fVar62 * fVar28) -
                                                  fVar44 * fVar62 * fVar35)) -
                                                  fVar60 * fVar63 * fVar8) -
                                                  fVar56 * fVar63 * fVar20) -
                                                  fVar51 * fVar63 * fVar27) -
                                                 fVar43 * fVar63 * fVar35)) -
                                                fVar60 * fVar64 * fVar9) - fVar55 * fVar64 * fVar20)
                                              - fVar51 * fVar64 * fVar28) - fVar42 * fVar64 * fVar35
                                             )) - fVar2 * fVar65 * fVar46) - fVar3 * fVar65 * fVar47
                                           ) - fVar7 * fVar65 * fVar48) - fVar65 * fVar6 * fVar49))
                                        - fVar19 * fVar66 * fVar46) - fVar3 * fVar66 * fVar48) -
                                      fVar66 * fVar6 * fVar52)) - fVar19 * fVar67 * fVar47) -
                                    fVar2 * fVar67 * fVar48) - fVar3 * fVar67 * fVar49) -
                                  fVar67 * fVar7 * fVar52)) - fVar25 * fVar68 * fVar46) -
                                fVar26 * fVar68 * fVar47) - fVar7 * fVar68 * fVar57) -
                              fVar68 * fVar6 * fVar58)) - fVar34 * fVar69 * fVar46) -
                            fVar26 * fVar69 * fVar48) - fVar3 * fVar69 * fVar57) -
                          fVar6 * fVar69 * fVar61)) - fVar34 * fVar70 * fVar47) -
                        fVar25 * fVar70 * fVar48) - fVar26 * fVar70 * fVar49) -
                      fVar2 * fVar70 * fVar57) - fVar3 * fVar70 * fVar58) - fVar7 * fVar70 * fVar61)
                    ) - fVar34 * fVar71 * fVar48) - fVar26 * fVar71 * fVar52) -
                 fVar19 * fVar71 * fVar57) - fVar3 * fVar71 * fVar61)) - fVar34 * fVar72 * fVar49) -
              fVar25 * fVar72 * fVar52) - fVar19 * fVar72 * fVar58) - fVar2 * fVar72 * fVar61;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[4];
  fVar3 = pfVar80[3];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[2];
  fVar8 = pfVar81[3];
  fVar9 = pfVar81[4];
  fVar10 = pfVar79[4];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[2];
  fVar13 = pfVar79[3];
  fVar14 = pfVar79[2];
  fVar15 = pfVar82[3];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[4];
  fVar18 = pfVar78[7];
  fVar19 = pfVar80[5];
  fVar20 = pfVar81[5];
  fVar21 = pfVar79[5];
  fVar22 = pfVar82[5];
  fVar23 = pfVar78[6];
  fVar24 = pfVar78[5];
  fVar25 = pfVar80[7];
  fVar26 = pfVar80[6];
  fVar27 = pfVar81[6];
  fVar28 = pfVar81[7];
  fVar29 = pfVar79[7];
  fVar30 = pfVar79[6];
  fVar31 = pfVar82[6];
  fVar32 = pfVar82[7];
  fVar33 = pfVar78[4];
  fVar34 = pfVar80[8];
  fVar35 = pfVar81[8];
  fVar36 = pfVar79[8];
  fVar37 = pfVar82[8];
  fVar38 = pfVar78[3];
  fVar39 = pfVar78[2];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[8];
  fVar42 = pfVar79[4];
  fVar43 = pfVar79[3];
  fVar44 = pfVar79[2];
  fVar45 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar46 = pfVar80[1];
  fVar47 = pfVar80[2];
  fVar48 = pfVar80[3];
  fVar49 = pfVar80[4];
  fVar50 = pfVar78[7];
  fVar51 = pfVar79[5];
  fVar52 = pfVar80[5];
  fVar53 = pfVar78[6];
  fVar54 = pfVar78[5];
  fVar55 = pfVar79[7];
  fVar56 = pfVar79[6];
  fVar57 = pfVar80[6];
  fVar58 = pfVar80[7];
  fVar59 = pfVar78[4];
  fVar60 = pfVar79[8];
  fVar61 = pfVar80[8];
  fVar62 = pfVar78[3];
  fVar63 = pfVar78[2];
  fVar64 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar65 = pfVar78[8];
  fVar66 = pfVar78[7];
  fVar67 = pfVar78[6];
  fVar68 = pfVar78[5];
  fVar69 = pfVar78[4];
  fVar70 = pfVar78[3];
  fVar71 = pfVar78[2];
  fVar72 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x29
                      );
  *pSVar83 = ((((fVar42 * fVar72 * fVar37 +
                fVar51 * fVar72 * fVar32 +
                fVar55 * fVar72 * fVar22 +
                fVar60 * fVar72 * fVar17 +
                (((((fVar43 * fVar71 * fVar37 +
                    fVar51 * fVar71 * fVar31 +
                    fVar56 * fVar71 * fVar22 +
                    fVar60 * fVar71 * fVar15 +
                    (((((fVar44 * fVar70 * fVar37 +
                        fVar42 * fVar70 * fVar32 +
                        fVar55 * fVar70 * fVar17 +
                        fVar60 * fVar70 * fVar12 +
                        (((((((fVar45 * fVar69 * fVar37 +
                              fVar43 * fVar69 * fVar32 +
                              fVar42 * fVar69 * fVar31 +
                              fVar56 * fVar69 * fVar17 +
                              fVar55 * fVar69 * fVar15 +
                              fVar60 * fVar69 * fVar11 +
                              (((((fVar45 * fVar68 * fVar32 +
                                  fVar44 * fVar68 * fVar31 +
                                  fVar56 * fVar68 * fVar12 +
                                  fVar55 * fVar68 * fVar11 +
                                  ((((fVar44 * fVar67 * fVar22 +
                                     fVar42 * fVar67 * fVar17 +
                                     fVar51 * fVar67 * fVar12 +
                                     (((((fVar45 * fVar66 * fVar22 +
                                         fVar43 * fVar66 * fVar17 +
                                         fVar42 * fVar66 * fVar15 +
                                         fVar51 * fVar66 * fVar11 +
                                         (((((fVar45 * fVar65 * fVar17 +
                                             fVar44 * fVar65 * fVar15 +
                                             fVar43 * fVar65 * fVar12 +
                                             fVar42 * fVar65 * fVar11 +
                                             fVar10 * fVar64 * fVar61 +
                                             fVar21 * fVar64 * fVar58 +
                                             fVar29 * fVar64 * fVar52 +
                                             fVar36 * fVar64 * fVar49 +
                                             (((((fVar13 * fVar63 * fVar61 +
                                                 fVar21 * fVar63 * fVar57 +
                                                 fVar30 * fVar63 * fVar52 +
                                                 fVar36 * fVar63 * fVar48 +
                                                 (((((fVar14 * fVar62 * fVar61 +
                                                     fVar10 * fVar62 * fVar58 +
                                                     fVar29 * fVar62 * fVar49 +
                                                     fVar36 * fVar62 * fVar47 +
                                                     (((((fVar16 * fVar59 * fVar61 +
                                                         fVar13 * fVar59 * fVar58 +
                                                         fVar10 * fVar59 * fVar57 +
                                                         fVar30 * fVar59 * fVar49 +
                                                         fVar29 * fVar59 * fVar48 +
                                                         fVar36 * fVar59 * fVar46 +
                                                         (((((((fVar54 * fVar16 * fVar58 +
                                                               fVar14 * fVar54 * fVar57 +
                                                               fVar30 * fVar54 * fVar47 +
                                                               fVar29 * fVar54 * fVar46 +
                                                               (((((fVar53 * fVar14 * fVar52 +
                                                                   fVar10 * fVar53 * fVar49 +
                                                                   fVar21 * fVar53 * fVar47 +
                                                                   ((((fVar50 * fVar16 * fVar52 +
                                                                      fVar13 * fVar50 * fVar49 +
                                                                      fVar10 * fVar50 * fVar48 +
                                                                      fVar21 * fVar50 * fVar46 +
                                                                      (((((fVar41 * fVar16 * fVar49
                                                                          + fVar14 * fVar41 * fVar48
                                                                            + fVar13 * fVar41 *
                                                                              fVar47 + fVar10 * 
                                                  fVar41 * fVar46 +
                                                  (((((((((fVar2 * fVar40 * fVar35 +
                                                          fVar19 * fVar40 * fVar28 +
                                                          fVar25 * fVar40 * fVar20 +
                                                          fVar34 * fVar40 * fVar9 +
                                                          (((((fVar3 * fVar39 * fVar35 +
                                                              fVar19 * fVar39 * fVar27 +
                                                              fVar26 * fVar39 * fVar20 +
                                                              fVar34 * fVar39 * fVar8 +
                                                              (((((fVar7 * fVar38 * fVar35 +
                                                                  fVar2 * fVar38 * fVar28 +
                                                                  fVar25 * fVar38 * fVar9 +
                                                                  fVar34 * fVar38 * fVar5 +
                                                                  (((((((fVar6 * fVar33 * fVar35 +
                                                                        fVar3 * fVar33 * fVar28 +
                                                                        fVar2 * fVar33 * fVar27 +
                                                                        fVar26 * fVar33 * fVar9 +
                                                                        fVar25 * fVar33 * fVar8 +
                                                                        fVar33 * fVar34 * fVar4 +
                                                                        (((((fVar6 * fVar24 * fVar28
                                                                            + fVar7 * fVar24 *
                                                                              fVar27 + fVar24 * 
                                                  fVar26 * fVar5 +
                                                  fVar24 * fVar25 * fVar4 +
                                                  ((((fVar7 * fVar23 * fVar20 +
                                                     fVar2 * fVar23 * fVar9 +
                                                     fVar19 * fVar23 * fVar5 +
                                                     (((((fVar6 * fVar18 * fVar20 +
                                                         fVar3 * fVar18 * fVar9 +
                                                         fVar2 * fVar18 * fVar8 +
                                                         fVar18 * fVar19 * fVar4 +
                                                         (((((fVar1 * fVar6 * fVar9 +
                                                             fVar1 * fVar7 * fVar8 +
                                                             fVar1 * fVar2 * fVar4 +
                                                             fVar1 * fVar3 * fVar5) -
                                                            fVar10 * fVar1 * fVar11) -
                                                           fVar13 * fVar1 * fVar12) -
                                                          fVar14 * fVar1 * fVar15) -
                                                         fVar1 * fVar16 * fVar17)) -
                                                        fVar21 * fVar18 * fVar11) -
                                                       fVar10 * fVar18 * fVar15) -
                                                      fVar13 * fVar18 * fVar17) -
                                                     fVar18 * fVar16 * fVar22)) -
                                                    fVar21 * fVar23 * fVar12) -
                                                   fVar10 * fVar23 * fVar17) -
                                                  fVar23 * fVar14 * fVar22)) -
                                                  fVar29 * fVar24 * fVar11) -
                                                  fVar30 * fVar24 * fVar12) -
                                                  fVar14 * fVar24 * fVar31) -
                                                  fVar24 * fVar16 * fVar32)) -
                                                  fVar36 * fVar33 * fVar11) -
                                                  fVar29 * fVar33 * fVar15) -
                                                  fVar30 * fVar33 * fVar17) -
                                                  fVar10 * fVar33 * fVar31) -
                                                  fVar13 * fVar33 * fVar32) -
                                                  fVar33 * fVar16 * fVar37)) -
                                                  fVar36 * fVar38 * fVar12) -
                                                  fVar29 * fVar38 * fVar17) -
                                                  fVar10 * fVar38 * fVar32) -
                                                  fVar38 * fVar14 * fVar37)) -
                                                  fVar36 * fVar39 * fVar15) -
                                                  fVar30 * fVar39 * fVar22) -
                                                  fVar21 * fVar39 * fVar31) -
                                                  fVar39 * fVar13 * fVar37)) -
                                                  fVar36 * fVar40 * fVar17) -
                                                  fVar29 * fVar40 * fVar22) -
                                                  fVar21 * fVar40 * fVar32) -
                                                  fVar40 * fVar10 * fVar37) -
                                                  fVar42 * fVar41 * fVar4) - fVar43 * fVar41 * fVar5
                                                  ) - fVar44 * fVar41 * fVar8) -
                                                  fVar45 * fVar41 * fVar9)) -
                                                  fVar51 * fVar50 * fVar4) - fVar42 * fVar50 * fVar8
                                                  ) - fVar43 * fVar50 * fVar9) -
                                                  fVar45 * fVar50 * fVar20)) -
                                                  fVar51 * fVar53 * fVar5) - fVar42 * fVar53 * fVar9
                                                  ) - fVar44 * fVar53 * fVar20)) -
                                                  fVar55 * fVar54 * fVar4) - fVar56 * fVar54 * fVar5
                                                  ) - fVar44 * fVar54 * fVar27) -
                                                  fVar45 * fVar54 * fVar28)) -
                                                  fVar60 * fVar59 * fVar4) - fVar55 * fVar59 * fVar8
                                                  ) - fVar56 * fVar59 * fVar9) -
                                                  fVar42 * fVar59 * fVar27) -
                                                  fVar43 * fVar59 * fVar28) -
                                                  fVar45 * fVar59 * fVar35)) -
                                                  fVar60 * fVar62 * fVar5) - fVar55 * fVar62 * fVar9
                                                  ) - fVar42 * fVar62 * fVar28) -
                                                  fVar44 * fVar62 * fVar35)) -
                                                  fVar60 * fVar63 * fVar8) -
                                                  fVar56 * fVar63 * fVar20) -
                                                  fVar51 * fVar63 * fVar27) -
                                                 fVar43 * fVar63 * fVar35)) -
                                                fVar60 * fVar64 * fVar9) - fVar55 * fVar64 * fVar20)
                                              - fVar51 * fVar64 * fVar28) - fVar42 * fVar64 * fVar35
                                             )) - fVar2 * fVar65 * fVar46) - fVar3 * fVar65 * fVar47
                                           ) - fVar7 * fVar65 * fVar48) - fVar65 * fVar6 * fVar49))
                                        - fVar19 * fVar66 * fVar46) - fVar2 * fVar66 * fVar48) -
                                      fVar3 * fVar66 * fVar49) - fVar66 * fVar6 * fVar52)) -
                                    fVar19 * fVar67 * fVar47) - fVar2 * fVar67 * fVar49) -
                                  fVar67 * fVar7 * fVar52)) - fVar25 * fVar68 * fVar46) -
                                fVar26 * fVar68 * fVar47) - fVar7 * fVar68 * fVar57) -
                              fVar68 * fVar6 * fVar58)) - fVar34 * fVar69 * fVar46) -
                            fVar25 * fVar69 * fVar48) - fVar26 * fVar69 * fVar49) -
                          fVar2 * fVar69 * fVar57) - fVar3 * fVar69 * fVar58) -
                        fVar6 * fVar69 * fVar61)) - fVar34 * fVar70 * fVar47) -
                      fVar25 * fVar70 * fVar49) - fVar2 * fVar70 * fVar58) - fVar7 * fVar70 * fVar61
                    )) - fVar34 * fVar71 * fVar48) - fVar26 * fVar71 * fVar52) -
                 fVar19 * fVar71 * fVar57) - fVar3 * fVar71 * fVar61)) - fVar34 * fVar72 * fVar49) -
              fVar25 * fVar72 * fVar52) - fVar19 * fVar72 * fVar58) - fVar2 * fVar72 * fVar61;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[2];
  fVar5 = pfVar81[4];
  fVar6 = pfVar79[2];
  fVar7 = pfVar79[4];
  fVar8 = pfVar82[2];
  fVar9 = pfVar82[4];
  fVar10 = pfVar78[7];
  fVar11 = pfVar80[5];
  fVar12 = pfVar81[5];
  fVar13 = pfVar79[5];
  fVar14 = pfVar82[5];
  fVar15 = pfVar78[5];
  fVar16 = pfVar80[7];
  fVar17 = pfVar81[7];
  fVar18 = pfVar79[7];
  fVar19 = pfVar82[7];
  fVar20 = pfVar78[4];
  fVar21 = pfVar80[8];
  fVar22 = pfVar81[8];
  fVar23 = pfVar79[8];
  fVar24 = pfVar82[8];
  fVar25 = pfVar78[2];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[8];
  fVar27 = pfVar79[4];
  fVar28 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = pfVar80[2];
  fVar30 = pfVar80[4];
  fVar31 = pfVar78[7];
  fVar32 = pfVar79[5];
  fVar33 = pfVar80[5];
  fVar34 = pfVar78[5];
  fVar35 = pfVar79[7];
  fVar36 = pfVar80[7];
  fVar37 = pfVar78[4];
  fVar38 = pfVar79[8];
  fVar39 = pfVar80[8];
  fVar40 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[8];
  fVar42 = pfVar78[7];
  fVar43 = pfVar78[5];
  fVar44 = pfVar78[4];
  fVar45 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x2a
                      );
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                (((((fVar28 * fVar44 * fVar24 +
                    fVar27 * fVar44 * fVar19 +
                    fVar35 * fVar44 * fVar9 +
                    fVar38 * fVar44 * fVar8 +
                    (((fVar28 * fVar43 * fVar19 +
                      fVar35 * fVar43 * fVar8 +
                      ((((fVar28 * fVar42 * fVar14 +
                         fVar27 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar7 * fVar37 * fVar36 +
                               fVar18 * fVar37 * fVar30 +
                               fVar23 * fVar37 * fVar29 +
                               (((((fVar34 * fVar6 * fVar36 +
                                   fVar18 * fVar34 * fVar29 +
                                   (((fVar31 * fVar6 * fVar33 +
                                     fVar7 * fVar31 * fVar30 +
                                     fVar13 * fVar31 * fVar29 +
                                     ((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              (((((fVar2 * fVar20 * fVar22 +
                                                  fVar3 * fVar20 * fVar17 +
                                                  fVar16 * fVar20 * fVar5 +
                                                  fVar20 * fVar21 * fVar4 +
                                                  (((fVar2 * fVar15 * fVar17 +
                                                    fVar15 * fVar16 * fVar4 +
                                                    ((((fVar2 * fVar10 * fVar12 +
                                                       fVar3 * fVar10 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar7 * fVar10 * fVar9) -
                                                    fVar10 * fVar6 * fVar14)) -
                                                   fVar18 * fVar15 * fVar8) -
                                                  fVar15 * fVar6 * fVar19)) -
                                                 fVar23 * fVar20 * fVar8) - fVar18 * fVar20 * fVar9)
                                               - fVar7 * fVar20 * fVar19) - fVar20 * fVar6 * fVar24)
                                              ) - fVar23 * fVar25 * fVar9) -
                                            fVar18 * fVar25 * fVar14) - fVar13 * fVar25 * fVar19) -
                                          fVar25 * fVar7 * fVar24) - fVar27 * fVar26 * fVar4) -
                                        fVar28 * fVar26 * fVar5)) - fVar32 * fVar31 * fVar4) -
                                      fVar27 * fVar31 * fVar5) - fVar28 * fVar31 * fVar12)) -
                                    fVar35 * fVar34 * fVar4) - fVar28 * fVar34 * fVar17)) -
                                  fVar38 * fVar37 * fVar4) - fVar35 * fVar37 * fVar5) -
                                fVar27 * fVar37 * fVar17) - fVar28 * fVar37 * fVar22)) -
                              fVar38 * fVar40 * fVar5) - fVar35 * fVar40 * fVar12) -
                            fVar32 * fVar40 * fVar17) - fVar27 * fVar40 * fVar22)) -
                          fVar3 * fVar41 * fVar29) - fVar41 * fVar2 * fVar30)) -
                        fVar11 * fVar42 * fVar29) - fVar3 * fVar42 * fVar30) -
                      fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                    fVar43 * fVar2 * fVar36)) - fVar21 * fVar44 * fVar29) - fVar16 * fVar44 * fVar30
                  ) - fVar3 * fVar44 * fVar36) - fVar2 * fVar44 * fVar39)) -
               fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) - fVar11 * fVar45 * fVar36) -
             fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[8];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[5];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[3];
  fVar7 = pfVar76[5];
  fVar8 = pfVar74[5];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[3];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[3];
  fVar13 = pfVar77[5];
  fVar14 = pfVar73[6];
  fVar15 = pfVar73[5];
  fVar16 = pfVar75[8];
  fVar17 = pfVar75[6];
  fVar18 = pfVar76[6];
  fVar19 = pfVar76[8];
  fVar20 = pfVar74[8];
  fVar21 = pfVar74[6];
  fVar22 = pfVar77[6];
  fVar23 = pfVar77[8];
  fVar24 = pfVar73[3];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[8];
  fVar27 = pfVar74[5];
  fVar28 = pfVar74[3];
  fVar29 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar30 = *pfVar75;
  fVar31 = pfVar75[3];
  fVar32 = pfVar75[5];
  fVar33 = pfVar73[6];
  fVar34 = pfVar73[5];
  fVar35 = pfVar74[8];
  fVar36 = pfVar74[6];
  fVar37 = pfVar75[6];
  fVar38 = pfVar75[8];
  fVar39 = pfVar73[3];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[8];
  fVar42 = pfVar73[6];
  fVar43 = pfVar73[5];
  fVar44 = pfVar73[3];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x2b
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar23 +
              fVar35 * fVar45 * fVar13 +
              (((((fVar28 * fVar44 * fVar23 +
                  fVar27 * fVar44 * fVar22 +
                  fVar36 * fVar44 * fVar13 +
                  fVar35 * fVar44 * fVar10 +
                  (((((fVar29 * fVar43 * fVar23 +
                      fVar28 * fVar43 * fVar22 +
                      fVar36 * fVar43 * fVar10 +
                      fVar35 * fVar43 * fVar9 +
                      (((fVar28 * fVar42 * fVar13 +
                        fVar27 * fVar42 * fVar10 +
                        ((((fVar29 * fVar41 * fVar13 +
                           fVar28 * fVar41 * fVar10 +
                           fVar27 * fVar41 * fVar9 +
                           fVar8 * fVar40 * fVar38 +
                           fVar20 * fVar40 * fVar32 +
                           (((fVar12 * fVar39 * fVar38 +
                             fVar8 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar32 +
                             fVar20 * fVar39 * fVar31 +
                             (((((fVar11 * fVar34 * fVar38 +
                                 fVar12 * fVar34 * fVar37 +
                                 fVar21 * fVar34 * fVar31 +
                                 fVar20 * fVar34 * fVar30 +
                                 (((((fVar33 * fVar12 * fVar32 +
                                     fVar8 * fVar33 * fVar31 +
                                     (((fVar26 * fVar11 * fVar32 +
                                       fVar12 * fVar26 * fVar31 +
                                       fVar8 * fVar26 * fVar30 +
                                       ((((((fVar2 * fVar25 * fVar19 +
                                            fVar16 * fVar25 * fVar7 +
                                            (((((fVar4 * fVar24 * fVar19 +
                                                fVar2 * fVar24 * fVar18 +
                                                fVar17 * fVar24 * fVar7 +
                                                fVar16 * fVar24 * fVar6 +
                                                (((((fVar3 * fVar15 * fVar19 +
                                                    fVar4 * fVar15 * fVar18 +
                                                    fVar15 * fVar17 * fVar6 +
                                                    fVar15 * fVar16 * fVar5 +
                                                    (((fVar4 * fVar14 * fVar7 +
                                                      fVar2 * fVar14 * fVar6 +
                                                      ((((fVar1 * fVar3 * fVar7 +
                                                         fVar1 * fVar2 * fVar5 +
                                                         fVar1 * fVar4 * fVar6) -
                                                        fVar8 * fVar1 * fVar9) -
                                                       fVar12 * fVar1 * fVar10) -
                                                      fVar1 * fVar11 * fVar13)) -
                                                     fVar8 * fVar14 * fVar10) -
                                                    fVar14 * fVar12 * fVar13)) -
                                                   fVar20 * fVar15 * fVar9) -
                                                  fVar21 * fVar15 * fVar10) -
                                                 fVar12 * fVar15 * fVar22) -
                                                fVar15 * fVar11 * fVar23)) -
                                               fVar20 * fVar24 * fVar10) - fVar21 * fVar24 * fVar13)
                                             - fVar8 * fVar24 * fVar22) - fVar24 * fVar12 * fVar23))
                                           - fVar20 * fVar25 * fVar13) - fVar25 * fVar8 * fVar23) -
                                         fVar27 * fVar26 * fVar5) - fVar28 * fVar26 * fVar6) -
                                       fVar29 * fVar26 * fVar7)) - fVar27 * fVar33 * fVar6) -
                                     fVar28 * fVar33 * fVar7)) - fVar35 * fVar34 * fVar5) -
                                   fVar36 * fVar34 * fVar6) - fVar28 * fVar34 * fVar18) -
                                 fVar29 * fVar34 * fVar19)) - fVar35 * fVar39 * fVar6) -
                               fVar36 * fVar39 * fVar7) - fVar27 * fVar39 * fVar18) -
                             fVar28 * fVar39 * fVar19)) - fVar35 * fVar40 * fVar7) -
                           fVar27 * fVar40 * fVar19)) - fVar2 * fVar41 * fVar30) -
                         fVar4 * fVar41 * fVar31) - fVar41 * fVar3 * fVar32)) -
                       fVar2 * fVar42 * fVar31) - fVar42 * fVar4 * fVar32)) -
                     fVar16 * fVar43 * fVar30) - fVar17 * fVar43 * fVar31) - fVar4 * fVar43 * fVar37
                   ) - fVar3 * fVar43 * fVar38)) - fVar16 * fVar44 * fVar31) -
                fVar17 * fVar44 * fVar32) - fVar2 * fVar44 * fVar37) - fVar4 * fVar44 * fVar38)) -
             fVar16 * fVar45 * fVar32) - fVar2 * fVar45 * fVar38;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[3];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[3];
  fVar8 = pfVar81[4];
  fVar9 = pfVar81[5];
  fVar10 = pfVar79[5];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[3];
  fVar13 = pfVar79[4];
  fVar14 = pfVar79[3];
  fVar15 = pfVar82[4];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[5];
  fVar18 = pfVar78[7];
  fVar19 = pfVar78[6];
  fVar20 = pfVar78[5];
  fVar21 = pfVar80[8];
  fVar22 = pfVar80[7];
  fVar23 = pfVar80[6];
  fVar24 = pfVar81[6];
  fVar25 = pfVar81[7];
  fVar26 = pfVar81[8];
  fVar27 = pfVar79[8];
  fVar28 = pfVar79[7];
  fVar29 = pfVar79[6];
  fVar30 = pfVar82[6];
  fVar31 = pfVar82[7];
  fVar32 = pfVar82[8];
  fVar33 = pfVar78[4];
  fVar34 = pfVar78[3];
  fVar35 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar36 = pfVar78[8];
  fVar37 = pfVar79[5];
  fVar38 = pfVar79[4];
  fVar39 = pfVar79[3];
  fVar40 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar80[1];
  fVar42 = pfVar80[3];
  fVar43 = pfVar80[4];
  fVar44 = pfVar80[5];
  fVar45 = pfVar78[7];
  fVar46 = pfVar78[6];
  fVar47 = pfVar78[5];
  fVar48 = pfVar79[8];
  fVar49 = pfVar79[7];
  fVar50 = pfVar79[6];
  fVar51 = pfVar80[6];
  fVar52 = pfVar80[7];
  fVar53 = pfVar80[8];
  fVar54 = pfVar78[4];
  fVar55 = pfVar78[3];
  fVar56 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar57 = pfVar78[8];
  fVar58 = pfVar78[7];
  fVar59 = pfVar78[6];
  fVar60 = pfVar78[5];
  fVar61 = pfVar78[4];
  fVar62 = pfVar78[3];
  fVar63 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x2c
                      );
  *pSVar83 = ((fVar37 * fVar63 * fVar32 +
              fVar48 * fVar63 * fVar17 +
              (((((fVar38 * fVar62 * fVar32 +
                  fVar37 * fVar62 * fVar31 +
                  fVar49 * fVar62 * fVar17 +
                  fVar48 * fVar62 * fVar15 +
                  (((((fVar39 * fVar61 * fVar32 +
                      fVar37 * fVar61 * fVar30 +
                      fVar50 * fVar61 * fVar17 +
                      fVar48 * fVar61 * fVar12 +
                      (((((((fVar40 * fVar60 * fVar32 +
                            fVar39 * fVar60 * fVar31 +
                            fVar38 * fVar60 * fVar30 +
                            fVar50 * fVar60 * fVar15 +
                            fVar49 * fVar60 * fVar12 +
                            fVar48 * fVar60 * fVar11 +
                            (((fVar38 * fVar59 * fVar17 +
                              fVar37 * fVar59 * fVar15 +
                              (((fVar39 * fVar58 * fVar17 +
                                fVar37 * fVar58 * fVar12 +
                                (((((fVar40 * fVar57 * fVar17 +
                                    fVar39 * fVar57 * fVar15 +
                                    fVar38 * fVar57 * fVar12 +
                                    fVar37 * fVar57 * fVar11 +
                                    fVar10 * fVar56 * fVar53 +
                                    fVar27 * fVar56 * fVar44 +
                                    (((fVar13 * fVar55 * fVar53 +
                                      fVar10 * fVar55 * fVar52 +
                                      fVar28 * fVar55 * fVar44 +
                                      fVar27 * fVar55 * fVar43 +
                                      (((((fVar14 * fVar54 * fVar53 +
                                          fVar10 * fVar54 * fVar51 +
                                          fVar29 * fVar54 * fVar44 +
                                          fVar27 * fVar54 * fVar42 +
                                          (((((fVar16 * fVar47 * fVar53 +
                                              fVar14 * fVar47 * fVar52 +
                                              fVar13 * fVar47 * fVar51 +
                                              fVar29 * fVar47 * fVar43 +
                                              fVar28 * fVar47 * fVar42 +
                                              fVar27 * fVar47 * fVar41 +
                                              (((((((fVar46 * fVar13 * fVar44 +
                                                    fVar10 * fVar46 * fVar43 +
                                                    (((fVar45 * fVar14 * fVar44 +
                                                      fVar10 * fVar45 * fVar42 +
                                                      (((fVar36 * fVar16 * fVar44 +
                                                        fVar14 * fVar36 * fVar43 +
                                                        fVar13 * fVar36 * fVar42 +
                                                        fVar10 * fVar36 * fVar41 +
                                                        (((((((fVar2 * fVar35 * fVar26 +
                                                              fVar21 * fVar35 * fVar9 +
                                                              (((((fVar3 * fVar34 * fVar26 +
                                                                  fVar2 * fVar34 * fVar25 +
                                                                  fVar22 * fVar34 * fVar9 +
                                                                  fVar21 * fVar34 * fVar8 +
                                                                  (((((fVar7 * fVar33 * fVar26 +
                                                                      fVar2 * fVar33 * fVar24 +
                                                                      fVar23 * fVar33 * fVar9 +
                                                                      fVar21 * fVar33 * fVar5 +
                                                                      (((((((fVar6 * fVar20 * fVar26
                                                                            + fVar7 * fVar20 *
                                                                              fVar25 + fVar3 * 
                                                  fVar20 * fVar24 +
                                                  fVar20 * fVar23 * fVar8 +
                                                  fVar20 * fVar22 * fVar5 +
                                                  fVar20 * fVar21 * fVar4 +
                                                  (((fVar3 * fVar19 * fVar9 +
                                                    fVar2 * fVar19 * fVar8 +
                                                    (((fVar7 * fVar18 * fVar9 +
                                                      fVar2 * fVar18 * fVar5 +
                                                      (((((fVar1 * fVar6 * fVar9 +
                                                          fVar1 * fVar7 * fVar8 +
                                                          fVar1 * fVar2 * fVar4 +
                                                          fVar1 * fVar3 * fVar5) -
                                                         fVar10 * fVar1 * fVar11) -
                                                        fVar13 * fVar1 * fVar12) -
                                                       fVar14 * fVar1 * fVar15) -
                                                      fVar1 * fVar16 * fVar17)) -
                                                     fVar10 * fVar18 * fVar12) -
                                                    fVar18 * fVar14 * fVar17)) -
                                                   fVar10 * fVar19 * fVar15) -
                                                  fVar19 * fVar13 * fVar17)) -
                                                  fVar27 * fVar20 * fVar11) -
                                                  fVar28 * fVar20 * fVar12) -
                                                  fVar29 * fVar20 * fVar15) -
                                                  fVar13 * fVar20 * fVar30) -
                                                  fVar14 * fVar20 * fVar31) -
                                                  fVar20 * fVar16 * fVar32)) -
                                                  fVar27 * fVar33 * fVar12) -
                                                  fVar29 * fVar33 * fVar17) -
                                                  fVar10 * fVar33 * fVar30) -
                                                  fVar33 * fVar14 * fVar32)) -
                                                  fVar27 * fVar34 * fVar15) -
                                                  fVar28 * fVar34 * fVar17) -
                                                  fVar10 * fVar34 * fVar31) -
                                                  fVar34 * fVar13 * fVar32)) -
                                                  fVar27 * fVar35 * fVar17) -
                                                  fVar35 * fVar10 * fVar32) -
                                                  fVar37 * fVar36 * fVar4) - fVar38 * fVar36 * fVar5
                                                  ) - fVar39 * fVar36 * fVar8) -
                                                  fVar40 * fVar36 * fVar9)) -
                                                  fVar37 * fVar45 * fVar5) - fVar39 * fVar45 * fVar9
                                                  )) - fVar37 * fVar46 * fVar8) -
                                                  fVar38 * fVar46 * fVar9)) -
                                                  fVar48 * fVar47 * fVar4) - fVar49 * fVar47 * fVar5
                                                  ) - fVar50 * fVar47 * fVar8) -
                                                fVar38 * fVar47 * fVar24) - fVar39 * fVar47 * fVar25
                                               ) - fVar40 * fVar47 * fVar26)) -
                                             fVar48 * fVar54 * fVar5) - fVar50 * fVar54 * fVar9) -
                                           fVar37 * fVar54 * fVar24) - fVar39 * fVar54 * fVar26)) -
                                         fVar48 * fVar55 * fVar8) - fVar49 * fVar55 * fVar9) -
                                       fVar37 * fVar55 * fVar25) - fVar38 * fVar55 * fVar26)) -
                                     fVar48 * fVar56 * fVar9) - fVar37 * fVar56 * fVar26)) -
                                   fVar2 * fVar57 * fVar41) - fVar3 * fVar57 * fVar42) -
                                 fVar7 * fVar57 * fVar43) - fVar57 * fVar6 * fVar44)) -
                               fVar2 * fVar58 * fVar42) - fVar58 * fVar7 * fVar44)) -
                             fVar2 * fVar59 * fVar43) - fVar59 * fVar3 * fVar44)) -
                           fVar21 * fVar60 * fVar41) - fVar22 * fVar60 * fVar42) -
                         fVar23 * fVar60 * fVar43) - fVar3 * fVar60 * fVar51) -
                       fVar7 * fVar60 * fVar52) - fVar6 * fVar60 * fVar53)) -
                     fVar21 * fVar61 * fVar42) - fVar23 * fVar61 * fVar44) - fVar2 * fVar61 * fVar51
                   ) - fVar7 * fVar61 * fVar53)) - fVar21 * fVar62 * fVar43) -
                fVar22 * fVar62 * fVar44) - fVar2 * fVar62 * fVar52) - fVar3 * fVar62 * fVar53)) -
             fVar21 * fVar63 * fVar44) - fVar2 * fVar63 * fVar53;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[2];
  fVar4 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar81[2];
  fVar6 = pfVar81[4];
  fVar7 = pfVar81[5];
  fVar8 = pfVar79[5];
  fVar9 = pfVar82[2];
  fVar10 = pfVar82[4];
  fVar11 = pfVar79[2];
  fVar12 = pfVar79[4];
  fVar13 = pfVar82[5];
  fVar14 = pfVar78[7];
  fVar15 = pfVar78[5];
  fVar16 = pfVar80[8];
  fVar17 = pfVar80[7];
  fVar18 = pfVar81[7];
  fVar19 = pfVar81[8];
  fVar20 = pfVar79[8];
  fVar21 = pfVar79[7];
  fVar22 = pfVar82[7];
  fVar23 = pfVar82[8];
  fVar24 = pfVar78[4];
  fVar25 = pfVar78[2];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[8];
  fVar27 = pfVar79[5];
  fVar28 = pfVar79[4];
  fVar29 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar30 = pfVar80[2];
  fVar31 = pfVar80[4];
  fVar32 = pfVar80[5];
  fVar33 = pfVar78[7];
  fVar34 = pfVar78[5];
  fVar35 = pfVar79[8];
  fVar36 = pfVar79[7];
  fVar37 = pfVar80[7];
  fVar38 = pfVar80[8];
  fVar39 = pfVar78[4];
  fVar40 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[8];
  fVar42 = pfVar78[7];
  fVar43 = pfVar78[5];
  fVar44 = pfVar78[4];
  fVar45 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x2d
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar23 +
              fVar35 * fVar45 * fVar13 +
              (((((fVar28 * fVar44 * fVar23 +
                  fVar27 * fVar44 * fVar22 +
                  fVar36 * fVar44 * fVar13 +
                  fVar35 * fVar44 * fVar10 +
                  (((((fVar29 * fVar43 * fVar23 +
                      fVar28 * fVar43 * fVar22 +
                      fVar36 * fVar43 * fVar10 +
                      fVar35 * fVar43 * fVar9 +
                      (((fVar28 * fVar42 * fVar13 +
                        fVar27 * fVar42 * fVar10 +
                        ((((fVar29 * fVar41 * fVar13 +
                           fVar28 * fVar41 * fVar10 +
                           fVar27 * fVar41 * fVar9 +
                           fVar8 * fVar40 * fVar38 +
                           fVar20 * fVar40 * fVar32 +
                           (((fVar12 * fVar39 * fVar38 +
                             fVar8 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar32 +
                             fVar20 * fVar39 * fVar31 +
                             (((((fVar11 * fVar34 * fVar38 +
                                 fVar12 * fVar34 * fVar37 +
                                 fVar21 * fVar34 * fVar31 +
                                 fVar20 * fVar34 * fVar30 +
                                 (((((fVar33 * fVar12 * fVar32 +
                                     fVar8 * fVar33 * fVar31 +
                                     (((fVar26 * fVar11 * fVar32 +
                                       fVar12 * fVar26 * fVar31 +
                                       fVar8 * fVar26 * fVar30 +
                                       ((((((fVar2 * fVar25 * fVar19 +
                                            fVar16 * fVar25 * fVar7 +
                                            (((((fVar4 * fVar24 * fVar19 +
                                                fVar2 * fVar24 * fVar18 +
                                                fVar17 * fVar24 * fVar7 +
                                                fVar16 * fVar24 * fVar6 +
                                                (((((fVar3 * fVar15 * fVar19 +
                                                    fVar4 * fVar15 * fVar18 +
                                                    fVar15 * fVar17 * fVar6 +
                                                    fVar15 * fVar16 * fVar5 +
                                                    (((fVar4 * fVar14 * fVar7 +
                                                      fVar2 * fVar14 * fVar6 +
                                                      ((((fVar1 * fVar3 * fVar7 +
                                                         fVar1 * fVar2 * fVar5 +
                                                         fVar1 * fVar4 * fVar6) -
                                                        fVar8 * fVar1 * fVar9) -
                                                       fVar12 * fVar1 * fVar10) -
                                                      fVar1 * fVar11 * fVar13)) -
                                                     fVar8 * fVar14 * fVar10) -
                                                    fVar14 * fVar12 * fVar13)) -
                                                   fVar20 * fVar15 * fVar9) -
                                                  fVar21 * fVar15 * fVar10) -
                                                 fVar12 * fVar15 * fVar22) -
                                                fVar15 * fVar11 * fVar23)) -
                                               fVar20 * fVar24 * fVar10) - fVar21 * fVar24 * fVar13)
                                             - fVar8 * fVar24 * fVar22) - fVar24 * fVar12 * fVar23))
                                           - fVar20 * fVar25 * fVar13) - fVar25 * fVar8 * fVar23) -
                                         fVar27 * fVar26 * fVar5) - fVar28 * fVar26 * fVar6) -
                                       fVar29 * fVar26 * fVar7)) - fVar27 * fVar33 * fVar6) -
                                     fVar28 * fVar33 * fVar7)) - fVar35 * fVar34 * fVar5) -
                                   fVar36 * fVar34 * fVar6) - fVar28 * fVar34 * fVar18) -
                                 fVar29 * fVar34 * fVar19)) - fVar35 * fVar39 * fVar6) -
                               fVar36 * fVar39 * fVar7) - fVar27 * fVar39 * fVar18) -
                             fVar28 * fVar39 * fVar19)) - fVar35 * fVar40 * fVar7) -
                           fVar27 * fVar40 * fVar19)) - fVar2 * fVar41 * fVar30) -
                         fVar4 * fVar41 * fVar31) - fVar41 * fVar3 * fVar32)) -
                       fVar2 * fVar42 * fVar31) - fVar42 * fVar4 * fVar32)) -
                     fVar16 * fVar43 * fVar30) - fVar17 * fVar43 * fVar31) - fVar4 * fVar43 * fVar37
                   ) - fVar3 * fVar43 * fVar38)) - fVar16 * fVar44 * fVar31) -
                fVar17 * fVar44 * fVar32) - fVar2 * fVar44 * fVar37) - fVar4 * fVar44 * fVar38)) -
             fVar16 * fVar45 * fVar32) - fVar2 * fVar45 * fVar38;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[3];
  fVar3 = pfVar80[5];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[3];
  fVar5 = pfVar81[5];
  fVar6 = pfVar79[3];
  fVar7 = pfVar79[5];
  fVar8 = pfVar82[3];
  fVar9 = pfVar82[5];
  fVar10 = pfVar78[6];
  fVar11 = pfVar78[5];
  fVar12 = pfVar80[8];
  fVar13 = pfVar80[6];
  fVar14 = pfVar81[6];
  fVar15 = pfVar81[8];
  fVar16 = pfVar79[8];
  fVar17 = pfVar79[6];
  fVar18 = pfVar82[6];
  fVar19 = pfVar82[8];
  fVar20 = pfVar78[3];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[8];
  fVar22 = pfVar79[5];
  fVar23 = pfVar79[3];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[3];
  fVar25 = pfVar80[5];
  fVar26 = pfVar78[6];
  fVar27 = pfVar78[5];
  fVar28 = pfVar79[8];
  fVar29 = pfVar79[6];
  fVar30 = pfVar80[6];
  fVar31 = pfVar80[8];
  fVar32 = pfVar78[3];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[8];
  fVar34 = pfVar78[6];
  fVar35 = pfVar78[5];
  fVar36 = pfVar78[3];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x2e
                      );
  *pSVar83 = ((fVar22 * fVar36 * fVar19 +
              fVar28 * fVar36 * fVar9 +
              (((((fVar23 * fVar35 * fVar19 +
                  fVar22 * fVar35 * fVar18 +
                  fVar29 * fVar35 * fVar9 +
                  fVar28 * fVar35 * fVar8 +
                  ((fVar22 * fVar34 * fVar9 +
                   (((fVar23 * fVar33 * fVar9 +
                     fVar22 * fVar33 * fVar8 +
                     fVar7 * fVar32 * fVar31 +
                     fVar16 * fVar32 * fVar25 +
                     (((fVar6 * fVar27 * fVar31 +
                       fVar7 * fVar27 * fVar30 +
                       fVar17 * fVar27 * fVar25 +
                       fVar16 * fVar27 * fVar24 +
                       (((((fVar26 * fVar7 * fVar25 +
                           ((fVar21 * fVar6 * fVar25 +
                            fVar7 * fVar21 * fVar24 +
                            (((((fVar3 * fVar20 * fVar15 +
                                fVar12 * fVar20 * fVar5 +
                                (((((fVar2 * fVar11 * fVar15 +
                                    fVar3 * fVar11 * fVar14 +
                                    fVar11 * fVar13 * fVar5 +
                                    fVar11 * fVar12 * fVar4 +
                                    ((fVar3 * fVar10 * fVar5 +
                                     (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                      fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                                    fVar10 * fVar7 * fVar9)) - fVar16 * fVar11 * fVar8) -
                                  fVar17 * fVar11 * fVar9) - fVar7 * fVar11 * fVar18) -
                                fVar11 * fVar6 * fVar19)) - fVar16 * fVar20 * fVar9) -
                              fVar20 * fVar7 * fVar19) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5)) - fVar22 * fVar26 * fVar5)) -
                          fVar28 * fVar27 * fVar4) - fVar29 * fVar27 * fVar5) -
                        fVar22 * fVar27 * fVar14) - fVar23 * fVar27 * fVar15)) -
                      fVar28 * fVar32 * fVar5) - fVar22 * fVar32 * fVar15)) -
                    fVar3 * fVar33 * fVar24) - fVar33 * fVar2 * fVar25)) - fVar34 * fVar3 * fVar25))
                 - fVar12 * fVar35 * fVar24) - fVar13 * fVar35 * fVar25) - fVar3 * fVar35 * fVar30)
              - fVar2 * fVar35 * fVar31)) - fVar12 * fVar36 * fVar25) - fVar3 * fVar36 * fVar31;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[4];
  fVar3 = pfVar80[5];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[4];
  fVar5 = pfVar81[5];
  fVar6 = pfVar79[4];
  fVar7 = pfVar79[5];
  fVar8 = pfVar82[4];
  fVar9 = pfVar82[5];
  fVar10 = pfVar78[7];
  fVar11 = pfVar78[5];
  fVar12 = pfVar80[8];
  fVar13 = pfVar80[7];
  fVar14 = pfVar81[7];
  fVar15 = pfVar81[8];
  fVar16 = pfVar79[8];
  fVar17 = pfVar79[7];
  fVar18 = pfVar82[7];
  fVar19 = pfVar82[8];
  fVar20 = pfVar78[4];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[8];
  fVar22 = pfVar79[5];
  fVar23 = pfVar79[4];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[4];
  fVar25 = pfVar80[5];
  fVar26 = pfVar78[7];
  fVar27 = pfVar78[5];
  fVar28 = pfVar79[8];
  fVar29 = pfVar79[7];
  fVar30 = pfVar80[7];
  fVar31 = pfVar80[8];
  fVar32 = pfVar78[4];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[8];
  fVar34 = pfVar78[7];
  fVar35 = pfVar78[5];
  fVar36 = pfVar78[4];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x2f
                      );
  *pSVar83 = ((fVar22 * fVar36 * fVar19 +
              fVar28 * fVar36 * fVar9 +
              (((((fVar23 * fVar35 * fVar19 +
                  fVar22 * fVar35 * fVar18 +
                  fVar29 * fVar35 * fVar9 +
                  fVar28 * fVar35 * fVar8 +
                  ((fVar22 * fVar34 * fVar9 +
                   (((fVar23 * fVar33 * fVar9 +
                     fVar22 * fVar33 * fVar8 +
                     fVar7 * fVar32 * fVar31 +
                     fVar16 * fVar32 * fVar25 +
                     (((fVar6 * fVar27 * fVar31 +
                       fVar7 * fVar27 * fVar30 +
                       fVar17 * fVar27 * fVar25 +
                       fVar16 * fVar27 * fVar24 +
                       (((((fVar26 * fVar7 * fVar25 +
                           ((fVar21 * fVar6 * fVar25 +
                            fVar7 * fVar21 * fVar24 +
                            (((((fVar3 * fVar20 * fVar15 +
                                fVar12 * fVar20 * fVar5 +
                                (((((fVar2 * fVar11 * fVar15 +
                                    fVar3 * fVar11 * fVar14 +
                                    fVar11 * fVar13 * fVar5 +
                                    fVar11 * fVar12 * fVar4 +
                                    ((fVar3 * fVar10 * fVar5 +
                                     (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                      fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                                    fVar10 * fVar7 * fVar9)) - fVar16 * fVar11 * fVar8) -
                                  fVar17 * fVar11 * fVar9) - fVar7 * fVar11 * fVar18) -
                                fVar11 * fVar6 * fVar19)) - fVar16 * fVar20 * fVar9) -
                              fVar20 * fVar7 * fVar19) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5)) - fVar22 * fVar26 * fVar5)) -
                          fVar28 * fVar27 * fVar4) - fVar29 * fVar27 * fVar5) -
                        fVar22 * fVar27 * fVar14) - fVar23 * fVar27 * fVar15)) -
                      fVar28 * fVar32 * fVar5) - fVar22 * fVar32 * fVar15)) -
                    fVar3 * fVar33 * fVar24) - fVar33 * fVar2 * fVar25)) - fVar34 * fVar3 * fVar25))
                 - fVar12 * fVar35 * fVar24) - fVar13 * fVar35 * fVar25) - fVar3 * fVar35 * fVar30)
              - fVar2 * fVar35 * fVar31)) - fVar12 * fVar36 * fVar25) - fVar3 * fVar36 * fVar31;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[5];
  fVar2 = pfVar78[8];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[5];
  fVar4 = pfVar79[8];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar78[5];
  fVar6 = pfVar78[8];
  fVar7 = pfVar80[5];
  fVar8 = pfVar80[8];
  fVar9 = pfVar79[5];
  fVar10 = pfVar79[8];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[5];
  fVar12 = pfVar79[8];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[5];
  fVar14 = pfVar79[8];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[5];
  fVar16 = pfVar79[8];
  fVar17 = pfVar78[5];
  fVar18 = pfVar78[8];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x30
                      );
  *pSVar83 = ((fVar13 * fVar17 * fVar8 +
              fVar14 * fVar17 * fVar7 +
              ((fVar13 * fVar18 * fVar7 +
               fVar5 * fVar11 * fVar16 +
               fVar6 * fVar11 * fVar15 +
               (((fVar12 * fVar5 * fVar15 +
                 ((((fVar3 * fVar1 * fVar10 +
                    fVar1 * fVar4 * fVar9 + (fVar2 * fVar3 * fVar9 - fVar5 * fVar2 * fVar7)) -
                   fVar6 * fVar1 * fVar7) - fVar1 * fVar5 * fVar8) - fVar13 * fVar12 * fVar9)) -
                fVar14 * fVar11 * fVar9) - fVar13 * fVar11 * fVar10)) - fVar18 * fVar3 * fVar15)) -
             fVar4 * fVar17 * fVar15) - fVar3 * fVar17 * fVar16;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[6];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar74;
  fVar5 = pfVar74[6];
  fVar6 = *pfVar77;
  fVar7 = pfVar77[6];
  fVar8 = *pfVar76;
  fVar9 = pfVar76[6];
  fVar10 = *pfVar73;
  fVar11 = pfVar73[6];
  fVar12 = pfVar75[9];
  fVar13 = pfVar76[9];
  fVar14 = pfVar74[9];
  fVar15 = pfVar77[9];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[9];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar18 = *pfVar75;
  fVar19 = pfVar74[6];
  fVar20 = pfVar73[6];
  fVar21 = pfVar75[6];
  fVar22 = *pfVar73;
  fVar23 = pfVar74[9];
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar75[9];
  fVar25 = pfVar73[9];
  fVar26 = pfVar73[6];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x31
                      );
  *pSVar83 = (((fVar17 * fVar27 * fVar15 +
               fVar19 * fVar27 * fVar7 +
               fVar23 * fVar27 * fVar6 +
               (((fVar17 * fVar26 * fVar7 +
                 fVar19 * fVar26 * fVar6 +
                 ((fVar17 * fVar25 * fVar6 +
                  fVar4 * fVar22 * fVar24 +
                  fVar5 * fVar22 * fVar21 +
                  fVar14 * fVar22 * fVar18 +
                  ((((fVar20 * fVar4 * fVar21 +
                     fVar5 * fVar20 * fVar18 +
                     (((fVar16 * fVar4 * fVar18 +
                       (((((fVar2 * fVar10 * fVar13 +
                           fVar3 * fVar10 * fVar9 +
                           fVar10 * fVar12 * fVar8 +
                           (((fVar2 * fVar11 * fVar9 +
                             fVar11 * fVar3 * fVar8 +
                             (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                            fVar5 * fVar11 * fVar6) - fVar11 * fVar4 * fVar7)) -
                          fVar14 * fVar10 * fVar6) - fVar5 * fVar10 * fVar7) -
                        fVar10 * fVar4 * fVar15) - fVar17 * fVar16 * fVar8)) -
                      fVar19 * fVar20 * fVar8) - fVar17 * fVar20 * fVar9)) - fVar23 * fVar22 * fVar8
                    ) - fVar19 * fVar22 * fVar9) - fVar17 * fVar22 * fVar13)) -
                 fVar25 * fVar2 * fVar18)) - fVar3 * fVar26 * fVar18) - fVar26 * fVar2 * fVar21)) -
              fVar12 * fVar27 * fVar18) - fVar3 * fVar27 * fVar21) - fVar2 * fVar27 * fVar24;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[1];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[1];
  fVar10 = pfVar73[7];
  fVar11 = pfVar75[6];
  fVar12 = pfVar76[6];
  fVar13 = pfVar74[6];
  fVar14 = pfVar77[6];
  fVar15 = pfVar73[6];
  fVar16 = pfVar75[7];
  fVar17 = pfVar76[7];
  fVar18 = pfVar74[7];
  fVar19 = pfVar77[7];
  fVar20 = pfVar73[1];
  fVar21 = pfVar75[9];
  fVar22 = pfVar76[9];
  fVar23 = pfVar74[9];
  fVar24 = pfVar77[9];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[9];
  fVar27 = pfVar74[1];
  fVar28 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = *pfVar75;
  fVar30 = pfVar75[1];
  fVar31 = pfVar73[7];
  fVar32 = pfVar74[6];
  fVar33 = pfVar75[6];
  fVar34 = pfVar73[6];
  fVar35 = pfVar74[7];
  fVar36 = pfVar75[7];
  fVar37 = pfVar73[1];
  fVar38 = pfVar74[9];
  fVar39 = pfVar75[9];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[9];
  fVar42 = pfVar73[7];
  fVar43 = pfVar73[6];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x32
                      );
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                ((((fVar28 * fVar44 * fVar24 +
                   fVar32 * fVar44 * fVar14 +
                   fVar38 * fVar44 * fVar8 +
                   (((((fVar28 * fVar43 * fVar19 +
                       fVar27 * fVar43 * fVar14 +
                       fVar32 * fVar43 * fVar9 +
                       fVar35 * fVar43 * fVar8 +
                       (((fVar28 * fVar42 * fVar14 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar13 * fVar37 * fVar33 +
                               fVar23 * fVar37 * fVar29 +
                               ((((fVar34 * fVar6 * fVar36 +
                                  fVar7 * fVar34 * fVar33 +
                                  fVar13 * fVar34 * fVar30 +
                                  fVar18 * fVar34 * fVar29 +
                                  (((((fVar31 * fVar6 * fVar33 +
                                      fVar13 * fVar31 * fVar29 +
                                      (((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              ((((fVar2 * fVar20 * fVar22 +
                                                 fVar11 * fVar20 * fVar12 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((((fVar2 * fVar15 * fVar17 +
                                                     fVar3 * fVar15 * fVar12 +
                                                     fVar11 * fVar15 * fVar5 +
                                                     fVar15 * fVar16 * fVar4 +
                                                     (((fVar2 * fVar10 * fVar12 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar10 * fVar6 * fVar14)) -
                                                    fVar18 * fVar15 * fVar8) -
                                                   fVar13 * fVar15 * fVar9) -
                                                  fVar7 * fVar15 * fVar14) - fVar15 * fVar6 * fVar19
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar13 * fVar20 * fVar14) - fVar20 * fVar6 * fVar24))
                                             - fVar23 * fVar25 * fVar9) - fVar18 * fVar25 * fVar14)
                                           - fVar13 * fVar25 * fVar19) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar28 * fVar31 * fVar12)) -
                                     fVar35 * fVar34 * fVar4) - fVar32 * fVar34 * fVar5) -
                                   fVar27 * fVar34 * fVar12) - fVar28 * fVar34 * fVar17)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar12) -
                               fVar28 * fVar37 * fVar22)) - fVar38 * fVar40 * fVar5) -
                             fVar35 * fVar40 * fVar12) - fVar32 * fVar40 * fVar17) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                     fVar11 * fVar43 * fVar30) - fVar3 * fVar43 * fVar33) - fVar43 * fVar2 * fVar36)
                   ) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar33) -
                fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) -
             fVar11 * fVar45 * fVar36) - fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[2];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[1];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[1];
  fVar7 = pfVar76[2];
  fVar8 = pfVar74[2];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[1];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[1];
  fVar13 = pfVar77[2];
  fVar14 = pfVar73[7];
  fVar15 = pfVar75[7];
  fVar16 = pfVar75[6];
  fVar17 = pfVar76[6];
  fVar18 = pfVar76[7];
  fVar19 = pfVar74[7];
  fVar20 = pfVar74[6];
  fVar21 = pfVar77[6];
  fVar22 = pfVar77[7];
  fVar23 = pfVar73[6];
  fVar24 = pfVar73[2];
  fVar25 = pfVar75[9];
  fVar26 = pfVar76[9];
  fVar27 = pfVar74[9];
  fVar28 = pfVar77[9];
  fVar29 = pfVar73[1];
  fVar30 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar73[9];
  fVar32 = pfVar74[2];
  fVar33 = pfVar74[1];
  fVar34 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar35 = *pfVar75;
  fVar36 = pfVar75[1];
  fVar37 = pfVar75[2];
  fVar38 = pfVar73[7];
  fVar39 = pfVar74[7];
  fVar40 = pfVar74[6];
  fVar41 = pfVar75[6];
  fVar42 = pfVar75[7];
  fVar43 = pfVar73[6];
  fVar44 = pfVar73[2];
  fVar45 = pfVar74[9];
  fVar46 = pfVar75[9];
  fVar47 = pfVar73[1];
  fVar48 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar49 = pfVar73[9];
  fVar50 = pfVar73[7];
  fVar51 = pfVar73[6];
  fVar52 = pfVar73[2];
  fVar53 = pfVar73[1];
  fVar54 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x33
                      );
  *pSVar83 = (((fVar32 * fVar54 * fVar28 +
               fVar39 * fVar54 * fVar22 +
               fVar45 * fVar54 * fVar13 +
               (((((fVar33 * fVar53 * fVar28 +
                   fVar40 * fVar53 * fVar22 +
                   fVar39 * fVar53 * fVar21 +
                   fVar45 * fVar53 * fVar10 +
                   ((((fVar34 * fVar52 * fVar28 +
                      fVar40 * fVar52 * fVar21 +
                      fVar45 * fVar52 * fVar9 +
                      (((((fVar33 * fVar51 * fVar22 +
                          fVar32 * fVar51 * fVar21 +
                          fVar40 * fVar51 * fVar13 +
                          fVar39 * fVar51 * fVar10 +
                          (((((fVar34 * fVar50 * fVar22 +
                              fVar33 * fVar50 * fVar21 +
                              fVar40 * fVar50 * fVar10 +
                              fVar39 * fVar50 * fVar9 +
                              ((((fVar34 * fVar49 * fVar13 +
                                 fVar33 * fVar49 * fVar10 +
                                 fVar32 * fVar49 * fVar9 +
                                 fVar8 * fVar48 * fVar46 +
                                 fVar19 * fVar48 * fVar42 +
                                 fVar27 * fVar48 * fVar37 +
                                 ((((fVar12 * fVar47 * fVar46 +
                                    fVar20 * fVar47 * fVar42 +
                                    fVar19 * fVar47 * fVar41 +
                                    fVar27 * fVar47 * fVar36 +
                                    (((((fVar11 * fVar44 * fVar46 +
                                        fVar20 * fVar44 * fVar41 +
                                        fVar27 * fVar44 * fVar35 +
                                        ((((fVar43 * fVar12 * fVar42 +
                                           fVar8 * fVar43 * fVar41 +
                                           fVar20 * fVar43 * fVar37 +
                                           fVar19 * fVar43 * fVar36 +
                                           (((((fVar38 * fVar11 * fVar42 +
                                               fVar12 * fVar38 * fVar41 +
                                               fVar20 * fVar38 * fVar36 +
                                               fVar19 * fVar38 * fVar35 +
                                               (((((fVar31 * fVar11 * fVar37 +
                                                   fVar12 * fVar31 * fVar36 +
                                                   fVar8 * fVar31 * fVar35 +
                                                   (((((((fVar2 * fVar30 * fVar26 +
                                                         fVar15 * fVar30 * fVar18 +
                                                         fVar25 * fVar30 * fVar7 +
                                                         (((((fVar4 * fVar29 * fVar26 +
                                                             fVar16 * fVar29 * fVar18 +
                                                             fVar15 * fVar29 * fVar17 +
                                                             fVar25 * fVar29 * fVar6 +
                                                             ((((fVar3 * fVar24 * fVar26 +
                                                                fVar16 * fVar24 * fVar17 +
                                                                fVar24 * fVar25 * fVar5 +
                                                                (((((fVar4 * fVar23 * fVar18 +
                                                                    fVar2 * fVar23 * fVar17 +
                                                                    fVar16 * fVar23 * fVar7 +
                                                                    fVar15 * fVar23 * fVar6 +
                                                                    (((((fVar3 * fVar14 * fVar18 +
                                                                        fVar4 * fVar14 * fVar17 +
                                                                        fVar14 * fVar16 * fVar6 +
                                                                        fVar14 * fVar15 * fVar5 +
                                                                        ((((fVar1 * fVar3 * fVar7 +
                                                                           fVar1 * fVar2 * fVar5 +
                                                                           fVar1 * fVar4 * fVar6) -
                                                                          fVar8 * fVar1 * fVar9) -
                                                                         fVar12 * fVar1 * fVar10) -
                                                                        fVar1 * fVar11 * fVar13)) -
                                                                       fVar19 * fVar14 * fVar9) -
                                                                      fVar20 * fVar14 * fVar10) -
                                                                     fVar12 * fVar14 * fVar21) -
                                                                    fVar14 * fVar11 * fVar22)) -
                                                                   fVar19 * fVar23 * fVar10) -
                                                                  fVar20 * fVar23 * fVar13) -
                                                                 fVar8 * fVar23 * fVar21) -
                                                                fVar23 * fVar12 * fVar22)) -
                                                               fVar27 * fVar24 * fVar9) -
                                                              fVar20 * fVar24 * fVar21) -
                                                             fVar24 * fVar11 * fVar28)) -
                                                            fVar27 * fVar29 * fVar10) -
                                                           fVar19 * fVar29 * fVar21) -
                                                          fVar20 * fVar29 * fVar22) -
                                                         fVar29 * fVar12 * fVar28)) -
                                                        fVar27 * fVar30 * fVar13) -
                                                       fVar19 * fVar30 * fVar22) -
                                                      fVar30 * fVar8 * fVar28) -
                                                     fVar32 * fVar31 * fVar5) -
                                                    fVar33 * fVar31 * fVar6) -
                                                   fVar34 * fVar31 * fVar7)) -
                                                  fVar39 * fVar38 * fVar5) - fVar40 * fVar38 * fVar6
                                                 ) - fVar33 * fVar38 * fVar17) -
                                               fVar34 * fVar38 * fVar18)) - fVar39 * fVar43 * fVar6)
                                             - fVar40 * fVar43 * fVar7) - fVar32 * fVar43 * fVar17)
                                           - fVar33 * fVar43 * fVar18)) - fVar45 * fVar44 * fVar5) -
                                         fVar40 * fVar44 * fVar17) - fVar34 * fVar44 * fVar26)) -
                                       fVar45 * fVar47 * fVar6) - fVar39 * fVar47 * fVar17) -
                                     fVar40 * fVar47 * fVar18) - fVar33 * fVar47 * fVar26)) -
                                   fVar45 * fVar48 * fVar7) - fVar39 * fVar48 * fVar18) -
                                 fVar32 * fVar48 * fVar26)) - fVar2 * fVar49 * fVar35) -
                               fVar4 * fVar49 * fVar36) - fVar49 * fVar3 * fVar37)) -
                             fVar15 * fVar50 * fVar35) - fVar16 * fVar50 * fVar36) -
                           fVar4 * fVar50 * fVar41) - fVar50 * fVar3 * fVar42)) -
                         fVar15 * fVar51 * fVar36) - fVar16 * fVar51 * fVar37) -
                       fVar2 * fVar51 * fVar41) - fVar51 * fVar4 * fVar42)) -
                     fVar25 * fVar52 * fVar35) - fVar16 * fVar52 * fVar41) - fVar3 * fVar52 * fVar46
                   )) - fVar25 * fVar53 * fVar36) - fVar15 * fVar53 * fVar41) -
                fVar16 * fVar53 * fVar42) - fVar4 * fVar53 * fVar46)) - fVar25 * fVar54 * fVar37) -
             fVar15 * fVar54 * fVar42) - fVar2 * fVar54 * fVar46;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[1];
  fVar3 = pfVar80[2];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar79[1];
  fVar7 = pfVar79[2];
  fVar8 = pfVar82[1];
  fVar9 = pfVar82[2];
  fVar10 = pfVar78[7];
  fVar11 = pfVar80[7];
  fVar12 = pfVar80[6];
  fVar13 = pfVar81[6];
  fVar14 = pfVar81[7];
  fVar15 = pfVar79[7];
  fVar16 = pfVar79[6];
  fVar17 = pfVar82[6];
  fVar18 = pfVar82[7];
  fVar19 = pfVar78[6];
  fVar20 = pfVar78[2];
  fVar21 = pfVar80[9];
  fVar22 = pfVar81[9];
  fVar23 = pfVar79[9];
  fVar24 = pfVar82[9];
  fVar25 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[2];
  fVar28 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = pfVar80[1];
  fVar30 = pfVar80[2];
  fVar31 = pfVar78[7];
  fVar32 = pfVar79[7];
  fVar33 = pfVar79[6];
  fVar34 = pfVar80[6];
  fVar35 = pfVar80[7];
  fVar36 = pfVar78[6];
  fVar37 = pfVar78[2];
  fVar38 = pfVar79[9];
  fVar39 = pfVar80[9];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[7];
  fVar43 = pfVar78[6];
  fVar44 = pfVar78[2];
  fVar45 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x34
                      );
  *pSVar83 = (((fVar27 * fVar45 * fVar24 +
               fVar32 * fVar45 * fVar18 +
               fVar38 * fVar45 * fVar9 +
               (((((fVar28 * fVar44 * fVar24 +
                   fVar33 * fVar44 * fVar18 +
                   fVar32 * fVar44 * fVar17 +
                   fVar38 * fVar44 * fVar8 +
                   (((fVar27 * fVar43 * fVar18 +
                     fVar32 * fVar43 * fVar9 +
                     (((((fVar28 * fVar42 * fVar18 +
                         fVar27 * fVar42 * fVar17 +
                         fVar33 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar15 * fVar40 * fVar35 +
                           fVar23 * fVar40 * fVar30 +
                           ((((fVar6 * fVar37 * fVar39 +
                              fVar16 * fVar37 * fVar35 +
                              fVar15 * fVar37 * fVar34 +
                              fVar23 * fVar37 * fVar29 +
                              (((((fVar36 * fVar7 * fVar35 +
                                  fVar15 * fVar36 * fVar30 +
                                  (((fVar31 * fVar6 * fVar35 +
                                    fVar7 * fVar31 * fVar34 +
                                    fVar16 * fVar31 * fVar30 +
                                    fVar15 * fVar31 * fVar29 +
                                    (((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        ((((((fVar3 * fVar25 * fVar22 +
                                             fVar11 * fVar25 * fVar14 +
                                             fVar21 * fVar25 * fVar5 +
                                             (((((fVar2 * fVar20 * fVar22 +
                                                 fVar12 * fVar20 * fVar14 +
                                                 fVar11 * fVar20 * fVar13 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((fVar3 * fVar19 * fVar14 +
                                                   fVar11 * fVar19 * fVar5 +
                                                   (((((fVar2 * fVar10 * fVar14 +
                                                       fVar3 * fVar10 * fVar13 +
                                                       fVar10 * fVar12 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar15 * fVar10 * fVar8) -
                                                     fVar16 * fVar10 * fVar9) -
                                                    fVar7 * fVar10 * fVar17) -
                                                   fVar10 * fVar6 * fVar18)) -
                                                  fVar15 * fVar19 * fVar9) - fVar19 * fVar7 * fVar18
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar15 * fVar20 * fVar17) - fVar16 * fVar20 * fVar18)
                                             - fVar20 * fVar6 * fVar24)) - fVar23 * fVar25 * fVar9)
                                           - fVar15 * fVar25 * fVar18) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar33 * fVar31 * fVar5) -
                                     fVar27 * fVar31 * fVar13) - fVar28 * fVar31 * fVar14)) -
                                   fVar32 * fVar36 * fVar5) - fVar27 * fVar36 * fVar14)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar13) -
                               fVar33 * fVar37 * fVar14) - fVar28 * fVar37 * fVar22)) -
                             fVar38 * fVar40 * fVar5) - fVar32 * fVar40 * fVar14) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar12 * fVar42 * fVar30) - fVar3 * fVar42 * fVar34) -
                     fVar42 * fVar2 * fVar35)) - fVar11 * fVar43 * fVar30) - fVar43 * fVar3 * fVar35
                   )) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar34) -
                fVar12 * fVar44 * fVar35) - fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) -
             fVar11 * fVar45 * fVar35) - fVar3 * fVar45 * fVar39;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[7];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar79[2];
  fVar5 = pfVar79[7];
  fVar6 = pfVar82[2];
  fVar7 = pfVar82[7];
  fVar8 = pfVar81[2];
  fVar9 = pfVar81[7];
  fVar10 = pfVar78[2];
  fVar11 = pfVar78[7];
  fVar12 = pfVar80[9];
  fVar13 = pfVar81[9];
  fVar14 = pfVar79[9];
  fVar15 = pfVar82[9];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar18 = pfVar80[2];
  fVar19 = pfVar79[7];
  fVar20 = pfVar78[7];
  fVar21 = pfVar80[7];
  fVar22 = pfVar78[2];
  fVar23 = pfVar79[9];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[9];
  fVar25 = pfVar78[9];
  fVar26 = pfVar78[7];
  fVar27 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x35
                      );
  *pSVar83 = (((fVar17 * fVar27 * fVar15 +
               fVar19 * fVar27 * fVar7 +
               fVar23 * fVar27 * fVar6 +
               (((fVar17 * fVar26 * fVar7 +
                 fVar19 * fVar26 * fVar6 +
                 ((fVar17 * fVar25 * fVar6 +
                  fVar4 * fVar22 * fVar24 +
                  fVar5 * fVar22 * fVar21 +
                  fVar14 * fVar22 * fVar18 +
                  ((((fVar20 * fVar4 * fVar21 +
                     fVar5 * fVar20 * fVar18 +
                     (((fVar16 * fVar4 * fVar18 +
                       (((((fVar2 * fVar10 * fVar13 +
                           fVar3 * fVar10 * fVar9 +
                           fVar10 * fVar12 * fVar8 +
                           (((fVar2 * fVar11 * fVar9 +
                             fVar11 * fVar3 * fVar8 +
                             (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                            fVar5 * fVar11 * fVar6) - fVar11 * fVar4 * fVar7)) -
                          fVar14 * fVar10 * fVar6) - fVar5 * fVar10 * fVar7) -
                        fVar10 * fVar4 * fVar15) - fVar17 * fVar16 * fVar8)) -
                      fVar19 * fVar20 * fVar8) - fVar17 * fVar20 * fVar9)) - fVar23 * fVar22 * fVar8
                    ) - fVar19 * fVar22 * fVar9) - fVar17 * fVar22 * fVar13)) -
                 fVar25 * fVar2 * fVar18)) - fVar3 * fVar26 * fVar18) - fVar26 * fVar2 * fVar21)) -
              fVar12 * fVar27 * fVar18) - fVar3 * fVar27 * fVar21) - fVar2 * fVar27 * fVar24;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[3];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[3];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[3];
  fVar10 = pfVar73[8];
  fVar11 = pfVar75[6];
  fVar12 = pfVar76[6];
  fVar13 = pfVar74[6];
  fVar14 = pfVar77[6];
  fVar15 = pfVar73[6];
  fVar16 = pfVar75[8];
  fVar17 = pfVar76[8];
  fVar18 = pfVar74[8];
  fVar19 = pfVar77[8];
  fVar20 = pfVar73[3];
  fVar21 = pfVar75[9];
  fVar22 = pfVar76[9];
  fVar23 = pfVar74[9];
  fVar24 = pfVar77[9];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[9];
  fVar27 = pfVar74[3];
  fVar28 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = *pfVar75;
  fVar30 = pfVar75[3];
  fVar31 = pfVar73[8];
  fVar32 = pfVar74[6];
  fVar33 = pfVar75[6];
  fVar34 = pfVar73[6];
  fVar35 = pfVar74[8];
  fVar36 = pfVar75[8];
  fVar37 = pfVar73[3];
  fVar38 = pfVar74[9];
  fVar39 = pfVar75[9];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[9];
  fVar42 = pfVar73[8];
  fVar43 = pfVar73[6];
  fVar44 = pfVar73[3];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x36
                      );
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                ((((fVar28 * fVar44 * fVar24 +
                   fVar32 * fVar44 * fVar14 +
                   fVar38 * fVar44 * fVar8 +
                   (((((fVar28 * fVar43 * fVar19 +
                       fVar27 * fVar43 * fVar14 +
                       fVar32 * fVar43 * fVar9 +
                       fVar35 * fVar43 * fVar8 +
                       (((fVar28 * fVar42 * fVar14 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar13 * fVar37 * fVar33 +
                               fVar23 * fVar37 * fVar29 +
                               ((((fVar34 * fVar6 * fVar36 +
                                  fVar7 * fVar34 * fVar33 +
                                  fVar13 * fVar34 * fVar30 +
                                  fVar18 * fVar34 * fVar29 +
                                  (((((fVar31 * fVar6 * fVar33 +
                                      fVar13 * fVar31 * fVar29 +
                                      (((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              ((((fVar2 * fVar20 * fVar22 +
                                                 fVar11 * fVar20 * fVar12 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((((fVar2 * fVar15 * fVar17 +
                                                     fVar3 * fVar15 * fVar12 +
                                                     fVar11 * fVar15 * fVar5 +
                                                     fVar15 * fVar16 * fVar4 +
                                                     (((fVar2 * fVar10 * fVar12 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar10 * fVar6 * fVar14)) -
                                                    fVar18 * fVar15 * fVar8) -
                                                   fVar13 * fVar15 * fVar9) -
                                                  fVar7 * fVar15 * fVar14) - fVar15 * fVar6 * fVar19
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar13 * fVar20 * fVar14) - fVar20 * fVar6 * fVar24))
                                             - fVar23 * fVar25 * fVar9) - fVar18 * fVar25 * fVar14)
                                           - fVar13 * fVar25 * fVar19) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar28 * fVar31 * fVar12)) -
                                     fVar35 * fVar34 * fVar4) - fVar32 * fVar34 * fVar5) -
                                   fVar27 * fVar34 * fVar12) - fVar28 * fVar34 * fVar17)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar12) -
                               fVar28 * fVar37 * fVar22)) - fVar38 * fVar40 * fVar5) -
                             fVar35 * fVar40 * fVar12) - fVar32 * fVar40 * fVar17) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                     fVar11 * fVar43 * fVar30) - fVar3 * fVar43 * fVar33) - fVar43 * fVar2 * fVar36)
                   ) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar33) -
                fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) -
             fVar11 * fVar45 * fVar36) - fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[4];
  fVar3 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar75;
  fVar7 = pfVar75[1];
  fVar8 = pfVar76[3];
  fVar9 = pfVar76[4];
  fVar10 = pfVar74[4];
  fVar11 = *pfVar77;
  fVar12 = pfVar77[1];
  fVar13 = pfVar74[3];
  fVar14 = pfVar74[1];
  fVar15 = pfVar77[3];
  fVar16 = *pfVar74;
  fVar17 = pfVar77[4];
  fVar18 = pfVar73[8];
  fVar19 = pfVar75[7];
  fVar20 = pfVar75[6];
  fVar21 = pfVar76[6];
  fVar22 = pfVar76[7];
  fVar23 = pfVar74[7];
  fVar24 = pfVar74[6];
  fVar25 = pfVar77[6];
  fVar26 = pfVar77[7];
  fVar27 = pfVar73[7];
  fVar28 = pfVar75[8];
  fVar29 = pfVar76[8];
  fVar30 = pfVar74[8];
  fVar31 = pfVar77[8];
  fVar32 = pfVar73[6];
  fVar33 = pfVar73[4];
  fVar34 = pfVar75[9];
  fVar35 = pfVar76[9];
  fVar36 = pfVar74[9];
  fVar37 = pfVar77[9];
  fVar38 = pfVar73[3];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[9];
  fVar42 = pfVar74[4];
  fVar43 = pfVar74[3];
  fVar44 = pfVar74[1];
  fVar45 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar46 = *pfVar75;
  fVar47 = pfVar75[1];
  fVar48 = pfVar75[3];
  fVar49 = pfVar75[4];
  fVar50 = pfVar73[8];
  fVar51 = pfVar74[7];
  fVar52 = pfVar74[6];
  fVar53 = pfVar75[6];
  fVar54 = pfVar75[7];
  fVar55 = pfVar73[7];
  fVar56 = pfVar74[8];
  fVar57 = pfVar75[8];
  fVar58 = pfVar73[6];
  fVar59 = pfVar73[4];
  fVar60 = pfVar74[9];
  fVar61 = pfVar75[9];
  fVar62 = pfVar73[3];
  fVar63 = pfVar73[1];
  fVar64 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar65 = pfVar73[9];
  fVar66 = pfVar73[8];
  fVar67 = pfVar73[7];
  fVar68 = pfVar73[6];
  fVar69 = pfVar73[4];
  fVar70 = pfVar73[3];
  fVar71 = pfVar73[1];
  fVar72 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x37
                      );
  *pSVar83 = ((((fVar42 * fVar72 * fVar37 +
                fVar51 * fVar72 * fVar31 +
                fVar56 * fVar72 * fVar26 +
                fVar60 * fVar72 * fVar17 +
                (((((fVar43 * fVar71 * fVar37 +
                    fVar52 * fVar71 * fVar31 +
                    fVar56 * fVar71 * fVar25 +
                    fVar60 * fVar71 * fVar15 +
                    (((((fVar44 * fVar70 * fVar37 +
                        fVar52 * fVar70 * fVar26 +
                        fVar51 * fVar70 * fVar25 +
                        fVar60 * fVar70 * fVar12 +
                        ((((fVar45 * fVar69 * fVar37 +
                           fVar52 * fVar69 * fVar25 +
                           fVar60 * fVar69 * fVar11 +
                           (((((((fVar44 * fVar68 * fVar31 +
                                 fVar43 * fVar68 * fVar26 +
                                 fVar42 * fVar68 * fVar25 +
                                 fVar52 * fVar68 * fVar17 +
                                 fVar51 * fVar68 * fVar15 +
                                 fVar56 * fVar68 * fVar12 +
                                 (((((fVar45 * fVar67 * fVar31 +
                                     fVar43 * fVar67 * fVar25 +
                                     fVar52 * fVar67 * fVar15 +
                                     fVar56 * fVar67 * fVar11 +
                                     (((((fVar45 * fVar66 * fVar26 +
                                         fVar44 * fVar66 * fVar25 +
                                         fVar52 * fVar66 * fVar12 +
                                         fVar51 * fVar66 * fVar11 +
                                         (((((fVar45 * fVar65 * fVar17 +
                                             fVar44 * fVar65 * fVar15 +
                                             fVar43 * fVar65 * fVar12 +
                                             fVar42 * fVar65 * fVar11 +
                                             fVar10 * fVar64 * fVar61 +
                                             fVar23 * fVar64 * fVar57 +
                                             fVar30 * fVar64 * fVar54 +
                                             fVar36 * fVar64 * fVar49 +
                                             (((((fVar13 * fVar63 * fVar61 +
                                                 fVar24 * fVar63 * fVar57 +
                                                 fVar30 * fVar63 * fVar53 +
                                                 fVar36 * fVar63 * fVar48 +
                                                 (((((fVar14 * fVar62 * fVar61 +
                                                     fVar24 * fVar62 * fVar54 +
                                                     fVar23 * fVar62 * fVar53 +
                                                     fVar36 * fVar62 * fVar47 +
                                                     (((((fVar16 * fVar59 * fVar61 +
                                                         fVar24 * fVar59 * fVar53 +
                                                         fVar36 * fVar59 * fVar46 +
                                                         ((((fVar58 * fVar14 * fVar57 +
                                                            fVar13 * fVar58 * fVar54 +
                                                            fVar10 * fVar58 * fVar53 +
                                                            fVar24 * fVar58 * fVar49 +
                                                            fVar23 * fVar58 * fVar48 +
                                                            fVar30 * fVar58 * fVar47 +
                                                            (((((((fVar55 * fVar16 * fVar57 +
                                                                  fVar13 * fVar55 * fVar53 +
                                                                  fVar24 * fVar55 * fVar48 +
                                                                  fVar30 * fVar55 * fVar46 +
                                                                  (((((fVar50 * fVar16 * fVar54 +
                                                                      fVar14 * fVar50 * fVar53 +
                                                                      fVar24 * fVar50 * fVar47 +
                                                                      fVar23 * fVar50 * fVar46 +
                                                                      (((((fVar41 * fVar16 * fVar49
                                                                          + fVar14 * fVar41 * fVar48
                                                                            + fVar13 * fVar41 *
                                                                              fVar47 + fVar10 * 
                                                  fVar41 * fVar46 +
                                                  (((((((((fVar2 * fVar40 * fVar35 +
                                                          fVar19 * fVar40 * fVar29 +
                                                          fVar28 * fVar40 * fVar22 +
                                                          fVar34 * fVar40 * fVar9 +
                                                          (((((fVar3 * fVar39 * fVar35 +
                                                              fVar20 * fVar39 * fVar29 +
                                                              fVar28 * fVar39 * fVar21 +
                                                              fVar34 * fVar39 * fVar8 +
                                                              (((((fVar7 * fVar38 * fVar35 +
                                                                  fVar20 * fVar38 * fVar22 +
                                                                  fVar19 * fVar38 * fVar21 +
                                                                  fVar34 * fVar38 * fVar5 +
                                                                  ((((fVar6 * fVar33 * fVar35 +
                                                                     fVar20 * fVar33 * fVar21 +
                                                                     fVar33 * fVar34 * fVar4 +
                                                                     (((((((fVar7 * fVar32 * fVar29
                                                                           + fVar3 * fVar32 * fVar22
                                                                             + fVar2 * fVar32 *
                                                                               fVar21 + fVar20 * 
                                                  fVar32 * fVar9 +
                                                  fVar19 * fVar32 * fVar8 +
                                                  fVar28 * fVar32 * fVar5 +
                                                  (((((fVar6 * fVar27 * fVar29 +
                                                      fVar3 * fVar27 * fVar21 +
                                                      fVar20 * fVar27 * fVar8 +
                                                      fVar27 * fVar28 * fVar4 +
                                                      (((((fVar6 * fVar18 * fVar22 +
                                                          fVar7 * fVar18 * fVar21 +
                                                          fVar18 * fVar20 * fVar5 +
                                                          fVar18 * fVar19 * fVar4 +
                                                          (((((fVar1 * fVar6 * fVar9 +
                                                              fVar1 * fVar7 * fVar8 +
                                                              fVar1 * fVar2 * fVar4 +
                                                              fVar1 * fVar3 * fVar5) -
                                                             fVar10 * fVar1 * fVar11) -
                                                            fVar13 * fVar1 * fVar12) -
                                                           fVar14 * fVar1 * fVar15) -
                                                          fVar1 * fVar16 * fVar17)) -
                                                         fVar23 * fVar18 * fVar11) -
                                                        fVar24 * fVar18 * fVar12) -
                                                       fVar14 * fVar18 * fVar25) -
                                                      fVar18 * fVar16 * fVar26)) -
                                                     fVar30 * fVar27 * fVar11) -
                                                    fVar24 * fVar27 * fVar15) -
                                                   fVar13 * fVar27 * fVar25) -
                                                  fVar27 * fVar16 * fVar31)) -
                                                  fVar30 * fVar32 * fVar12) -
                                                  fVar23 * fVar32 * fVar15) -
                                                  fVar24 * fVar32 * fVar17) -
                                                  fVar10 * fVar32 * fVar25) -
                                                  fVar13 * fVar32 * fVar26) -
                                                  fVar32 * fVar14 * fVar31)) -
                                                  fVar36 * fVar33 * fVar11) -
                                                  fVar24 * fVar33 * fVar25) -
                                                  fVar33 * fVar16 * fVar37)) -
                                                  fVar36 * fVar38 * fVar12) -
                                                  fVar23 * fVar38 * fVar25) -
                                                  fVar24 * fVar38 * fVar26) -
                                                  fVar38 * fVar14 * fVar37)) -
                                                  fVar36 * fVar39 * fVar15) -
                                                  fVar30 * fVar39 * fVar25) -
                                                  fVar24 * fVar39 * fVar31) -
                                                  fVar39 * fVar13 * fVar37)) -
                                                  fVar36 * fVar40 * fVar17) -
                                                  fVar30 * fVar40 * fVar26) -
                                                  fVar23 * fVar40 * fVar31) -
                                                  fVar40 * fVar10 * fVar37) -
                                                  fVar42 * fVar41 * fVar4) - fVar43 * fVar41 * fVar5
                                                  ) - fVar44 * fVar41 * fVar8) -
                                                  fVar45 * fVar41 * fVar9)) -
                                                  fVar51 * fVar50 * fVar4) - fVar52 * fVar50 * fVar5
                                                  ) - fVar44 * fVar50 * fVar21) -
                                                  fVar45 * fVar50 * fVar22)) -
                                                  fVar56 * fVar55 * fVar4) - fVar52 * fVar55 * fVar8
                                                  ) - fVar43 * fVar55 * fVar21) -
                                                  fVar45 * fVar55 * fVar29)) -
                                                  fVar56 * fVar58 * fVar5) - fVar51 * fVar58 * fVar8
                                                  ) - fVar52 * fVar58 * fVar9) -
                                                  fVar42 * fVar58 * fVar21) -
                                                  fVar43 * fVar58 * fVar22) -
                                                  fVar44 * fVar58 * fVar29)) -
                                                  fVar60 * fVar59 * fVar4) -
                                                  fVar52 * fVar59 * fVar21) -
                                                  fVar45 * fVar59 * fVar35)) -
                                                  fVar60 * fVar62 * fVar5) -
                                                  fVar51 * fVar62 * fVar21) -
                                                  fVar52 * fVar62 * fVar22) -
                                                  fVar44 * fVar62 * fVar35)) -
                                                  fVar60 * fVar63 * fVar8) -
                                                  fVar56 * fVar63 * fVar21) -
                                                  fVar52 * fVar63 * fVar29) -
                                                 fVar43 * fVar63 * fVar35)) -
                                                fVar60 * fVar64 * fVar9) - fVar56 * fVar64 * fVar22)
                                              - fVar51 * fVar64 * fVar29) - fVar42 * fVar64 * fVar35
                                             )) - fVar2 * fVar65 * fVar46) - fVar3 * fVar65 * fVar47
                                           ) - fVar7 * fVar65 * fVar48) - fVar65 * fVar6 * fVar49))
                                        - fVar19 * fVar66 * fVar46) - fVar20 * fVar66 * fVar47) -
                                      fVar7 * fVar66 * fVar53) - fVar66 * fVar6 * fVar54)) -
                                    fVar28 * fVar67 * fVar46) - fVar20 * fVar67 * fVar48) -
                                  fVar3 * fVar67 * fVar53) - fVar67 * fVar6 * fVar57)) -
                                fVar28 * fVar68 * fVar47) - fVar19 * fVar68 * fVar48) -
                              fVar20 * fVar68 * fVar49) - fVar2 * fVar68 * fVar53) -
                            fVar3 * fVar68 * fVar54) - fVar68 * fVar7 * fVar57)) -
                          fVar34 * fVar69 * fVar46) - fVar20 * fVar69 * fVar53) -
                        fVar6 * fVar69 * fVar61)) - fVar34 * fVar70 * fVar47) -
                      fVar19 * fVar70 * fVar53) - fVar20 * fVar70 * fVar54) -
                    fVar7 * fVar70 * fVar61)) - fVar34 * fVar71 * fVar48) - fVar28 * fVar71 * fVar53
                  ) - fVar20 * fVar71 * fVar57) - fVar3 * fVar71 * fVar61)) -
               fVar34 * fVar72 * fVar49) - fVar28 * fVar72 * fVar54) - fVar19 * fVar72 * fVar57) -
             fVar2 * fVar72 * fVar61;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[4];
  fVar3 = pfVar80[3];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[2];
  fVar8 = pfVar81[3];
  fVar9 = pfVar81[4];
  fVar10 = pfVar79[4];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[2];
  fVar13 = pfVar79[3];
  fVar14 = pfVar79[2];
  fVar15 = pfVar82[3];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[4];
  fVar18 = pfVar78[8];
  fVar19 = pfVar80[7];
  fVar20 = pfVar80[6];
  fVar21 = pfVar81[6];
  fVar22 = pfVar81[7];
  fVar23 = pfVar79[7];
  fVar24 = pfVar79[6];
  fVar25 = pfVar82[6];
  fVar26 = pfVar82[7];
  fVar27 = pfVar78[7];
  fVar28 = pfVar80[8];
  fVar29 = pfVar81[8];
  fVar30 = pfVar79[8];
  fVar31 = pfVar82[8];
  fVar32 = pfVar78[6];
  fVar33 = pfVar78[4];
  fVar34 = pfVar80[9];
  fVar35 = pfVar81[9];
  fVar36 = pfVar79[9];
  fVar37 = pfVar82[9];
  fVar38 = pfVar78[3];
  fVar39 = pfVar78[2];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar79[4];
  fVar43 = pfVar79[3];
  fVar44 = pfVar79[2];
  fVar45 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar46 = pfVar80[1];
  fVar47 = pfVar80[2];
  fVar48 = pfVar80[3];
  fVar49 = pfVar80[4];
  fVar50 = pfVar78[8];
  fVar51 = pfVar79[7];
  fVar52 = pfVar79[6];
  fVar53 = pfVar80[6];
  fVar54 = pfVar80[7];
  fVar55 = pfVar78[7];
  fVar56 = pfVar79[8];
  fVar57 = pfVar80[8];
  fVar58 = pfVar78[6];
  fVar59 = pfVar78[4];
  fVar60 = pfVar79[9];
  fVar61 = pfVar80[9];
  fVar62 = pfVar78[3];
  fVar63 = pfVar78[2];
  fVar64 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar65 = pfVar78[9];
  fVar66 = pfVar78[8];
  fVar67 = pfVar78[7];
  fVar68 = pfVar78[6];
  fVar69 = pfVar78[4];
  fVar70 = pfVar78[3];
  fVar71 = pfVar78[2];
  fVar72 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x38
                      );
  *pSVar83 = ((((fVar42 * fVar72 * fVar37 +
                fVar51 * fVar72 * fVar31 +
                fVar56 * fVar72 * fVar26 +
                fVar60 * fVar72 * fVar17 +
                (((((fVar43 * fVar71 * fVar37 +
                    fVar52 * fVar71 * fVar31 +
                    fVar56 * fVar71 * fVar25 +
                    fVar60 * fVar71 * fVar15 +
                    ((((fVar44 * fVar70 * fVar37 +
                       fVar51 * fVar70 * fVar26 +
                       fVar60 * fVar70 * fVar12 +
                       (((((fVar45 * fVar69 * fVar37 +
                           fVar52 * fVar69 * fVar26 +
                           fVar51 * fVar69 * fVar25 +
                           fVar60 * fVar69 * fVar11 +
                           (((((fVar44 * fVar68 * fVar31 +
                               fVar42 * fVar68 * fVar26 +
                               fVar51 * fVar68 * fVar17 +
                               fVar56 * fVar68 * fVar12 +
                               (((((((fVar45 * fVar67 * fVar31 +
                                     fVar43 * fVar67 * fVar26 +
                                     fVar42 * fVar67 * fVar25 +
                                     fVar52 * fVar67 * fVar17 +
                                     fVar51 * fVar67 * fVar15 +
                                     fVar56 * fVar67 * fVar11 +
                                     (((((fVar45 * fVar66 * fVar26 +
                                         fVar44 * fVar66 * fVar25 +
                                         fVar52 * fVar66 * fVar12 +
                                         fVar51 * fVar66 * fVar11 +
                                         (((((fVar45 * fVar65 * fVar17 +
                                             fVar44 * fVar65 * fVar15 +
                                             fVar43 * fVar65 * fVar12 +
                                             fVar42 * fVar65 * fVar11 +
                                             fVar10 * fVar64 * fVar61 +
                                             fVar23 * fVar64 * fVar57 +
                                             fVar30 * fVar64 * fVar54 +
                                             fVar36 * fVar64 * fVar49 +
                                             (((((fVar13 * fVar63 * fVar61 +
                                                 fVar24 * fVar63 * fVar57 +
                                                 fVar30 * fVar63 * fVar53 +
                                                 fVar36 * fVar63 * fVar48 +
                                                 (((((fVar14 * fVar62 * fVar61 +
                                                     fVar23 * fVar62 * fVar54 +
                                                     fVar36 * fVar62 * fVar47 +
                                                     ((((fVar16 * fVar59 * fVar61 +
                                                        fVar24 * fVar59 * fVar54 +
                                                        fVar23 * fVar59 * fVar53 +
                                                        fVar36 * fVar59 * fVar46 +
                                                        (((((fVar58 * fVar14 * fVar57 +
                                                            fVar10 * fVar58 * fVar54 +
                                                            fVar23 * fVar58 * fVar49 +
                                                            fVar30 * fVar58 * fVar47 +
                                                            (((((fVar55 * fVar16 * fVar57 +
                                                                fVar13 * fVar55 * fVar54 +
                                                                fVar10 * fVar55 * fVar53 +
                                                                fVar24 * fVar55 * fVar49 +
                                                                fVar23 * fVar55 * fVar48 +
                                                                fVar30 * fVar55 * fVar46 +
                                                                (((((((fVar50 * fVar16 * fVar54 +
                                                                      fVar14 * fVar50 * fVar53 +
                                                                      fVar24 * fVar50 * fVar47 +
                                                                      fVar23 * fVar50 * fVar46 +
                                                                      (((((fVar41 * fVar16 * fVar49
                                                                          + fVar14 * fVar41 * fVar48
                                                                            + fVar13 * fVar41 *
                                                                              fVar47 + fVar10 * 
                                                  fVar41 * fVar46 +
                                                  (((((((((fVar2 * fVar40 * fVar35 +
                                                          fVar19 * fVar40 * fVar29 +
                                                          fVar28 * fVar40 * fVar22 +
                                                          fVar34 * fVar40 * fVar9 +
                                                          (((((fVar3 * fVar39 * fVar35 +
                                                              fVar20 * fVar39 * fVar29 +
                                                              fVar28 * fVar39 * fVar21 +
                                                              fVar34 * fVar39 * fVar8 +
                                                              ((((fVar7 * fVar38 * fVar35 +
                                                                 fVar19 * fVar38 * fVar22 +
                                                                 fVar34 * fVar38 * fVar5 +
                                                                 (((((fVar6 * fVar33 * fVar35 +
                                                                     fVar20 * fVar33 * fVar22 +
                                                                     fVar19 * fVar33 * fVar21 +
                                                                     fVar33 * fVar34 * fVar4 +
                                                                     (((((fVar7 * fVar32 * fVar29 +
                                                                         fVar2 * fVar32 * fVar22 +
                                                                         fVar19 * fVar32 * fVar9 +
                                                                         fVar28 * fVar32 * fVar5 +
                                                                         (((((((fVar6 * fVar27 *
                                                                                fVar29 + fVar3 * 
                                                  fVar27 * fVar22 +
                                                  fVar2 * fVar27 * fVar21 +
                                                  fVar20 * fVar27 * fVar9 +
                                                  fVar19 * fVar27 * fVar8 +
                                                  fVar27 * fVar28 * fVar4 +
                                                  (((((fVar6 * fVar18 * fVar22 +
                                                      fVar7 * fVar18 * fVar21 +
                                                      fVar18 * fVar20 * fVar5 +
                                                      fVar18 * fVar19 * fVar4 +
                                                      (((((fVar1 * fVar6 * fVar9 +
                                                          fVar1 * fVar7 * fVar8 +
                                                          fVar1 * fVar2 * fVar4 +
                                                          fVar1 * fVar3 * fVar5) -
                                                         fVar10 * fVar1 * fVar11) -
                                                        fVar13 * fVar1 * fVar12) -
                                                       fVar14 * fVar1 * fVar15) -
                                                      fVar1 * fVar16 * fVar17)) -
                                                     fVar23 * fVar18 * fVar11) -
                                                    fVar24 * fVar18 * fVar12) -
                                                   fVar14 * fVar18 * fVar25) -
                                                  fVar18 * fVar16 * fVar26)) -
                                                  fVar30 * fVar27 * fVar11) -
                                                  fVar23 * fVar27 * fVar15) -
                                                  fVar24 * fVar27 * fVar17) -
                                                  fVar10 * fVar27 * fVar25) -
                                                  fVar13 * fVar27 * fVar26) -
                                                  fVar27 * fVar16 * fVar31)) -
                                                  fVar30 * fVar32 * fVar12) -
                                                  fVar23 * fVar32 * fVar17) -
                                                  fVar10 * fVar32 * fVar26) -
                                                  fVar32 * fVar14 * fVar31)) -
                                                  fVar36 * fVar33 * fVar11) -
                                                  fVar23 * fVar33 * fVar25) -
                                                  fVar24 * fVar33 * fVar26) -
                                                  fVar33 * fVar16 * fVar37)) -
                                                  fVar36 * fVar38 * fVar12) -
                                                  fVar23 * fVar38 * fVar26) -
                                                  fVar38 * fVar14 * fVar37)) -
                                                  fVar36 * fVar39 * fVar15) -
                                                  fVar30 * fVar39 * fVar25) -
                                                  fVar24 * fVar39 * fVar31) -
                                                  fVar39 * fVar13 * fVar37)) -
                                                  fVar36 * fVar40 * fVar17) -
                                                  fVar30 * fVar40 * fVar26) -
                                                  fVar23 * fVar40 * fVar31) -
                                                  fVar40 * fVar10 * fVar37) -
                                                  fVar42 * fVar41 * fVar4) - fVar43 * fVar41 * fVar5
                                                  ) - fVar44 * fVar41 * fVar8) -
                                                  fVar45 * fVar41 * fVar9)) -
                                                  fVar51 * fVar50 * fVar4) - fVar52 * fVar50 * fVar5
                                                  ) - fVar44 * fVar50 * fVar21) -
                                                  fVar45 * fVar50 * fVar22)) -
                                                  fVar56 * fVar55 * fVar4) - fVar51 * fVar55 * fVar8
                                                  ) - fVar52 * fVar55 * fVar9) -
                                                  fVar42 * fVar55 * fVar21) -
                                                  fVar43 * fVar55 * fVar22) -
                                                  fVar45 * fVar55 * fVar29)) -
                                                  fVar56 * fVar58 * fVar5) - fVar51 * fVar58 * fVar9
                                                  ) - fVar42 * fVar58 * fVar22) -
                                                  fVar44 * fVar58 * fVar29)) -
                                                  fVar60 * fVar59 * fVar4) -
                                                  fVar51 * fVar59 * fVar21) -
                                                  fVar52 * fVar59 * fVar22) -
                                                  fVar45 * fVar59 * fVar35)) -
                                                  fVar60 * fVar62 * fVar5) -
                                                  fVar51 * fVar62 * fVar22) -
                                                  fVar44 * fVar62 * fVar35)) -
                                                  fVar60 * fVar63 * fVar8) -
                                                  fVar56 * fVar63 * fVar21) -
                                                  fVar52 * fVar63 * fVar29) -
                                                 fVar43 * fVar63 * fVar35)) -
                                                fVar60 * fVar64 * fVar9) - fVar56 * fVar64 * fVar22)
                                              - fVar51 * fVar64 * fVar29) - fVar42 * fVar64 * fVar35
                                             )) - fVar2 * fVar65 * fVar46) - fVar3 * fVar65 * fVar47
                                           ) - fVar7 * fVar65 * fVar48) - fVar65 * fVar6 * fVar49))
                                        - fVar19 * fVar66 * fVar46) - fVar20 * fVar66 * fVar47) -
                                      fVar7 * fVar66 * fVar53) - fVar66 * fVar6 * fVar54)) -
                                    fVar28 * fVar67 * fVar46) - fVar19 * fVar67 * fVar48) -
                                  fVar20 * fVar67 * fVar49) - fVar2 * fVar67 * fVar53) -
                                fVar3 * fVar67 * fVar54) - fVar67 * fVar6 * fVar57)) -
                              fVar28 * fVar68 * fVar47) - fVar19 * fVar68 * fVar49) -
                            fVar2 * fVar68 * fVar54) - fVar68 * fVar7 * fVar57)) -
                          fVar34 * fVar69 * fVar46) - fVar19 * fVar69 * fVar53) -
                        fVar20 * fVar69 * fVar54) - fVar6 * fVar69 * fVar61)) -
                      fVar34 * fVar70 * fVar47) - fVar19 * fVar70 * fVar54) -
                    fVar7 * fVar70 * fVar61)) - fVar34 * fVar71 * fVar48) - fVar28 * fVar71 * fVar53
                  ) - fVar20 * fVar71 * fVar57) - fVar3 * fVar71 * fVar61)) -
               fVar34 * fVar72 * fVar49) - fVar28 * fVar72 * fVar54) - fVar19 * fVar72 * fVar57) -
             fVar2 * fVar72 * fVar61;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[2];
  fVar5 = pfVar81[4];
  fVar6 = pfVar79[2];
  fVar7 = pfVar79[4];
  fVar8 = pfVar82[2];
  fVar9 = pfVar82[4];
  fVar10 = pfVar78[8];
  fVar11 = pfVar80[7];
  fVar12 = pfVar81[7];
  fVar13 = pfVar79[7];
  fVar14 = pfVar82[7];
  fVar15 = pfVar78[7];
  fVar16 = pfVar80[8];
  fVar17 = pfVar81[8];
  fVar18 = pfVar79[8];
  fVar19 = pfVar82[8];
  fVar20 = pfVar78[4];
  fVar21 = pfVar80[9];
  fVar22 = pfVar81[9];
  fVar23 = pfVar79[9];
  fVar24 = pfVar82[9];
  fVar25 = pfVar78[2];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[4];
  fVar28 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = pfVar80[2];
  fVar30 = pfVar80[4];
  fVar31 = pfVar78[8];
  fVar32 = pfVar79[7];
  fVar33 = pfVar80[7];
  fVar34 = pfVar78[7];
  fVar35 = pfVar79[8];
  fVar36 = pfVar80[8];
  fVar37 = pfVar78[4];
  fVar38 = pfVar79[9];
  fVar39 = pfVar80[9];
  fVar40 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[8];
  fVar43 = pfVar78[7];
  fVar44 = pfVar78[4];
  fVar45 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x39
                      );
  *pSVar83 = ((((fVar27 * fVar45 * fVar24 +
                fVar32 * fVar45 * fVar19 +
                fVar35 * fVar45 * fVar14 +
                fVar38 * fVar45 * fVar9 +
                ((((fVar28 * fVar44 * fVar24 +
                   fVar32 * fVar44 * fVar14 +
                   fVar38 * fVar44 * fVar8 +
                   (((((fVar28 * fVar43 * fVar19 +
                       fVar27 * fVar43 * fVar14 +
                       fVar32 * fVar43 * fVar9 +
                       fVar35 * fVar43 * fVar8 +
                       (((fVar28 * fVar42 * fVar14 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar13 * fVar40 * fVar36 +
                           fVar18 * fVar40 * fVar33 +
                           fVar23 * fVar40 * fVar30 +
                           (((((fVar6 * fVar37 * fVar39 +
                               fVar13 * fVar37 * fVar33 +
                               fVar23 * fVar37 * fVar29 +
                               ((((fVar34 * fVar6 * fVar36 +
                                  fVar7 * fVar34 * fVar33 +
                                  fVar13 * fVar34 * fVar30 +
                                  fVar18 * fVar34 * fVar29 +
                                  (((((fVar31 * fVar6 * fVar33 +
                                      fVar13 * fVar31 * fVar29 +
                                      (((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        (((((((fVar3 * fVar25 * fVar22 +
                                              fVar11 * fVar25 * fVar17 +
                                              fVar16 * fVar25 * fVar12 +
                                              fVar21 * fVar25 * fVar5 +
                                              ((((fVar2 * fVar20 * fVar22 +
                                                 fVar11 * fVar20 * fVar12 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((((fVar2 * fVar15 * fVar17 +
                                                     fVar3 * fVar15 * fVar12 +
                                                     fVar11 * fVar15 * fVar5 +
                                                     fVar15 * fVar16 * fVar4 +
                                                     (((fVar2 * fVar10 * fVar12 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar13 * fVar10 * fVar8) -
                                                     fVar10 * fVar6 * fVar14)) -
                                                    fVar18 * fVar15 * fVar8) -
                                                   fVar13 * fVar15 * fVar9) -
                                                  fVar7 * fVar15 * fVar14) - fVar15 * fVar6 * fVar19
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar13 * fVar20 * fVar14) - fVar20 * fVar6 * fVar24))
                                             - fVar23 * fVar25 * fVar9) - fVar18 * fVar25 * fVar14)
                                           - fVar13 * fVar25 * fVar19) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar28 * fVar31 * fVar12)) -
                                     fVar35 * fVar34 * fVar4) - fVar32 * fVar34 * fVar5) -
                                   fVar27 * fVar34 * fVar12) - fVar28 * fVar34 * fVar17)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar12) -
                               fVar28 * fVar37 * fVar22)) - fVar38 * fVar40 * fVar5) -
                             fVar35 * fVar40 * fVar12) - fVar32 * fVar40 * fVar17) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar42 * fVar2 * fVar33)) - fVar16 * fVar43 * fVar29) -
                     fVar11 * fVar43 * fVar30) - fVar3 * fVar43 * fVar33) - fVar43 * fVar2 * fVar36)
                   ) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar33) -
                fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) - fVar16 * fVar45 * fVar33) -
             fVar11 * fVar45 * fVar36) - fVar3 * fVar45 * fVar39;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[5];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[3];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar76;
  fVar6 = pfVar76[3];
  fVar7 = pfVar76[5];
  fVar8 = pfVar74[5];
  fVar9 = *pfVar77;
  fVar10 = pfVar77[3];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[3];
  fVar13 = pfVar77[5];
  fVar14 = pfVar73[8];
  fVar15 = pfVar75[8];
  fVar16 = pfVar75[6];
  fVar17 = pfVar76[6];
  fVar18 = pfVar76[8];
  fVar19 = pfVar74[8];
  fVar20 = pfVar74[6];
  fVar21 = pfVar77[6];
  fVar22 = pfVar77[8];
  fVar23 = pfVar73[6];
  fVar24 = pfVar73[5];
  fVar25 = pfVar75[9];
  fVar26 = pfVar76[9];
  fVar27 = pfVar74[9];
  fVar28 = pfVar77[9];
  fVar29 = pfVar73[3];
  fVar30 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar73[9];
  fVar32 = pfVar74[5];
  fVar33 = pfVar74[3];
  fVar34 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar35 = *pfVar75;
  fVar36 = pfVar75[3];
  fVar37 = pfVar75[5];
  fVar38 = pfVar73[8];
  fVar39 = pfVar74[8];
  fVar40 = pfVar74[6];
  fVar41 = pfVar75[6];
  fVar42 = pfVar75[8];
  fVar43 = pfVar73[6];
  fVar44 = pfVar73[5];
  fVar45 = pfVar74[9];
  fVar46 = pfVar75[9];
  fVar47 = pfVar73[3];
  fVar48 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar49 = pfVar73[9];
  fVar50 = pfVar73[8];
  fVar51 = pfVar73[6];
  fVar52 = pfVar73[5];
  fVar53 = pfVar73[3];
  fVar54 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x3a
                      );
  *pSVar83 = (((fVar32 * fVar54 * fVar28 +
               fVar39 * fVar54 * fVar22 +
               fVar45 * fVar54 * fVar13 +
               (((((fVar33 * fVar53 * fVar28 +
                   fVar40 * fVar53 * fVar22 +
                   fVar39 * fVar53 * fVar21 +
                   fVar45 * fVar53 * fVar10 +
                   ((((fVar34 * fVar52 * fVar28 +
                      fVar40 * fVar52 * fVar21 +
                      fVar45 * fVar52 * fVar9 +
                      (((((fVar33 * fVar51 * fVar22 +
                          fVar32 * fVar51 * fVar21 +
                          fVar40 * fVar51 * fVar13 +
                          fVar39 * fVar51 * fVar10 +
                          (((((fVar34 * fVar50 * fVar22 +
                              fVar33 * fVar50 * fVar21 +
                              fVar40 * fVar50 * fVar10 +
                              fVar39 * fVar50 * fVar9 +
                              ((((fVar34 * fVar49 * fVar13 +
                                 fVar33 * fVar49 * fVar10 +
                                 fVar32 * fVar49 * fVar9 +
                                 fVar8 * fVar48 * fVar46 +
                                 fVar19 * fVar48 * fVar42 +
                                 fVar27 * fVar48 * fVar37 +
                                 ((((fVar12 * fVar47 * fVar46 +
                                    fVar20 * fVar47 * fVar42 +
                                    fVar19 * fVar47 * fVar41 +
                                    fVar27 * fVar47 * fVar36 +
                                    (((((fVar11 * fVar44 * fVar46 +
                                        fVar20 * fVar44 * fVar41 +
                                        fVar27 * fVar44 * fVar35 +
                                        ((((fVar43 * fVar12 * fVar42 +
                                           fVar8 * fVar43 * fVar41 +
                                           fVar20 * fVar43 * fVar37 +
                                           fVar19 * fVar43 * fVar36 +
                                           (((((fVar38 * fVar11 * fVar42 +
                                               fVar12 * fVar38 * fVar41 +
                                               fVar20 * fVar38 * fVar36 +
                                               fVar19 * fVar38 * fVar35 +
                                               (((((fVar31 * fVar11 * fVar37 +
                                                   fVar12 * fVar31 * fVar36 +
                                                   fVar8 * fVar31 * fVar35 +
                                                   (((((((fVar2 * fVar30 * fVar26 +
                                                         fVar15 * fVar30 * fVar18 +
                                                         fVar25 * fVar30 * fVar7 +
                                                         (((((fVar4 * fVar29 * fVar26 +
                                                             fVar16 * fVar29 * fVar18 +
                                                             fVar15 * fVar29 * fVar17 +
                                                             fVar25 * fVar29 * fVar6 +
                                                             ((((fVar3 * fVar24 * fVar26 +
                                                                fVar16 * fVar24 * fVar17 +
                                                                fVar24 * fVar25 * fVar5 +
                                                                (((((fVar4 * fVar23 * fVar18 +
                                                                    fVar2 * fVar23 * fVar17 +
                                                                    fVar16 * fVar23 * fVar7 +
                                                                    fVar15 * fVar23 * fVar6 +
                                                                    (((((fVar3 * fVar14 * fVar18 +
                                                                        fVar4 * fVar14 * fVar17 +
                                                                        fVar14 * fVar16 * fVar6 +
                                                                        fVar14 * fVar15 * fVar5 +
                                                                        ((((fVar1 * fVar3 * fVar7 +
                                                                           fVar1 * fVar2 * fVar5 +
                                                                           fVar1 * fVar4 * fVar6) -
                                                                          fVar8 * fVar1 * fVar9) -
                                                                         fVar12 * fVar1 * fVar10) -
                                                                        fVar1 * fVar11 * fVar13)) -
                                                                       fVar19 * fVar14 * fVar9) -
                                                                      fVar20 * fVar14 * fVar10) -
                                                                     fVar12 * fVar14 * fVar21) -
                                                                    fVar14 * fVar11 * fVar22)) -
                                                                   fVar19 * fVar23 * fVar10) -
                                                                  fVar20 * fVar23 * fVar13) -
                                                                 fVar8 * fVar23 * fVar21) -
                                                                fVar23 * fVar12 * fVar22)) -
                                                               fVar27 * fVar24 * fVar9) -
                                                              fVar20 * fVar24 * fVar21) -
                                                             fVar24 * fVar11 * fVar28)) -
                                                            fVar27 * fVar29 * fVar10) -
                                                           fVar19 * fVar29 * fVar21) -
                                                          fVar20 * fVar29 * fVar22) -
                                                         fVar29 * fVar12 * fVar28)) -
                                                        fVar27 * fVar30 * fVar13) -
                                                       fVar19 * fVar30 * fVar22) -
                                                      fVar30 * fVar8 * fVar28) -
                                                     fVar32 * fVar31 * fVar5) -
                                                    fVar33 * fVar31 * fVar6) -
                                                   fVar34 * fVar31 * fVar7)) -
                                                  fVar39 * fVar38 * fVar5) - fVar40 * fVar38 * fVar6
                                                 ) - fVar33 * fVar38 * fVar17) -
                                               fVar34 * fVar38 * fVar18)) - fVar39 * fVar43 * fVar6)
                                             - fVar40 * fVar43 * fVar7) - fVar32 * fVar43 * fVar17)
                                           - fVar33 * fVar43 * fVar18)) - fVar45 * fVar44 * fVar5) -
                                         fVar40 * fVar44 * fVar17) - fVar34 * fVar44 * fVar26)) -
                                       fVar45 * fVar47 * fVar6) - fVar39 * fVar47 * fVar17) -
                                     fVar40 * fVar47 * fVar18) - fVar33 * fVar47 * fVar26)) -
                                   fVar45 * fVar48 * fVar7) - fVar39 * fVar48 * fVar18) -
                                 fVar32 * fVar48 * fVar26)) - fVar2 * fVar49 * fVar35) -
                               fVar4 * fVar49 * fVar36) - fVar49 * fVar3 * fVar37)) -
                             fVar15 * fVar50 * fVar35) - fVar16 * fVar50 * fVar36) -
                           fVar4 * fVar50 * fVar41) - fVar50 * fVar3 * fVar42)) -
                         fVar15 * fVar51 * fVar36) - fVar16 * fVar51 * fVar37) -
                       fVar2 * fVar51 * fVar41) - fVar51 * fVar4 * fVar42)) -
                     fVar25 * fVar52 * fVar35) - fVar16 * fVar52 * fVar41) - fVar3 * fVar52 * fVar46
                   )) - fVar25 * fVar53 * fVar36) - fVar15 * fVar53 * fVar41) -
                fVar16 * fVar53 * fVar42) - fVar4 * fVar53 * fVar46)) - fVar25 * fVar54 * fVar37) -
             fVar15 * fVar54 * fVar42) - fVar2 * fVar54 * fVar46;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[3];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[3];
  fVar8 = pfVar81[4];
  fVar9 = pfVar81[5];
  fVar10 = pfVar79[5];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[3];
  fVar13 = pfVar79[4];
  fVar14 = pfVar79[3];
  fVar15 = pfVar82[4];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[5];
  fVar18 = pfVar78[8];
  fVar19 = pfVar80[8];
  fVar20 = pfVar80[7];
  fVar21 = pfVar80[6];
  fVar22 = pfVar81[6];
  fVar23 = pfVar81[7];
  fVar24 = pfVar81[8];
  fVar25 = pfVar79[8];
  fVar26 = pfVar79[7];
  fVar27 = pfVar79[6];
  fVar28 = pfVar82[6];
  fVar29 = pfVar82[7];
  fVar30 = pfVar82[8];
  fVar31 = pfVar78[7];
  fVar32 = pfVar78[6];
  fVar33 = pfVar78[5];
  fVar34 = pfVar80[9];
  fVar35 = pfVar81[9];
  fVar36 = pfVar79[9];
  fVar37 = pfVar82[9];
  fVar38 = pfVar78[4];
  fVar39 = pfVar78[3];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar79[5];
  fVar43 = pfVar79[4];
  fVar44 = pfVar79[3];
  fVar45 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar46 = pfVar80[1];
  fVar47 = pfVar80[3];
  fVar48 = pfVar80[4];
  fVar49 = pfVar80[5];
  fVar50 = pfVar78[8];
  fVar51 = pfVar79[8];
  fVar52 = pfVar79[7];
  fVar53 = pfVar79[6];
  fVar54 = pfVar80[6];
  fVar55 = pfVar80[7];
  fVar56 = pfVar80[8];
  fVar57 = pfVar78[7];
  fVar58 = pfVar78[6];
  fVar59 = pfVar78[5];
  fVar60 = pfVar79[9];
  fVar61 = pfVar80[9];
  fVar62 = pfVar78[4];
  fVar63 = pfVar78[3];
  fVar64 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar65 = pfVar78[9];
  fVar66 = pfVar78[8];
  fVar67 = pfVar78[7];
  fVar68 = pfVar78[6];
  fVar69 = pfVar78[5];
  fVar70 = pfVar78[4];
  fVar71 = pfVar78[3];
  fVar72 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x3b
                      );
  *pSVar83 = (((fVar42 * fVar72 * fVar37 +
               fVar51 * fVar72 * fVar30 +
               fVar60 * fVar72 * fVar17 +
               (((((fVar43 * fVar71 * fVar37 +
                   fVar52 * fVar71 * fVar30 +
                   fVar51 * fVar71 * fVar29 +
                   fVar60 * fVar71 * fVar15 +
                   (((((fVar44 * fVar70 * fVar37 +
                       fVar53 * fVar70 * fVar30 +
                       fVar51 * fVar70 * fVar28 +
                       fVar60 * fVar70 * fVar12 +
                       (((((fVar45 * fVar69 * fVar37 +
                           fVar53 * fVar69 * fVar29 +
                           fVar52 * fVar69 * fVar28 +
                           fVar60 * fVar69 * fVar11 +
                           (((((fVar43 * fVar68 * fVar30 +
                               fVar42 * fVar68 * fVar29 +
                               fVar52 * fVar68 * fVar17 +
                               fVar51 * fVar68 * fVar15 +
                               (((((fVar44 * fVar67 * fVar30 +
                                   fVar42 * fVar67 * fVar28 +
                                   fVar53 * fVar67 * fVar17 +
                                   fVar51 * fVar67 * fVar12 +
                                   (((((((fVar45 * fVar66 * fVar30 +
                                         fVar44 * fVar66 * fVar29 +
                                         fVar43 * fVar66 * fVar28 +
                                         fVar53 * fVar66 * fVar15 +
                                         fVar52 * fVar66 * fVar12 +
                                         fVar51 * fVar66 * fVar11 +
                                         (((((fVar45 * fVar65 * fVar17 +
                                             fVar44 * fVar65 * fVar15 +
                                             fVar43 * fVar65 * fVar12 +
                                             fVar42 * fVar65 * fVar11 +
                                             fVar10 * fVar64 * fVar61 +
                                             fVar25 * fVar64 * fVar56 +
                                             fVar36 * fVar64 * fVar49 +
                                             ((((fVar13 * fVar63 * fVar61 +
                                                fVar26 * fVar63 * fVar56 +
                                                fVar25 * fVar63 * fVar55 +
                                                fVar36 * fVar63 * fVar48 +
                                                (((((fVar14 * fVar62 * fVar61 +
                                                    fVar27 * fVar62 * fVar56 +
                                                    fVar25 * fVar62 * fVar54 +
                                                    fVar36 * fVar62 * fVar47 +
                                                    (((((fVar16 * fVar59 * fVar61 +
                                                        fVar27 * fVar59 * fVar55 +
                                                        fVar26 * fVar59 * fVar54 +
                                                        fVar36 * fVar59 * fVar46 +
                                                        (((((fVar58 * fVar13 * fVar56 +
                                                            fVar10 * fVar58 * fVar55 +
                                                            fVar26 * fVar58 * fVar49 +
                                                            fVar25 * fVar58 * fVar48 +
                                                            (((((fVar57 * fVar14 * fVar56 +
                                                                fVar10 * fVar57 * fVar54 +
                                                                fVar27 * fVar57 * fVar49 +
                                                                fVar25 * fVar57 * fVar47 +
                                                                (((((fVar50 * fVar16 * fVar56 +
                                                                    fVar14 * fVar50 * fVar55 +
                                                                    fVar13 * fVar50 * fVar54 +
                                                                    fVar27 * fVar50 * fVar48 +
                                                                    fVar26 * fVar50 * fVar47 +
                                                                    fVar25 * fVar50 * fVar46 +
                                                                    (((((((fVar41 * fVar16 * fVar49
                                                                          + fVar14 * fVar41 * fVar48
                                                                            + fVar13 * fVar41 *
                                                                              fVar47 + fVar10 * 
                                                  fVar41 * fVar46 +
                                                  ((((((((fVar2 * fVar40 * fVar35 +
                                                         fVar19 * fVar40 * fVar24 +
                                                         fVar34 * fVar40 * fVar9 +
                                                         (((((fVar3 * fVar39 * fVar35 +
                                                             fVar20 * fVar39 * fVar24 +
                                                             fVar19 * fVar39 * fVar23 +
                                                             fVar34 * fVar39 * fVar8 +
                                                             (((((fVar7 * fVar38 * fVar35 +
                                                                 fVar21 * fVar38 * fVar24 +
                                                                 fVar19 * fVar38 * fVar22 +
                                                                 fVar34 * fVar38 * fVar5 +
                                                                 (((((fVar6 * fVar33 * fVar35 +
                                                                     fVar21 * fVar33 * fVar23 +
                                                                     fVar20 * fVar33 * fVar22 +
                                                                     fVar33 * fVar34 * fVar4 +
                                                                     (((((fVar3 * fVar32 * fVar24 +
                                                                         fVar2 * fVar32 * fVar23 +
                                                                         fVar20 * fVar32 * fVar9 +
                                                                         fVar19 * fVar32 * fVar8 +
                                                                         (((((fVar7 * fVar31 *
                                                                              fVar24 + fVar2 * 
                                                  fVar31 * fVar22 +
                                                  fVar21 * fVar31 * fVar9 +
                                                  fVar19 * fVar31 * fVar5 +
                                                  (((((((fVar6 * fVar18 * fVar24 +
                                                        fVar7 * fVar18 * fVar23 +
                                                        fVar3 * fVar18 * fVar22 +
                                                        fVar18 * fVar21 * fVar8 +
                                                        fVar18 * fVar20 * fVar5 +
                                                        fVar18 * fVar19 * fVar4 +
                                                        (((((fVar1 * fVar6 * fVar9 +
                                                            fVar1 * fVar7 * fVar8 +
                                                            fVar1 * fVar2 * fVar4 +
                                                            fVar1 * fVar3 * fVar5) -
                                                           fVar10 * fVar1 * fVar11) -
                                                          fVar13 * fVar1 * fVar12) -
                                                         fVar14 * fVar1 * fVar15) -
                                                        fVar1 * fVar16 * fVar17)) -
                                                       fVar25 * fVar18 * fVar11) -
                                                      fVar26 * fVar18 * fVar12) -
                                                     fVar27 * fVar18 * fVar15) -
                                                    fVar13 * fVar18 * fVar28) -
                                                   fVar14 * fVar18 * fVar29) -
                                                  fVar18 * fVar16 * fVar30)) -
                                                  fVar25 * fVar31 * fVar12) -
                                                  fVar27 * fVar31 * fVar17) -
                                                  fVar10 * fVar31 * fVar28) -
                                                  fVar31 * fVar14 * fVar30)) -
                                                  fVar25 * fVar32 * fVar15) -
                                                  fVar26 * fVar32 * fVar17) -
                                                  fVar10 * fVar32 * fVar29) -
                                                  fVar32 * fVar13 * fVar30)) -
                                                  fVar36 * fVar33 * fVar11) -
                                                  fVar26 * fVar33 * fVar28) -
                                                  fVar27 * fVar33 * fVar29) -
                                                  fVar33 * fVar16 * fVar37)) -
                                                  fVar36 * fVar38 * fVar12) -
                                                  fVar25 * fVar38 * fVar28) -
                                                  fVar27 * fVar38 * fVar30) -
                                                  fVar38 * fVar14 * fVar37)) -
                                                  fVar36 * fVar39 * fVar15) -
                                                  fVar25 * fVar39 * fVar29) -
                                                  fVar26 * fVar39 * fVar30) -
                                                  fVar39 * fVar13 * fVar37)) -
                                                  fVar36 * fVar40 * fVar17) -
                                                  fVar25 * fVar40 * fVar30) -
                                                  fVar40 * fVar10 * fVar37) -
                                                  fVar42 * fVar41 * fVar4) - fVar43 * fVar41 * fVar5
                                                  ) - fVar44 * fVar41 * fVar8) -
                                                  fVar45 * fVar41 * fVar9)) -
                                                  fVar51 * fVar50 * fVar4) - fVar52 * fVar50 * fVar5
                                                  ) - fVar53 * fVar50 * fVar8) -
                                                  fVar43 * fVar50 * fVar22) -
                                                  fVar44 * fVar50 * fVar23) -
                                                  fVar45 * fVar50 * fVar24)) -
                                                  fVar51 * fVar57 * fVar5) - fVar53 * fVar57 * fVar9
                                                  ) - fVar42 * fVar57 * fVar22) -
                                                  fVar44 * fVar57 * fVar24)) -
                                                  fVar51 * fVar58 * fVar8) - fVar52 * fVar58 * fVar9
                                                  ) - fVar42 * fVar58 * fVar23) -
                                                  fVar43 * fVar58 * fVar24)) -
                                                  fVar60 * fVar59 * fVar4) -
                                                  fVar52 * fVar59 * fVar22) -
                                                  fVar53 * fVar59 * fVar23) -
                                                  fVar45 * fVar59 * fVar35)) -
                                                  fVar60 * fVar62 * fVar5) -
                                                  fVar51 * fVar62 * fVar22) -
                                                  fVar53 * fVar62 * fVar24) -
                                                  fVar44 * fVar62 * fVar35)) -
                                                  fVar60 * fVar63 * fVar8) -
                                                  fVar51 * fVar63 * fVar23) -
                                                 fVar52 * fVar63 * fVar24) -
                                                fVar43 * fVar63 * fVar35)) - fVar60 * fVar64 * fVar9
                                               ) - fVar51 * fVar64 * fVar24) -
                                             fVar42 * fVar64 * fVar35)) - fVar2 * fVar65 * fVar46) -
                                           fVar3 * fVar65 * fVar47) - fVar7 * fVar65 * fVar48) -
                                         fVar65 * fVar6 * fVar49)) - fVar19 * fVar66 * fVar46) -
                                       fVar20 * fVar66 * fVar47) - fVar21 * fVar66 * fVar48) -
                                     fVar3 * fVar66 * fVar54) - fVar7 * fVar66 * fVar55) -
                                   fVar66 * fVar6 * fVar56)) - fVar19 * fVar67 * fVar47) -
                                 fVar21 * fVar67 * fVar49) - fVar2 * fVar67 * fVar54) -
                               fVar67 * fVar7 * fVar56)) - fVar19 * fVar68 * fVar48) -
                             fVar20 * fVar68 * fVar49) - fVar2 * fVar68 * fVar55) -
                           fVar68 * fVar3 * fVar56)) - fVar34 * fVar69 * fVar46) -
                         fVar20 * fVar69 * fVar54) - fVar21 * fVar69 * fVar55) -
                       fVar6 * fVar69 * fVar61)) - fVar34 * fVar70 * fVar47) -
                     fVar19 * fVar70 * fVar54) - fVar21 * fVar70 * fVar56) - fVar7 * fVar70 * fVar61
                   )) - fVar34 * fVar71 * fVar48) - fVar19 * fVar71 * fVar55) -
                fVar20 * fVar71 * fVar56) - fVar3 * fVar71 * fVar61)) - fVar34 * fVar72 * fVar49) -
             fVar19 * fVar72 * fVar56) - fVar2 * fVar72 * fVar61;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[2];
  fVar4 = pfVar80[4];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar81[2];
  fVar6 = pfVar81[4];
  fVar7 = pfVar81[5];
  fVar8 = pfVar79[5];
  fVar9 = pfVar82[2];
  fVar10 = pfVar82[4];
  fVar11 = pfVar79[2];
  fVar12 = pfVar79[4];
  fVar13 = pfVar82[5];
  fVar14 = pfVar78[8];
  fVar15 = pfVar80[8];
  fVar16 = pfVar80[7];
  fVar17 = pfVar81[7];
  fVar18 = pfVar81[8];
  fVar19 = pfVar79[8];
  fVar20 = pfVar79[7];
  fVar21 = pfVar82[7];
  fVar22 = pfVar82[8];
  fVar23 = pfVar78[7];
  fVar24 = pfVar78[5];
  fVar25 = pfVar80[9];
  fVar26 = pfVar81[9];
  fVar27 = pfVar79[9];
  fVar28 = pfVar82[9];
  fVar29 = pfVar78[4];
  fVar30 = pfVar78[2];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar78[9];
  fVar32 = pfVar79[5];
  fVar33 = pfVar79[4];
  fVar34 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar35 = pfVar80[2];
  fVar36 = pfVar80[4];
  fVar37 = pfVar80[5];
  fVar38 = pfVar78[8];
  fVar39 = pfVar79[8];
  fVar40 = pfVar79[7];
  fVar41 = pfVar80[7];
  fVar42 = pfVar80[8];
  fVar43 = pfVar78[7];
  fVar44 = pfVar78[5];
  fVar45 = pfVar79[9];
  fVar46 = pfVar80[9];
  fVar47 = pfVar78[4];
  fVar48 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar49 = pfVar78[9];
  fVar50 = pfVar78[8];
  fVar51 = pfVar78[7];
  fVar52 = pfVar78[5];
  fVar53 = pfVar78[4];
  fVar54 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x3c
                      );
  *pSVar83 = (((fVar32 * fVar54 * fVar28 +
               fVar39 * fVar54 * fVar22 +
               fVar45 * fVar54 * fVar13 +
               (((((fVar33 * fVar53 * fVar28 +
                   fVar40 * fVar53 * fVar22 +
                   fVar39 * fVar53 * fVar21 +
                   fVar45 * fVar53 * fVar10 +
                   ((((fVar34 * fVar52 * fVar28 +
                      fVar40 * fVar52 * fVar21 +
                      fVar45 * fVar52 * fVar9 +
                      (((((fVar33 * fVar51 * fVar22 +
                          fVar32 * fVar51 * fVar21 +
                          fVar40 * fVar51 * fVar13 +
                          fVar39 * fVar51 * fVar10 +
                          (((((fVar34 * fVar50 * fVar22 +
                              fVar33 * fVar50 * fVar21 +
                              fVar40 * fVar50 * fVar10 +
                              fVar39 * fVar50 * fVar9 +
                              ((((fVar34 * fVar49 * fVar13 +
                                 fVar33 * fVar49 * fVar10 +
                                 fVar32 * fVar49 * fVar9 +
                                 fVar8 * fVar48 * fVar46 +
                                 fVar19 * fVar48 * fVar42 +
                                 fVar27 * fVar48 * fVar37 +
                                 ((((fVar12 * fVar47 * fVar46 +
                                    fVar20 * fVar47 * fVar42 +
                                    fVar19 * fVar47 * fVar41 +
                                    fVar27 * fVar47 * fVar36 +
                                    (((((fVar11 * fVar44 * fVar46 +
                                        fVar20 * fVar44 * fVar41 +
                                        fVar27 * fVar44 * fVar35 +
                                        ((((fVar43 * fVar12 * fVar42 +
                                           fVar8 * fVar43 * fVar41 +
                                           fVar20 * fVar43 * fVar37 +
                                           fVar19 * fVar43 * fVar36 +
                                           (((((fVar38 * fVar11 * fVar42 +
                                               fVar12 * fVar38 * fVar41 +
                                               fVar20 * fVar38 * fVar36 +
                                               fVar19 * fVar38 * fVar35 +
                                               (((((fVar31 * fVar11 * fVar37 +
                                                   fVar12 * fVar31 * fVar36 +
                                                   fVar8 * fVar31 * fVar35 +
                                                   (((((((fVar2 * fVar30 * fVar26 +
                                                         fVar15 * fVar30 * fVar18 +
                                                         fVar25 * fVar30 * fVar7 +
                                                         (((((fVar4 * fVar29 * fVar26 +
                                                             fVar16 * fVar29 * fVar18 +
                                                             fVar15 * fVar29 * fVar17 +
                                                             fVar25 * fVar29 * fVar6 +
                                                             ((((fVar3 * fVar24 * fVar26 +
                                                                fVar16 * fVar24 * fVar17 +
                                                                fVar24 * fVar25 * fVar5 +
                                                                (((((fVar4 * fVar23 * fVar18 +
                                                                    fVar2 * fVar23 * fVar17 +
                                                                    fVar16 * fVar23 * fVar7 +
                                                                    fVar15 * fVar23 * fVar6 +
                                                                    (((((fVar3 * fVar14 * fVar18 +
                                                                        fVar4 * fVar14 * fVar17 +
                                                                        fVar14 * fVar16 * fVar6 +
                                                                        fVar14 * fVar15 * fVar5 +
                                                                        ((((fVar1 * fVar3 * fVar7 +
                                                                           fVar1 * fVar2 * fVar5 +
                                                                           fVar1 * fVar4 * fVar6) -
                                                                          fVar8 * fVar1 * fVar9) -
                                                                         fVar12 * fVar1 * fVar10) -
                                                                        fVar1 * fVar11 * fVar13)) -
                                                                       fVar19 * fVar14 * fVar9) -
                                                                      fVar20 * fVar14 * fVar10) -
                                                                     fVar12 * fVar14 * fVar21) -
                                                                    fVar14 * fVar11 * fVar22)) -
                                                                   fVar19 * fVar23 * fVar10) -
                                                                  fVar20 * fVar23 * fVar13) -
                                                                 fVar8 * fVar23 * fVar21) -
                                                                fVar23 * fVar12 * fVar22)) -
                                                               fVar27 * fVar24 * fVar9) -
                                                              fVar20 * fVar24 * fVar21) -
                                                             fVar24 * fVar11 * fVar28)) -
                                                            fVar27 * fVar29 * fVar10) -
                                                           fVar19 * fVar29 * fVar21) -
                                                          fVar20 * fVar29 * fVar22) -
                                                         fVar29 * fVar12 * fVar28)) -
                                                        fVar27 * fVar30 * fVar13) -
                                                       fVar19 * fVar30 * fVar22) -
                                                      fVar30 * fVar8 * fVar28) -
                                                     fVar32 * fVar31 * fVar5) -
                                                    fVar33 * fVar31 * fVar6) -
                                                   fVar34 * fVar31 * fVar7)) -
                                                  fVar39 * fVar38 * fVar5) - fVar40 * fVar38 * fVar6
                                                 ) - fVar33 * fVar38 * fVar17) -
                                               fVar34 * fVar38 * fVar18)) - fVar39 * fVar43 * fVar6)
                                             - fVar40 * fVar43 * fVar7) - fVar32 * fVar43 * fVar17)
                                           - fVar33 * fVar43 * fVar18)) - fVar45 * fVar44 * fVar5) -
                                         fVar40 * fVar44 * fVar17) - fVar34 * fVar44 * fVar26)) -
                                       fVar45 * fVar47 * fVar6) - fVar39 * fVar47 * fVar17) -
                                     fVar40 * fVar47 * fVar18) - fVar33 * fVar47 * fVar26)) -
                                   fVar45 * fVar48 * fVar7) - fVar39 * fVar48 * fVar18) -
                                 fVar32 * fVar48 * fVar26)) - fVar2 * fVar49 * fVar35) -
                               fVar4 * fVar49 * fVar36) - fVar49 * fVar3 * fVar37)) -
                             fVar15 * fVar50 * fVar35) - fVar16 * fVar50 * fVar36) -
                           fVar4 * fVar50 * fVar41) - fVar50 * fVar3 * fVar42)) -
                         fVar15 * fVar51 * fVar36) - fVar16 * fVar51 * fVar37) -
                       fVar2 * fVar51 * fVar41) - fVar51 * fVar4 * fVar42)) -
                     fVar25 * fVar52 * fVar35) - fVar16 * fVar52 * fVar41) - fVar3 * fVar52 * fVar46
                   )) - fVar25 * fVar53 * fVar36) - fVar15 * fVar53 * fVar41) -
                fVar16 * fVar53 * fVar42) - fVar4 * fVar53 * fVar46)) - fVar25 * fVar54 * fVar37) -
             fVar15 * fVar54 * fVar42) - fVar2 * fVar54 * fVar46;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[3];
  fVar3 = pfVar80[5];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[3];
  fVar5 = pfVar81[5];
  fVar6 = pfVar79[3];
  fVar7 = pfVar79[5];
  fVar8 = pfVar82[3];
  fVar9 = pfVar82[5];
  fVar10 = pfVar78[8];
  fVar11 = pfVar80[8];
  fVar12 = pfVar80[6];
  fVar13 = pfVar81[6];
  fVar14 = pfVar81[8];
  fVar15 = pfVar79[8];
  fVar16 = pfVar79[6];
  fVar17 = pfVar82[6];
  fVar18 = pfVar82[8];
  fVar19 = pfVar78[6];
  fVar20 = pfVar78[5];
  fVar21 = pfVar80[9];
  fVar22 = pfVar81[9];
  fVar23 = pfVar79[9];
  fVar24 = pfVar82[9];
  fVar25 = pfVar78[3];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[5];
  fVar28 = pfVar79[3];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = pfVar80[3];
  fVar30 = pfVar80[5];
  fVar31 = pfVar78[8];
  fVar32 = pfVar79[8];
  fVar33 = pfVar79[6];
  fVar34 = pfVar80[6];
  fVar35 = pfVar80[8];
  fVar36 = pfVar78[6];
  fVar37 = pfVar78[5];
  fVar38 = pfVar79[9];
  fVar39 = pfVar80[9];
  fVar40 = pfVar78[3];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[8];
  fVar43 = pfVar78[6];
  fVar44 = pfVar78[5];
  fVar45 = pfVar78[3];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x3d
                      );
  *pSVar83 = (((fVar27 * fVar45 * fVar24 +
               fVar32 * fVar45 * fVar18 +
               fVar38 * fVar45 * fVar9 +
               (((((fVar28 * fVar44 * fVar24 +
                   fVar33 * fVar44 * fVar18 +
                   fVar32 * fVar44 * fVar17 +
                   fVar38 * fVar44 * fVar8 +
                   (((fVar27 * fVar43 * fVar18 +
                     fVar32 * fVar43 * fVar9 +
                     (((((fVar28 * fVar42 * fVar18 +
                         fVar27 * fVar42 * fVar17 +
                         fVar33 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar15 * fVar40 * fVar35 +
                           fVar23 * fVar40 * fVar30 +
                           ((((fVar6 * fVar37 * fVar39 +
                              fVar16 * fVar37 * fVar35 +
                              fVar15 * fVar37 * fVar34 +
                              fVar23 * fVar37 * fVar29 +
                              (((((fVar36 * fVar7 * fVar35 +
                                  fVar15 * fVar36 * fVar30 +
                                  (((fVar31 * fVar6 * fVar35 +
                                    fVar7 * fVar31 * fVar34 +
                                    fVar16 * fVar31 * fVar30 +
                                    fVar15 * fVar31 * fVar29 +
                                    (((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        ((((((fVar3 * fVar25 * fVar22 +
                                             fVar11 * fVar25 * fVar14 +
                                             fVar21 * fVar25 * fVar5 +
                                             (((((fVar2 * fVar20 * fVar22 +
                                                 fVar12 * fVar20 * fVar14 +
                                                 fVar11 * fVar20 * fVar13 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((fVar3 * fVar19 * fVar14 +
                                                   fVar11 * fVar19 * fVar5 +
                                                   (((((fVar2 * fVar10 * fVar14 +
                                                       fVar3 * fVar10 * fVar13 +
                                                       fVar10 * fVar12 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar15 * fVar10 * fVar8) -
                                                     fVar16 * fVar10 * fVar9) -
                                                    fVar7 * fVar10 * fVar17) -
                                                   fVar10 * fVar6 * fVar18)) -
                                                  fVar15 * fVar19 * fVar9) - fVar19 * fVar7 * fVar18
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar15 * fVar20 * fVar17) - fVar16 * fVar20 * fVar18)
                                             - fVar20 * fVar6 * fVar24)) - fVar23 * fVar25 * fVar9)
                                           - fVar15 * fVar25 * fVar18) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar33 * fVar31 * fVar5) -
                                     fVar27 * fVar31 * fVar13) - fVar28 * fVar31 * fVar14)) -
                                   fVar32 * fVar36 * fVar5) - fVar27 * fVar36 * fVar14)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar13) -
                               fVar33 * fVar37 * fVar14) - fVar28 * fVar37 * fVar22)) -
                             fVar38 * fVar40 * fVar5) - fVar32 * fVar40 * fVar14) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar12 * fVar42 * fVar30) - fVar3 * fVar42 * fVar34) -
                     fVar42 * fVar2 * fVar35)) - fVar11 * fVar43 * fVar30) - fVar43 * fVar3 * fVar35
                   )) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar34) -
                fVar12 * fVar44 * fVar35) - fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) -
             fVar11 * fVar45 * fVar35) - fVar3 * fVar45 * fVar39;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[4];
  fVar3 = pfVar80[5];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[4];
  fVar5 = pfVar81[5];
  fVar6 = pfVar79[4];
  fVar7 = pfVar79[5];
  fVar8 = pfVar82[4];
  fVar9 = pfVar82[5];
  fVar10 = pfVar78[8];
  fVar11 = pfVar80[8];
  fVar12 = pfVar80[7];
  fVar13 = pfVar81[7];
  fVar14 = pfVar81[8];
  fVar15 = pfVar79[8];
  fVar16 = pfVar79[7];
  fVar17 = pfVar82[7];
  fVar18 = pfVar82[8];
  fVar19 = pfVar78[7];
  fVar20 = pfVar78[5];
  fVar21 = pfVar80[9];
  fVar22 = pfVar81[9];
  fVar23 = pfVar79[9];
  fVar24 = pfVar82[9];
  fVar25 = pfVar78[4];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[5];
  fVar28 = pfVar79[4];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar29 = pfVar80[4];
  fVar30 = pfVar80[5];
  fVar31 = pfVar78[8];
  fVar32 = pfVar79[8];
  fVar33 = pfVar79[7];
  fVar34 = pfVar80[7];
  fVar35 = pfVar80[8];
  fVar36 = pfVar78[7];
  fVar37 = pfVar78[5];
  fVar38 = pfVar79[9];
  fVar39 = pfVar80[9];
  fVar40 = pfVar78[4];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[8];
  fVar43 = pfVar78[7];
  fVar44 = pfVar78[5];
  fVar45 = pfVar78[4];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x3e
                      );
  *pSVar83 = (((fVar27 * fVar45 * fVar24 +
               fVar32 * fVar45 * fVar18 +
               fVar38 * fVar45 * fVar9 +
               (((((fVar28 * fVar44 * fVar24 +
                   fVar33 * fVar44 * fVar18 +
                   fVar32 * fVar44 * fVar17 +
                   fVar38 * fVar44 * fVar8 +
                   (((fVar27 * fVar43 * fVar18 +
                     fVar32 * fVar43 * fVar9 +
                     (((((fVar28 * fVar42 * fVar18 +
                         fVar27 * fVar42 * fVar17 +
                         fVar33 * fVar42 * fVar9 +
                         fVar32 * fVar42 * fVar8 +
                         (((fVar28 * fVar41 * fVar9 +
                           fVar27 * fVar41 * fVar8 +
                           fVar7 * fVar40 * fVar39 +
                           fVar15 * fVar40 * fVar35 +
                           fVar23 * fVar40 * fVar30 +
                           ((((fVar6 * fVar37 * fVar39 +
                              fVar16 * fVar37 * fVar35 +
                              fVar15 * fVar37 * fVar34 +
                              fVar23 * fVar37 * fVar29 +
                              (((((fVar36 * fVar7 * fVar35 +
                                  fVar15 * fVar36 * fVar30 +
                                  (((fVar31 * fVar6 * fVar35 +
                                    fVar7 * fVar31 * fVar34 +
                                    fVar16 * fVar31 * fVar30 +
                                    fVar15 * fVar31 * fVar29 +
                                    (((((fVar26 * fVar6 * fVar30 +
                                        fVar7 * fVar26 * fVar29 +
                                        ((((((fVar3 * fVar25 * fVar22 +
                                             fVar11 * fVar25 * fVar14 +
                                             fVar21 * fVar25 * fVar5 +
                                             (((((fVar2 * fVar20 * fVar22 +
                                                 fVar12 * fVar20 * fVar14 +
                                                 fVar11 * fVar20 * fVar13 +
                                                 fVar20 * fVar21 * fVar4 +
                                                 (((fVar3 * fVar19 * fVar14 +
                                                   fVar11 * fVar19 * fVar5 +
                                                   (((((fVar2 * fVar10 * fVar14 +
                                                       fVar3 * fVar10 * fVar13 +
                                                       fVar10 * fVar12 * fVar5 +
                                                       fVar10 * fVar11 * fVar4 +
                                                       (((fVar1 * fVar3 * fVar4 +
                                                         fVar1 * fVar2 * fVar5) -
                                                        fVar7 * fVar1 * fVar8) -
                                                       fVar1 * fVar6 * fVar9)) -
                                                      fVar15 * fVar10 * fVar8) -
                                                     fVar16 * fVar10 * fVar9) -
                                                    fVar7 * fVar10 * fVar17) -
                                                   fVar10 * fVar6 * fVar18)) -
                                                  fVar15 * fVar19 * fVar9) - fVar19 * fVar7 * fVar18
                                                 )) - fVar23 * fVar20 * fVar8) -
                                               fVar15 * fVar20 * fVar17) - fVar16 * fVar20 * fVar18)
                                             - fVar20 * fVar6 * fVar24)) - fVar23 * fVar25 * fVar9)
                                           - fVar15 * fVar25 * fVar18) - fVar25 * fVar7 * fVar24) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5)) -
                                       fVar32 * fVar31 * fVar4) - fVar33 * fVar31 * fVar5) -
                                     fVar27 * fVar31 * fVar13) - fVar28 * fVar31 * fVar14)) -
                                   fVar32 * fVar36 * fVar5) - fVar27 * fVar36 * fVar14)) -
                                 fVar38 * fVar37 * fVar4) - fVar32 * fVar37 * fVar13) -
                               fVar33 * fVar37 * fVar14) - fVar28 * fVar37 * fVar22)) -
                             fVar38 * fVar40 * fVar5) - fVar32 * fVar40 * fVar14) -
                           fVar27 * fVar40 * fVar22)) - fVar3 * fVar41 * fVar29) -
                         fVar41 * fVar2 * fVar30)) - fVar11 * fVar42 * fVar29) -
                       fVar12 * fVar42 * fVar30) - fVar3 * fVar42 * fVar34) -
                     fVar42 * fVar2 * fVar35)) - fVar11 * fVar43 * fVar30) - fVar43 * fVar3 * fVar35
                   )) - fVar21 * fVar44 * fVar29) - fVar11 * fVar44 * fVar34) -
                fVar12 * fVar44 * fVar35) - fVar2 * fVar44 * fVar39)) - fVar21 * fVar45 * fVar30) -
             fVar11 * fVar45 * fVar35) - fVar3 * fVar45 * fVar39;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[8];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar79[5];
  fVar5 = pfVar79[8];
  fVar6 = pfVar82[5];
  fVar7 = pfVar82[8];
  fVar8 = pfVar81[5];
  fVar9 = pfVar81[8];
  fVar10 = pfVar78[5];
  fVar11 = pfVar78[8];
  fVar12 = pfVar80[9];
  fVar13 = pfVar81[9];
  fVar14 = pfVar79[9];
  fVar15 = pfVar82[9];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[5];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar18 = pfVar80[5];
  fVar19 = pfVar79[8];
  fVar20 = pfVar78[8];
  fVar21 = pfVar80[8];
  fVar22 = pfVar78[5];
  fVar23 = pfVar79[9];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar24 = pfVar80[9];
  fVar25 = pfVar78[9];
  fVar26 = pfVar78[8];
  fVar27 = pfVar78[5];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x3f
                      );
  *pSVar83 = (((fVar17 * fVar27 * fVar15 +
               fVar19 * fVar27 * fVar7 +
               fVar23 * fVar27 * fVar6 +
               (((fVar17 * fVar26 * fVar7 +
                 fVar19 * fVar26 * fVar6 +
                 ((fVar17 * fVar25 * fVar6 +
                  fVar4 * fVar22 * fVar24 +
                  fVar5 * fVar22 * fVar21 +
                  fVar14 * fVar22 * fVar18 +
                  ((((fVar20 * fVar4 * fVar21 +
                     fVar5 * fVar20 * fVar18 +
                     (((fVar16 * fVar4 * fVar18 +
                       (((((fVar2 * fVar10 * fVar13 +
                           fVar3 * fVar10 * fVar9 +
                           fVar10 * fVar12 * fVar8 +
                           (((fVar2 * fVar11 * fVar9 +
                             fVar11 * fVar3 * fVar8 +
                             (fVar1 * fVar2 * fVar8 - fVar4 * fVar1 * fVar6)) -
                            fVar5 * fVar11 * fVar6) - fVar11 * fVar4 * fVar7)) -
                          fVar14 * fVar10 * fVar6) - fVar5 * fVar10 * fVar7) -
                        fVar10 * fVar4 * fVar15) - fVar17 * fVar16 * fVar8)) -
                      fVar19 * fVar20 * fVar8) - fVar17 * fVar20 * fVar9)) - fVar23 * fVar22 * fVar8
                    ) - fVar19 * fVar22 * fVar9) - fVar17 * fVar22 * fVar13)) -
                 fVar25 * fVar2 * fVar18)) - fVar3 * fVar26 * fVar18) - fVar26 * fVar2 * fVar21)) -
              fVar12 * fVar27 * fVar18) - fVar3 * fVar27 * fVar21) - fVar2 * fVar27 * fVar24;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = *pfVar75;
  fVar3 = pfVar75[6];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[6];
  fVar6 = *pfVar74;
  fVar7 = pfVar74[6];
  fVar8 = *pfVar77;
  fVar9 = pfVar77[6];
  fVar10 = *pfVar73;
  fVar11 = pfVar73[6];
  fVar12 = pfVar75[9];
  fVar13 = pfVar76[9];
  fVar14 = pfVar74[9];
  fVar15 = pfVar77[9];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[9];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar74[6];
  fVar18 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar19 = *pfVar75;
  fVar20 = pfVar75[6];
  fVar21 = pfVar73[6];
  fVar22 = pfVar74[9];
  fVar23 = pfVar75[9];
  fVar24 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar73[9];
  fVar26 = pfVar73[6];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x40
                      );
  *pSVar83 = ((fVar17 * fVar27 * fVar15 +
              fVar22 * fVar27 * fVar9 +
              ((((fVar18 * fVar26 * fVar15 +
                 fVar17 * fVar26 * fVar9 +
                 fVar22 * fVar26 * fVar8 +
                 (((fVar18 * fVar25 * fVar9 +
                   fVar17 * fVar25 * fVar8 +
                   fVar7 * fVar24 * fVar23 +
                   fVar14 * fVar24 * fVar20 +
                   (((fVar6 * fVar21 * fVar23 +
                     fVar7 * fVar21 * fVar20 +
                     fVar14 * fVar21 * fVar19 +
                     ((((fVar16 * fVar6 * fVar20 +
                        fVar7 * fVar16 * fVar19 +
                        (((((fVar3 * fVar10 * fVar13 +
                            fVar12 * fVar10 * fVar5 +
                            ((((fVar2 * fVar11 * fVar13 +
                               fVar3 * fVar11 * fVar5 +
                               fVar11 * fVar12 * fVar4 +
                               (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                              fVar14 * fVar11 * fVar8) - fVar7 * fVar11 * fVar9) -
                            fVar11 * fVar6 * fVar15)) - fVar14 * fVar10 * fVar9) -
                          fVar10 * fVar7 * fVar15) - fVar17 * fVar16 * fVar4) -
                        fVar18 * fVar16 * fVar5)) - fVar22 * fVar21 * fVar4) -
                      fVar17 * fVar21 * fVar5) - fVar18 * fVar21 * fVar13)) -
                    fVar22 * fVar24 * fVar5) - fVar17 * fVar24 * fVar13)) - fVar3 * fVar25 * fVar19)
                 - fVar25 * fVar2 * fVar20)) - fVar12 * fVar26 * fVar19) - fVar3 * fVar26 * fVar20)
              - fVar2 * fVar26 * fVar23)) - fVar12 * fVar27 * fVar20) - fVar3 * fVar27 * fVar23;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[7];
  fVar3 = pfVar75[6];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[1];
  fVar6 = *pfVar75;
  fVar7 = pfVar75[1];
  fVar8 = pfVar76[6];
  fVar9 = pfVar76[7];
  fVar10 = pfVar74[7];
  fVar11 = *pfVar77;
  fVar12 = pfVar77[1];
  fVar13 = pfVar74[6];
  fVar14 = pfVar74[1];
  fVar15 = pfVar77[6];
  fVar16 = *pfVar74;
  fVar17 = pfVar77[7];
  fVar18 = pfVar73[7];
  fVar19 = pfVar75[9];
  fVar20 = pfVar76[9];
  fVar21 = pfVar74[9];
  fVar22 = pfVar77[9];
  fVar23 = pfVar73[6];
  fVar24 = pfVar73[1];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[9];
  fVar27 = pfVar74[7];
  fVar28 = pfVar74[6];
  fVar29 = pfVar74[1];
  fVar30 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = *pfVar75;
  fVar32 = pfVar75[1];
  fVar33 = pfVar75[6];
  fVar34 = pfVar75[7];
  fVar35 = pfVar73[7];
  fVar36 = pfVar74[9];
  fVar37 = pfVar75[9];
  fVar38 = pfVar73[6];
  fVar39 = pfVar73[1];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[9];
  fVar42 = pfVar73[7];
  fVar43 = pfVar73[6];
  fVar44 = pfVar73[1];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x41
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                (((((fVar29 * fVar43 * fVar22 +
                    fVar28 * fVar43 * fVar17 +
                    fVar27 * fVar43 * fVar15 +
                    fVar36 * fVar43 * fVar12 +
                    ((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar13 * fVar38 * fVar34 +
                               fVar10 * fVar38 * fVar33 +
                               fVar21 * fVar38 * fVar32 +
                               (((((fVar16 * fVar35 * fVar37 +
                                   fVar13 * fVar35 * fVar33 +
                                   fVar21 * fVar35 * fVar31 +
                                   ((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              (((((fVar7 * fVar23 * fVar20 +
                                                  fVar3 * fVar23 * fVar9 +
                                                  fVar2 * fVar23 * fVar8 +
                                                  fVar19 * fVar23 * fVar5 +
                                                  ((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar13 * fVar18 * fVar15) -
                                                  fVar18 * fVar16 * fVar22)) -
                                                 fVar21 * fVar23 * fVar12) -
                                                fVar10 * fVar23 * fVar15) - fVar13 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar28 * fVar35 * fVar8) -
                                   fVar30 * fVar35 * fVar20)) - fVar36 * fVar38 * fVar5) -
                                 fVar27 * fVar38 * fVar8) - fVar28 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar3 * fVar42 * fVar33) - fVar6 * fVar42 * fVar37)) - fVar19 * fVar43 * fVar32
                   ) - fVar2 * fVar43 * fVar33) - fVar3 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37
                )) - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) -
             fVar19 * fVar45 * fVar34) - fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[7];
  fVar3 = pfVar80[6];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[2];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[2];
  fVar8 = pfVar81[6];
  fVar9 = pfVar81[7];
  fVar10 = pfVar79[7];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[2];
  fVar13 = pfVar79[6];
  fVar14 = pfVar79[2];
  fVar15 = pfVar82[6];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[7];
  fVar18 = pfVar78[7];
  fVar19 = pfVar80[9];
  fVar20 = pfVar81[9];
  fVar21 = pfVar79[9];
  fVar22 = pfVar82[9];
  fVar23 = pfVar78[6];
  fVar24 = pfVar78[2];
  fVar25 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[7];
  fVar28 = pfVar79[6];
  fVar29 = pfVar79[2];
  fVar30 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar80[1];
  fVar32 = pfVar80[2];
  fVar33 = pfVar80[6];
  fVar34 = pfVar80[7];
  fVar35 = pfVar78[7];
  fVar36 = pfVar79[9];
  fVar37 = pfVar80[9];
  fVar38 = pfVar78[6];
  fVar39 = pfVar78[2];
  fVar40 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[7];
  fVar43 = pfVar78[6];
  fVar44 = pfVar78[2];
  fVar45 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x42
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                ((((fVar29 * fVar43 * fVar22 +
                   fVar27 * fVar43 * fVar17 +
                   fVar36 * fVar43 * fVar12 +
                   (((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar17 +
                       fVar27 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar10 * fVar38 * fVar34 +
                               fVar21 * fVar38 * fVar32 +
                               ((((fVar16 * fVar35 * fVar37 +
                                  fVar13 * fVar35 * fVar34 +
                                  fVar10 * fVar35 * fVar33 +
                                  fVar21 * fVar35 * fVar31 +
                                  (((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              ((((fVar7 * fVar23 * fVar20 +
                                                 fVar2 * fVar23 * fVar9 +
                                                 fVar19 * fVar23 * fVar5 +
                                                 (((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar9 +
                                                     fVar2 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar10 * fVar18 * fVar15) -
                                                  fVar13 * fVar18 * fVar17) -
                                                 fVar18 * fVar16 * fVar22)) -
                                                fVar21 * fVar23 * fVar12) - fVar10 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar27 * fVar35 * fVar8) -
                                   fVar28 * fVar35 * fVar9) - fVar30 * fVar35 * fVar20)) -
                                 fVar36 * fVar38 * fVar5) - fVar27 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar2 * fVar42 * fVar33) - fVar3 * fVar42 * fVar34) - fVar6 * fVar42 * fVar37))
                  - fVar19 * fVar43 * fVar32) - fVar2 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37))
               - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) - fVar19 * fVar45 * fVar34) -
             fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[2];
  fVar3 = pfVar80[7];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[2];
  fVar5 = pfVar81[7];
  fVar6 = pfVar79[2];
  fVar7 = pfVar79[7];
  fVar8 = pfVar82[2];
  fVar9 = pfVar82[7];
  fVar10 = pfVar78[2];
  fVar11 = pfVar78[7];
  fVar12 = pfVar80[9];
  fVar13 = pfVar81[9];
  fVar14 = pfVar79[9];
  fVar15 = pfVar82[9];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[7];
  fVar18 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar19 = pfVar80[2];
  fVar20 = pfVar80[7];
  fVar21 = pfVar78[7];
  fVar22 = pfVar79[9];
  fVar23 = pfVar80[9];
  fVar24 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar78[9];
  fVar26 = pfVar78[7];
  fVar27 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x43
                      );
  *pSVar83 = ((fVar17 * fVar27 * fVar15 +
              fVar22 * fVar27 * fVar9 +
              ((((fVar18 * fVar26 * fVar15 +
                 fVar17 * fVar26 * fVar9 +
                 fVar22 * fVar26 * fVar8 +
                 (((fVar18 * fVar25 * fVar9 +
                   fVar17 * fVar25 * fVar8 +
                   fVar7 * fVar24 * fVar23 +
                   fVar14 * fVar24 * fVar20 +
                   (((fVar6 * fVar21 * fVar23 +
                     fVar7 * fVar21 * fVar20 +
                     fVar14 * fVar21 * fVar19 +
                     ((((fVar16 * fVar6 * fVar20 +
                        fVar7 * fVar16 * fVar19 +
                        (((((fVar3 * fVar10 * fVar13 +
                            fVar12 * fVar10 * fVar5 +
                            ((((fVar2 * fVar11 * fVar13 +
                               fVar3 * fVar11 * fVar5 +
                               fVar11 * fVar12 * fVar4 +
                               (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                              fVar14 * fVar11 * fVar8) - fVar7 * fVar11 * fVar9) -
                            fVar11 * fVar6 * fVar15)) - fVar14 * fVar10 * fVar9) -
                          fVar10 * fVar7 * fVar15) - fVar17 * fVar16 * fVar4) -
                        fVar18 * fVar16 * fVar5)) - fVar22 * fVar21 * fVar4) -
                      fVar17 * fVar21 * fVar5) - fVar18 * fVar21 * fVar13)) -
                    fVar22 * fVar24 * fVar5) - fVar17 * fVar24 * fVar13)) - fVar3 * fVar25 * fVar19)
                 - fVar25 * fVar2 * fVar20)) - fVar12 * fVar26 * fVar19) - fVar3 * fVar26 * fVar20)
              - fVar2 * fVar26 * fVar23)) - fVar12 * fVar27 * fVar20) - fVar3 * fVar27 * fVar23;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[8];
  fVar3 = pfVar75[6];
  pfVar76 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar77 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = *pfVar76;
  fVar5 = pfVar76[3];
  fVar6 = *pfVar75;
  fVar7 = pfVar75[3];
  fVar8 = pfVar76[6];
  fVar9 = pfVar76[8];
  fVar10 = pfVar74[8];
  fVar11 = *pfVar77;
  fVar12 = pfVar77[3];
  fVar13 = pfVar74[6];
  fVar14 = pfVar74[3];
  fVar15 = pfVar77[6];
  fVar16 = *pfVar74;
  fVar17 = pfVar77[8];
  fVar18 = pfVar73[8];
  fVar19 = pfVar75[9];
  fVar20 = pfVar76[9];
  fVar21 = pfVar74[9];
  fVar22 = pfVar77[9];
  fVar23 = pfVar73[6];
  fVar24 = pfVar73[3];
  fVar25 = *pfVar73;
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar73[9];
  fVar27 = pfVar74[8];
  fVar28 = pfVar74[6];
  fVar29 = pfVar74[3];
  fVar30 = *pfVar74;
  pfVar75 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = *pfVar75;
  fVar32 = pfVar75[3];
  fVar33 = pfVar75[6];
  fVar34 = pfVar75[8];
  fVar35 = pfVar73[8];
  fVar36 = pfVar74[9];
  fVar37 = pfVar75[9];
  fVar38 = pfVar73[6];
  fVar39 = pfVar73[3];
  fVar40 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar73[9];
  fVar42 = pfVar73[8];
  fVar43 = pfVar73[6];
  fVar44 = pfVar73[3];
  fVar45 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x44
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                (((((fVar29 * fVar43 * fVar22 +
                    fVar28 * fVar43 * fVar17 +
                    fVar27 * fVar43 * fVar15 +
                    fVar36 * fVar43 * fVar12 +
                    ((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar13 * fVar38 * fVar34 +
                               fVar10 * fVar38 * fVar33 +
                               fVar21 * fVar38 * fVar32 +
                               (((((fVar16 * fVar35 * fVar37 +
                                   fVar13 * fVar35 * fVar33 +
                                   fVar21 * fVar35 * fVar31 +
                                   ((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              (((((fVar7 * fVar23 * fVar20 +
                                                  fVar3 * fVar23 * fVar9 +
                                                  fVar2 * fVar23 * fVar8 +
                                                  fVar19 * fVar23 * fVar5 +
                                                  ((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar13 * fVar18 * fVar15) -
                                                  fVar18 * fVar16 * fVar22)) -
                                                 fVar21 * fVar23 * fVar12) -
                                                fVar10 * fVar23 * fVar15) - fVar13 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar28 * fVar35 * fVar8) -
                                   fVar30 * fVar35 * fVar20)) - fVar36 * fVar38 * fVar5) -
                                 fVar27 * fVar38 * fVar8) - fVar28 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar3 * fVar42 * fVar33) - fVar6 * fVar42 * fVar37)) - fVar19 * fVar43 * fVar32
                   ) - fVar2 * fVar43 * fVar33) - fVar3 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37
                )) - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) -
             fVar19 * fVar45 * fVar34) - fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[8];
  fVar3 = pfVar80[7];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[3];
  fVar6 = pfVar80[6];
  fVar7 = pfVar81[4];
  fVar8 = pfVar80[4];
  fVar9 = pfVar81[6];
  fVar10 = pfVar80[1];
  fVar11 = pfVar80[3];
  fVar12 = pfVar81[7];
  fVar13 = pfVar81[8];
  fVar14 = pfVar79[8];
  fVar15 = pfVar82[1];
  fVar16 = pfVar79[7];
  fVar17 = pfVar82[3];
  fVar18 = pfVar79[6];
  fVar19 = pfVar82[4];
  fVar20 = pfVar79[4];
  fVar21 = pfVar82[6];
  fVar22 = pfVar79[3];
  fVar23 = pfVar82[7];
  fVar24 = pfVar79[1];
  fVar25 = pfVar82[8];
  fVar26 = pfVar78[8];
  fVar27 = pfVar80[9];
  fVar28 = pfVar81[9];
  fVar29 = pfVar79[9];
  fVar30 = pfVar82[9];
  fVar31 = pfVar78[7];
  fVar32 = pfVar78[6];
  fVar33 = pfVar78[4];
  fVar34 = pfVar78[3];
  fVar35 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar36 = pfVar78[9];
  fVar37 = pfVar79[8];
  fVar38 = pfVar79[7];
  fVar39 = pfVar79[6];
  fVar40 = pfVar79[4];
  fVar41 = pfVar79[3];
  fVar42 = pfVar79[1];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar43 = pfVar80[1];
  fVar44 = pfVar80[3];
  fVar45 = pfVar80[4];
  fVar46 = pfVar80[6];
  fVar47 = pfVar80[7];
  fVar48 = pfVar80[8];
  fVar49 = pfVar78[8];
  fVar50 = pfVar79[9];
  fVar51 = pfVar80[9];
  fVar52 = pfVar78[7];
  fVar53 = pfVar78[6];
  fVar54 = pfVar78[4];
  fVar55 = pfVar78[3];
  fVar56 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar57 = pfVar78[9];
  fVar58 = pfVar78[8];
  fVar59 = pfVar78[7];
  fVar60 = pfVar78[6];
  fVar61 = pfVar78[4];
  fVar62 = pfVar78[3];
  fVar63 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x45
                      );
  *pSVar83 = ((fVar37 * fVar63 * fVar30 +
              fVar50 * fVar63 * fVar25 +
              (((fVar38 * fVar62 * fVar30 +
                fVar50 * fVar62 * fVar23 +
                (((fVar39 * fVar61 * fVar30 +
                  fVar50 * fVar61 * fVar21 +
                  (((((fVar40 * fVar60 * fVar30 +
                      fVar38 * fVar60 * fVar25 +
                      fVar37 * fVar60 * fVar23 +
                      fVar50 * fVar60 * fVar19 +
                      (((((fVar41 * fVar59 * fVar30 +
                          fVar39 * fVar59 * fVar25 +
                          fVar37 * fVar59 * fVar21 +
                          fVar50 * fVar59 * fVar17 +
                          (((((fVar42 * fVar58 * fVar30 +
                              fVar39 * fVar58 * fVar23 +
                              fVar38 * fVar58 * fVar21 +
                              fVar50 * fVar58 * fVar15 +
                              (((((((fVar42 * fVar57 * fVar25 +
                                    fVar41 * fVar57 * fVar23 +
                                    fVar40 * fVar57 * fVar21 +
                                    fVar39 * fVar57 * fVar19 +
                                    fVar38 * fVar57 * fVar17 +
                                    fVar37 * fVar57 * fVar15 +
                                    fVar14 * fVar56 * fVar51 +
                                    fVar29 * fVar56 * fVar48 +
                                    (((fVar16 * fVar55 * fVar51 +
                                      fVar29 * fVar55 * fVar47 +
                                      (((fVar18 * fVar54 * fVar51 +
                                        fVar29 * fVar54 * fVar46 +
                                        (((fVar20 * fVar53 * fVar51 +
                                          fVar16 * fVar53 * fVar48 +
                                          fVar14 * fVar53 * fVar47 +
                                          fVar29 * fVar53 * fVar45 +
                                          (((((fVar22 * fVar52 * fVar51 +
                                              fVar18 * fVar52 * fVar48 +
                                              fVar14 * fVar52 * fVar46 +
                                              fVar29 * fVar52 * fVar44 +
                                              (((((fVar24 * fVar49 * fVar51 +
                                                  fVar18 * fVar49 * fVar47 +
                                                  fVar16 * fVar49 * fVar46 +
                                                  fVar29 * fVar49 * fVar43 +
                                                  (((((fVar36 * fVar24 * fVar48 +
                                                      fVar22 * fVar36 * fVar47 +
                                                      fVar20 * fVar36 * fVar46 +
                                                      fVar18 * fVar36 * fVar45 +
                                                      fVar16 * fVar36 * fVar44 +
                                                      fVar14 * fVar36 * fVar43 +
                                                      (((((((((fVar2 * fVar35 * fVar28 +
                                                              fVar27 * fVar35 * fVar13 +
                                                              (((fVar3 * fVar34 * fVar28 +
                                                                fVar27 * fVar34 * fVar12 +
                                                                (((fVar6 * fVar33 * fVar28 +
                                                                  fVar27 * fVar33 * fVar9 +
                                                                  (((((fVar8 * fVar32 * fVar28 +
                                                                      fVar3 * fVar32 * fVar13 +
                                                                      fVar2 * fVar32 * fVar12 +
                                                                      fVar27 * fVar32 * fVar7 +
                                                                      (((((fVar11 * fVar31 * fVar28
                                                                          + fVar6 * fVar31 * fVar13
                                                                            + fVar2 * fVar31 * fVar9
                                                                              + fVar27 * fVar31 *
                                                                                fVar5 + (((((fVar10 
                                                  * fVar26 * fVar28 +
                                                  fVar6 * fVar26 * fVar12 +
                                                  fVar3 * fVar26 * fVar9 +
                                                  fVar26 * fVar27 * fVar4 +
                                                  (((((((fVar1 * fVar10 * fVar13 +
                                                        fVar1 * fVar11 * fVar12 +
                                                        fVar1 * fVar8 * fVar9 +
                                                        fVar1 * fVar6 * fVar7 +
                                                        fVar1 * fVar2 * fVar4 +
                                                        fVar1 * fVar3 * fVar5) -
                                                       fVar14 * fVar1 * fVar15) -
                                                      fVar16 * fVar1 * fVar17) -
                                                     fVar18 * fVar1 * fVar19) -
                                                    fVar20 * fVar1 * fVar21) -
                                                   fVar22 * fVar1 * fVar23) -
                                                  fVar1 * fVar24 * fVar25)) -
                                                  fVar29 * fVar26 * fVar15) -
                                                  fVar16 * fVar26 * fVar21) -
                                                  fVar18 * fVar26 * fVar23) -
                                                  fVar26 * fVar24 * fVar30)) -
                                                  fVar29 * fVar31 * fVar17) -
                                                  fVar14 * fVar31 * fVar21) -
                                                  fVar18 * fVar31 * fVar25) -
                                                  fVar31 * fVar22 * fVar30)) -
                                                  fVar29 * fVar32 * fVar19) -
                                                  fVar14 * fVar32 * fVar23) -
                                                  fVar16 * fVar32 * fVar25) -
                                                  fVar32 * fVar20 * fVar30)) -
                                                  fVar29 * fVar33 * fVar21) -
                                                  fVar33 * fVar18 * fVar30)) -
                                                  fVar29 * fVar34 * fVar23) -
                                                  fVar34 * fVar16 * fVar30)) -
                                                  fVar29 * fVar35 * fVar25) -
                                                  fVar35 * fVar14 * fVar30) -
                                                  fVar37 * fVar36 * fVar4) - fVar38 * fVar36 * fVar5
                                                  ) - fVar39 * fVar36 * fVar7) -
                                                  fVar40 * fVar36 * fVar9) -
                                                  fVar41 * fVar36 * fVar12) -
                                                  fVar42 * fVar36 * fVar13)) -
                                                  fVar50 * fVar49 * fVar4) - fVar38 * fVar49 * fVar9
                                                  ) - fVar39 * fVar49 * fVar12) -
                                                  fVar42 * fVar49 * fVar28)) -
                                                 fVar50 * fVar52 * fVar5) - fVar37 * fVar52 * fVar9)
                                               - fVar39 * fVar52 * fVar13) -
                                              fVar41 * fVar52 * fVar28)) - fVar50 * fVar53 * fVar7)
                                            - fVar37 * fVar53 * fVar12) - fVar38 * fVar53 * fVar13)
                                          - fVar40 * fVar53 * fVar28)) - fVar50 * fVar54 * fVar9) -
                                        fVar39 * fVar54 * fVar28)) - fVar50 * fVar55 * fVar12) -
                                      fVar38 * fVar55 * fVar28)) - fVar50 * fVar56 * fVar13) -
                                    fVar37 * fVar56 * fVar28)) - fVar2 * fVar57 * fVar43) -
                                  fVar3 * fVar57 * fVar44) - fVar6 * fVar57 * fVar45) -
                                fVar8 * fVar57 * fVar46) - fVar11 * fVar57 * fVar47) -
                              fVar57 * fVar10 * fVar48)) - fVar27 * fVar58 * fVar43) -
                            fVar3 * fVar58 * fVar46) - fVar6 * fVar58 * fVar47) -
                          fVar10 * fVar58 * fVar51)) - fVar27 * fVar59 * fVar44) -
                        fVar2 * fVar59 * fVar46) - fVar6 * fVar59 * fVar48) -
                      fVar11 * fVar59 * fVar51)) - fVar27 * fVar60 * fVar45) -
                    fVar2 * fVar60 * fVar47) - fVar3 * fVar60 * fVar48) - fVar8 * fVar60 * fVar51))
                 - fVar27 * fVar61 * fVar46) - fVar6 * fVar61 * fVar51)) - fVar27 * fVar62 * fVar47)
              - fVar3 * fVar62 * fVar51)) - fVar27 * fVar63 * fVar48) - fVar2 * fVar63 * fVar51;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[8];
  fVar3 = pfVar80[7];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[2];
  fVar5 = pfVar81[4];
  fVar6 = pfVar80[2];
  fVar7 = pfVar80[4];
  fVar8 = pfVar81[7];
  fVar9 = pfVar81[8];
  fVar10 = pfVar79[8];
  fVar11 = pfVar82[2];
  fVar12 = pfVar82[4];
  fVar13 = pfVar79[7];
  fVar14 = pfVar79[4];
  fVar15 = pfVar82[7];
  fVar16 = pfVar79[2];
  fVar17 = pfVar82[8];
  fVar18 = pfVar78[8];
  fVar19 = pfVar80[9];
  fVar20 = pfVar81[9];
  fVar21 = pfVar79[9];
  fVar22 = pfVar82[9];
  fVar23 = pfVar78[7];
  fVar24 = pfVar78[4];
  fVar25 = pfVar78[2];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[8];
  fVar28 = pfVar79[7];
  fVar29 = pfVar79[4];
  fVar30 = pfVar79[2];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar80[2];
  fVar32 = pfVar80[4];
  fVar33 = pfVar80[7];
  fVar34 = pfVar80[8];
  fVar35 = pfVar78[8];
  fVar36 = pfVar79[9];
  fVar37 = pfVar80[9];
  fVar38 = pfVar78[7];
  fVar39 = pfVar78[4];
  fVar40 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[8];
  fVar43 = pfVar78[7];
  fVar44 = pfVar78[4];
  fVar45 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x46
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                (((((fVar29 * fVar43 * fVar22 +
                    fVar28 * fVar43 * fVar17 +
                    fVar27 * fVar43 * fVar15 +
                    fVar36 * fVar43 * fVar12 +
                    ((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar13 * fVar38 * fVar34 +
                               fVar10 * fVar38 * fVar33 +
                               fVar21 * fVar38 * fVar32 +
                               (((((fVar16 * fVar35 * fVar37 +
                                   fVar13 * fVar35 * fVar33 +
                                   fVar21 * fVar35 * fVar31 +
                                   ((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              (((((fVar7 * fVar23 * fVar20 +
                                                  fVar3 * fVar23 * fVar9 +
                                                  fVar2 * fVar23 * fVar8 +
                                                  fVar19 * fVar23 * fVar5 +
                                                  ((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar13 * fVar18 * fVar15) -
                                                  fVar18 * fVar16 * fVar22)) -
                                                 fVar21 * fVar23 * fVar12) -
                                                fVar10 * fVar23 * fVar15) - fVar13 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar28 * fVar35 * fVar8) -
                                   fVar30 * fVar35 * fVar20)) - fVar36 * fVar38 * fVar5) -
                                 fVar27 * fVar38 * fVar8) - fVar28 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar3 * fVar42 * fVar33) - fVar6 * fVar42 * fVar37)) - fVar19 * fVar43 * fVar32
                   ) - fVar2 * fVar43 * fVar33) - fVar3 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37
                )) - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) -
             fVar19 * fVar45 * fVar34) - fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[8];
  fVar3 = pfVar80[6];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[3];
  fVar5 = pfVar81[5];
  fVar6 = pfVar80[3];
  fVar7 = pfVar80[5];
  fVar8 = pfVar81[6];
  fVar9 = pfVar81[8];
  fVar10 = pfVar79[8];
  fVar11 = pfVar82[3];
  fVar12 = pfVar82[5];
  fVar13 = pfVar79[6];
  fVar14 = pfVar79[5];
  fVar15 = pfVar82[6];
  fVar16 = pfVar79[3];
  fVar17 = pfVar82[8];
  fVar18 = pfVar78[8];
  fVar19 = pfVar80[9];
  fVar20 = pfVar81[9];
  fVar21 = pfVar79[9];
  fVar22 = pfVar82[9];
  fVar23 = pfVar78[6];
  fVar24 = pfVar78[5];
  fVar25 = pfVar78[3];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[8];
  fVar28 = pfVar79[6];
  fVar29 = pfVar79[5];
  fVar30 = pfVar79[3];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar80[3];
  fVar32 = pfVar80[5];
  fVar33 = pfVar80[6];
  fVar34 = pfVar80[8];
  fVar35 = pfVar78[8];
  fVar36 = pfVar79[9];
  fVar37 = pfVar80[9];
  fVar38 = pfVar78[6];
  fVar39 = pfVar78[5];
  fVar40 = pfVar78[3];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[8];
  fVar43 = pfVar78[6];
  fVar44 = pfVar78[5];
  fVar45 = pfVar78[3];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x47
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                ((((fVar29 * fVar43 * fVar22 +
                   fVar27 * fVar43 * fVar17 +
                   fVar36 * fVar43 * fVar12 +
                   (((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar17 +
                       fVar27 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar10 * fVar38 * fVar34 +
                               fVar21 * fVar38 * fVar32 +
                               ((((fVar16 * fVar35 * fVar37 +
                                  fVar13 * fVar35 * fVar34 +
                                  fVar10 * fVar35 * fVar33 +
                                  fVar21 * fVar35 * fVar31 +
                                  (((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              ((((fVar7 * fVar23 * fVar20 +
                                                 fVar2 * fVar23 * fVar9 +
                                                 fVar19 * fVar23 * fVar5 +
                                                 (((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar9 +
                                                     fVar2 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar10 * fVar18 * fVar15) -
                                                  fVar13 * fVar18 * fVar17) -
                                                 fVar18 * fVar16 * fVar22)) -
                                                fVar21 * fVar23 * fVar12) - fVar10 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar27 * fVar35 * fVar8) -
                                   fVar28 * fVar35 * fVar9) - fVar30 * fVar35 * fVar20)) -
                                 fVar36 * fVar38 * fVar5) - fVar27 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar2 * fVar42 * fVar33) - fVar3 * fVar42 * fVar34) - fVar6 * fVar42 * fVar37))
                  - fVar19 * fVar43 * fVar32) - fVar2 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37))
               - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) - fVar19 * fVar45 * fVar34) -
             fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[8];
  fVar3 = pfVar80[7];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[4];
  fVar5 = pfVar81[5];
  fVar6 = pfVar80[4];
  fVar7 = pfVar80[5];
  fVar8 = pfVar81[7];
  fVar9 = pfVar81[8];
  fVar10 = pfVar79[8];
  fVar11 = pfVar82[4];
  fVar12 = pfVar82[5];
  fVar13 = pfVar79[7];
  fVar14 = pfVar79[5];
  fVar15 = pfVar82[7];
  fVar16 = pfVar79[4];
  fVar17 = pfVar82[8];
  fVar18 = pfVar78[8];
  fVar19 = pfVar80[9];
  fVar20 = pfVar81[9];
  fVar21 = pfVar79[9];
  fVar22 = pfVar82[9];
  fVar23 = pfVar78[7];
  fVar24 = pfVar78[5];
  fVar25 = pfVar78[4];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar78[9];
  fVar27 = pfVar79[8];
  fVar28 = pfVar79[7];
  fVar29 = pfVar79[5];
  fVar30 = pfVar79[4];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar31 = pfVar80[4];
  fVar32 = pfVar80[5];
  fVar33 = pfVar80[7];
  fVar34 = pfVar80[8];
  fVar35 = pfVar78[8];
  fVar36 = pfVar79[9];
  fVar37 = pfVar80[9];
  fVar38 = pfVar78[7];
  fVar39 = pfVar78[5];
  fVar40 = pfVar78[4];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar41 = pfVar78[9];
  fVar42 = pfVar78[8];
  fVar43 = pfVar78[7];
  fVar44 = pfVar78[5];
  fVar45 = pfVar78[4];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x48
                      );
  *pSVar83 = ((fVar27 * fVar45 * fVar22 +
              fVar36 * fVar45 * fVar17 +
              (((fVar28 * fVar44 * fVar22 +
                fVar36 * fVar44 * fVar15 +
                ((((fVar29 * fVar43 * fVar22 +
                   fVar27 * fVar43 * fVar17 +
                   fVar36 * fVar43 * fVar12 +
                   (((((fVar30 * fVar42 * fVar22 +
                       fVar28 * fVar42 * fVar17 +
                       fVar27 * fVar42 * fVar15 +
                       fVar36 * fVar42 * fVar11 +
                       (((((fVar30 * fVar41 * fVar17 +
                           fVar29 * fVar41 * fVar15 +
                           fVar28 * fVar41 * fVar12 +
                           fVar27 * fVar41 * fVar11 +
                           fVar10 * fVar40 * fVar37 +
                           fVar21 * fVar40 * fVar34 +
                           (((fVar13 * fVar39 * fVar37 +
                             fVar21 * fVar39 * fVar33 +
                             (((fVar14 * fVar38 * fVar37 +
                               fVar10 * fVar38 * fVar34 +
                               fVar21 * fVar38 * fVar32 +
                               ((((fVar16 * fVar35 * fVar37 +
                                  fVar13 * fVar35 * fVar34 +
                                  fVar10 * fVar35 * fVar33 +
                                  fVar21 * fVar35 * fVar31 +
                                  (((((fVar26 * fVar16 * fVar34 +
                                      fVar14 * fVar26 * fVar33 +
                                      fVar13 * fVar26 * fVar32 +
                                      fVar10 * fVar26 * fVar31 +
                                      (((((((fVar2 * fVar25 * fVar20 +
                                            fVar19 * fVar25 * fVar9 +
                                            (((fVar3 * fVar24 * fVar20 +
                                              fVar19 * fVar24 * fVar8 +
                                              ((((fVar7 * fVar23 * fVar20 +
                                                 fVar2 * fVar23 * fVar9 +
                                                 fVar19 * fVar23 * fVar5 +
                                                 (((((fVar6 * fVar18 * fVar20 +
                                                     fVar3 * fVar18 * fVar9 +
                                                     fVar2 * fVar18 * fVar8 +
                                                     fVar18 * fVar19 * fVar4 +
                                                     (((((fVar1 * fVar6 * fVar9 +
                                                         fVar1 * fVar7 * fVar8 +
                                                         fVar1 * fVar2 * fVar4 +
                                                         fVar1 * fVar3 * fVar5) -
                                                        fVar10 * fVar1 * fVar11) -
                                                       fVar13 * fVar1 * fVar12) -
                                                      fVar14 * fVar1 * fVar15) -
                                                     fVar1 * fVar16 * fVar17)) -
                                                    fVar21 * fVar18 * fVar11) -
                                                   fVar10 * fVar18 * fVar15) -
                                                  fVar13 * fVar18 * fVar17) -
                                                 fVar18 * fVar16 * fVar22)) -
                                                fVar21 * fVar23 * fVar12) - fVar10 * fVar23 * fVar17
                                               ) - fVar23 * fVar14 * fVar22)) -
                                             fVar21 * fVar24 * fVar15) - fVar24 * fVar13 * fVar22))
                                           - fVar21 * fVar25 * fVar17) - fVar25 * fVar10 * fVar22) -
                                         fVar27 * fVar26 * fVar4) - fVar28 * fVar26 * fVar5) -
                                       fVar29 * fVar26 * fVar8) - fVar30 * fVar26 * fVar9)) -
                                     fVar36 * fVar35 * fVar4) - fVar27 * fVar35 * fVar8) -
                                   fVar28 * fVar35 * fVar9) - fVar30 * fVar35 * fVar20)) -
                                 fVar36 * fVar38 * fVar5) - fVar27 * fVar38 * fVar9) -
                               fVar29 * fVar38 * fVar20)) - fVar36 * fVar39 * fVar8) -
                             fVar28 * fVar39 * fVar20)) - fVar36 * fVar40 * fVar9) -
                           fVar27 * fVar40 * fVar20)) - fVar2 * fVar41 * fVar31) -
                         fVar3 * fVar41 * fVar32) - fVar7 * fVar41 * fVar33) -
                       fVar41 * fVar6 * fVar34)) - fVar19 * fVar42 * fVar31) -
                     fVar2 * fVar42 * fVar33) - fVar3 * fVar42 * fVar34) - fVar6 * fVar42 * fVar37))
                  - fVar19 * fVar43 * fVar32) - fVar2 * fVar43 * fVar34) - fVar7 * fVar43 * fVar37))
               - fVar19 * fVar44 * fVar33) - fVar3 * fVar44 * fVar37)) - fVar19 * fVar45 * fVar34) -
             fVar2 * fVar45 * fVar37;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[5];
  fVar3 = pfVar80[8];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[5];
  fVar5 = pfVar81[8];
  fVar6 = pfVar79[5];
  fVar7 = pfVar79[8];
  fVar8 = pfVar82[5];
  fVar9 = pfVar82[8];
  fVar10 = pfVar78[5];
  fVar11 = pfVar78[8];
  fVar12 = pfVar80[9];
  fVar13 = pfVar81[9];
  fVar14 = pfVar79[9];
  fVar15 = pfVar82[9];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[8];
  fVar18 = pfVar79[5];
  pfVar80 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar19 = pfVar80[5];
  fVar20 = pfVar80[8];
  fVar21 = pfVar78[8];
  fVar22 = pfVar79[9];
  fVar23 = pfVar80[9];
  fVar24 = pfVar78[5];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar78[9];
  fVar26 = pfVar78[8];
  fVar27 = pfVar78[5];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x49
                      );
  *pSVar83 = ((fVar17 * fVar27 * fVar15 +
              fVar22 * fVar27 * fVar9 +
              ((((fVar18 * fVar26 * fVar15 +
                 fVar17 * fVar26 * fVar9 +
                 fVar22 * fVar26 * fVar8 +
                 (((fVar18 * fVar25 * fVar9 +
                   fVar17 * fVar25 * fVar8 +
                   fVar7 * fVar24 * fVar23 +
                   fVar14 * fVar24 * fVar20 +
                   (((fVar6 * fVar21 * fVar23 +
                     fVar7 * fVar21 * fVar20 +
                     fVar14 * fVar21 * fVar19 +
                     ((((fVar16 * fVar6 * fVar20 +
                        fVar7 * fVar16 * fVar19 +
                        (((((fVar3 * fVar10 * fVar13 +
                            fVar12 * fVar10 * fVar5 +
                            ((((fVar2 * fVar11 * fVar13 +
                               fVar3 * fVar11 * fVar5 +
                               fVar11 * fVar12 * fVar4 +
                               (((fVar1 * fVar3 * fVar4 + fVar1 * fVar2 * fVar5) -
                                fVar7 * fVar1 * fVar8) - fVar1 * fVar6 * fVar9)) -
                              fVar14 * fVar11 * fVar8) - fVar7 * fVar11 * fVar9) -
                            fVar11 * fVar6 * fVar15)) - fVar14 * fVar10 * fVar9) -
                          fVar10 * fVar7 * fVar15) - fVar17 * fVar16 * fVar4) -
                        fVar18 * fVar16 * fVar5)) - fVar22 * fVar21 * fVar4) -
                      fVar17 * fVar21 * fVar5) - fVar18 * fVar21 * fVar13)) -
                    fVar22 * fVar24 * fVar5) - fVar17 * fVar24 * fVar13)) - fVar3 * fVar25 * fVar19)
                 - fVar25 * fVar2 * fVar20)) - fVar12 * fVar26 * fVar19) - fVar3 * fVar26 * fVar20)
              - fVar2 * fVar26 * fVar23)) - fVar12 * fVar27 * fVar20) - fVar3 * fVar27 * fVar23;
  pfVar73 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar73[9];
  pfVar74 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar75 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar75[9];
  fVar3 = *pfVar75;
  fVar4 = pfVar75[6];
  pfVar75 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar76 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = *pfVar75;
  fVar6 = pfVar75[6];
  fVar7 = pfVar75[9];
  fVar8 = pfVar74[9];
  fVar9 = *pfVar76;
  fVar10 = pfVar76[6];
  fVar11 = *pfVar74;
  fVar12 = pfVar74[6];
  fVar13 = pfVar76[9];
  fVar14 = *pfVar73;
  fVar15 = pfVar73[6];
  pfVar73 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar73[9];
  pfVar74 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar74[9];
  fVar18 = pfVar74[6];
  fVar19 = *pfVar74;
  pfVar74 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar20 = *pfVar74;
  fVar21 = pfVar74[6];
  fVar22 = pfVar74[9];
  fVar23 = pfVar73[6];
  fVar24 = *pfVar73;
  pfVar73 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar73[9];
  fVar26 = pfVar73[6];
  fVar27 = *pfVar73;
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x4a
                      );
  *pSVar83 = (fVar17 * fVar27 * fVar13 +
             (((fVar18 * fVar26 * fVar13 +
               fVar17 * fVar26 * fVar10 +
               ((((fVar19 * fVar25 * fVar13 +
                  fVar18 * fVar25 * fVar10 +
                  fVar17 * fVar25 * fVar9 +
                  fVar8 * fVar24 * fVar22 +
                  ((fVar12 * fVar23 * fVar22 +
                   fVar8 * fVar23 * fVar21 +
                   (((fVar11 * fVar16 * fVar22 +
                     fVar12 * fVar16 * fVar21 +
                     fVar8 * fVar16 * fVar20 +
                     (((((fVar2 * fVar14 * fVar7 +
                         (((fVar4 * fVar15 * fVar7 +
                           fVar2 * fVar15 * fVar6 +
                           ((((fVar1 * fVar3 * fVar7 + fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6
                              ) - fVar8 * fVar1 * fVar9) - fVar12 * fVar1 * fVar10) -
                           fVar1 * fVar11 * fVar13)) - fVar8 * fVar15 * fVar10) -
                         fVar15 * fVar12 * fVar13)) - fVar14 * fVar8 * fVar13) -
                       fVar17 * fVar16 * fVar5) - fVar18 * fVar16 * fVar6) - fVar19 * fVar16 * fVar7
                     )) - fVar17 * fVar23 * fVar6) - fVar18 * fVar23 * fVar7)) -
                  fVar17 * fVar24 * fVar7)) - fVar2 * fVar25 * fVar20) - fVar4 * fVar25 * fVar21) -
               fVar3 * fVar25 * fVar22)) - fVar2 * fVar26 * fVar21) - fVar4 * fVar26 * fVar22)) -
             fVar2 * fVar27 * fVar22;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[9];
  fVar3 = pfVar80[7];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[1];
  fVar5 = pfVar81[6];
  fVar6 = pfVar80[1];
  fVar7 = pfVar80[6];
  fVar8 = pfVar81[7];
  fVar9 = pfVar81[9];
  fVar10 = pfVar79[9];
  fVar11 = pfVar82[1];
  fVar12 = pfVar82[6];
  fVar13 = pfVar79[7];
  fVar14 = pfVar79[6];
  fVar15 = pfVar82[7];
  fVar16 = pfVar79[1];
  fVar17 = pfVar82[9];
  fVar18 = pfVar78[7];
  fVar19 = pfVar78[6];
  fVar20 = pfVar78[1];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[9];
  fVar22 = pfVar79[9];
  fVar23 = pfVar79[7];
  fVar24 = pfVar79[6];
  fVar25 = pfVar79[1];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar79[1];
  fVar27 = pfVar79[6];
  fVar28 = pfVar79[7];
  fVar29 = pfVar79[9];
  fVar30 = pfVar78[7];
  fVar31 = pfVar78[6];
  fVar32 = pfVar78[1];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[9];
  fVar34 = pfVar78[7];
  fVar35 = pfVar78[6];
  fVar36 = pfVar78[1];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x4b
                      );
  *pSVar83 = (fVar22 * fVar36 * fVar17 +
             (((fVar23 * fVar35 * fVar17 +
               fVar22 * fVar35 * fVar15 +
               (((fVar24 * fVar34 * fVar17 +
                 fVar22 * fVar34 * fVar12 +
                 (((((fVar25 * fVar33 * fVar17 +
                     fVar24 * fVar33 * fVar15 +
                     fVar23 * fVar33 * fVar12 +
                     fVar22 * fVar33 * fVar11 +
                     fVar10 * fVar32 * fVar29 +
                     ((fVar13 * fVar31 * fVar29 +
                      fVar10 * fVar31 * fVar28 +
                      (((fVar14 * fVar30 * fVar29 +
                        fVar10 * fVar30 * fVar27 +
                        (((fVar16 * fVar21 * fVar29 +
                          fVar14 * fVar21 * fVar28 +
                          fVar13 * fVar21 * fVar27 +
                          fVar10 * fVar21 * fVar26 +
                          ((((((fVar2 * fVar20 * fVar9 +
                               (((fVar3 * fVar19 * fVar9 +
                                 fVar2 * fVar19 * fVar8 +
                                 (((fVar7 * fVar18 * fVar9 +
                                   fVar2 * fVar18 * fVar5 +
                                   (((((fVar1 * fVar6 * fVar9 +
                                       fVar1 * fVar7 * fVar8 +
                                       fVar1 * fVar2 * fVar4 + fVar1 * fVar3 * fVar5) -
                                      fVar10 * fVar1 * fVar11) - fVar13 * fVar1 * fVar12) -
                                    fVar14 * fVar1 * fVar15) - fVar1 * fVar16 * fVar17)) -
                                  fVar10 * fVar18 * fVar12) - fVar18 * fVar14 * fVar17)) -
                                fVar10 * fVar19 * fVar15) - fVar19 * fVar13 * fVar17)) -
                              fVar20 * fVar10 * fVar17) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5) - fVar24 * fVar21 * fVar8) -
                          fVar25 * fVar21 * fVar9)) - fVar22 * fVar30 * fVar5) -
                        fVar24 * fVar30 * fVar9)) - fVar22 * fVar31 * fVar8) -
                      fVar23 * fVar31 * fVar9)) - fVar22 * fVar32 * fVar9)) -
                    fVar2 * fVar33 * fVar26) - fVar3 * fVar33 * fVar27) - fVar7 * fVar33 * fVar28) -
                 fVar6 * fVar33 * fVar29)) - fVar2 * fVar34 * fVar27) - fVar7 * fVar34 * fVar29)) -
              fVar2 * fVar35 * fVar28) - fVar3 * fVar35 * fVar29)) - fVar2 * fVar36 * fVar29;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[9];
  fVar3 = pfVar80[2];
  fVar4 = pfVar80[7];
  pfVar80 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar81 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar80[2];
  fVar6 = pfVar80[7];
  fVar7 = pfVar80[9];
  fVar8 = pfVar79[9];
  fVar9 = pfVar81[2];
  fVar10 = pfVar81[7];
  fVar11 = pfVar79[2];
  fVar12 = pfVar79[7];
  fVar13 = pfVar81[9];
  fVar14 = pfVar78[2];
  fVar15 = pfVar78[7];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[9];
  fVar18 = pfVar79[7];
  fVar19 = pfVar79[2];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar20 = pfVar79[2];
  fVar21 = pfVar79[7];
  fVar22 = pfVar79[9];
  fVar23 = pfVar78[7];
  fVar24 = pfVar78[2];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar78[9];
  fVar26 = pfVar78[7];
  fVar27 = pfVar78[2];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x4c
                      );
  *pSVar83 = (fVar17 * fVar27 * fVar13 +
             (((fVar18 * fVar26 * fVar13 +
               fVar17 * fVar26 * fVar10 +
               ((((fVar19 * fVar25 * fVar13 +
                  fVar18 * fVar25 * fVar10 +
                  fVar17 * fVar25 * fVar9 +
                  fVar8 * fVar24 * fVar22 +
                  ((fVar12 * fVar23 * fVar22 +
                   fVar8 * fVar23 * fVar21 +
                   (((fVar11 * fVar16 * fVar22 +
                     fVar12 * fVar16 * fVar21 +
                     fVar8 * fVar16 * fVar20 +
                     (((((fVar2 * fVar14 * fVar7 +
                         (((fVar4 * fVar15 * fVar7 +
                           fVar2 * fVar15 * fVar6 +
                           ((((fVar1 * fVar3 * fVar7 + fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6
                              ) - fVar8 * fVar1 * fVar9) - fVar12 * fVar1 * fVar10) -
                           fVar1 * fVar11 * fVar13)) - fVar8 * fVar15 * fVar10) -
                         fVar15 * fVar12 * fVar13)) - fVar14 * fVar8 * fVar13) -
                       fVar17 * fVar16 * fVar5) - fVar18 * fVar16 * fVar6) - fVar19 * fVar16 * fVar7
                     )) - fVar17 * fVar23 * fVar6) - fVar18 * fVar23 * fVar7)) -
                  fVar17 * fVar24 * fVar7)) - fVar2 * fVar25 * fVar20) - fVar4 * fVar25 * fVar21) -
               fVar3 * fVar25 * fVar22)) - fVar2 * fVar26 * fVar21) - fVar4 * fVar26 * fVar22)) -
             fVar2 * fVar27 * fVar22;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[9];
  fVar3 = pfVar80[8];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[3];
  fVar5 = pfVar81[6];
  fVar6 = pfVar80[3];
  fVar7 = pfVar80[6];
  fVar8 = pfVar81[8];
  fVar9 = pfVar81[9];
  fVar10 = pfVar79[9];
  fVar11 = pfVar82[3];
  fVar12 = pfVar82[6];
  fVar13 = pfVar79[8];
  fVar14 = pfVar79[6];
  fVar15 = pfVar82[8];
  fVar16 = pfVar79[3];
  fVar17 = pfVar82[9];
  fVar18 = pfVar78[8];
  fVar19 = pfVar78[6];
  fVar20 = pfVar78[3];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[9];
  fVar22 = pfVar79[9];
  fVar23 = pfVar79[8];
  fVar24 = pfVar79[6];
  fVar25 = pfVar79[3];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar79[3];
  fVar27 = pfVar79[6];
  fVar28 = pfVar79[8];
  fVar29 = pfVar79[9];
  fVar30 = pfVar78[8];
  fVar31 = pfVar78[6];
  fVar32 = pfVar78[3];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[9];
  fVar34 = pfVar78[8];
  fVar35 = pfVar78[6];
  fVar36 = pfVar78[3];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x4d
                      );
  *pSVar83 = (fVar22 * fVar36 * fVar17 +
             (((fVar23 * fVar35 * fVar17 +
               fVar22 * fVar35 * fVar15 +
               (((fVar24 * fVar34 * fVar17 +
                 fVar22 * fVar34 * fVar12 +
                 (((((fVar25 * fVar33 * fVar17 +
                     fVar24 * fVar33 * fVar15 +
                     fVar23 * fVar33 * fVar12 +
                     fVar22 * fVar33 * fVar11 +
                     fVar10 * fVar32 * fVar29 +
                     ((fVar13 * fVar31 * fVar29 +
                      fVar10 * fVar31 * fVar28 +
                      (((fVar14 * fVar30 * fVar29 +
                        fVar10 * fVar30 * fVar27 +
                        (((fVar16 * fVar21 * fVar29 +
                          fVar14 * fVar21 * fVar28 +
                          fVar13 * fVar21 * fVar27 +
                          fVar10 * fVar21 * fVar26 +
                          ((((((fVar2 * fVar20 * fVar9 +
                               (((fVar3 * fVar19 * fVar9 +
                                 fVar2 * fVar19 * fVar8 +
                                 (((fVar7 * fVar18 * fVar9 +
                                   fVar2 * fVar18 * fVar5 +
                                   (((((fVar1 * fVar6 * fVar9 +
                                       fVar1 * fVar7 * fVar8 +
                                       fVar1 * fVar2 * fVar4 + fVar1 * fVar3 * fVar5) -
                                      fVar10 * fVar1 * fVar11) - fVar13 * fVar1 * fVar12) -
                                    fVar14 * fVar1 * fVar15) - fVar1 * fVar16 * fVar17)) -
                                  fVar10 * fVar18 * fVar12) - fVar18 * fVar14 * fVar17)) -
                                fVar10 * fVar19 * fVar15) - fVar19 * fVar13 * fVar17)) -
                              fVar20 * fVar10 * fVar17) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5) - fVar24 * fVar21 * fVar8) -
                          fVar25 * fVar21 * fVar9)) - fVar22 * fVar30 * fVar5) -
                        fVar24 * fVar30 * fVar9)) - fVar22 * fVar31 * fVar8) -
                      fVar23 * fVar31 * fVar9)) - fVar22 * fVar32 * fVar9)) -
                    fVar2 * fVar33 * fVar26) - fVar3 * fVar33 * fVar27) - fVar7 * fVar33 * fVar28) -
                 fVar6 * fVar33 * fVar29)) - fVar2 * fVar34 * fVar27) - fVar7 * fVar34 * fVar29)) -
              fVar2 * fVar35 * fVar28) - fVar3 * fVar35 * fVar29)) - fVar2 * fVar36 * fVar29;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[9];
  fVar3 = pfVar80[8];
  pfVar81 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar82 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar4 = pfVar81[4];
  fVar5 = pfVar81[7];
  fVar6 = pfVar80[4];
  fVar7 = pfVar80[7];
  fVar8 = pfVar81[8];
  fVar9 = pfVar81[9];
  fVar10 = pfVar79[9];
  fVar11 = pfVar82[4];
  fVar12 = pfVar82[7];
  fVar13 = pfVar79[8];
  fVar14 = pfVar79[7];
  fVar15 = pfVar82[8];
  fVar16 = pfVar79[4];
  fVar17 = pfVar82[9];
  fVar18 = pfVar78[8];
  fVar19 = pfVar78[7];
  fVar20 = pfVar78[4];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar21 = pfVar78[9];
  fVar22 = pfVar79[9];
  fVar23 = pfVar79[8];
  fVar24 = pfVar79[7];
  fVar25 = pfVar79[4];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar26 = pfVar79[4];
  fVar27 = pfVar79[7];
  fVar28 = pfVar79[8];
  fVar29 = pfVar79[9];
  fVar30 = pfVar78[8];
  fVar31 = pfVar78[7];
  fVar32 = pfVar78[4];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar33 = pfVar78[9];
  fVar34 = pfVar78[8];
  fVar35 = pfVar78[7];
  fVar36 = pfVar78[4];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x4e
                      );
  *pSVar83 = (fVar22 * fVar36 * fVar17 +
             (((fVar23 * fVar35 * fVar17 +
               fVar22 * fVar35 * fVar15 +
               (((fVar24 * fVar34 * fVar17 +
                 fVar22 * fVar34 * fVar12 +
                 (((((fVar25 * fVar33 * fVar17 +
                     fVar24 * fVar33 * fVar15 +
                     fVar23 * fVar33 * fVar12 +
                     fVar22 * fVar33 * fVar11 +
                     fVar10 * fVar32 * fVar29 +
                     ((fVar13 * fVar31 * fVar29 +
                      fVar10 * fVar31 * fVar28 +
                      (((fVar14 * fVar30 * fVar29 +
                        fVar10 * fVar30 * fVar27 +
                        (((fVar16 * fVar21 * fVar29 +
                          fVar14 * fVar21 * fVar28 +
                          fVar13 * fVar21 * fVar27 +
                          fVar10 * fVar21 * fVar26 +
                          ((((((fVar2 * fVar20 * fVar9 +
                               (((fVar3 * fVar19 * fVar9 +
                                 fVar2 * fVar19 * fVar8 +
                                 (((fVar7 * fVar18 * fVar9 +
                                   fVar2 * fVar18 * fVar5 +
                                   (((((fVar1 * fVar6 * fVar9 +
                                       fVar1 * fVar7 * fVar8 +
                                       fVar1 * fVar2 * fVar4 + fVar1 * fVar3 * fVar5) -
                                      fVar10 * fVar1 * fVar11) - fVar13 * fVar1 * fVar12) -
                                    fVar14 * fVar1 * fVar15) - fVar1 * fVar16 * fVar17)) -
                                  fVar10 * fVar18 * fVar12) - fVar18 * fVar14 * fVar17)) -
                                fVar10 * fVar19 * fVar15) - fVar19 * fVar13 * fVar17)) -
                              fVar20 * fVar10 * fVar17) - fVar22 * fVar21 * fVar4) -
                            fVar23 * fVar21 * fVar5) - fVar24 * fVar21 * fVar8) -
                          fVar25 * fVar21 * fVar9)) - fVar22 * fVar30 * fVar5) -
                        fVar24 * fVar30 * fVar9)) - fVar22 * fVar31 * fVar8) -
                      fVar23 * fVar31 * fVar9)) - fVar22 * fVar32 * fVar9)) -
                    fVar2 * fVar33 * fVar26) - fVar3 * fVar33 * fVar27) - fVar7 * fVar33 * fVar28) -
                 fVar6 * fVar33 * fVar29)) - fVar2 * fVar34 * fVar27) - fVar7 * fVar34 * fVar29)) -
              fVar2 * fVar35 * fVar28) - fVar3 * fVar35 * fVar29)) - fVar2 * fVar36 * fVar29;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[9];
  pfVar79 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar2 = pfVar80[9];
  fVar3 = pfVar80[5];
  fVar4 = pfVar80[8];
  pfVar80 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar81 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar80[5];
  fVar6 = pfVar80[8];
  fVar7 = pfVar80[9];
  fVar8 = pfVar79[9];
  fVar9 = pfVar81[5];
  fVar10 = pfVar81[8];
  fVar11 = pfVar79[5];
  fVar12 = pfVar79[8];
  fVar13 = pfVar81[9];
  fVar14 = pfVar78[5];
  fVar15 = pfVar78[8];
  pfVar78 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar16 = pfVar78[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar17 = pfVar79[9];
  fVar18 = pfVar79[8];
  fVar19 = pfVar79[5];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar20 = pfVar79[5];
  fVar21 = pfVar79[8];
  fVar22 = pfVar79[9];
  fVar23 = pfVar78[8];
  fVar24 = pfVar78[5];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar25 = pfVar78[9];
  fVar26 = pfVar78[8];
  fVar27 = pfVar78[5];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x4f
                      );
  *pSVar83 = (fVar17 * fVar27 * fVar13 +
             (((fVar18 * fVar26 * fVar13 +
               fVar17 * fVar26 * fVar10 +
               ((((fVar19 * fVar25 * fVar13 +
                  fVar18 * fVar25 * fVar10 +
                  fVar17 * fVar25 * fVar9 +
                  fVar8 * fVar24 * fVar22 +
                  ((fVar12 * fVar23 * fVar22 +
                   fVar8 * fVar23 * fVar21 +
                   (((fVar11 * fVar16 * fVar22 +
                     fVar12 * fVar16 * fVar21 +
                     fVar8 * fVar16 * fVar20 +
                     (((((fVar2 * fVar14 * fVar7 +
                         (((fVar4 * fVar15 * fVar7 +
                           fVar2 * fVar15 * fVar6 +
                           ((((fVar1 * fVar3 * fVar7 + fVar1 * fVar2 * fVar5 + fVar1 * fVar4 * fVar6
                              ) - fVar8 * fVar1 * fVar9) - fVar12 * fVar1 * fVar10) -
                           fVar1 * fVar11 * fVar13)) - fVar8 * fVar15 * fVar10) -
                         fVar15 * fVar12 * fVar13)) - fVar14 * fVar8 * fVar13) -
                       fVar17 * fVar16 * fVar5) - fVar18 * fVar16 * fVar6) - fVar19 * fVar16 * fVar7
                     )) - fVar17 * fVar23 * fVar6) - fVar18 * fVar23 * fVar7)) -
                  fVar17 * fVar24 * fVar7)) - fVar2 * fVar25 * fVar20) - fVar4 * fVar25 * fVar21) -
               fVar3 * fVar25 * fVar22)) - fVar2 * fVar26 * fVar21) - fVar4 * fVar26 * fVar22)) -
             fVar2 * fVar27 * fVar22;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[6];
  fVar2 = pfVar78[9];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[6];
  fVar4 = pfVar79[9];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar79[6];
  fVar6 = pfVar79[9];
  fVar7 = pfVar78[6];
  fVar8 = pfVar78[9];
  fVar9 = pfVar80[6];
  fVar10 = pfVar80[9];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[6];
  fVar12 = pfVar79[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[6];
  fVar14 = pfVar79[9];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[6];
  fVar16 = pfVar79[9];
  fVar17 = pfVar78[6];
  fVar18 = pfVar78[9];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x50
                      );
  *pSVar83 = (fVar14 * fVar17 * fVar10 +
             (((fVar13 * fVar18 * fVar10 +
               fVar14 * fVar18 * fVar9 +
               fVar8 * fVar11 * fVar16 +
               ((fVar7 * fVar12 * fVar16 +
                fVar8 * fVar12 * fVar15 +
                ((((fVar4 * fVar1 * fVar6 +
                   (((fVar2 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6) - fVar8 * fVar2 * fVar9) -
                   fVar2 * fVar7 * fVar10)) - fVar1 * fVar8 * fVar10) - fVar14 * fVar12 * fVar5) -
                fVar13 * fVar12 * fVar6)) - fVar14 * fVar11 * fVar6)) - fVar4 * fVar18 * fVar15) -
             fVar3 * fVar18 * fVar16)) - fVar4 * fVar17 * fVar16;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[7];
  fVar2 = pfVar78[9];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[7];
  fVar4 = pfVar79[9];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar79[7];
  fVar6 = pfVar79[9];
  fVar7 = pfVar78[7];
  fVar8 = pfVar78[9];
  fVar9 = pfVar80[7];
  fVar10 = pfVar80[9];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[7];
  fVar12 = pfVar79[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[7];
  fVar14 = pfVar79[9];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[7];
  fVar16 = pfVar79[9];
  fVar17 = pfVar78[7];
  fVar18 = pfVar78[9];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x51
                      );
  *pSVar83 = (fVar14 * fVar17 * fVar10 +
             (((fVar13 * fVar18 * fVar10 +
               fVar14 * fVar18 * fVar9 +
               fVar8 * fVar11 * fVar16 +
               ((fVar7 * fVar12 * fVar16 +
                fVar8 * fVar12 * fVar15 +
                ((((fVar4 * fVar1 * fVar6 +
                   (((fVar2 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6) - fVar8 * fVar2 * fVar9) -
                   fVar2 * fVar7 * fVar10)) - fVar1 * fVar8 * fVar10) - fVar14 * fVar12 * fVar5) -
                fVar13 * fVar12 * fVar6)) - fVar14 * fVar11 * fVar6)) - fVar4 * fVar18 * fVar15) -
             fVar3 * fVar18 * fVar16)) - fVar4 * fVar17 * fVar16;
  pfVar78 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar1 = pfVar78[8];
  fVar2 = pfVar78[9];
  pfVar78 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar3 = pfVar79[8];
  fVar4 = pfVar79[9];
  pfVar79 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar80 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar5 = pfVar79[8];
  fVar6 = pfVar79[9];
  fVar7 = pfVar78[8];
  fVar8 = pfVar78[9];
  fVar9 = pfVar80[8];
  fVar10 = pfVar80[9];
  pfVar78 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar79 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar11 = pfVar79[8];
  fVar12 = pfVar79[9];
  pfVar79 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar13 = pfVar79[8];
  fVar14 = pfVar79[9];
  pfVar79 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  fVar15 = pfVar79[8];
  fVar16 = pfVar79[9];
  fVar17 = pfVar78[8];
  fVar18 = pfVar78[9];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x52
                      );
  *pSVar83 = (fVar14 * fVar17 * fVar10 +
             (((fVar13 * fVar18 * fVar10 +
               fVar14 * fVar18 * fVar9 +
               fVar8 * fVar11 * fVar16 +
               ((fVar7 * fVar12 * fVar16 +
                fVar8 * fVar12 * fVar15 +
                ((((fVar4 * fVar1 * fVar6 +
                   (((fVar2 * fVar4 * fVar5 + fVar2 * fVar3 * fVar6) - fVar8 * fVar2 * fVar9) -
                   fVar2 * fVar7 * fVar10)) - fVar1 * fVar8 * fVar10) - fVar14 * fVar12 * fVar5) -
                fVar13 * fVar12 * fVar6)) - fVar14 * fVar11 * fVar6)) - fVar4 * fVar18 * fVar15) -
             fVar3 * fVar18 * fVar16)) - fVar4 * fVar17 * fVar16;
  fVar1 = (*m2)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar2 = (*m1)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar3 = (*m0)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar4 = (*m1)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar5 = (*m0)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar6 = (*m2)[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar7 = (*m1)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar8 = (*m0)[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  fVar9 = (*m2)[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[9];
  pSVar83 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_60,_84,_0,_60,_84>,_1> *)M1,row_00,0x53
                      );
  *pSVar83 = (fVar7 * fVar9 * fVar5 +
             fVar4 * fVar6 * fVar8 +
             ((fVar1 * fVar2 * fVar3 - fVar4 * fVar1 * fVar5) - fVar7 * fVar6 * fVar3)) -
             fVar2 * fVar9 * fVar8;
  return;
}

Assistant:

void fillRow2(Eigen::Matrix<floatPrec,EQS,84> & M1,
    int row,
    const std::vector<floatPrec> (&m0)[3],
    const std::vector<floatPrec> (&m1)[3],
    const std::vector<floatPrec> (&m2)[3] )
{
  M1(row,0) = m2[2][0]*m1[1][0]*m0[0][0]-m2[2][0]*m1[0][0]*m0[1][0]-m2[1][0]*m1[2][0]*m0[0][0]+m2[1][0]*m1[0][0]*m0[2][0]+m2[0][0]*m1[2][0]*m0[1][0]-m2[0][0]*m1[1][0]*m0[2][0]; 
  M1(row,1) = m2[2][1]*m1[1][0]*m0[0][0]-m2[2][1]*m1[0][0]*m0[1][0]+m2[2][0]*m1[1][1]*m0[0][0]+m2[2][0]*m1[1][0]*m0[0][1]-m2[2][0]*m1[0][1]*m0[1][0]-m2[2][0]*m1[0][0]*m0[1][1]-m2[1][1]*m1[2][0]*m0[0][0]+m2[1][1]*m1[0][0]*m0[2][0]-m2[1][0]*m1[2][1]*m0[0][0]-m2[1][0]*m1[2][0]*m0[0][1]+m2[1][0]*m1[0][1]*m0[2][0]+m2[1][0]*m1[0][0]*m0[2][1]+m2[0][1]*m1[2][0]*m0[1][0]-m2[0][1]*m1[1][0]*m0[2][0]+m2[0][0]*m1[2][1]*m0[1][0]+m2[0][0]*m1[2][0]*m0[1][1]-m2[0][0]*m1[1][1]*m0[2][0]-m2[0][0]*m1[1][0]*m0[2][1]; 
  M1(row,2) = m2[2][2]*m1[1][0]*m0[0][0]-m2[2][2]*m1[0][0]*m0[1][0]+m2[2][1]*m1[1][1]*m0[0][0]+m2[2][1]*m1[1][0]*m0[0][1]-m2[2][1]*m1[0][1]*m0[1][0]-m2[2][1]*m1[0][0]*m0[1][1]+m2[2][0]*m1[1][2]*m0[0][0]+m2[2][0]*m1[1][1]*m0[0][1]+m2[2][0]*m1[1][0]*m0[0][2]-m2[2][0]*m1[0][2]*m0[1][0]-m2[2][0]*m1[0][1]*m0[1][1]-m2[2][0]*m1[0][0]*m0[1][2]-m2[1][2]*m1[2][0]*m0[0][0]+m2[1][2]*m1[0][0]*m0[2][0]-m2[1][1]*m1[2][1]*m0[0][0]-m2[1][1]*m1[2][0]*m0[0][1]+m2[1][1]*m1[0][1]*m0[2][0]+m2[1][1]*m1[0][0]*m0[2][1]-m2[1][0]*m1[2][2]*m0[0][0]-m2[1][0]*m1[2][1]*m0[0][1]-m2[1][0]*m1[2][0]*m0[0][2]+m2[1][0]*m1[0][2]*m0[2][0]+m2[1][0]*m1[0][1]*m0[2][1]+m2[1][0]*m1[0][0]*m0[2][2]+m2[0][2]*m1[2][0]*m0[1][0]-m2[0][2]*m1[1][0]*m0[2][0]+m2[0][1]*m1[2][1]*m0[1][0]+m2[0][1]*m1[2][0]*m0[1][1]-m2[0][1]*m1[1][1]*m0[2][0]-m2[0][1]*m1[1][0]*m0[2][1]+m2[0][0]*m1[2][2]*m0[1][0]+m2[0][0]*m1[2][1]*m0[1][1]+m2[0][0]*m1[2][0]*m0[1][2]-m2[0][0]*m1[1][2]*m0[2][0]-m2[0][0]*m1[1][1]*m0[2][1]-m2[0][0]*m1[1][0]*m0[2][2]; 
  M1(row,3) = m2[2][2]*m1[1][1]*m0[0][0]+m2[2][2]*m1[1][0]*m0[0][1]-m2[2][2]*m1[0][1]*m0[1][0]-m2[2][2]*m1[0][0]*m0[1][1]+m2[2][1]*m1[1][2]*m0[0][0]+m2[2][1]*m1[1][1]*m0[0][1]+m2[2][1]*m1[1][0]*m0[0][2]-m2[2][1]*m1[0][2]*m0[1][0]-m2[2][1]*m1[0][1]*m0[1][1]-m2[2][1]*m1[0][0]*m0[1][2]+m2[2][0]*m1[1][2]*m0[0][1]+m2[2][0]*m1[1][1]*m0[0][2]-m2[2][0]*m1[0][2]*m0[1][1]-m2[2][0]*m1[0][1]*m0[1][2]-m2[1][2]*m1[2][1]*m0[0][0]-m2[1][2]*m1[2][0]*m0[0][1]+m2[1][2]*m1[0][1]*m0[2][0]+m2[1][2]*m1[0][0]*m0[2][1]-m2[1][1]*m1[2][2]*m0[0][0]-m2[1][1]*m1[2][1]*m0[0][1]-m2[1][1]*m1[2][0]*m0[0][2]+m2[1][1]*m1[0][2]*m0[2][0]+m2[1][1]*m1[0][1]*m0[2][1]+m2[1][1]*m1[0][0]*m0[2][2]-m2[1][0]*m1[2][2]*m0[0][1]-m2[1][0]*m1[2][1]*m0[0][2]+m2[1][0]*m1[0][2]*m0[2][1]+m2[1][0]*m1[0][1]*m0[2][2]+m2[0][2]*m1[2][1]*m0[1][0]+m2[0][2]*m1[2][0]*m0[1][1]-m2[0][2]*m1[1][1]*m0[2][0]-m2[0][2]*m1[1][0]*m0[2][1]+m2[0][1]*m1[2][2]*m0[1][0]+m2[0][1]*m1[2][1]*m0[1][1]+m2[0][1]*m1[2][0]*m0[1][2]-m2[0][1]*m1[1][2]*m0[2][0]-m2[0][1]*m1[1][1]*m0[2][1]-m2[0][1]*m1[1][0]*m0[2][2]+m2[0][0]*m1[2][2]*m0[1][1]+m2[0][0]*m1[2][1]*m0[1][2]-m2[0][0]*m1[1][2]*m0[2][1]-m2[0][0]*m1[1][1]*m0[2][2]; 
  M1(row,4) = m2[2][2]*m1[1][2]*m0[0][0]+m2[2][2]*m1[1][1]*m0[0][1]+m2[2][2]*m1[1][0]*m0[0][2]-m2[2][2]*m1[0][2]*m0[1][0]-m2[2][2]*m1[0][1]*m0[1][1]-m2[2][2]*m1[0][0]*m0[1][2]+m2[2][1]*m1[1][2]*m0[0][1]+m2[2][1]*m1[1][1]*m0[0][2]-m2[2][1]*m1[0][2]*m0[1][1]-m2[2][1]*m1[0][1]*m0[1][2]+m2[2][0]*m1[1][2]*m0[0][2]-m2[2][0]*m1[0][2]*m0[1][2]-m2[1][2]*m1[2][2]*m0[0][0]-m2[1][2]*m1[2][1]*m0[0][1]-m2[1][2]*m1[2][0]*m0[0][2]+m2[1][2]*m1[0][2]*m0[2][0]+m2[1][2]*m1[0][1]*m0[2][1]+m2[1][2]*m1[0][0]*m0[2][2]-m2[1][1]*m1[2][2]*m0[0][1]-m2[1][1]*m1[2][1]*m0[0][2]+m2[1][1]*m1[0][2]*m0[2][1]+m2[1][1]*m1[0][1]*m0[2][2]-m2[1][0]*m1[2][2]*m0[0][2]+m2[1][0]*m1[0][2]*m0[2][2]+m2[0][2]*m1[2][2]*m0[1][0]+m2[0][2]*m1[2][1]*m0[1][1]+m2[0][2]*m1[2][0]*m0[1][2]-m2[0][2]*m1[1][2]*m0[2][0]-m2[0][2]*m1[1][1]*m0[2][1]-m2[0][2]*m1[1][0]*m0[2][2]+m2[0][1]*m1[2][2]*m0[1][1]+m2[0][1]*m1[2][1]*m0[1][2]-m2[0][1]*m1[1][2]*m0[2][1]-m2[0][1]*m1[1][1]*m0[2][2]+m2[0][0]*m1[2][2]*m0[1][2]-m2[0][0]*m1[1][2]*m0[2][2]; 
  M1(row,5) = m2[2][2]*m1[1][2]*m0[0][1]+m2[2][2]*m1[1][1]*m0[0][2]-m2[2][2]*m1[0][2]*m0[1][1]-m2[2][2]*m1[0][1]*m0[1][2]+m2[2][1]*m1[1][2]*m0[0][2]-m2[2][1]*m1[0][2]*m0[1][2]-m2[1][2]*m1[2][2]*m0[0][1]-m2[1][2]*m1[2][1]*m0[0][2]+m2[1][2]*m1[0][2]*m0[2][1]+m2[1][2]*m1[0][1]*m0[2][2]-m2[1][1]*m1[2][2]*m0[0][2]+m2[1][1]*m1[0][2]*m0[2][2]+m2[0][2]*m1[2][2]*m0[1][1]+m2[0][2]*m1[2][1]*m0[1][2]-m2[0][2]*m1[1][2]*m0[2][1]-m2[0][2]*m1[1][1]*m0[2][2]+m2[0][1]*m1[2][2]*m0[1][2]-m2[0][1]*m1[1][2]*m0[2][2]; 
  M1(row,6) = m2[2][2]*m1[1][2]*m0[0][2]-m2[2][2]*m1[0][2]*m0[1][2]-m2[1][2]*m1[2][2]*m0[0][2]+m2[1][2]*m1[0][2]*m0[2][2]+m2[0][2]*m1[2][2]*m0[1][2]-m2[0][2]*m1[1][2]*m0[2][2]; 
  M1(row,7) = m2[2][3]*m1[1][0]*m0[0][0]-m2[2][3]*m1[0][0]*m0[1][0]+m2[2][0]*m1[1][3]*m0[0][0]+m2[2][0]*m1[1][0]*m0[0][3]-m2[2][0]*m1[0][3]*m0[1][0]-m2[2][0]*m1[0][0]*m0[1][3]-m2[1][3]*m1[2][0]*m0[0][0]+m2[1][3]*m1[0][0]*m0[2][0]-m2[1][0]*m1[2][3]*m0[0][0]-m2[1][0]*m1[2][0]*m0[0][3]+m2[1][0]*m1[0][3]*m0[2][0]+m2[1][0]*m1[0][0]*m0[2][3]+m2[0][3]*m1[2][0]*m0[1][0]-m2[0][3]*m1[1][0]*m0[2][0]+m2[0][0]*m1[2][3]*m0[1][0]+m2[0][0]*m1[2][0]*m0[1][3]-m2[0][0]*m1[1][3]*m0[2][0]-m2[0][0]*m1[1][0]*m0[2][3]; 
  M1(row,8) = m2[2][4]*m1[1][0]*m0[0][0]-m2[2][4]*m1[0][0]*m0[1][0]+m2[2][3]*m1[1][1]*m0[0][0]+m2[2][3]*m1[1][0]*m0[0][1]-m2[2][3]*m1[0][1]*m0[1][0]-m2[2][3]*m1[0][0]*m0[1][1]+m2[2][1]*m1[1][3]*m0[0][0]+m2[2][1]*m1[1][0]*m0[0][3]-m2[2][1]*m1[0][3]*m0[1][0]-m2[2][1]*m1[0][0]*m0[1][3]+m2[2][0]*m1[1][4]*m0[0][0]+m2[2][0]*m1[1][3]*m0[0][1]+m2[2][0]*m1[1][1]*m0[0][3]+m2[2][0]*m1[1][0]*m0[0][4]-m2[2][0]*m1[0][4]*m0[1][0]-m2[2][0]*m1[0][3]*m0[1][1]-m2[2][0]*m1[0][1]*m0[1][3]-m2[2][0]*m1[0][0]*m0[1][4]-m2[1][4]*m1[2][0]*m0[0][0]+m2[1][4]*m1[0][0]*m0[2][0]-m2[1][3]*m1[2][1]*m0[0][0]-m2[1][3]*m1[2][0]*m0[0][1]+m2[1][3]*m1[0][1]*m0[2][0]+m2[1][3]*m1[0][0]*m0[2][1]-m2[1][1]*m1[2][3]*m0[0][0]-m2[1][1]*m1[2][0]*m0[0][3]+m2[1][1]*m1[0][3]*m0[2][0]+m2[1][1]*m1[0][0]*m0[2][3]-m2[1][0]*m1[2][4]*m0[0][0]-m2[1][0]*m1[2][3]*m0[0][1]-m2[1][0]*m1[2][1]*m0[0][3]-m2[1][0]*m1[2][0]*m0[0][4]+m2[1][0]*m1[0][4]*m0[2][0]+m2[1][0]*m1[0][3]*m0[2][1]+m2[1][0]*m1[0][1]*m0[2][3]+m2[1][0]*m1[0][0]*m0[2][4]+m2[0][4]*m1[2][0]*m0[1][0]-m2[0][4]*m1[1][0]*m0[2][0]+m2[0][3]*m1[2][1]*m0[1][0]+m2[0][3]*m1[2][0]*m0[1][1]-m2[0][3]*m1[1][1]*m0[2][0]-m2[0][3]*m1[1][0]*m0[2][1]+m2[0][1]*m1[2][3]*m0[1][0]+m2[0][1]*m1[2][0]*m0[1][3]-m2[0][1]*m1[1][3]*m0[2][0]-m2[0][1]*m1[1][0]*m0[2][3]+m2[0][0]*m1[2][4]*m0[1][0]+m2[0][0]*m1[2][3]*m0[1][1]+m2[0][0]*m1[2][1]*m0[1][3]+m2[0][0]*m1[2][0]*m0[1][4]-m2[0][0]*m1[1][4]*m0[2][0]-m2[0][0]*m1[1][3]*m0[2][1]-m2[0][0]*m1[1][1]*m0[2][3]-m2[0][0]*m1[1][0]*m0[2][4]; 
  M1(row,9) = m2[2][4]*m1[1][1]*m0[0][0]+m2[2][4]*m1[1][0]*m0[0][1]-m2[2][4]*m1[0][1]*m0[1][0]-m2[2][4]*m1[0][0]*m0[1][1]+m2[2][3]*m1[1][2]*m0[0][0]+m2[2][3]*m1[1][1]*m0[0][1]+m2[2][3]*m1[1][0]*m0[0][2]-m2[2][3]*m1[0][2]*m0[1][0]-m2[2][3]*m1[0][1]*m0[1][1]-m2[2][3]*m1[0][0]*m0[1][2]+m2[2][2]*m1[1][3]*m0[0][0]+m2[2][2]*m1[1][0]*m0[0][3]-m2[2][2]*m1[0][3]*m0[1][0]-m2[2][2]*m1[0][0]*m0[1][3]+m2[2][1]*m1[1][4]*m0[0][0]+m2[2][1]*m1[1][3]*m0[0][1]+m2[2][1]*m1[1][1]*m0[0][3]+m2[2][1]*m1[1][0]*m0[0][4]-m2[2][1]*m1[0][4]*m0[1][0]-m2[2][1]*m1[0][3]*m0[1][1]-m2[2][1]*m1[0][1]*m0[1][3]-m2[2][1]*m1[0][0]*m0[1][4]+m2[2][0]*m1[1][4]*m0[0][1]+m2[2][0]*m1[1][3]*m0[0][2]+m2[2][0]*m1[1][2]*m0[0][3]+m2[2][0]*m1[1][1]*m0[0][4]-m2[2][0]*m1[0][4]*m0[1][1]-m2[2][0]*m1[0][3]*m0[1][2]-m2[2][0]*m1[0][2]*m0[1][3]-m2[2][0]*m1[0][1]*m0[1][4]-m2[1][4]*m1[2][1]*m0[0][0]-m2[1][4]*m1[2][0]*m0[0][1]+m2[1][4]*m1[0][1]*m0[2][0]+m2[1][4]*m1[0][0]*m0[2][1]-m2[1][3]*m1[2][2]*m0[0][0]-m2[1][3]*m1[2][1]*m0[0][1]-m2[1][3]*m1[2][0]*m0[0][2]+m2[1][3]*m1[0][2]*m0[2][0]+m2[1][3]*m1[0][1]*m0[2][1]+m2[1][3]*m1[0][0]*m0[2][2]-m2[1][2]*m1[2][3]*m0[0][0]-m2[1][2]*m1[2][0]*m0[0][3]+m2[1][2]*m1[0][3]*m0[2][0]+m2[1][2]*m1[0][0]*m0[2][3]-m2[1][1]*m1[2][4]*m0[0][0]-m2[1][1]*m1[2][3]*m0[0][1]-m2[1][1]*m1[2][1]*m0[0][3]-m2[1][1]*m1[2][0]*m0[0][4]+m2[1][1]*m1[0][4]*m0[2][0]+m2[1][1]*m1[0][3]*m0[2][1]+m2[1][1]*m1[0][1]*m0[2][3]+m2[1][1]*m1[0][0]*m0[2][4]-m2[1][0]*m1[2][4]*m0[0][1]-m2[1][0]*m1[2][3]*m0[0][2]-m2[1][0]*m1[2][2]*m0[0][3]-m2[1][0]*m1[2][1]*m0[0][4]+m2[1][0]*m1[0][4]*m0[2][1]+m2[1][0]*m1[0][3]*m0[2][2]+m2[1][0]*m1[0][2]*m0[2][3]+m2[1][0]*m1[0][1]*m0[2][4]+m2[0][4]*m1[2][1]*m0[1][0]+m2[0][4]*m1[2][0]*m0[1][1]-m2[0][4]*m1[1][1]*m0[2][0]-m2[0][4]*m1[1][0]*m0[2][1]+m2[0][3]*m1[2][2]*m0[1][0]+m2[0][3]*m1[2][1]*m0[1][1]+m2[0][3]*m1[2][0]*m0[1][2]-m2[0][3]*m1[1][2]*m0[2][0]-m2[0][3]*m1[1][1]*m0[2][1]-m2[0][3]*m1[1][0]*m0[2][2]+m2[0][2]*m1[2][3]*m0[1][0]+m2[0][2]*m1[2][0]*m0[1][3]-m2[0][2]*m1[1][3]*m0[2][0]-m2[0][2]*m1[1][0]*m0[2][3]+m2[0][1]*m1[2][4]*m0[1][0]+m2[0][1]*m1[2][3]*m0[1][1]+m2[0][1]*m1[2][1]*m0[1][3]+m2[0][1]*m1[2][0]*m0[1][4]-m2[0][1]*m1[1][4]*m0[2][0]-m2[0][1]*m1[1][3]*m0[2][1]-m2[0][1]*m1[1][1]*m0[2][3]-m2[0][1]*m1[1][0]*m0[2][4]+m2[0][0]*m1[2][4]*m0[1][1]+m2[0][0]*m1[2][3]*m0[1][2]+m2[0][0]*m1[2][2]*m0[1][3]+m2[0][0]*m1[2][1]*m0[1][4]-m2[0][0]*m1[1][4]*m0[2][1]-m2[0][0]*m1[1][3]*m0[2][2]-m2[0][0]*m1[1][2]*m0[2][3]-m2[0][0]*m1[1][1]*m0[2][4]; 
  M1(row,10) = m2[2][4]*m1[1][2]*m0[0][0]+m2[2][4]*m1[1][1]*m0[0][1]+m2[2][4]*m1[1][0]*m0[0][2]-m2[2][4]*m1[0][2]*m0[1][0]-m2[2][4]*m1[0][1]*m0[1][1]-m2[2][4]*m1[0][0]*m0[1][2]+m2[2][3]*m1[1][2]*m0[0][1]+m2[2][3]*m1[1][1]*m0[0][2]-m2[2][3]*m1[0][2]*m0[1][1]-m2[2][3]*m1[0][1]*m0[1][2]+m2[2][2]*m1[1][4]*m0[0][0]+m2[2][2]*m1[1][3]*m0[0][1]+m2[2][2]*m1[1][1]*m0[0][3]+m2[2][2]*m1[1][0]*m0[0][4]-m2[2][2]*m1[0][4]*m0[1][0]-m2[2][2]*m1[0][3]*m0[1][1]-m2[2][2]*m1[0][1]*m0[1][3]-m2[2][2]*m1[0][0]*m0[1][4]+m2[2][1]*m1[1][4]*m0[0][1]+m2[2][1]*m1[1][3]*m0[0][2]+m2[2][1]*m1[1][2]*m0[0][3]+m2[2][1]*m1[1][1]*m0[0][4]-m2[2][1]*m1[0][4]*m0[1][1]-m2[2][1]*m1[0][3]*m0[1][2]-m2[2][1]*m1[0][2]*m0[1][3]-m2[2][1]*m1[0][1]*m0[1][4]+m2[2][0]*m1[1][4]*m0[0][2]+m2[2][0]*m1[1][2]*m0[0][4]-m2[2][0]*m1[0][4]*m0[1][2]-m2[2][0]*m1[0][2]*m0[1][4]-m2[1][4]*m1[2][2]*m0[0][0]-m2[1][4]*m1[2][1]*m0[0][1]-m2[1][4]*m1[2][0]*m0[0][2]+m2[1][4]*m1[0][2]*m0[2][0]+m2[1][4]*m1[0][1]*m0[2][1]+m2[1][4]*m1[0][0]*m0[2][2]-m2[1][3]*m1[2][2]*m0[0][1]-m2[1][3]*m1[2][1]*m0[0][2]+m2[1][3]*m1[0][2]*m0[2][1]+m2[1][3]*m1[0][1]*m0[2][2]-m2[1][2]*m1[2][4]*m0[0][0]-m2[1][2]*m1[2][3]*m0[0][1]-m2[1][2]*m1[2][1]*m0[0][3]-m2[1][2]*m1[2][0]*m0[0][4]+m2[1][2]*m1[0][4]*m0[2][0]+m2[1][2]*m1[0][3]*m0[2][1]+m2[1][2]*m1[0][1]*m0[2][3]+m2[1][2]*m1[0][0]*m0[2][4]-m2[1][1]*m1[2][4]*m0[0][1]-m2[1][1]*m1[2][3]*m0[0][2]-m2[1][1]*m1[2][2]*m0[0][3]-m2[1][1]*m1[2][1]*m0[0][4]+m2[1][1]*m1[0][4]*m0[2][1]+m2[1][1]*m1[0][3]*m0[2][2]+m2[1][1]*m1[0][2]*m0[2][3]+m2[1][1]*m1[0][1]*m0[2][4]-m2[1][0]*m1[2][4]*m0[0][2]-m2[1][0]*m1[2][2]*m0[0][4]+m2[1][0]*m1[0][4]*m0[2][2]+m2[1][0]*m1[0][2]*m0[2][4]+m2[0][4]*m1[2][2]*m0[1][0]+m2[0][4]*m1[2][1]*m0[1][1]+m2[0][4]*m1[2][0]*m0[1][2]-m2[0][4]*m1[1][2]*m0[2][0]-m2[0][4]*m1[1][1]*m0[2][1]-m2[0][4]*m1[1][0]*m0[2][2]+m2[0][3]*m1[2][2]*m0[1][1]+m2[0][3]*m1[2][1]*m0[1][2]-m2[0][3]*m1[1][2]*m0[2][1]-m2[0][3]*m1[1][1]*m0[2][2]+m2[0][2]*m1[2][4]*m0[1][0]+m2[0][2]*m1[2][3]*m0[1][1]+m2[0][2]*m1[2][1]*m0[1][3]+m2[0][2]*m1[2][0]*m0[1][4]-m2[0][2]*m1[1][4]*m0[2][0]-m2[0][2]*m1[1][3]*m0[2][1]-m2[0][2]*m1[1][1]*m0[2][3]-m2[0][2]*m1[1][0]*m0[2][4]+m2[0][1]*m1[2][4]*m0[1][1]+m2[0][1]*m1[2][3]*m0[1][2]+m2[0][1]*m1[2][2]*m0[1][3]+m2[0][1]*m1[2][1]*m0[1][4]-m2[0][1]*m1[1][4]*m0[2][1]-m2[0][1]*m1[1][3]*m0[2][2]-m2[0][1]*m1[1][2]*m0[2][3]-m2[0][1]*m1[1][1]*m0[2][4]+m2[0][0]*m1[2][4]*m0[1][2]+m2[0][0]*m1[2][2]*m0[1][4]-m2[0][0]*m1[1][4]*m0[2][2]-m2[0][0]*m1[1][2]*m0[2][4]; 
  M1(row,11) = m2[2][4]*m1[1][2]*m0[0][1]+m2[2][4]*m1[1][1]*m0[0][2]-m2[2][4]*m1[0][2]*m0[1][1]-m2[2][4]*m1[0][1]*m0[1][2]+m2[2][3]*m1[1][2]*m0[0][2]-m2[2][3]*m1[0][2]*m0[1][2]+m2[2][2]*m1[1][4]*m0[0][1]+m2[2][2]*m1[1][3]*m0[0][2]+m2[2][2]*m1[1][2]*m0[0][3]+m2[2][2]*m1[1][1]*m0[0][4]-m2[2][2]*m1[0][4]*m0[1][1]-m2[2][2]*m1[0][3]*m0[1][2]-m2[2][2]*m1[0][2]*m0[1][3]-m2[2][2]*m1[0][1]*m0[1][4]+m2[2][1]*m1[1][4]*m0[0][2]+m2[2][1]*m1[1][2]*m0[0][4]-m2[2][1]*m1[0][4]*m0[1][2]-m2[2][1]*m1[0][2]*m0[1][4]-m2[1][4]*m1[2][2]*m0[0][1]-m2[1][4]*m1[2][1]*m0[0][2]+m2[1][4]*m1[0][2]*m0[2][1]+m2[1][4]*m1[0][1]*m0[2][2]-m2[1][3]*m1[2][2]*m0[0][2]+m2[1][3]*m1[0][2]*m0[2][2]-m2[1][2]*m1[2][4]*m0[0][1]-m2[1][2]*m1[2][3]*m0[0][2]-m2[1][2]*m1[2][2]*m0[0][3]-m2[1][2]*m1[2][1]*m0[0][4]+m2[1][2]*m1[0][4]*m0[2][1]+m2[1][2]*m1[0][3]*m0[2][2]+m2[1][2]*m1[0][2]*m0[2][3]+m2[1][2]*m1[0][1]*m0[2][4]-m2[1][1]*m1[2][4]*m0[0][2]-m2[1][1]*m1[2][2]*m0[0][4]+m2[1][1]*m1[0][4]*m0[2][2]+m2[1][1]*m1[0][2]*m0[2][4]+m2[0][4]*m1[2][2]*m0[1][1]+m2[0][4]*m1[2][1]*m0[1][2]-m2[0][4]*m1[1][2]*m0[2][1]-m2[0][4]*m1[1][1]*m0[2][2]+m2[0][3]*m1[2][2]*m0[1][2]-m2[0][3]*m1[1][2]*m0[2][2]+m2[0][2]*m1[2][4]*m0[1][1]+m2[0][2]*m1[2][3]*m0[1][2]+m2[0][2]*m1[2][2]*m0[1][3]+m2[0][2]*m1[2][1]*m0[1][4]-m2[0][2]*m1[1][4]*m0[2][1]-m2[0][2]*m1[1][3]*m0[2][2]-m2[0][2]*m1[1][2]*m0[2][3]-m2[0][2]*m1[1][1]*m0[2][4]+m2[0][1]*m1[2][4]*m0[1][2]+m2[0][1]*m1[2][2]*m0[1][4]-m2[0][1]*m1[1][4]*m0[2][2]-m2[0][1]*m1[1][2]*m0[2][4]; 
  M1(row,12) = m2[2][4]*m1[1][2]*m0[0][2]-m2[2][4]*m1[0][2]*m0[1][2]+m2[2][2]*m1[1][4]*m0[0][2]+m2[2][2]*m1[1][2]*m0[0][4]-m2[2][2]*m1[0][4]*m0[1][2]-m2[2][2]*m1[0][2]*m0[1][4]-m2[1][4]*m1[2][2]*m0[0][2]+m2[1][4]*m1[0][2]*m0[2][2]-m2[1][2]*m1[2][4]*m0[0][2]-m2[1][2]*m1[2][2]*m0[0][4]+m2[1][2]*m1[0][4]*m0[2][2]+m2[1][2]*m1[0][2]*m0[2][4]+m2[0][4]*m1[2][2]*m0[1][2]-m2[0][4]*m1[1][2]*m0[2][2]+m2[0][2]*m1[2][4]*m0[1][2]+m2[0][2]*m1[2][2]*m0[1][4]-m2[0][2]*m1[1][4]*m0[2][2]-m2[0][2]*m1[1][2]*m0[2][4]; 
  M1(row,13) = m2[2][5]*m1[1][0]*m0[0][0]-m2[2][5]*m1[0][0]*m0[1][0]+m2[2][3]*m1[1][3]*m0[0][0]+m2[2][3]*m1[1][0]*m0[0][3]-m2[2][3]*m1[0][3]*m0[1][0]-m2[2][3]*m1[0][0]*m0[1][3]+m2[2][0]*m1[1][5]*m0[0][0]+m2[2][0]*m1[1][3]*m0[0][3]+m2[2][0]*m1[1][0]*m0[0][5]-m2[2][0]*m1[0][5]*m0[1][0]-m2[2][0]*m1[0][3]*m0[1][3]-m2[2][0]*m1[0][0]*m0[1][5]-m2[1][5]*m1[2][0]*m0[0][0]+m2[1][5]*m1[0][0]*m0[2][0]-m2[1][3]*m1[2][3]*m0[0][0]-m2[1][3]*m1[2][0]*m0[0][3]+m2[1][3]*m1[0][3]*m0[2][0]+m2[1][3]*m1[0][0]*m0[2][3]-m2[1][0]*m1[2][5]*m0[0][0]-m2[1][0]*m1[2][3]*m0[0][3]-m2[1][0]*m1[2][0]*m0[0][5]+m2[1][0]*m1[0][5]*m0[2][0]+m2[1][0]*m1[0][3]*m0[2][3]+m2[1][0]*m1[0][0]*m0[2][5]+m2[0][5]*m1[2][0]*m0[1][0]-m2[0][5]*m1[1][0]*m0[2][0]+m2[0][3]*m1[2][3]*m0[1][0]+m2[0][3]*m1[2][0]*m0[1][3]-m2[0][3]*m1[1][3]*m0[2][0]-m2[0][3]*m1[1][0]*m0[2][3]+m2[0][0]*m1[2][5]*m0[1][0]+m2[0][0]*m1[2][3]*m0[1][3]+m2[0][0]*m1[2][0]*m0[1][5]-m2[0][0]*m1[1][5]*m0[2][0]-m2[0][0]*m1[1][3]*m0[2][3]-m2[0][0]*m1[1][0]*m0[2][5]; 
  M1(row,14) = m2[2][5]*m1[1][1]*m0[0][0]+m2[2][5]*m1[1][0]*m0[0][1]-m2[2][5]*m1[0][1]*m0[1][0]-m2[2][5]*m1[0][0]*m0[1][1]+m2[2][4]*m1[1][3]*m0[0][0]+m2[2][4]*m1[1][0]*m0[0][3]-m2[2][4]*m1[0][3]*m0[1][0]-m2[2][4]*m1[0][0]*m0[1][3]+m2[2][3]*m1[1][4]*m0[0][0]+m2[2][3]*m1[1][3]*m0[0][1]+m2[2][3]*m1[1][1]*m0[0][3]+m2[2][3]*m1[1][0]*m0[0][4]-m2[2][3]*m1[0][4]*m0[1][0]-m2[2][3]*m1[0][3]*m0[1][1]-m2[2][3]*m1[0][1]*m0[1][3]-m2[2][3]*m1[0][0]*m0[1][4]+m2[2][1]*m1[1][5]*m0[0][0]+m2[2][1]*m1[1][3]*m0[0][3]+m2[2][1]*m1[1][0]*m0[0][5]-m2[2][1]*m1[0][5]*m0[1][0]-m2[2][1]*m1[0][3]*m0[1][3]-m2[2][1]*m1[0][0]*m0[1][5]+m2[2][0]*m1[1][5]*m0[0][1]+m2[2][0]*m1[1][4]*m0[0][3]+m2[2][0]*m1[1][3]*m0[0][4]+m2[2][0]*m1[1][1]*m0[0][5]-m2[2][0]*m1[0][5]*m0[1][1]-m2[2][0]*m1[0][4]*m0[1][3]-m2[2][0]*m1[0][3]*m0[1][4]-m2[2][0]*m1[0][1]*m0[1][5]-m2[1][5]*m1[2][1]*m0[0][0]-m2[1][5]*m1[2][0]*m0[0][1]+m2[1][5]*m1[0][1]*m0[2][0]+m2[1][5]*m1[0][0]*m0[2][1]-m2[1][4]*m1[2][3]*m0[0][0]-m2[1][4]*m1[2][0]*m0[0][3]+m2[1][4]*m1[0][3]*m0[2][0]+m2[1][4]*m1[0][0]*m0[2][3]-m2[1][3]*m1[2][4]*m0[0][0]-m2[1][3]*m1[2][3]*m0[0][1]-m2[1][3]*m1[2][1]*m0[0][3]-m2[1][3]*m1[2][0]*m0[0][4]+m2[1][3]*m1[0][4]*m0[2][0]+m2[1][3]*m1[0][3]*m0[2][1]+m2[1][3]*m1[0][1]*m0[2][3]+m2[1][3]*m1[0][0]*m0[2][4]-m2[1][1]*m1[2][5]*m0[0][0]-m2[1][1]*m1[2][3]*m0[0][3]-m2[1][1]*m1[2][0]*m0[0][5]+m2[1][1]*m1[0][5]*m0[2][0]+m2[1][1]*m1[0][3]*m0[2][3]+m2[1][1]*m1[0][0]*m0[2][5]-m2[1][0]*m1[2][5]*m0[0][1]-m2[1][0]*m1[2][4]*m0[0][3]-m2[1][0]*m1[2][3]*m0[0][4]-m2[1][0]*m1[2][1]*m0[0][5]+m2[1][0]*m1[0][5]*m0[2][1]+m2[1][0]*m1[0][4]*m0[2][3]+m2[1][0]*m1[0][3]*m0[2][4]+m2[1][0]*m1[0][1]*m0[2][5]+m2[0][5]*m1[2][1]*m0[1][0]+m2[0][5]*m1[2][0]*m0[1][1]-m2[0][5]*m1[1][1]*m0[2][0]-m2[0][5]*m1[1][0]*m0[2][1]+m2[0][4]*m1[2][3]*m0[1][0]+m2[0][4]*m1[2][0]*m0[1][3]-m2[0][4]*m1[1][3]*m0[2][0]-m2[0][4]*m1[1][0]*m0[2][3]+m2[0][3]*m1[2][4]*m0[1][0]+m2[0][3]*m1[2][3]*m0[1][1]+m2[0][3]*m1[2][1]*m0[1][3]+m2[0][3]*m1[2][0]*m0[1][4]-m2[0][3]*m1[1][4]*m0[2][0]-m2[0][3]*m1[1][3]*m0[2][1]-m2[0][3]*m1[1][1]*m0[2][3]-m2[0][3]*m1[1][0]*m0[2][4]+m2[0][1]*m1[2][5]*m0[1][0]+m2[0][1]*m1[2][3]*m0[1][3]+m2[0][1]*m1[2][0]*m0[1][5]-m2[0][1]*m1[1][5]*m0[2][0]-m2[0][1]*m1[1][3]*m0[2][3]-m2[0][1]*m1[1][0]*m0[2][5]+m2[0][0]*m1[2][5]*m0[1][1]+m2[0][0]*m1[2][4]*m0[1][3]+m2[0][0]*m1[2][3]*m0[1][4]+m2[0][0]*m1[2][1]*m0[1][5]-m2[0][0]*m1[1][5]*m0[2][1]-m2[0][0]*m1[1][4]*m0[2][3]-m2[0][0]*m1[1][3]*m0[2][4]-m2[0][0]*m1[1][1]*m0[2][5]; 
  M1(row,15) = m2[2][5]*m1[1][2]*m0[0][0]+m2[2][5]*m1[1][1]*m0[0][1]+m2[2][5]*m1[1][0]*m0[0][2]-m2[2][5]*m1[0][2]*m0[1][0]-m2[2][5]*m1[0][1]*m0[1][1]-m2[2][5]*m1[0][0]*m0[1][2]+m2[2][4]*m1[1][4]*m0[0][0]+m2[2][4]*m1[1][3]*m0[0][1]+m2[2][4]*m1[1][1]*m0[0][3]+m2[2][4]*m1[1][0]*m0[0][4]-m2[2][4]*m1[0][4]*m0[1][0]-m2[2][4]*m1[0][3]*m0[1][1]-m2[2][4]*m1[0][1]*m0[1][3]-m2[2][4]*m1[0][0]*m0[1][4]+m2[2][3]*m1[1][4]*m0[0][1]+m2[2][3]*m1[1][3]*m0[0][2]+m2[2][3]*m1[1][2]*m0[0][3]+m2[2][3]*m1[1][1]*m0[0][4]-m2[2][3]*m1[0][4]*m0[1][1]-m2[2][3]*m1[0][3]*m0[1][2]-m2[2][3]*m1[0][2]*m0[1][3]-m2[2][3]*m1[0][1]*m0[1][4]+m2[2][2]*m1[1][5]*m0[0][0]+m2[2][2]*m1[1][3]*m0[0][3]+m2[2][2]*m1[1][0]*m0[0][5]-m2[2][2]*m1[0][5]*m0[1][0]-m2[2][2]*m1[0][3]*m0[1][3]-m2[2][2]*m1[0][0]*m0[1][5]+m2[2][1]*m1[1][5]*m0[0][1]+m2[2][1]*m1[1][4]*m0[0][3]+m2[2][1]*m1[1][3]*m0[0][4]+m2[2][1]*m1[1][1]*m0[0][5]-m2[2][1]*m1[0][5]*m0[1][1]-m2[2][1]*m1[0][4]*m0[1][3]-m2[2][1]*m1[0][3]*m0[1][4]-m2[2][1]*m1[0][1]*m0[1][5]+m2[2][0]*m1[1][5]*m0[0][2]+m2[2][0]*m1[1][4]*m0[0][4]+m2[2][0]*m1[1][2]*m0[0][5]-m2[2][0]*m1[0][5]*m0[1][2]-m2[2][0]*m1[0][4]*m0[1][4]-m2[2][0]*m1[0][2]*m0[1][5]-m2[1][5]*m1[2][2]*m0[0][0]-m2[1][5]*m1[2][1]*m0[0][1]-m2[1][5]*m1[2][0]*m0[0][2]+m2[1][5]*m1[0][2]*m0[2][0]+m2[1][5]*m1[0][1]*m0[2][1]+m2[1][5]*m1[0][0]*m0[2][2]-m2[1][4]*m1[2][4]*m0[0][0]-m2[1][4]*m1[2][3]*m0[0][1]-m2[1][4]*m1[2][1]*m0[0][3]-m2[1][4]*m1[2][0]*m0[0][4]+m2[1][4]*m1[0][4]*m0[2][0]+m2[1][4]*m1[0][3]*m0[2][1]+m2[1][4]*m1[0][1]*m0[2][3]+m2[1][4]*m1[0][0]*m0[2][4]-m2[1][3]*m1[2][4]*m0[0][1]-m2[1][3]*m1[2][3]*m0[0][2]-m2[1][3]*m1[2][2]*m0[0][3]-m2[1][3]*m1[2][1]*m0[0][4]+m2[1][3]*m1[0][4]*m0[2][1]+m2[1][3]*m1[0][3]*m0[2][2]+m2[1][3]*m1[0][2]*m0[2][3]+m2[1][3]*m1[0][1]*m0[2][4]-m2[1][2]*m1[2][5]*m0[0][0]-m2[1][2]*m1[2][3]*m0[0][3]-m2[1][2]*m1[2][0]*m0[0][5]+m2[1][2]*m1[0][5]*m0[2][0]+m2[1][2]*m1[0][3]*m0[2][3]+m2[1][2]*m1[0][0]*m0[2][5]-m2[1][1]*m1[2][5]*m0[0][1]-m2[1][1]*m1[2][4]*m0[0][3]-m2[1][1]*m1[2][3]*m0[0][4]-m2[1][1]*m1[2][1]*m0[0][5]+m2[1][1]*m1[0][5]*m0[2][1]+m2[1][1]*m1[0][4]*m0[2][3]+m2[1][1]*m1[0][3]*m0[2][4]+m2[1][1]*m1[0][1]*m0[2][5]-m2[1][0]*m1[2][5]*m0[0][2]-m2[1][0]*m1[2][4]*m0[0][4]-m2[1][0]*m1[2][2]*m0[0][5]+m2[1][0]*m1[0][5]*m0[2][2]+m2[1][0]*m1[0][4]*m0[2][4]+m2[1][0]*m1[0][2]*m0[2][5]+m2[0][5]*m1[2][2]*m0[1][0]+m2[0][5]*m1[2][1]*m0[1][1]+m2[0][5]*m1[2][0]*m0[1][2]-m2[0][5]*m1[1][2]*m0[2][0]-m2[0][5]*m1[1][1]*m0[2][1]-m2[0][5]*m1[1][0]*m0[2][2]+m2[0][4]*m1[2][4]*m0[1][0]+m2[0][4]*m1[2][3]*m0[1][1]+m2[0][4]*m1[2][1]*m0[1][3]+m2[0][4]*m1[2][0]*m0[1][4]-m2[0][4]*m1[1][4]*m0[2][0]-m2[0][4]*m1[1][3]*m0[2][1]-m2[0][4]*m1[1][1]*m0[2][3]-m2[0][4]*m1[1][0]*m0[2][4]+m2[0][3]*m1[2][4]*m0[1][1]+m2[0][3]*m1[2][3]*m0[1][2]+m2[0][3]*m1[2][2]*m0[1][3]+m2[0][3]*m1[2][1]*m0[1][4]-m2[0][3]*m1[1][4]*m0[2][1]-m2[0][3]*m1[1][3]*m0[2][2]-m2[0][3]*m1[1][2]*m0[2][3]-m2[0][3]*m1[1][1]*m0[2][4]+m2[0][2]*m1[2][5]*m0[1][0]+m2[0][2]*m1[2][3]*m0[1][3]+m2[0][2]*m1[2][0]*m0[1][5]-m2[0][2]*m1[1][5]*m0[2][0]-m2[0][2]*m1[1][3]*m0[2][3]-m2[0][2]*m1[1][0]*m0[2][5]+m2[0][1]*m1[2][5]*m0[1][1]+m2[0][1]*m1[2][4]*m0[1][3]+m2[0][1]*m1[2][3]*m0[1][4]+m2[0][1]*m1[2][1]*m0[1][5]-m2[0][1]*m1[1][5]*m0[2][1]-m2[0][1]*m1[1][4]*m0[2][3]-m2[0][1]*m1[1][3]*m0[2][4]-m2[0][1]*m1[1][1]*m0[2][5]+m2[0][0]*m1[2][5]*m0[1][2]+m2[0][0]*m1[2][4]*m0[1][4]+m2[0][0]*m1[2][2]*m0[1][5]-m2[0][0]*m1[1][5]*m0[2][2]-m2[0][0]*m1[1][4]*m0[2][4]-m2[0][0]*m1[1][2]*m0[2][5]; 
  M1(row,16) = m2[2][5]*m1[1][2]*m0[0][1]+m2[2][5]*m1[1][1]*m0[0][2]-m2[2][5]*m1[0][2]*m0[1][1]-m2[2][5]*m1[0][1]*m0[1][2]+m2[2][4]*m1[1][4]*m0[0][1]+m2[2][4]*m1[1][3]*m0[0][2]+m2[2][4]*m1[1][2]*m0[0][3]+m2[2][4]*m1[1][1]*m0[0][4]-m2[2][4]*m1[0][4]*m0[1][1]-m2[2][4]*m1[0][3]*m0[1][2]-m2[2][4]*m1[0][2]*m0[1][3]-m2[2][4]*m1[0][1]*m0[1][4]+m2[2][3]*m1[1][4]*m0[0][2]+m2[2][3]*m1[1][2]*m0[0][4]-m2[2][3]*m1[0][4]*m0[1][2]-m2[2][3]*m1[0][2]*m0[1][4]+m2[2][2]*m1[1][5]*m0[0][1]+m2[2][2]*m1[1][4]*m0[0][3]+m2[2][2]*m1[1][3]*m0[0][4]+m2[2][2]*m1[1][1]*m0[0][5]-m2[2][2]*m1[0][5]*m0[1][1]-m2[2][2]*m1[0][4]*m0[1][3]-m2[2][2]*m1[0][3]*m0[1][4]-m2[2][2]*m1[0][1]*m0[1][5]+m2[2][1]*m1[1][5]*m0[0][2]+m2[2][1]*m1[1][4]*m0[0][4]+m2[2][1]*m1[1][2]*m0[0][5]-m2[2][1]*m1[0][5]*m0[1][2]-m2[2][1]*m1[0][4]*m0[1][4]-m2[2][1]*m1[0][2]*m0[1][5]-m2[1][5]*m1[2][2]*m0[0][1]-m2[1][5]*m1[2][1]*m0[0][2]+m2[1][5]*m1[0][2]*m0[2][1]+m2[1][5]*m1[0][1]*m0[2][2]-m2[1][4]*m1[2][4]*m0[0][1]-m2[1][4]*m1[2][3]*m0[0][2]-m2[1][4]*m1[2][2]*m0[0][3]-m2[1][4]*m1[2][1]*m0[0][4]+m2[1][4]*m1[0][4]*m0[2][1]+m2[1][4]*m1[0][3]*m0[2][2]+m2[1][4]*m1[0][2]*m0[2][3]+m2[1][4]*m1[0][1]*m0[2][4]-m2[1][3]*m1[2][4]*m0[0][2]-m2[1][3]*m1[2][2]*m0[0][4]+m2[1][3]*m1[0][4]*m0[2][2]+m2[1][3]*m1[0][2]*m0[2][4]-m2[1][2]*m1[2][5]*m0[0][1]-m2[1][2]*m1[2][4]*m0[0][3]-m2[1][2]*m1[2][3]*m0[0][4]-m2[1][2]*m1[2][1]*m0[0][5]+m2[1][2]*m1[0][5]*m0[2][1]+m2[1][2]*m1[0][4]*m0[2][3]+m2[1][2]*m1[0][3]*m0[2][4]+m2[1][2]*m1[0][1]*m0[2][5]-m2[1][1]*m1[2][5]*m0[0][2]-m2[1][1]*m1[2][4]*m0[0][4]-m2[1][1]*m1[2][2]*m0[0][5]+m2[1][1]*m1[0][5]*m0[2][2]+m2[1][1]*m1[0][4]*m0[2][4]+m2[1][1]*m1[0][2]*m0[2][5]+m2[0][5]*m1[2][2]*m0[1][1]+m2[0][5]*m1[2][1]*m0[1][2]-m2[0][5]*m1[1][2]*m0[2][1]-m2[0][5]*m1[1][1]*m0[2][2]+m2[0][4]*m1[2][4]*m0[1][1]+m2[0][4]*m1[2][3]*m0[1][2]+m2[0][4]*m1[2][2]*m0[1][3]+m2[0][4]*m1[2][1]*m0[1][4]-m2[0][4]*m1[1][4]*m0[2][1]-m2[0][4]*m1[1][3]*m0[2][2]-m2[0][4]*m1[1][2]*m0[2][3]-m2[0][4]*m1[1][1]*m0[2][4]+m2[0][3]*m1[2][4]*m0[1][2]+m2[0][3]*m1[2][2]*m0[1][4]-m2[0][3]*m1[1][4]*m0[2][2]-m2[0][3]*m1[1][2]*m0[2][4]+m2[0][2]*m1[2][5]*m0[1][1]+m2[0][2]*m1[2][4]*m0[1][3]+m2[0][2]*m1[2][3]*m0[1][4]+m2[0][2]*m1[2][1]*m0[1][5]-m2[0][2]*m1[1][5]*m0[2][1]-m2[0][2]*m1[1][4]*m0[2][3]-m2[0][2]*m1[1][3]*m0[2][4]-m2[0][2]*m1[1][1]*m0[2][5]+m2[0][1]*m1[2][5]*m0[1][2]+m2[0][1]*m1[2][4]*m0[1][4]+m2[0][1]*m1[2][2]*m0[1][5]-m2[0][1]*m1[1][5]*m0[2][2]-m2[0][1]*m1[1][4]*m0[2][4]-m2[0][1]*m1[1][2]*m0[2][5]; 
  M1(row,17) = m2[2][5]*m1[1][2]*m0[0][2]-m2[2][5]*m1[0][2]*m0[1][2]+m2[2][4]*m1[1][4]*m0[0][2]+m2[2][4]*m1[1][2]*m0[0][4]-m2[2][4]*m1[0][4]*m0[1][2]-m2[2][4]*m1[0][2]*m0[1][4]+m2[2][2]*m1[1][5]*m0[0][2]+m2[2][2]*m1[1][4]*m0[0][4]+m2[2][2]*m1[1][2]*m0[0][5]-m2[2][2]*m1[0][5]*m0[1][2]-m2[2][2]*m1[0][4]*m0[1][4]-m2[2][2]*m1[0][2]*m0[1][5]-m2[1][5]*m1[2][2]*m0[0][2]+m2[1][5]*m1[0][2]*m0[2][2]-m2[1][4]*m1[2][4]*m0[0][2]-m2[1][4]*m1[2][2]*m0[0][4]+m2[1][4]*m1[0][4]*m0[2][2]+m2[1][4]*m1[0][2]*m0[2][4]-m2[1][2]*m1[2][5]*m0[0][2]-m2[1][2]*m1[2][4]*m0[0][4]-m2[1][2]*m1[2][2]*m0[0][5]+m2[1][2]*m1[0][5]*m0[2][2]+m2[1][2]*m1[0][4]*m0[2][4]+m2[1][2]*m1[0][2]*m0[2][5]+m2[0][5]*m1[2][2]*m0[1][2]-m2[0][5]*m1[1][2]*m0[2][2]+m2[0][4]*m1[2][4]*m0[1][2]+m2[0][4]*m1[2][2]*m0[1][4]-m2[0][4]*m1[1][4]*m0[2][2]-m2[0][4]*m1[1][2]*m0[2][4]+m2[0][2]*m1[2][5]*m0[1][2]+m2[0][2]*m1[2][4]*m0[1][4]+m2[0][2]*m1[2][2]*m0[1][5]-m2[0][2]*m1[1][5]*m0[2][2]-m2[0][2]*m1[1][4]*m0[2][4]-m2[0][2]*m1[1][2]*m0[2][5]; 
  M1(row,18) = m2[2][5]*m1[1][3]*m0[0][0]+m2[2][5]*m1[1][0]*m0[0][3]-m2[2][5]*m1[0][3]*m0[1][0]-m2[2][5]*m1[0][0]*m0[1][3]+m2[2][3]*m1[1][5]*m0[0][0]+m2[2][3]*m1[1][3]*m0[0][3]+m2[2][3]*m1[1][0]*m0[0][5]-m2[2][3]*m1[0][5]*m0[1][0]-m2[2][3]*m1[0][3]*m0[1][3]-m2[2][3]*m1[0][0]*m0[1][5]+m2[2][0]*m1[1][5]*m0[0][3]+m2[2][0]*m1[1][3]*m0[0][5]-m2[2][0]*m1[0][5]*m0[1][3]-m2[2][0]*m1[0][3]*m0[1][5]-m2[1][5]*m1[2][3]*m0[0][0]-m2[1][5]*m1[2][0]*m0[0][3]+m2[1][5]*m1[0][3]*m0[2][0]+m2[1][5]*m1[0][0]*m0[2][3]-m2[1][3]*m1[2][5]*m0[0][0]-m2[1][3]*m1[2][3]*m0[0][3]-m2[1][3]*m1[2][0]*m0[0][5]+m2[1][3]*m1[0][5]*m0[2][0]+m2[1][3]*m1[0][3]*m0[2][3]+m2[1][3]*m1[0][0]*m0[2][5]-m2[1][0]*m1[2][5]*m0[0][3]-m2[1][0]*m1[2][3]*m0[0][5]+m2[1][0]*m1[0][5]*m0[2][3]+m2[1][0]*m1[0][3]*m0[2][5]+m2[0][5]*m1[2][3]*m0[1][0]+m2[0][5]*m1[2][0]*m0[1][3]-m2[0][5]*m1[1][3]*m0[2][0]-m2[0][5]*m1[1][0]*m0[2][3]+m2[0][3]*m1[2][5]*m0[1][0]+m2[0][3]*m1[2][3]*m0[1][3]+m2[0][3]*m1[2][0]*m0[1][5]-m2[0][3]*m1[1][5]*m0[2][0]-m2[0][3]*m1[1][3]*m0[2][3]-m2[0][3]*m1[1][0]*m0[2][5]+m2[0][0]*m1[2][5]*m0[1][3]+m2[0][0]*m1[2][3]*m0[1][5]-m2[0][0]*m1[1][5]*m0[2][3]-m2[0][0]*m1[1][3]*m0[2][5]; 
  M1(row,19) = m2[2][5]*m1[1][4]*m0[0][0]+m2[2][5]*m1[1][3]*m0[0][1]+m2[2][5]*m1[1][1]*m0[0][3]+m2[2][5]*m1[1][0]*m0[0][4]-m2[2][5]*m1[0][4]*m0[1][0]-m2[2][5]*m1[0][3]*m0[1][1]-m2[2][5]*m1[0][1]*m0[1][3]-m2[2][5]*m1[0][0]*m0[1][4]+m2[2][4]*m1[1][5]*m0[0][0]+m2[2][4]*m1[1][3]*m0[0][3]+m2[2][4]*m1[1][0]*m0[0][5]-m2[2][4]*m1[0][5]*m0[1][0]-m2[2][4]*m1[0][3]*m0[1][3]-m2[2][4]*m1[0][0]*m0[1][5]+m2[2][3]*m1[1][5]*m0[0][1]+m2[2][3]*m1[1][4]*m0[0][3]+m2[2][3]*m1[1][3]*m0[0][4]+m2[2][3]*m1[1][1]*m0[0][5]-m2[2][3]*m1[0][5]*m0[1][1]-m2[2][3]*m1[0][4]*m0[1][3]-m2[2][3]*m1[0][3]*m0[1][4]-m2[2][3]*m1[0][1]*m0[1][5]+m2[2][1]*m1[1][5]*m0[0][3]+m2[2][1]*m1[1][3]*m0[0][5]-m2[2][1]*m1[0][5]*m0[1][3]-m2[2][1]*m1[0][3]*m0[1][5]+m2[2][0]*m1[1][5]*m0[0][4]+m2[2][0]*m1[1][4]*m0[0][5]-m2[2][0]*m1[0][5]*m0[1][4]-m2[2][0]*m1[0][4]*m0[1][5]-m2[1][5]*m1[2][4]*m0[0][0]-m2[1][5]*m1[2][3]*m0[0][1]-m2[1][5]*m1[2][1]*m0[0][3]-m2[1][5]*m1[2][0]*m0[0][4]+m2[1][5]*m1[0][4]*m0[2][0]+m2[1][5]*m1[0][3]*m0[2][1]+m2[1][5]*m1[0][1]*m0[2][3]+m2[1][5]*m1[0][0]*m0[2][4]-m2[1][4]*m1[2][5]*m0[0][0]-m2[1][4]*m1[2][3]*m0[0][3]-m2[1][4]*m1[2][0]*m0[0][5]+m2[1][4]*m1[0][5]*m0[2][0]+m2[1][4]*m1[0][3]*m0[2][3]+m2[1][4]*m1[0][0]*m0[2][5]-m2[1][3]*m1[2][5]*m0[0][1]-m2[1][3]*m1[2][4]*m0[0][3]-m2[1][3]*m1[2][3]*m0[0][4]-m2[1][3]*m1[2][1]*m0[0][5]+m2[1][3]*m1[0][5]*m0[2][1]+m2[1][3]*m1[0][4]*m0[2][3]+m2[1][3]*m1[0][3]*m0[2][4]+m2[1][3]*m1[0][1]*m0[2][5]-m2[1][1]*m1[2][5]*m0[0][3]-m2[1][1]*m1[2][3]*m0[0][5]+m2[1][1]*m1[0][5]*m0[2][3]+m2[1][1]*m1[0][3]*m0[2][5]-m2[1][0]*m1[2][5]*m0[0][4]-m2[1][0]*m1[2][4]*m0[0][5]+m2[1][0]*m1[0][5]*m0[2][4]+m2[1][0]*m1[0][4]*m0[2][5]+m2[0][5]*m1[2][4]*m0[1][0]+m2[0][5]*m1[2][3]*m0[1][1]+m2[0][5]*m1[2][1]*m0[1][3]+m2[0][5]*m1[2][0]*m0[1][4]-m2[0][5]*m1[1][4]*m0[2][0]-m2[0][5]*m1[1][3]*m0[2][1]-m2[0][5]*m1[1][1]*m0[2][3]-m2[0][5]*m1[1][0]*m0[2][4]+m2[0][4]*m1[2][5]*m0[1][0]+m2[0][4]*m1[2][3]*m0[1][3]+m2[0][4]*m1[2][0]*m0[1][5]-m2[0][4]*m1[1][5]*m0[2][0]-m2[0][4]*m1[1][3]*m0[2][3]-m2[0][4]*m1[1][0]*m0[2][5]+m2[0][3]*m1[2][5]*m0[1][1]+m2[0][3]*m1[2][4]*m0[1][3]+m2[0][3]*m1[2][3]*m0[1][4]+m2[0][3]*m1[2][1]*m0[1][5]-m2[0][3]*m1[1][5]*m0[2][1]-m2[0][3]*m1[1][4]*m0[2][3]-m2[0][3]*m1[1][3]*m0[2][4]-m2[0][3]*m1[1][1]*m0[2][5]+m2[0][1]*m1[2][5]*m0[1][3]+m2[0][1]*m1[2][3]*m0[1][5]-m2[0][1]*m1[1][5]*m0[2][3]-m2[0][1]*m1[1][3]*m0[2][5]+m2[0][0]*m1[2][5]*m0[1][4]+m2[0][0]*m1[2][4]*m0[1][5]-m2[0][0]*m1[1][5]*m0[2][4]-m2[0][0]*m1[1][4]*m0[2][5]; 
  M1(row,20) = m2[2][5]*m1[1][4]*m0[0][1]+m2[2][5]*m1[1][3]*m0[0][2]+m2[2][5]*m1[1][2]*m0[0][3]+m2[2][5]*m1[1][1]*m0[0][4]-m2[2][5]*m1[0][4]*m0[1][1]-m2[2][5]*m1[0][3]*m0[1][2]-m2[2][5]*m1[0][2]*m0[1][3]-m2[2][5]*m1[0][1]*m0[1][4]+m2[2][4]*m1[1][5]*m0[0][1]+m2[2][4]*m1[1][4]*m0[0][3]+m2[2][4]*m1[1][3]*m0[0][4]+m2[2][4]*m1[1][1]*m0[0][5]-m2[2][4]*m1[0][5]*m0[1][1]-m2[2][4]*m1[0][4]*m0[1][3]-m2[2][4]*m1[0][3]*m0[1][4]-m2[2][4]*m1[0][1]*m0[1][5]+m2[2][3]*m1[1][5]*m0[0][2]+m2[2][3]*m1[1][4]*m0[0][4]+m2[2][3]*m1[1][2]*m0[0][5]-m2[2][3]*m1[0][5]*m0[1][2]-m2[2][3]*m1[0][4]*m0[1][4]-m2[2][3]*m1[0][2]*m0[1][5]+m2[2][2]*m1[1][5]*m0[0][3]+m2[2][2]*m1[1][3]*m0[0][5]-m2[2][2]*m1[0][5]*m0[1][3]-m2[2][2]*m1[0][3]*m0[1][5]+m2[2][1]*m1[1][5]*m0[0][4]+m2[2][1]*m1[1][4]*m0[0][5]-m2[2][1]*m1[0][5]*m0[1][4]-m2[2][1]*m1[0][4]*m0[1][5]-m2[1][5]*m1[2][4]*m0[0][1]-m2[1][5]*m1[2][3]*m0[0][2]-m2[1][5]*m1[2][2]*m0[0][3]-m2[1][5]*m1[2][1]*m0[0][4]+m2[1][5]*m1[0][4]*m0[2][1]+m2[1][5]*m1[0][3]*m0[2][2]+m2[1][5]*m1[0][2]*m0[2][3]+m2[1][5]*m1[0][1]*m0[2][4]-m2[1][4]*m1[2][5]*m0[0][1]-m2[1][4]*m1[2][4]*m0[0][3]-m2[1][4]*m1[2][3]*m0[0][4]-m2[1][4]*m1[2][1]*m0[0][5]+m2[1][4]*m1[0][5]*m0[2][1]+m2[1][4]*m1[0][4]*m0[2][3]+m2[1][4]*m1[0][3]*m0[2][4]+m2[1][4]*m1[0][1]*m0[2][5]-m2[1][3]*m1[2][5]*m0[0][2]-m2[1][3]*m1[2][4]*m0[0][4]-m2[1][3]*m1[2][2]*m0[0][5]+m2[1][3]*m1[0][5]*m0[2][2]+m2[1][3]*m1[0][4]*m0[2][4]+m2[1][3]*m1[0][2]*m0[2][5]-m2[1][2]*m1[2][5]*m0[0][3]-m2[1][2]*m1[2][3]*m0[0][5]+m2[1][2]*m1[0][5]*m0[2][3]+m2[1][2]*m1[0][3]*m0[2][5]-m2[1][1]*m1[2][5]*m0[0][4]-m2[1][1]*m1[2][4]*m0[0][5]+m2[1][1]*m1[0][5]*m0[2][4]+m2[1][1]*m1[0][4]*m0[2][5]+m2[0][5]*m1[2][4]*m0[1][1]+m2[0][5]*m1[2][3]*m0[1][2]+m2[0][5]*m1[2][2]*m0[1][3]+m2[0][5]*m1[2][1]*m0[1][4]-m2[0][5]*m1[1][4]*m0[2][1]-m2[0][5]*m1[1][3]*m0[2][2]-m2[0][5]*m1[1][2]*m0[2][3]-m2[0][5]*m1[1][1]*m0[2][4]+m2[0][4]*m1[2][5]*m0[1][1]+m2[0][4]*m1[2][4]*m0[1][3]+m2[0][4]*m1[2][3]*m0[1][4]+m2[0][4]*m1[2][1]*m0[1][5]-m2[0][4]*m1[1][5]*m0[2][1]-m2[0][4]*m1[1][4]*m0[2][3]-m2[0][4]*m1[1][3]*m0[2][4]-m2[0][4]*m1[1][1]*m0[2][5]+m2[0][3]*m1[2][5]*m0[1][2]+m2[0][3]*m1[2][4]*m0[1][4]+m2[0][3]*m1[2][2]*m0[1][5]-m2[0][3]*m1[1][5]*m0[2][2]-m2[0][3]*m1[1][4]*m0[2][4]-m2[0][3]*m1[1][2]*m0[2][5]+m2[0][2]*m1[2][5]*m0[1][3]+m2[0][2]*m1[2][3]*m0[1][5]-m2[0][2]*m1[1][5]*m0[2][3]-m2[0][2]*m1[1][3]*m0[2][5]+m2[0][1]*m1[2][5]*m0[1][4]+m2[0][1]*m1[2][4]*m0[1][5]-m2[0][1]*m1[1][5]*m0[2][4]-m2[0][1]*m1[1][4]*m0[2][5]; 
  M1(row,21) = m2[2][5]*m1[1][4]*m0[0][2]+m2[2][5]*m1[1][2]*m0[0][4]-m2[2][5]*m1[0][4]*m0[1][2]-m2[2][5]*m1[0][2]*m0[1][4]+m2[2][4]*m1[1][5]*m0[0][2]+m2[2][4]*m1[1][4]*m0[0][4]+m2[2][4]*m1[1][2]*m0[0][5]-m2[2][4]*m1[0][5]*m0[1][2]-m2[2][4]*m1[0][4]*m0[1][4]-m2[2][4]*m1[0][2]*m0[1][5]+m2[2][2]*m1[1][5]*m0[0][4]+m2[2][2]*m1[1][4]*m0[0][5]-m2[2][2]*m1[0][5]*m0[1][4]-m2[2][2]*m1[0][4]*m0[1][5]-m2[1][5]*m1[2][4]*m0[0][2]-m2[1][5]*m1[2][2]*m0[0][4]+m2[1][5]*m1[0][4]*m0[2][2]+m2[1][5]*m1[0][2]*m0[2][4]-m2[1][4]*m1[2][5]*m0[0][2]-m2[1][4]*m1[2][4]*m0[0][4]-m2[1][4]*m1[2][2]*m0[0][5]+m2[1][4]*m1[0][5]*m0[2][2]+m2[1][4]*m1[0][4]*m0[2][4]+m2[1][4]*m1[0][2]*m0[2][5]-m2[1][2]*m1[2][5]*m0[0][4]-m2[1][2]*m1[2][4]*m0[0][5]+m2[1][2]*m1[0][5]*m0[2][4]+m2[1][2]*m1[0][4]*m0[2][5]+m2[0][5]*m1[2][4]*m0[1][2]+m2[0][5]*m1[2][2]*m0[1][4]-m2[0][5]*m1[1][4]*m0[2][2]-m2[0][5]*m1[1][2]*m0[2][4]+m2[0][4]*m1[2][5]*m0[1][2]+m2[0][4]*m1[2][4]*m0[1][4]+m2[0][4]*m1[2][2]*m0[1][5]-m2[0][4]*m1[1][5]*m0[2][2]-m2[0][4]*m1[1][4]*m0[2][4]-m2[0][4]*m1[1][2]*m0[2][5]+m2[0][2]*m1[2][5]*m0[1][4]+m2[0][2]*m1[2][4]*m0[1][5]-m2[0][2]*m1[1][5]*m0[2][4]-m2[0][2]*m1[1][4]*m0[2][5]; 
  M1(row,22) = m2[2][5]*m1[1][5]*m0[0][0]+m2[2][5]*m1[1][3]*m0[0][3]+m2[2][5]*m1[1][0]*m0[0][5]-m2[2][5]*m1[0][5]*m0[1][0]-m2[2][5]*m1[0][3]*m0[1][3]-m2[2][5]*m1[0][0]*m0[1][5]+m2[2][3]*m1[1][5]*m0[0][3]+m2[2][3]*m1[1][3]*m0[0][5]-m2[2][3]*m1[0][5]*m0[1][3]-m2[2][3]*m1[0][3]*m0[1][5]+m2[2][0]*m1[1][5]*m0[0][5]-m2[2][0]*m1[0][5]*m0[1][5]-m2[1][5]*m1[2][5]*m0[0][0]-m2[1][5]*m1[2][3]*m0[0][3]-m2[1][5]*m1[2][0]*m0[0][5]+m2[1][5]*m1[0][5]*m0[2][0]+m2[1][5]*m1[0][3]*m0[2][3]+m2[1][5]*m1[0][0]*m0[2][5]-m2[1][3]*m1[2][5]*m0[0][3]-m2[1][3]*m1[2][3]*m0[0][5]+m2[1][3]*m1[0][5]*m0[2][3]+m2[1][3]*m1[0][3]*m0[2][5]-m2[1][0]*m1[2][5]*m0[0][5]+m2[1][0]*m1[0][5]*m0[2][5]+m2[0][5]*m1[2][5]*m0[1][0]+m2[0][5]*m1[2][3]*m0[1][3]+m2[0][5]*m1[2][0]*m0[1][5]-m2[0][5]*m1[1][5]*m0[2][0]-m2[0][5]*m1[1][3]*m0[2][3]-m2[0][5]*m1[1][0]*m0[2][5]+m2[0][3]*m1[2][5]*m0[1][3]+m2[0][3]*m1[2][3]*m0[1][5]-m2[0][3]*m1[1][5]*m0[2][3]-m2[0][3]*m1[1][3]*m0[2][5]+m2[0][0]*m1[2][5]*m0[1][5]-m2[0][0]*m1[1][5]*m0[2][5]; 
  M1(row,23) = m2[2][5]*m1[1][5]*m0[0][1]+m2[2][5]*m1[1][4]*m0[0][3]+m2[2][5]*m1[1][3]*m0[0][4]+m2[2][5]*m1[1][1]*m0[0][5]-m2[2][5]*m1[0][5]*m0[1][1]-m2[2][5]*m1[0][4]*m0[1][3]-m2[2][5]*m1[0][3]*m0[1][4]-m2[2][5]*m1[0][1]*m0[1][5]+m2[2][4]*m1[1][5]*m0[0][3]+m2[2][4]*m1[1][3]*m0[0][5]-m2[2][4]*m1[0][5]*m0[1][3]-m2[2][4]*m1[0][3]*m0[1][5]+m2[2][3]*m1[1][5]*m0[0][4]+m2[2][3]*m1[1][4]*m0[0][5]-m2[2][3]*m1[0][5]*m0[1][4]-m2[2][3]*m1[0][4]*m0[1][5]+m2[2][1]*m1[1][5]*m0[0][5]-m2[2][1]*m1[0][5]*m0[1][5]-m2[1][5]*m1[2][5]*m0[0][1]-m2[1][5]*m1[2][4]*m0[0][3]-m2[1][5]*m1[2][3]*m0[0][4]-m2[1][5]*m1[2][1]*m0[0][5]+m2[1][5]*m1[0][5]*m0[2][1]+m2[1][5]*m1[0][4]*m0[2][3]+m2[1][5]*m1[0][3]*m0[2][4]+m2[1][5]*m1[0][1]*m0[2][5]-m2[1][4]*m1[2][5]*m0[0][3]-m2[1][4]*m1[2][3]*m0[0][5]+m2[1][4]*m1[0][5]*m0[2][3]+m2[1][4]*m1[0][3]*m0[2][5]-m2[1][3]*m1[2][5]*m0[0][4]-m2[1][3]*m1[2][4]*m0[0][5]+m2[1][3]*m1[0][5]*m0[2][4]+m2[1][3]*m1[0][4]*m0[2][5]-m2[1][1]*m1[2][5]*m0[0][5]+m2[1][1]*m1[0][5]*m0[2][5]+m2[0][5]*m1[2][5]*m0[1][1]+m2[0][5]*m1[2][4]*m0[1][3]+m2[0][5]*m1[2][3]*m0[1][4]+m2[0][5]*m1[2][1]*m0[1][5]-m2[0][5]*m1[1][5]*m0[2][1]-m2[0][5]*m1[1][4]*m0[2][3]-m2[0][5]*m1[1][3]*m0[2][4]-m2[0][5]*m1[1][1]*m0[2][5]+m2[0][4]*m1[2][5]*m0[1][3]+m2[0][4]*m1[2][3]*m0[1][5]-m2[0][4]*m1[1][5]*m0[2][3]-m2[0][4]*m1[1][3]*m0[2][5]+m2[0][3]*m1[2][5]*m0[1][4]+m2[0][3]*m1[2][4]*m0[1][5]-m2[0][3]*m1[1][5]*m0[2][4]-m2[0][3]*m1[1][4]*m0[2][5]+m2[0][1]*m1[2][5]*m0[1][5]-m2[0][1]*m1[1][5]*m0[2][5]; 
  M1(row,24) = m2[2][5]*m1[1][5]*m0[0][2]+m2[2][5]*m1[1][4]*m0[0][4]+m2[2][5]*m1[1][2]*m0[0][5]-m2[2][5]*m1[0][5]*m0[1][2]-m2[2][5]*m1[0][4]*m0[1][4]-m2[2][5]*m1[0][2]*m0[1][5]+m2[2][4]*m1[1][5]*m0[0][4]+m2[2][4]*m1[1][4]*m0[0][5]-m2[2][4]*m1[0][5]*m0[1][4]-m2[2][4]*m1[0][4]*m0[1][5]+m2[2][2]*m1[1][5]*m0[0][5]-m2[2][2]*m1[0][5]*m0[1][5]-m2[1][5]*m1[2][5]*m0[0][2]-m2[1][5]*m1[2][4]*m0[0][4]-m2[1][5]*m1[2][2]*m0[0][5]+m2[1][5]*m1[0][5]*m0[2][2]+m2[1][5]*m1[0][4]*m0[2][4]+m2[1][5]*m1[0][2]*m0[2][5]-m2[1][4]*m1[2][5]*m0[0][4]-m2[1][4]*m1[2][4]*m0[0][5]+m2[1][4]*m1[0][5]*m0[2][4]+m2[1][4]*m1[0][4]*m0[2][5]-m2[1][2]*m1[2][5]*m0[0][5]+m2[1][2]*m1[0][5]*m0[2][5]+m2[0][5]*m1[2][5]*m0[1][2]+m2[0][5]*m1[2][4]*m0[1][4]+m2[0][5]*m1[2][2]*m0[1][5]-m2[0][5]*m1[1][5]*m0[2][2]-m2[0][5]*m1[1][4]*m0[2][4]-m2[0][5]*m1[1][2]*m0[2][5]+m2[0][4]*m1[2][5]*m0[1][4]+m2[0][4]*m1[2][4]*m0[1][5]-m2[0][4]*m1[1][5]*m0[2][4]-m2[0][4]*m1[1][4]*m0[2][5]+m2[0][2]*m1[2][5]*m0[1][5]-m2[0][2]*m1[1][5]*m0[2][5]; 
  M1(row,25) = m2[2][5]*m1[1][5]*m0[0][3]+m2[2][5]*m1[1][3]*m0[0][5]-m2[2][5]*m1[0][5]*m0[1][3]-m2[2][5]*m1[0][3]*m0[1][5]+m2[2][3]*m1[1][5]*m0[0][5]-m2[2][3]*m1[0][5]*m0[1][5]-m2[1][5]*m1[2][5]*m0[0][3]-m2[1][5]*m1[2][3]*m0[0][5]+m2[1][5]*m1[0][5]*m0[2][3]+m2[1][5]*m1[0][3]*m0[2][5]-m2[1][3]*m1[2][5]*m0[0][5]+m2[1][3]*m1[0][5]*m0[2][5]+m2[0][5]*m1[2][5]*m0[1][3]+m2[0][5]*m1[2][3]*m0[1][5]-m2[0][5]*m1[1][5]*m0[2][3]-m2[0][5]*m1[1][3]*m0[2][5]+m2[0][3]*m1[2][5]*m0[1][5]-m2[0][3]*m1[1][5]*m0[2][5]; 
  M1(row,26) = m2[2][5]*m1[1][5]*m0[0][4]+m2[2][5]*m1[1][4]*m0[0][5]-m2[2][5]*m1[0][5]*m0[1][4]-m2[2][5]*m1[0][4]*m0[1][5]+m2[2][4]*m1[1][5]*m0[0][5]-m2[2][4]*m1[0][5]*m0[1][5]-m2[1][5]*m1[2][5]*m0[0][4]-m2[1][5]*m1[2][4]*m0[0][5]+m2[1][5]*m1[0][5]*m0[2][4]+m2[1][5]*m1[0][4]*m0[2][5]-m2[1][4]*m1[2][5]*m0[0][5]+m2[1][4]*m1[0][5]*m0[2][5]+m2[0][5]*m1[2][5]*m0[1][4]+m2[0][5]*m1[2][4]*m0[1][5]-m2[0][5]*m1[1][5]*m0[2][4]-m2[0][5]*m1[1][4]*m0[2][5]+m2[0][4]*m1[2][5]*m0[1][5]-m2[0][4]*m1[1][5]*m0[2][5]; 
  M1(row,27) = m2[2][5]*m1[1][5]*m0[0][5]-m2[2][5]*m1[0][5]*m0[1][5]-m2[1][5]*m1[2][5]*m0[0][5]+m2[1][5]*m1[0][5]*m0[2][5]+m2[0][5]*m1[2][5]*m0[1][5]-m2[0][5]*m1[1][5]*m0[2][5]; 
  M1(row,28) = m2[2][6]*m1[1][0]*m0[0][0]-m2[2][6]*m1[0][0]*m0[1][0]+m2[2][0]*m1[1][6]*m0[0][0]+m2[2][0]*m1[1][0]*m0[0][6]-m2[2][0]*m1[0][6]*m0[1][0]-m2[2][0]*m1[0][0]*m0[1][6]-m2[1][6]*m1[2][0]*m0[0][0]+m2[1][6]*m1[0][0]*m0[2][0]-m2[1][0]*m1[2][6]*m0[0][0]-m2[1][0]*m1[2][0]*m0[0][6]+m2[1][0]*m1[0][6]*m0[2][0]+m2[1][0]*m1[0][0]*m0[2][6]+m2[0][6]*m1[2][0]*m0[1][0]-m2[0][6]*m1[1][0]*m0[2][0]+m2[0][0]*m1[2][6]*m0[1][0]+m2[0][0]*m1[2][0]*m0[1][6]-m2[0][0]*m1[1][6]*m0[2][0]-m2[0][0]*m1[1][0]*m0[2][6]; 
  M1(row,29) = m2[2][7]*m1[1][0]*m0[0][0]-m2[2][7]*m1[0][0]*m0[1][0]+m2[2][6]*m1[1][1]*m0[0][0]+m2[2][6]*m1[1][0]*m0[0][1]-m2[2][6]*m1[0][1]*m0[1][0]-m2[2][6]*m1[0][0]*m0[1][1]+m2[2][1]*m1[1][6]*m0[0][0]+m2[2][1]*m1[1][0]*m0[0][6]-m2[2][1]*m1[0][6]*m0[1][0]-m2[2][1]*m1[0][0]*m0[1][6]+m2[2][0]*m1[1][7]*m0[0][0]+m2[2][0]*m1[1][6]*m0[0][1]+m2[2][0]*m1[1][1]*m0[0][6]+m2[2][0]*m1[1][0]*m0[0][7]-m2[2][0]*m1[0][7]*m0[1][0]-m2[2][0]*m1[0][6]*m0[1][1]-m2[2][0]*m1[0][1]*m0[1][6]-m2[2][0]*m1[0][0]*m0[1][7]-m2[1][7]*m1[2][0]*m0[0][0]+m2[1][7]*m1[0][0]*m0[2][0]-m2[1][6]*m1[2][1]*m0[0][0]-m2[1][6]*m1[2][0]*m0[0][1]+m2[1][6]*m1[0][1]*m0[2][0]+m2[1][6]*m1[0][0]*m0[2][1]-m2[1][1]*m1[2][6]*m0[0][0]-m2[1][1]*m1[2][0]*m0[0][6]+m2[1][1]*m1[0][6]*m0[2][0]+m2[1][1]*m1[0][0]*m0[2][6]-m2[1][0]*m1[2][7]*m0[0][0]-m2[1][0]*m1[2][6]*m0[0][1]-m2[1][0]*m1[2][1]*m0[0][6]-m2[1][0]*m1[2][0]*m0[0][7]+m2[1][0]*m1[0][7]*m0[2][0]+m2[1][0]*m1[0][6]*m0[2][1]+m2[1][0]*m1[0][1]*m0[2][6]+m2[1][0]*m1[0][0]*m0[2][7]+m2[0][7]*m1[2][0]*m0[1][0]-m2[0][7]*m1[1][0]*m0[2][0]+m2[0][6]*m1[2][1]*m0[1][0]+m2[0][6]*m1[2][0]*m0[1][1]-m2[0][6]*m1[1][1]*m0[2][0]-m2[0][6]*m1[1][0]*m0[2][1]+m2[0][1]*m1[2][6]*m0[1][0]+m2[0][1]*m1[2][0]*m0[1][6]-m2[0][1]*m1[1][6]*m0[2][0]-m2[0][1]*m1[1][0]*m0[2][6]+m2[0][0]*m1[2][7]*m0[1][0]+m2[0][0]*m1[2][6]*m0[1][1]+m2[0][0]*m1[2][1]*m0[1][6]+m2[0][0]*m1[2][0]*m0[1][7]-m2[0][0]*m1[1][7]*m0[2][0]-m2[0][0]*m1[1][6]*m0[2][1]-m2[0][0]*m1[1][1]*m0[2][6]-m2[0][0]*m1[1][0]*m0[2][7]; 
  M1(row,30) = m2[2][7]*m1[1][1]*m0[0][0]+m2[2][7]*m1[1][0]*m0[0][1]-m2[2][7]*m1[0][1]*m0[1][0]-m2[2][7]*m1[0][0]*m0[1][1]+m2[2][6]*m1[1][2]*m0[0][0]+m2[2][6]*m1[1][1]*m0[0][1]+m2[2][6]*m1[1][0]*m0[0][2]-m2[2][6]*m1[0][2]*m0[1][0]-m2[2][6]*m1[0][1]*m0[1][1]-m2[2][6]*m1[0][0]*m0[1][2]+m2[2][2]*m1[1][6]*m0[0][0]+m2[2][2]*m1[1][0]*m0[0][6]-m2[2][2]*m1[0][6]*m0[1][0]-m2[2][2]*m1[0][0]*m0[1][6]+m2[2][1]*m1[1][7]*m0[0][0]+m2[2][1]*m1[1][6]*m0[0][1]+m2[2][1]*m1[1][1]*m0[0][6]+m2[2][1]*m1[1][0]*m0[0][7]-m2[2][1]*m1[0][7]*m0[1][0]-m2[2][1]*m1[0][6]*m0[1][1]-m2[2][1]*m1[0][1]*m0[1][6]-m2[2][1]*m1[0][0]*m0[1][7]+m2[2][0]*m1[1][7]*m0[0][1]+m2[2][0]*m1[1][6]*m0[0][2]+m2[2][0]*m1[1][2]*m0[0][6]+m2[2][0]*m1[1][1]*m0[0][7]-m2[2][0]*m1[0][7]*m0[1][1]-m2[2][0]*m1[0][6]*m0[1][2]-m2[2][0]*m1[0][2]*m0[1][6]-m2[2][0]*m1[0][1]*m0[1][7]-m2[1][7]*m1[2][1]*m0[0][0]-m2[1][7]*m1[2][0]*m0[0][1]+m2[1][7]*m1[0][1]*m0[2][0]+m2[1][7]*m1[0][0]*m0[2][1]-m2[1][6]*m1[2][2]*m0[0][0]-m2[1][6]*m1[2][1]*m0[0][1]-m2[1][6]*m1[2][0]*m0[0][2]+m2[1][6]*m1[0][2]*m0[2][0]+m2[1][6]*m1[0][1]*m0[2][1]+m2[1][6]*m1[0][0]*m0[2][2]-m2[1][2]*m1[2][6]*m0[0][0]-m2[1][2]*m1[2][0]*m0[0][6]+m2[1][2]*m1[0][6]*m0[2][0]+m2[1][2]*m1[0][0]*m0[2][6]-m2[1][1]*m1[2][7]*m0[0][0]-m2[1][1]*m1[2][6]*m0[0][1]-m2[1][1]*m1[2][1]*m0[0][6]-m2[1][1]*m1[2][0]*m0[0][7]+m2[1][1]*m1[0][7]*m0[2][0]+m2[1][1]*m1[0][6]*m0[2][1]+m2[1][1]*m1[0][1]*m0[2][6]+m2[1][1]*m1[0][0]*m0[2][7]-m2[1][0]*m1[2][7]*m0[0][1]-m2[1][0]*m1[2][6]*m0[0][2]-m2[1][0]*m1[2][2]*m0[0][6]-m2[1][0]*m1[2][1]*m0[0][7]+m2[1][0]*m1[0][7]*m0[2][1]+m2[1][0]*m1[0][6]*m0[2][2]+m2[1][0]*m1[0][2]*m0[2][6]+m2[1][0]*m1[0][1]*m0[2][7]+m2[0][7]*m1[2][1]*m0[1][0]+m2[0][7]*m1[2][0]*m0[1][1]-m2[0][7]*m1[1][1]*m0[2][0]-m2[0][7]*m1[1][0]*m0[2][1]+m2[0][6]*m1[2][2]*m0[1][0]+m2[0][6]*m1[2][1]*m0[1][1]+m2[0][6]*m1[2][0]*m0[1][2]-m2[0][6]*m1[1][2]*m0[2][0]-m2[0][6]*m1[1][1]*m0[2][1]-m2[0][6]*m1[1][0]*m0[2][2]+m2[0][2]*m1[2][6]*m0[1][0]+m2[0][2]*m1[2][0]*m0[1][6]-m2[0][2]*m1[1][6]*m0[2][0]-m2[0][2]*m1[1][0]*m0[2][6]+m2[0][1]*m1[2][7]*m0[1][0]+m2[0][1]*m1[2][6]*m0[1][1]+m2[0][1]*m1[2][1]*m0[1][6]+m2[0][1]*m1[2][0]*m0[1][7]-m2[0][1]*m1[1][7]*m0[2][0]-m2[0][1]*m1[1][6]*m0[2][1]-m2[0][1]*m1[1][1]*m0[2][6]-m2[0][1]*m1[1][0]*m0[2][7]+m2[0][0]*m1[2][7]*m0[1][1]+m2[0][0]*m1[2][6]*m0[1][2]+m2[0][0]*m1[2][2]*m0[1][6]+m2[0][0]*m1[2][1]*m0[1][7]-m2[0][0]*m1[1][7]*m0[2][1]-m2[0][0]*m1[1][6]*m0[2][2]-m2[0][0]*m1[1][2]*m0[2][6]-m2[0][0]*m1[1][1]*m0[2][7]; 
  M1(row,31) = m2[2][7]*m1[1][2]*m0[0][0]+m2[2][7]*m1[1][1]*m0[0][1]+m2[2][7]*m1[1][0]*m0[0][2]-m2[2][7]*m1[0][2]*m0[1][0]-m2[2][7]*m1[0][1]*m0[1][1]-m2[2][7]*m1[0][0]*m0[1][2]+m2[2][6]*m1[1][2]*m0[0][1]+m2[2][6]*m1[1][1]*m0[0][2]-m2[2][6]*m1[0][2]*m0[1][1]-m2[2][6]*m1[0][1]*m0[1][2]+m2[2][2]*m1[1][7]*m0[0][0]+m2[2][2]*m1[1][6]*m0[0][1]+m2[2][2]*m1[1][1]*m0[0][6]+m2[2][2]*m1[1][0]*m0[0][7]-m2[2][2]*m1[0][7]*m0[1][0]-m2[2][2]*m1[0][6]*m0[1][1]-m2[2][2]*m1[0][1]*m0[1][6]-m2[2][2]*m1[0][0]*m0[1][7]+m2[2][1]*m1[1][7]*m0[0][1]+m2[2][1]*m1[1][6]*m0[0][2]+m2[2][1]*m1[1][2]*m0[0][6]+m2[2][1]*m1[1][1]*m0[0][7]-m2[2][1]*m1[0][7]*m0[1][1]-m2[2][1]*m1[0][6]*m0[1][2]-m2[2][1]*m1[0][2]*m0[1][6]-m2[2][1]*m1[0][1]*m0[1][7]+m2[2][0]*m1[1][7]*m0[0][2]+m2[2][0]*m1[1][2]*m0[0][7]-m2[2][0]*m1[0][7]*m0[1][2]-m2[2][0]*m1[0][2]*m0[1][7]-m2[1][7]*m1[2][2]*m0[0][0]-m2[1][7]*m1[2][1]*m0[0][1]-m2[1][7]*m1[2][0]*m0[0][2]+m2[1][7]*m1[0][2]*m0[2][0]+m2[1][7]*m1[0][1]*m0[2][1]+m2[1][7]*m1[0][0]*m0[2][2]-m2[1][6]*m1[2][2]*m0[0][1]-m2[1][6]*m1[2][1]*m0[0][2]+m2[1][6]*m1[0][2]*m0[2][1]+m2[1][6]*m1[0][1]*m0[2][2]-m2[1][2]*m1[2][7]*m0[0][0]-m2[1][2]*m1[2][6]*m0[0][1]-m2[1][2]*m1[2][1]*m0[0][6]-m2[1][2]*m1[2][0]*m0[0][7]+m2[1][2]*m1[0][7]*m0[2][0]+m2[1][2]*m1[0][6]*m0[2][1]+m2[1][2]*m1[0][1]*m0[2][6]+m2[1][2]*m1[0][0]*m0[2][7]-m2[1][1]*m1[2][7]*m0[0][1]-m2[1][1]*m1[2][6]*m0[0][2]-m2[1][1]*m1[2][2]*m0[0][6]-m2[1][1]*m1[2][1]*m0[0][7]+m2[1][1]*m1[0][7]*m0[2][1]+m2[1][1]*m1[0][6]*m0[2][2]+m2[1][1]*m1[0][2]*m0[2][6]+m2[1][1]*m1[0][1]*m0[2][7]-m2[1][0]*m1[2][7]*m0[0][2]-m2[1][0]*m1[2][2]*m0[0][7]+m2[1][0]*m1[0][7]*m0[2][2]+m2[1][0]*m1[0][2]*m0[2][7]+m2[0][7]*m1[2][2]*m0[1][0]+m2[0][7]*m1[2][1]*m0[1][1]+m2[0][7]*m1[2][0]*m0[1][2]-m2[0][7]*m1[1][2]*m0[2][0]-m2[0][7]*m1[1][1]*m0[2][1]-m2[0][7]*m1[1][0]*m0[2][2]+m2[0][6]*m1[2][2]*m0[1][1]+m2[0][6]*m1[2][1]*m0[1][2]-m2[0][6]*m1[1][2]*m0[2][1]-m2[0][6]*m1[1][1]*m0[2][2]+m2[0][2]*m1[2][7]*m0[1][0]+m2[0][2]*m1[2][6]*m0[1][1]+m2[0][2]*m1[2][1]*m0[1][6]+m2[0][2]*m1[2][0]*m0[1][7]-m2[0][2]*m1[1][7]*m0[2][0]-m2[0][2]*m1[1][6]*m0[2][1]-m2[0][2]*m1[1][1]*m0[2][6]-m2[0][2]*m1[1][0]*m0[2][7]+m2[0][1]*m1[2][7]*m0[1][1]+m2[0][1]*m1[2][6]*m0[1][2]+m2[0][1]*m1[2][2]*m0[1][6]+m2[0][1]*m1[2][1]*m0[1][7]-m2[0][1]*m1[1][7]*m0[2][1]-m2[0][1]*m1[1][6]*m0[2][2]-m2[0][1]*m1[1][2]*m0[2][6]-m2[0][1]*m1[1][1]*m0[2][7]+m2[0][0]*m1[2][7]*m0[1][2]+m2[0][0]*m1[2][2]*m0[1][7]-m2[0][0]*m1[1][7]*m0[2][2]-m2[0][0]*m1[1][2]*m0[2][7]; 
  M1(row,32) = m2[2][7]*m1[1][2]*m0[0][1]+m2[2][7]*m1[1][1]*m0[0][2]-m2[2][7]*m1[0][2]*m0[1][1]-m2[2][7]*m1[0][1]*m0[1][2]+m2[2][6]*m1[1][2]*m0[0][2]-m2[2][6]*m1[0][2]*m0[1][2]+m2[2][2]*m1[1][7]*m0[0][1]+m2[2][2]*m1[1][6]*m0[0][2]+m2[2][2]*m1[1][2]*m0[0][6]+m2[2][2]*m1[1][1]*m0[0][7]-m2[2][2]*m1[0][7]*m0[1][1]-m2[2][2]*m1[0][6]*m0[1][2]-m2[2][2]*m1[0][2]*m0[1][6]-m2[2][2]*m1[0][1]*m0[1][7]+m2[2][1]*m1[1][7]*m0[0][2]+m2[2][1]*m1[1][2]*m0[0][7]-m2[2][1]*m1[0][7]*m0[1][2]-m2[2][1]*m1[0][2]*m0[1][7]-m2[1][7]*m1[2][2]*m0[0][1]-m2[1][7]*m1[2][1]*m0[0][2]+m2[1][7]*m1[0][2]*m0[2][1]+m2[1][7]*m1[0][1]*m0[2][2]-m2[1][6]*m1[2][2]*m0[0][2]+m2[1][6]*m1[0][2]*m0[2][2]-m2[1][2]*m1[2][7]*m0[0][1]-m2[1][2]*m1[2][6]*m0[0][2]-m2[1][2]*m1[2][2]*m0[0][6]-m2[1][2]*m1[2][1]*m0[0][7]+m2[1][2]*m1[0][7]*m0[2][1]+m2[1][2]*m1[0][6]*m0[2][2]+m2[1][2]*m1[0][2]*m0[2][6]+m2[1][2]*m1[0][1]*m0[2][7]-m2[1][1]*m1[2][7]*m0[0][2]-m2[1][1]*m1[2][2]*m0[0][7]+m2[1][1]*m1[0][7]*m0[2][2]+m2[1][1]*m1[0][2]*m0[2][7]+m2[0][7]*m1[2][2]*m0[1][1]+m2[0][7]*m1[2][1]*m0[1][2]-m2[0][7]*m1[1][2]*m0[2][1]-m2[0][7]*m1[1][1]*m0[2][2]+m2[0][6]*m1[2][2]*m0[1][2]-m2[0][6]*m1[1][2]*m0[2][2]+m2[0][2]*m1[2][7]*m0[1][1]+m2[0][2]*m1[2][6]*m0[1][2]+m2[0][2]*m1[2][2]*m0[1][6]+m2[0][2]*m1[2][1]*m0[1][7]-m2[0][2]*m1[1][7]*m0[2][1]-m2[0][2]*m1[1][6]*m0[2][2]-m2[0][2]*m1[1][2]*m0[2][6]-m2[0][2]*m1[1][1]*m0[2][7]+m2[0][1]*m1[2][7]*m0[1][2]+m2[0][1]*m1[2][2]*m0[1][7]-m2[0][1]*m1[1][7]*m0[2][2]-m2[0][1]*m1[1][2]*m0[2][7]; 
  M1(row,33) = m2[2][7]*m1[1][2]*m0[0][2]-m2[2][7]*m1[0][2]*m0[1][2]+m2[2][2]*m1[1][7]*m0[0][2]+m2[2][2]*m1[1][2]*m0[0][7]-m2[2][2]*m1[0][7]*m0[1][2]-m2[2][2]*m1[0][2]*m0[1][7]-m2[1][7]*m1[2][2]*m0[0][2]+m2[1][7]*m1[0][2]*m0[2][2]-m2[1][2]*m1[2][7]*m0[0][2]-m2[1][2]*m1[2][2]*m0[0][7]+m2[1][2]*m1[0][7]*m0[2][2]+m2[1][2]*m1[0][2]*m0[2][7]+m2[0][7]*m1[2][2]*m0[1][2]-m2[0][7]*m1[1][2]*m0[2][2]+m2[0][2]*m1[2][7]*m0[1][2]+m2[0][2]*m1[2][2]*m0[1][7]-m2[0][2]*m1[1][7]*m0[2][2]-m2[0][2]*m1[1][2]*m0[2][7]; 
  M1(row,34) = m2[2][8]*m1[1][0]*m0[0][0]-m2[2][8]*m1[0][0]*m0[1][0]+m2[2][6]*m1[1][3]*m0[0][0]+m2[2][6]*m1[1][0]*m0[0][3]-m2[2][6]*m1[0][3]*m0[1][0]-m2[2][6]*m1[0][0]*m0[1][3]+m2[2][3]*m1[1][6]*m0[0][0]+m2[2][3]*m1[1][0]*m0[0][6]-m2[2][3]*m1[0][6]*m0[1][0]-m2[2][3]*m1[0][0]*m0[1][6]+m2[2][0]*m1[1][8]*m0[0][0]+m2[2][0]*m1[1][6]*m0[0][3]+m2[2][0]*m1[1][3]*m0[0][6]+m2[2][0]*m1[1][0]*m0[0][8]-m2[2][0]*m1[0][8]*m0[1][0]-m2[2][0]*m1[0][6]*m0[1][3]-m2[2][0]*m1[0][3]*m0[1][6]-m2[2][0]*m1[0][0]*m0[1][8]-m2[1][8]*m1[2][0]*m0[0][0]+m2[1][8]*m1[0][0]*m0[2][0]-m2[1][6]*m1[2][3]*m0[0][0]-m2[1][6]*m1[2][0]*m0[0][3]+m2[1][6]*m1[0][3]*m0[2][0]+m2[1][6]*m1[0][0]*m0[2][3]-m2[1][3]*m1[2][6]*m0[0][0]-m2[1][3]*m1[2][0]*m0[0][6]+m2[1][3]*m1[0][6]*m0[2][0]+m2[1][3]*m1[0][0]*m0[2][6]-m2[1][0]*m1[2][8]*m0[0][0]-m2[1][0]*m1[2][6]*m0[0][3]-m2[1][0]*m1[2][3]*m0[0][6]-m2[1][0]*m1[2][0]*m0[0][8]+m2[1][0]*m1[0][8]*m0[2][0]+m2[1][0]*m1[0][6]*m0[2][3]+m2[1][0]*m1[0][3]*m0[2][6]+m2[1][0]*m1[0][0]*m0[2][8]+m2[0][8]*m1[2][0]*m0[1][0]-m2[0][8]*m1[1][0]*m0[2][0]+m2[0][6]*m1[2][3]*m0[1][0]+m2[0][6]*m1[2][0]*m0[1][3]-m2[0][6]*m1[1][3]*m0[2][0]-m2[0][6]*m1[1][0]*m0[2][3]+m2[0][3]*m1[2][6]*m0[1][0]+m2[0][3]*m1[2][0]*m0[1][6]-m2[0][3]*m1[1][6]*m0[2][0]-m2[0][3]*m1[1][0]*m0[2][6]+m2[0][0]*m1[2][8]*m0[1][0]+m2[0][0]*m1[2][6]*m0[1][3]+m2[0][0]*m1[2][3]*m0[1][6]+m2[0][0]*m1[2][0]*m0[1][8]-m2[0][0]*m1[1][8]*m0[2][0]-m2[0][0]*m1[1][6]*m0[2][3]-m2[0][0]*m1[1][3]*m0[2][6]-m2[0][0]*m1[1][0]*m0[2][8]; 
  M1(row,35) = m2[2][8]*m1[1][1]*m0[0][0]+m2[2][8]*m1[1][0]*m0[0][1]-m2[2][8]*m1[0][1]*m0[1][0]-m2[2][8]*m1[0][0]*m0[1][1]+m2[2][7]*m1[1][3]*m0[0][0]+m2[2][7]*m1[1][0]*m0[0][3]-m2[2][7]*m1[0][3]*m0[1][0]-m2[2][7]*m1[0][0]*m0[1][3]+m2[2][6]*m1[1][4]*m0[0][0]+m2[2][6]*m1[1][3]*m0[0][1]+m2[2][6]*m1[1][1]*m0[0][3]+m2[2][6]*m1[1][0]*m0[0][4]-m2[2][6]*m1[0][4]*m0[1][0]-m2[2][6]*m1[0][3]*m0[1][1]-m2[2][6]*m1[0][1]*m0[1][3]-m2[2][6]*m1[0][0]*m0[1][4]+m2[2][4]*m1[1][6]*m0[0][0]+m2[2][4]*m1[1][0]*m0[0][6]-m2[2][4]*m1[0][6]*m0[1][0]-m2[2][4]*m1[0][0]*m0[1][6]+m2[2][3]*m1[1][7]*m0[0][0]+m2[2][3]*m1[1][6]*m0[0][1]+m2[2][3]*m1[1][1]*m0[0][6]+m2[2][3]*m1[1][0]*m0[0][7]-m2[2][3]*m1[0][7]*m0[1][0]-m2[2][3]*m1[0][6]*m0[1][1]-m2[2][3]*m1[0][1]*m0[1][6]-m2[2][3]*m1[0][0]*m0[1][7]+m2[2][1]*m1[1][8]*m0[0][0]+m2[2][1]*m1[1][6]*m0[0][3]+m2[2][1]*m1[1][3]*m0[0][6]+m2[2][1]*m1[1][0]*m0[0][8]-m2[2][1]*m1[0][8]*m0[1][0]-m2[2][1]*m1[0][6]*m0[1][3]-m2[2][1]*m1[0][3]*m0[1][6]-m2[2][1]*m1[0][0]*m0[1][8]+m2[2][0]*m1[1][8]*m0[0][1]+m2[2][0]*m1[1][7]*m0[0][3]+m2[2][0]*m1[1][6]*m0[0][4]+m2[2][0]*m1[1][4]*m0[0][6]+m2[2][0]*m1[1][3]*m0[0][7]+m2[2][0]*m1[1][1]*m0[0][8]-m2[2][0]*m1[0][8]*m0[1][1]-m2[2][0]*m1[0][7]*m0[1][3]-m2[2][0]*m1[0][6]*m0[1][4]-m2[2][0]*m1[0][4]*m0[1][6]-m2[2][0]*m1[0][3]*m0[1][7]-m2[2][0]*m1[0][1]*m0[1][8]-m2[1][8]*m1[2][1]*m0[0][0]-m2[1][8]*m1[2][0]*m0[0][1]+m2[1][8]*m1[0][1]*m0[2][0]+m2[1][8]*m1[0][0]*m0[2][1]-m2[1][7]*m1[2][3]*m0[0][0]-m2[1][7]*m1[2][0]*m0[0][3]+m2[1][7]*m1[0][3]*m0[2][0]+m2[1][7]*m1[0][0]*m0[2][3]-m2[1][6]*m1[2][4]*m0[0][0]-m2[1][6]*m1[2][3]*m0[0][1]-m2[1][6]*m1[2][1]*m0[0][3]-m2[1][6]*m1[2][0]*m0[0][4]+m2[1][6]*m1[0][4]*m0[2][0]+m2[1][6]*m1[0][3]*m0[2][1]+m2[1][6]*m1[0][1]*m0[2][3]+m2[1][6]*m1[0][0]*m0[2][4]-m2[1][4]*m1[2][6]*m0[0][0]-m2[1][4]*m1[2][0]*m0[0][6]+m2[1][4]*m1[0][6]*m0[2][0]+m2[1][4]*m1[0][0]*m0[2][6]-m2[1][3]*m1[2][7]*m0[0][0]-m2[1][3]*m1[2][6]*m0[0][1]-m2[1][3]*m1[2][1]*m0[0][6]-m2[1][3]*m1[2][0]*m0[0][7]+m2[1][3]*m1[0][7]*m0[2][0]+m2[1][3]*m1[0][6]*m0[2][1]+m2[1][3]*m1[0][1]*m0[2][6]+m2[1][3]*m1[0][0]*m0[2][7]-m2[1][1]*m1[2][8]*m0[0][0]-m2[1][1]*m1[2][6]*m0[0][3]-m2[1][1]*m1[2][3]*m0[0][6]-m2[1][1]*m1[2][0]*m0[0][8]+m2[1][1]*m1[0][8]*m0[2][0]+m2[1][1]*m1[0][6]*m0[2][3]+m2[1][1]*m1[0][3]*m0[2][6]+m2[1][1]*m1[0][0]*m0[2][8]-m2[1][0]*m1[2][8]*m0[0][1]-m2[1][0]*m1[2][7]*m0[0][3]-m2[1][0]*m1[2][6]*m0[0][4]-m2[1][0]*m1[2][4]*m0[0][6]-m2[1][0]*m1[2][3]*m0[0][7]-m2[1][0]*m1[2][1]*m0[0][8]+m2[1][0]*m1[0][8]*m0[2][1]+m2[1][0]*m1[0][7]*m0[2][3]+m2[1][0]*m1[0][6]*m0[2][4]+m2[1][0]*m1[0][4]*m0[2][6]+m2[1][0]*m1[0][3]*m0[2][7]+m2[1][0]*m1[0][1]*m0[2][8]+m2[0][8]*m1[2][1]*m0[1][0]+m2[0][8]*m1[2][0]*m0[1][1]-m2[0][8]*m1[1][1]*m0[2][0]-m2[0][8]*m1[1][0]*m0[2][1]+m2[0][7]*m1[2][3]*m0[1][0]+m2[0][7]*m1[2][0]*m0[1][3]-m2[0][7]*m1[1][3]*m0[2][0]-m2[0][7]*m1[1][0]*m0[2][3]+m2[0][6]*m1[2][4]*m0[1][0]+m2[0][6]*m1[2][3]*m0[1][1]+m2[0][6]*m1[2][1]*m0[1][3]+m2[0][6]*m1[2][0]*m0[1][4]-m2[0][6]*m1[1][4]*m0[2][0]-m2[0][6]*m1[1][3]*m0[2][1]-m2[0][6]*m1[1][1]*m0[2][3]-m2[0][6]*m1[1][0]*m0[2][4]+m2[0][4]*m1[2][6]*m0[1][0]+m2[0][4]*m1[2][0]*m0[1][6]-m2[0][4]*m1[1][6]*m0[2][0]-m2[0][4]*m1[1][0]*m0[2][6]+m2[0][3]*m1[2][7]*m0[1][0]+m2[0][3]*m1[2][6]*m0[1][1]+m2[0][3]*m1[2][1]*m0[1][6]+m2[0][3]*m1[2][0]*m0[1][7]-m2[0][3]*m1[1][7]*m0[2][0]-m2[0][3]*m1[1][6]*m0[2][1]-m2[0][3]*m1[1][1]*m0[2][6]-m2[0][3]*m1[1][0]*m0[2][7]+m2[0][1]*m1[2][8]*m0[1][0]+m2[0][1]*m1[2][6]*m0[1][3]+m2[0][1]*m1[2][3]*m0[1][6]+m2[0][1]*m1[2][0]*m0[1][8]-m2[0][1]*m1[1][8]*m0[2][0]-m2[0][1]*m1[1][6]*m0[2][3]-m2[0][1]*m1[1][3]*m0[2][6]-m2[0][1]*m1[1][0]*m0[2][8]+m2[0][0]*m1[2][8]*m0[1][1]+m2[0][0]*m1[2][7]*m0[1][3]+m2[0][0]*m1[2][6]*m0[1][4]+m2[0][0]*m1[2][4]*m0[1][6]+m2[0][0]*m1[2][3]*m0[1][7]+m2[0][0]*m1[2][1]*m0[1][8]-m2[0][0]*m1[1][8]*m0[2][1]-m2[0][0]*m1[1][7]*m0[2][3]-m2[0][0]*m1[1][6]*m0[2][4]-m2[0][0]*m1[1][4]*m0[2][6]-m2[0][0]*m1[1][3]*m0[2][7]-m2[0][0]*m1[1][1]*m0[2][8]; 
  M1(row,36) = m2[2][8]*m1[1][2]*m0[0][0]+m2[2][8]*m1[1][1]*m0[0][1]+m2[2][8]*m1[1][0]*m0[0][2]-m2[2][8]*m1[0][2]*m0[1][0]-m2[2][8]*m1[0][1]*m0[1][1]-m2[2][8]*m1[0][0]*m0[1][2]+m2[2][7]*m1[1][4]*m0[0][0]+m2[2][7]*m1[1][3]*m0[0][1]+m2[2][7]*m1[1][1]*m0[0][3]+m2[2][7]*m1[1][0]*m0[0][4]-m2[2][7]*m1[0][4]*m0[1][0]-m2[2][7]*m1[0][3]*m0[1][1]-m2[2][7]*m1[0][1]*m0[1][3]-m2[2][7]*m1[0][0]*m0[1][4]+m2[2][6]*m1[1][4]*m0[0][1]+m2[2][6]*m1[1][3]*m0[0][2]+m2[2][6]*m1[1][2]*m0[0][3]+m2[2][6]*m1[1][1]*m0[0][4]-m2[2][6]*m1[0][4]*m0[1][1]-m2[2][6]*m1[0][3]*m0[1][2]-m2[2][6]*m1[0][2]*m0[1][3]-m2[2][6]*m1[0][1]*m0[1][4]+m2[2][4]*m1[1][7]*m0[0][0]+m2[2][4]*m1[1][6]*m0[0][1]+m2[2][4]*m1[1][1]*m0[0][6]+m2[2][4]*m1[1][0]*m0[0][7]-m2[2][4]*m1[0][7]*m0[1][0]-m2[2][4]*m1[0][6]*m0[1][1]-m2[2][4]*m1[0][1]*m0[1][6]-m2[2][4]*m1[0][0]*m0[1][7]+m2[2][3]*m1[1][7]*m0[0][1]+m2[2][3]*m1[1][6]*m0[0][2]+m2[2][3]*m1[1][2]*m0[0][6]+m2[2][3]*m1[1][1]*m0[0][7]-m2[2][3]*m1[0][7]*m0[1][1]-m2[2][3]*m1[0][6]*m0[1][2]-m2[2][3]*m1[0][2]*m0[1][6]-m2[2][3]*m1[0][1]*m0[1][7]+m2[2][2]*m1[1][8]*m0[0][0]+m2[2][2]*m1[1][6]*m0[0][3]+m2[2][2]*m1[1][3]*m0[0][6]+m2[2][2]*m1[1][0]*m0[0][8]-m2[2][2]*m1[0][8]*m0[1][0]-m2[2][2]*m1[0][6]*m0[1][3]-m2[2][2]*m1[0][3]*m0[1][6]-m2[2][2]*m1[0][0]*m0[1][8]+m2[2][1]*m1[1][8]*m0[0][1]+m2[2][1]*m1[1][7]*m0[0][3]+m2[2][1]*m1[1][6]*m0[0][4]+m2[2][1]*m1[1][4]*m0[0][6]+m2[2][1]*m1[1][3]*m0[0][7]+m2[2][1]*m1[1][1]*m0[0][8]-m2[2][1]*m1[0][8]*m0[1][1]-m2[2][1]*m1[0][7]*m0[1][3]-m2[2][1]*m1[0][6]*m0[1][4]-m2[2][1]*m1[0][4]*m0[1][6]-m2[2][1]*m1[0][3]*m0[1][7]-m2[2][1]*m1[0][1]*m0[1][8]+m2[2][0]*m1[1][8]*m0[0][2]+m2[2][0]*m1[1][7]*m0[0][4]+m2[2][0]*m1[1][4]*m0[0][7]+m2[2][0]*m1[1][2]*m0[0][8]-m2[2][0]*m1[0][8]*m0[1][2]-m2[2][0]*m1[0][7]*m0[1][4]-m2[2][0]*m1[0][4]*m0[1][7]-m2[2][0]*m1[0][2]*m0[1][8]-m2[1][8]*m1[2][2]*m0[0][0]-m2[1][8]*m1[2][1]*m0[0][1]-m2[1][8]*m1[2][0]*m0[0][2]+m2[1][8]*m1[0][2]*m0[2][0]+m2[1][8]*m1[0][1]*m0[2][1]+m2[1][8]*m1[0][0]*m0[2][2]-m2[1][7]*m1[2][4]*m0[0][0]-m2[1][7]*m1[2][3]*m0[0][1]-m2[1][7]*m1[2][1]*m0[0][3]-m2[1][7]*m1[2][0]*m0[0][4]+m2[1][7]*m1[0][4]*m0[2][0]+m2[1][7]*m1[0][3]*m0[2][1]+m2[1][7]*m1[0][1]*m0[2][3]+m2[1][7]*m1[0][0]*m0[2][4]-m2[1][6]*m1[2][4]*m0[0][1]-m2[1][6]*m1[2][3]*m0[0][2]-m2[1][6]*m1[2][2]*m0[0][3]-m2[1][6]*m1[2][1]*m0[0][4]+m2[1][6]*m1[0][4]*m0[2][1]+m2[1][6]*m1[0][3]*m0[2][2]+m2[1][6]*m1[0][2]*m0[2][3]+m2[1][6]*m1[0][1]*m0[2][4]-m2[1][4]*m1[2][7]*m0[0][0]-m2[1][4]*m1[2][6]*m0[0][1]-m2[1][4]*m1[2][1]*m0[0][6]-m2[1][4]*m1[2][0]*m0[0][7]+m2[1][4]*m1[0][7]*m0[2][0]+m2[1][4]*m1[0][6]*m0[2][1]+m2[1][4]*m1[0][1]*m0[2][6]+m2[1][4]*m1[0][0]*m0[2][7]-m2[1][3]*m1[2][7]*m0[0][1]-m2[1][3]*m1[2][6]*m0[0][2]-m2[1][3]*m1[2][2]*m0[0][6]-m2[1][3]*m1[2][1]*m0[0][7]+m2[1][3]*m1[0][7]*m0[2][1]+m2[1][3]*m1[0][6]*m0[2][2]+m2[1][3]*m1[0][2]*m0[2][6]+m2[1][3]*m1[0][1]*m0[2][7]-m2[1][2]*m1[2][8]*m0[0][0]-m2[1][2]*m1[2][6]*m0[0][3]-m2[1][2]*m1[2][3]*m0[0][6]-m2[1][2]*m1[2][0]*m0[0][8]+m2[1][2]*m1[0][8]*m0[2][0]+m2[1][2]*m1[0][6]*m0[2][3]+m2[1][2]*m1[0][3]*m0[2][6]+m2[1][2]*m1[0][0]*m0[2][8]-m2[1][1]*m1[2][8]*m0[0][1]-m2[1][1]*m1[2][7]*m0[0][3]-m2[1][1]*m1[2][6]*m0[0][4]-m2[1][1]*m1[2][4]*m0[0][6]-m2[1][1]*m1[2][3]*m0[0][7]-m2[1][1]*m1[2][1]*m0[0][8]+m2[1][1]*m1[0][8]*m0[2][1]+m2[1][1]*m1[0][7]*m0[2][3]+m2[1][1]*m1[0][6]*m0[2][4]+m2[1][1]*m1[0][4]*m0[2][6]+m2[1][1]*m1[0][3]*m0[2][7]+m2[1][1]*m1[0][1]*m0[2][8]-m2[1][0]*m1[2][8]*m0[0][2]-m2[1][0]*m1[2][7]*m0[0][4]-m2[1][0]*m1[2][4]*m0[0][7]-m2[1][0]*m1[2][2]*m0[0][8]+m2[1][0]*m1[0][8]*m0[2][2]+m2[1][0]*m1[0][7]*m0[2][4]+m2[1][0]*m1[0][4]*m0[2][7]+m2[1][0]*m1[0][2]*m0[2][8]+m2[0][8]*m1[2][2]*m0[1][0]+m2[0][8]*m1[2][1]*m0[1][1]+m2[0][8]*m1[2][0]*m0[1][2]-m2[0][8]*m1[1][2]*m0[2][0]-m2[0][8]*m1[1][1]*m0[2][1]-m2[0][8]*m1[1][0]*m0[2][2]+m2[0][7]*m1[2][4]*m0[1][0]+m2[0][7]*m1[2][3]*m0[1][1]+m2[0][7]*m1[2][1]*m0[1][3]+m2[0][7]*m1[2][0]*m0[1][4]-m2[0][7]*m1[1][4]*m0[2][0]-m2[0][7]*m1[1][3]*m0[2][1]-m2[0][7]*m1[1][1]*m0[2][3]-m2[0][7]*m1[1][0]*m0[2][4]+m2[0][6]*m1[2][4]*m0[1][1]+m2[0][6]*m1[2][3]*m0[1][2]+m2[0][6]*m1[2][2]*m0[1][3]+m2[0][6]*m1[2][1]*m0[1][4]-m2[0][6]*m1[1][4]*m0[2][1]-m2[0][6]*m1[1][3]*m0[2][2]-m2[0][6]*m1[1][2]*m0[2][3]-m2[0][6]*m1[1][1]*m0[2][4]+m2[0][4]*m1[2][7]*m0[1][0]+m2[0][4]*m1[2][6]*m0[1][1]+m2[0][4]*m1[2][1]*m0[1][6]+m2[0][4]*m1[2][0]*m0[1][7]-m2[0][4]*m1[1][7]*m0[2][0]-m2[0][4]*m1[1][6]*m0[2][1]-m2[0][4]*m1[1][1]*m0[2][6]-m2[0][4]*m1[1][0]*m0[2][7]+m2[0][3]*m1[2][7]*m0[1][1]+m2[0][3]*m1[2][6]*m0[1][2]+m2[0][3]*m1[2][2]*m0[1][6]+m2[0][3]*m1[2][1]*m0[1][7]-m2[0][3]*m1[1][7]*m0[2][1]-m2[0][3]*m1[1][6]*m0[2][2]-m2[0][3]*m1[1][2]*m0[2][6]-m2[0][3]*m1[1][1]*m0[2][7]+m2[0][2]*m1[2][8]*m0[1][0]+m2[0][2]*m1[2][6]*m0[1][3]+m2[0][2]*m1[2][3]*m0[1][6]+m2[0][2]*m1[2][0]*m0[1][8]-m2[0][2]*m1[1][8]*m0[2][0]-m2[0][2]*m1[1][6]*m0[2][3]-m2[0][2]*m1[1][3]*m0[2][6]-m2[0][2]*m1[1][0]*m0[2][8]+m2[0][1]*m1[2][8]*m0[1][1]+m2[0][1]*m1[2][7]*m0[1][3]+m2[0][1]*m1[2][6]*m0[1][4]+m2[0][1]*m1[2][4]*m0[1][6]+m2[0][1]*m1[2][3]*m0[1][7]+m2[0][1]*m1[2][1]*m0[1][8]-m2[0][1]*m1[1][8]*m0[2][1]-m2[0][1]*m1[1][7]*m0[2][3]-m2[0][1]*m1[1][6]*m0[2][4]-m2[0][1]*m1[1][4]*m0[2][6]-m2[0][1]*m1[1][3]*m0[2][7]-m2[0][1]*m1[1][1]*m0[2][8]+m2[0][0]*m1[2][8]*m0[1][2]+m2[0][0]*m1[2][7]*m0[1][4]+m2[0][0]*m1[2][4]*m0[1][7]+m2[0][0]*m1[2][2]*m0[1][8]-m2[0][0]*m1[1][8]*m0[2][2]-m2[0][0]*m1[1][7]*m0[2][4]-m2[0][0]*m1[1][4]*m0[2][7]-m2[0][0]*m1[1][2]*m0[2][8]; 
  M1(row,37) = m2[2][8]*m1[1][2]*m0[0][1]+m2[2][8]*m1[1][1]*m0[0][2]-m2[2][8]*m1[0][2]*m0[1][1]-m2[2][8]*m1[0][1]*m0[1][2]+m2[2][7]*m1[1][4]*m0[0][1]+m2[2][7]*m1[1][3]*m0[0][2]+m2[2][7]*m1[1][2]*m0[0][3]+m2[2][7]*m1[1][1]*m0[0][4]-m2[2][7]*m1[0][4]*m0[1][1]-m2[2][7]*m1[0][3]*m0[1][2]-m2[2][7]*m1[0][2]*m0[1][3]-m2[2][7]*m1[0][1]*m0[1][4]+m2[2][6]*m1[1][4]*m0[0][2]+m2[2][6]*m1[1][2]*m0[0][4]-m2[2][6]*m1[0][4]*m0[1][2]-m2[2][6]*m1[0][2]*m0[1][4]+m2[2][4]*m1[1][7]*m0[0][1]+m2[2][4]*m1[1][6]*m0[0][2]+m2[2][4]*m1[1][2]*m0[0][6]+m2[2][4]*m1[1][1]*m0[0][7]-m2[2][4]*m1[0][7]*m0[1][1]-m2[2][4]*m1[0][6]*m0[1][2]-m2[2][4]*m1[0][2]*m0[1][6]-m2[2][4]*m1[0][1]*m0[1][7]+m2[2][3]*m1[1][7]*m0[0][2]+m2[2][3]*m1[1][2]*m0[0][7]-m2[2][3]*m1[0][7]*m0[1][2]-m2[2][3]*m1[0][2]*m0[1][7]+m2[2][2]*m1[1][8]*m0[0][1]+m2[2][2]*m1[1][7]*m0[0][3]+m2[2][2]*m1[1][6]*m0[0][4]+m2[2][2]*m1[1][4]*m0[0][6]+m2[2][2]*m1[1][3]*m0[0][7]+m2[2][2]*m1[1][1]*m0[0][8]-m2[2][2]*m1[0][8]*m0[1][1]-m2[2][2]*m1[0][7]*m0[1][3]-m2[2][2]*m1[0][6]*m0[1][4]-m2[2][2]*m1[0][4]*m0[1][6]-m2[2][2]*m1[0][3]*m0[1][7]-m2[2][2]*m1[0][1]*m0[1][8]+m2[2][1]*m1[1][8]*m0[0][2]+m2[2][1]*m1[1][7]*m0[0][4]+m2[2][1]*m1[1][4]*m0[0][7]+m2[2][1]*m1[1][2]*m0[0][8]-m2[2][1]*m1[0][8]*m0[1][2]-m2[2][1]*m1[0][7]*m0[1][4]-m2[2][1]*m1[0][4]*m0[1][7]-m2[2][1]*m1[0][2]*m0[1][8]-m2[1][8]*m1[2][2]*m0[0][1]-m2[1][8]*m1[2][1]*m0[0][2]+m2[1][8]*m1[0][2]*m0[2][1]+m2[1][8]*m1[0][1]*m0[2][2]-m2[1][7]*m1[2][4]*m0[0][1]-m2[1][7]*m1[2][3]*m0[0][2]-m2[1][7]*m1[2][2]*m0[0][3]-m2[1][7]*m1[2][1]*m0[0][4]+m2[1][7]*m1[0][4]*m0[2][1]+m2[1][7]*m1[0][3]*m0[2][2]+m2[1][7]*m1[0][2]*m0[2][3]+m2[1][7]*m1[0][1]*m0[2][4]-m2[1][6]*m1[2][4]*m0[0][2]-m2[1][6]*m1[2][2]*m0[0][4]+m2[1][6]*m1[0][4]*m0[2][2]+m2[1][6]*m1[0][2]*m0[2][4]-m2[1][4]*m1[2][7]*m0[0][1]-m2[1][4]*m1[2][6]*m0[0][2]-m2[1][4]*m1[2][2]*m0[0][6]-m2[1][4]*m1[2][1]*m0[0][7]+m2[1][4]*m1[0][7]*m0[2][1]+m2[1][4]*m1[0][6]*m0[2][2]+m2[1][4]*m1[0][2]*m0[2][6]+m2[1][4]*m1[0][1]*m0[2][7]-m2[1][3]*m1[2][7]*m0[0][2]-m2[1][3]*m1[2][2]*m0[0][7]+m2[1][3]*m1[0][7]*m0[2][2]+m2[1][3]*m1[0][2]*m0[2][7]-m2[1][2]*m1[2][8]*m0[0][1]-m2[1][2]*m1[2][7]*m0[0][3]-m2[1][2]*m1[2][6]*m0[0][4]-m2[1][2]*m1[2][4]*m0[0][6]-m2[1][2]*m1[2][3]*m0[0][7]-m2[1][2]*m1[2][1]*m0[0][8]+m2[1][2]*m1[0][8]*m0[2][1]+m2[1][2]*m1[0][7]*m0[2][3]+m2[1][2]*m1[0][6]*m0[2][4]+m2[1][2]*m1[0][4]*m0[2][6]+m2[1][2]*m1[0][3]*m0[2][7]+m2[1][2]*m1[0][1]*m0[2][8]-m2[1][1]*m1[2][8]*m0[0][2]-m2[1][1]*m1[2][7]*m0[0][4]-m2[1][1]*m1[2][4]*m0[0][7]-m2[1][1]*m1[2][2]*m0[0][8]+m2[1][1]*m1[0][8]*m0[2][2]+m2[1][1]*m1[0][7]*m0[2][4]+m2[1][1]*m1[0][4]*m0[2][7]+m2[1][1]*m1[0][2]*m0[2][8]+m2[0][8]*m1[2][2]*m0[1][1]+m2[0][8]*m1[2][1]*m0[1][2]-m2[0][8]*m1[1][2]*m0[2][1]-m2[0][8]*m1[1][1]*m0[2][2]+m2[0][7]*m1[2][4]*m0[1][1]+m2[0][7]*m1[2][3]*m0[1][2]+m2[0][7]*m1[2][2]*m0[1][3]+m2[0][7]*m1[2][1]*m0[1][4]-m2[0][7]*m1[1][4]*m0[2][1]-m2[0][7]*m1[1][3]*m0[2][2]-m2[0][7]*m1[1][2]*m0[2][3]-m2[0][7]*m1[1][1]*m0[2][4]+m2[0][6]*m1[2][4]*m0[1][2]+m2[0][6]*m1[2][2]*m0[1][4]-m2[0][6]*m1[1][4]*m0[2][2]-m2[0][6]*m1[1][2]*m0[2][4]+m2[0][4]*m1[2][7]*m0[1][1]+m2[0][4]*m1[2][6]*m0[1][2]+m2[0][4]*m1[2][2]*m0[1][6]+m2[0][4]*m1[2][1]*m0[1][7]-m2[0][4]*m1[1][7]*m0[2][1]-m2[0][4]*m1[1][6]*m0[2][2]-m2[0][4]*m1[1][2]*m0[2][6]-m2[0][4]*m1[1][1]*m0[2][7]+m2[0][3]*m1[2][7]*m0[1][2]+m2[0][3]*m1[2][2]*m0[1][7]-m2[0][3]*m1[1][7]*m0[2][2]-m2[0][3]*m1[1][2]*m0[2][7]+m2[0][2]*m1[2][8]*m0[1][1]+m2[0][2]*m1[2][7]*m0[1][3]+m2[0][2]*m1[2][6]*m0[1][4]+m2[0][2]*m1[2][4]*m0[1][6]+m2[0][2]*m1[2][3]*m0[1][7]+m2[0][2]*m1[2][1]*m0[1][8]-m2[0][2]*m1[1][8]*m0[2][1]-m2[0][2]*m1[1][7]*m0[2][3]-m2[0][2]*m1[1][6]*m0[2][4]-m2[0][2]*m1[1][4]*m0[2][6]-m2[0][2]*m1[1][3]*m0[2][7]-m2[0][2]*m1[1][1]*m0[2][8]+m2[0][1]*m1[2][8]*m0[1][2]+m2[0][1]*m1[2][7]*m0[1][4]+m2[0][1]*m1[2][4]*m0[1][7]+m2[0][1]*m1[2][2]*m0[1][8]-m2[0][1]*m1[1][8]*m0[2][2]-m2[0][1]*m1[1][7]*m0[2][4]-m2[0][1]*m1[1][4]*m0[2][7]-m2[0][1]*m1[1][2]*m0[2][8]; 
  M1(row,38) = m2[2][8]*m1[1][2]*m0[0][2]-m2[2][8]*m1[0][2]*m0[1][2]+m2[2][7]*m1[1][4]*m0[0][2]+m2[2][7]*m1[1][2]*m0[0][4]-m2[2][7]*m1[0][4]*m0[1][2]-m2[2][7]*m1[0][2]*m0[1][4]+m2[2][4]*m1[1][7]*m0[0][2]+m2[2][4]*m1[1][2]*m0[0][7]-m2[2][4]*m1[0][7]*m0[1][2]-m2[2][4]*m1[0][2]*m0[1][7]+m2[2][2]*m1[1][8]*m0[0][2]+m2[2][2]*m1[1][7]*m0[0][4]+m2[2][2]*m1[1][4]*m0[0][7]+m2[2][2]*m1[1][2]*m0[0][8]-m2[2][2]*m1[0][8]*m0[1][2]-m2[2][2]*m1[0][7]*m0[1][4]-m2[2][2]*m1[0][4]*m0[1][7]-m2[2][2]*m1[0][2]*m0[1][8]-m2[1][8]*m1[2][2]*m0[0][2]+m2[1][8]*m1[0][2]*m0[2][2]-m2[1][7]*m1[2][4]*m0[0][2]-m2[1][7]*m1[2][2]*m0[0][4]+m2[1][7]*m1[0][4]*m0[2][2]+m2[1][7]*m1[0][2]*m0[2][4]-m2[1][4]*m1[2][7]*m0[0][2]-m2[1][4]*m1[2][2]*m0[0][7]+m2[1][4]*m1[0][7]*m0[2][2]+m2[1][4]*m1[0][2]*m0[2][7]-m2[1][2]*m1[2][8]*m0[0][2]-m2[1][2]*m1[2][7]*m0[0][4]-m2[1][2]*m1[2][4]*m0[0][7]-m2[1][2]*m1[2][2]*m0[0][8]+m2[1][2]*m1[0][8]*m0[2][2]+m2[1][2]*m1[0][7]*m0[2][4]+m2[1][2]*m1[0][4]*m0[2][7]+m2[1][2]*m1[0][2]*m0[2][8]+m2[0][8]*m1[2][2]*m0[1][2]-m2[0][8]*m1[1][2]*m0[2][2]+m2[0][7]*m1[2][4]*m0[1][2]+m2[0][7]*m1[2][2]*m0[1][4]-m2[0][7]*m1[1][4]*m0[2][2]-m2[0][7]*m1[1][2]*m0[2][4]+m2[0][4]*m1[2][7]*m0[1][2]+m2[0][4]*m1[2][2]*m0[1][7]-m2[0][4]*m1[1][7]*m0[2][2]-m2[0][4]*m1[1][2]*m0[2][7]+m2[0][2]*m1[2][8]*m0[1][2]+m2[0][2]*m1[2][7]*m0[1][4]+m2[0][2]*m1[2][4]*m0[1][7]+m2[0][2]*m1[2][2]*m0[1][8]-m2[0][2]*m1[1][8]*m0[2][2]-m2[0][2]*m1[1][7]*m0[2][4]-m2[0][2]*m1[1][4]*m0[2][7]-m2[0][2]*m1[1][2]*m0[2][8]; 
  M1(row,39) = m2[2][8]*m1[1][3]*m0[0][0]+m2[2][8]*m1[1][0]*m0[0][3]-m2[2][8]*m1[0][3]*m0[1][0]-m2[2][8]*m1[0][0]*m0[1][3]+m2[2][6]*m1[1][5]*m0[0][0]+m2[2][6]*m1[1][3]*m0[0][3]+m2[2][6]*m1[1][0]*m0[0][5]-m2[2][6]*m1[0][5]*m0[1][0]-m2[2][6]*m1[0][3]*m0[1][3]-m2[2][6]*m1[0][0]*m0[1][5]+m2[2][5]*m1[1][6]*m0[0][0]+m2[2][5]*m1[1][0]*m0[0][6]-m2[2][5]*m1[0][6]*m0[1][0]-m2[2][5]*m1[0][0]*m0[1][6]+m2[2][3]*m1[1][8]*m0[0][0]+m2[2][3]*m1[1][6]*m0[0][3]+m2[2][3]*m1[1][3]*m0[0][6]+m2[2][3]*m1[1][0]*m0[0][8]-m2[2][3]*m1[0][8]*m0[1][0]-m2[2][3]*m1[0][6]*m0[1][3]-m2[2][3]*m1[0][3]*m0[1][6]-m2[2][3]*m1[0][0]*m0[1][8]+m2[2][0]*m1[1][8]*m0[0][3]+m2[2][0]*m1[1][6]*m0[0][5]+m2[2][0]*m1[1][5]*m0[0][6]+m2[2][0]*m1[1][3]*m0[0][8]-m2[2][0]*m1[0][8]*m0[1][3]-m2[2][0]*m1[0][6]*m0[1][5]-m2[2][0]*m1[0][5]*m0[1][6]-m2[2][0]*m1[0][3]*m0[1][8]-m2[1][8]*m1[2][3]*m0[0][0]-m2[1][8]*m1[2][0]*m0[0][3]+m2[1][8]*m1[0][3]*m0[2][0]+m2[1][8]*m1[0][0]*m0[2][3]-m2[1][6]*m1[2][5]*m0[0][0]-m2[1][6]*m1[2][3]*m0[0][3]-m2[1][6]*m1[2][0]*m0[0][5]+m2[1][6]*m1[0][5]*m0[2][0]+m2[1][6]*m1[0][3]*m0[2][3]+m2[1][6]*m1[0][0]*m0[2][5]-m2[1][5]*m1[2][6]*m0[0][0]-m2[1][5]*m1[2][0]*m0[0][6]+m2[1][5]*m1[0][6]*m0[2][0]+m2[1][5]*m1[0][0]*m0[2][6]-m2[1][3]*m1[2][8]*m0[0][0]-m2[1][3]*m1[2][6]*m0[0][3]-m2[1][3]*m1[2][3]*m0[0][6]-m2[1][3]*m1[2][0]*m0[0][8]+m2[1][3]*m1[0][8]*m0[2][0]+m2[1][3]*m1[0][6]*m0[2][3]+m2[1][3]*m1[0][3]*m0[2][6]+m2[1][3]*m1[0][0]*m0[2][8]-m2[1][0]*m1[2][8]*m0[0][3]-m2[1][0]*m1[2][6]*m0[0][5]-m2[1][0]*m1[2][5]*m0[0][6]-m2[1][0]*m1[2][3]*m0[0][8]+m2[1][0]*m1[0][8]*m0[2][3]+m2[1][0]*m1[0][6]*m0[2][5]+m2[1][0]*m1[0][5]*m0[2][6]+m2[1][0]*m1[0][3]*m0[2][8]+m2[0][8]*m1[2][3]*m0[1][0]+m2[0][8]*m1[2][0]*m0[1][3]-m2[0][8]*m1[1][3]*m0[2][0]-m2[0][8]*m1[1][0]*m0[2][3]+m2[0][6]*m1[2][5]*m0[1][0]+m2[0][6]*m1[2][3]*m0[1][3]+m2[0][6]*m1[2][0]*m0[1][5]-m2[0][6]*m1[1][5]*m0[2][0]-m2[0][6]*m1[1][3]*m0[2][3]-m2[0][6]*m1[1][0]*m0[2][5]+m2[0][5]*m1[2][6]*m0[1][0]+m2[0][5]*m1[2][0]*m0[1][6]-m2[0][5]*m1[1][6]*m0[2][0]-m2[0][5]*m1[1][0]*m0[2][6]+m2[0][3]*m1[2][8]*m0[1][0]+m2[0][3]*m1[2][6]*m0[1][3]+m2[0][3]*m1[2][3]*m0[1][6]+m2[0][3]*m1[2][0]*m0[1][8]-m2[0][3]*m1[1][8]*m0[2][0]-m2[0][3]*m1[1][6]*m0[2][3]-m2[0][3]*m1[1][3]*m0[2][6]-m2[0][3]*m1[1][0]*m0[2][8]+m2[0][0]*m1[2][8]*m0[1][3]+m2[0][0]*m1[2][6]*m0[1][5]+m2[0][0]*m1[2][5]*m0[1][6]+m2[0][0]*m1[2][3]*m0[1][8]-m2[0][0]*m1[1][8]*m0[2][3]-m2[0][0]*m1[1][6]*m0[2][5]-m2[0][0]*m1[1][5]*m0[2][6]-m2[0][0]*m1[1][3]*m0[2][8]; 
  M1(row,40) = m2[2][8]*m1[1][4]*m0[0][0]+m2[2][8]*m1[1][3]*m0[0][1]+m2[2][8]*m1[1][1]*m0[0][3]+m2[2][8]*m1[1][0]*m0[0][4]-m2[2][8]*m1[0][4]*m0[1][0]-m2[2][8]*m1[0][3]*m0[1][1]-m2[2][8]*m1[0][1]*m0[1][3]-m2[2][8]*m1[0][0]*m0[1][4]+m2[2][7]*m1[1][5]*m0[0][0]+m2[2][7]*m1[1][3]*m0[0][3]+m2[2][7]*m1[1][0]*m0[0][5]-m2[2][7]*m1[0][5]*m0[1][0]-m2[2][7]*m1[0][3]*m0[1][3]-m2[2][7]*m1[0][0]*m0[1][5]+m2[2][6]*m1[1][5]*m0[0][1]+m2[2][6]*m1[1][4]*m0[0][3]+m2[2][6]*m1[1][3]*m0[0][4]+m2[2][6]*m1[1][1]*m0[0][5]-m2[2][6]*m1[0][5]*m0[1][1]-m2[2][6]*m1[0][4]*m0[1][3]-m2[2][6]*m1[0][3]*m0[1][4]-m2[2][6]*m1[0][1]*m0[1][5]+m2[2][5]*m1[1][7]*m0[0][0]+m2[2][5]*m1[1][6]*m0[0][1]+m2[2][5]*m1[1][1]*m0[0][6]+m2[2][5]*m1[1][0]*m0[0][7]-m2[2][5]*m1[0][7]*m0[1][0]-m2[2][5]*m1[0][6]*m0[1][1]-m2[2][5]*m1[0][1]*m0[1][6]-m2[2][5]*m1[0][0]*m0[1][7]+m2[2][4]*m1[1][8]*m0[0][0]+m2[2][4]*m1[1][6]*m0[0][3]+m2[2][4]*m1[1][3]*m0[0][6]+m2[2][4]*m1[1][0]*m0[0][8]-m2[2][4]*m1[0][8]*m0[1][0]-m2[2][4]*m1[0][6]*m0[1][3]-m2[2][4]*m1[0][3]*m0[1][6]-m2[2][4]*m1[0][0]*m0[1][8]+m2[2][3]*m1[1][8]*m0[0][1]+m2[2][3]*m1[1][7]*m0[0][3]+m2[2][3]*m1[1][6]*m0[0][4]+m2[2][3]*m1[1][4]*m0[0][6]+m2[2][3]*m1[1][3]*m0[0][7]+m2[2][3]*m1[1][1]*m0[0][8]-m2[2][3]*m1[0][8]*m0[1][1]-m2[2][3]*m1[0][7]*m0[1][3]-m2[2][3]*m1[0][6]*m0[1][4]-m2[2][3]*m1[0][4]*m0[1][6]-m2[2][3]*m1[0][3]*m0[1][7]-m2[2][3]*m1[0][1]*m0[1][8]+m2[2][1]*m1[1][8]*m0[0][3]+m2[2][1]*m1[1][6]*m0[0][5]+m2[2][1]*m1[1][5]*m0[0][6]+m2[2][1]*m1[1][3]*m0[0][8]-m2[2][1]*m1[0][8]*m0[1][3]-m2[2][1]*m1[0][6]*m0[1][5]-m2[2][1]*m1[0][5]*m0[1][6]-m2[2][1]*m1[0][3]*m0[1][8]+m2[2][0]*m1[1][8]*m0[0][4]+m2[2][0]*m1[1][7]*m0[0][5]+m2[2][0]*m1[1][5]*m0[0][7]+m2[2][0]*m1[1][4]*m0[0][8]-m2[2][0]*m1[0][8]*m0[1][4]-m2[2][0]*m1[0][7]*m0[1][5]-m2[2][0]*m1[0][5]*m0[1][7]-m2[2][0]*m1[0][4]*m0[1][8]-m2[1][8]*m1[2][4]*m0[0][0]-m2[1][8]*m1[2][3]*m0[0][1]-m2[1][8]*m1[2][1]*m0[0][3]-m2[1][8]*m1[2][0]*m0[0][4]+m2[1][8]*m1[0][4]*m0[2][0]+m2[1][8]*m1[0][3]*m0[2][1]+m2[1][8]*m1[0][1]*m0[2][3]+m2[1][8]*m1[0][0]*m0[2][4]-m2[1][7]*m1[2][5]*m0[0][0]-m2[1][7]*m1[2][3]*m0[0][3]-m2[1][7]*m1[2][0]*m0[0][5]+m2[1][7]*m1[0][5]*m0[2][0]+m2[1][7]*m1[0][3]*m0[2][3]+m2[1][7]*m1[0][0]*m0[2][5]-m2[1][6]*m1[2][5]*m0[0][1]-m2[1][6]*m1[2][4]*m0[0][3]-m2[1][6]*m1[2][3]*m0[0][4]-m2[1][6]*m1[2][1]*m0[0][5]+m2[1][6]*m1[0][5]*m0[2][1]+m2[1][6]*m1[0][4]*m0[2][3]+m2[1][6]*m1[0][3]*m0[2][4]+m2[1][6]*m1[0][1]*m0[2][5]-m2[1][5]*m1[2][7]*m0[0][0]-m2[1][5]*m1[2][6]*m0[0][1]-m2[1][5]*m1[2][1]*m0[0][6]-m2[1][5]*m1[2][0]*m0[0][7]+m2[1][5]*m1[0][7]*m0[2][0]+m2[1][5]*m1[0][6]*m0[2][1]+m2[1][5]*m1[0][1]*m0[2][6]+m2[1][5]*m1[0][0]*m0[2][7]-m2[1][4]*m1[2][8]*m0[0][0]-m2[1][4]*m1[2][6]*m0[0][3]-m2[1][4]*m1[2][3]*m0[0][6]-m2[1][4]*m1[2][0]*m0[0][8]+m2[1][4]*m1[0][8]*m0[2][0]+m2[1][4]*m1[0][6]*m0[2][3]+m2[1][4]*m1[0][3]*m0[2][6]+m2[1][4]*m1[0][0]*m0[2][8]-m2[1][3]*m1[2][8]*m0[0][1]-m2[1][3]*m1[2][7]*m0[0][3]-m2[1][3]*m1[2][6]*m0[0][4]-m2[1][3]*m1[2][4]*m0[0][6]-m2[1][3]*m1[2][3]*m0[0][7]-m2[1][3]*m1[2][1]*m0[0][8]+m2[1][3]*m1[0][8]*m0[2][1]+m2[1][3]*m1[0][7]*m0[2][3]+m2[1][3]*m1[0][6]*m0[2][4]+m2[1][3]*m1[0][4]*m0[2][6]+m2[1][3]*m1[0][3]*m0[2][7]+m2[1][3]*m1[0][1]*m0[2][8]-m2[1][1]*m1[2][8]*m0[0][3]-m2[1][1]*m1[2][6]*m0[0][5]-m2[1][1]*m1[2][5]*m0[0][6]-m2[1][1]*m1[2][3]*m0[0][8]+m2[1][1]*m1[0][8]*m0[2][3]+m2[1][1]*m1[0][6]*m0[2][5]+m2[1][1]*m1[0][5]*m0[2][6]+m2[1][1]*m1[0][3]*m0[2][8]-m2[1][0]*m1[2][8]*m0[0][4]-m2[1][0]*m1[2][7]*m0[0][5]-m2[1][0]*m1[2][5]*m0[0][7]-m2[1][0]*m1[2][4]*m0[0][8]+m2[1][0]*m1[0][8]*m0[2][4]+m2[1][0]*m1[0][7]*m0[2][5]+m2[1][0]*m1[0][5]*m0[2][7]+m2[1][0]*m1[0][4]*m0[2][8]+m2[0][8]*m1[2][4]*m0[1][0]+m2[0][8]*m1[2][3]*m0[1][1]+m2[0][8]*m1[2][1]*m0[1][3]+m2[0][8]*m1[2][0]*m0[1][4]-m2[0][8]*m1[1][4]*m0[2][0]-m2[0][8]*m1[1][3]*m0[2][1]-m2[0][8]*m1[1][1]*m0[2][3]-m2[0][8]*m1[1][0]*m0[2][4]+m2[0][7]*m1[2][5]*m0[1][0]+m2[0][7]*m1[2][3]*m0[1][3]+m2[0][7]*m1[2][0]*m0[1][5]-m2[0][7]*m1[1][5]*m0[2][0]-m2[0][7]*m1[1][3]*m0[2][3]-m2[0][7]*m1[1][0]*m0[2][5]+m2[0][6]*m1[2][5]*m0[1][1]+m2[0][6]*m1[2][4]*m0[1][3]+m2[0][6]*m1[2][3]*m0[1][4]+m2[0][6]*m1[2][1]*m0[1][5]-m2[0][6]*m1[1][5]*m0[2][1]-m2[0][6]*m1[1][4]*m0[2][3]-m2[0][6]*m1[1][3]*m0[2][4]-m2[0][6]*m1[1][1]*m0[2][5]+m2[0][5]*m1[2][7]*m0[1][0]+m2[0][5]*m1[2][6]*m0[1][1]+m2[0][5]*m1[2][1]*m0[1][6]+m2[0][5]*m1[2][0]*m0[1][7]-m2[0][5]*m1[1][7]*m0[2][0]-m2[0][5]*m1[1][6]*m0[2][1]-m2[0][5]*m1[1][1]*m0[2][6]-m2[0][5]*m1[1][0]*m0[2][7]+m2[0][4]*m1[2][8]*m0[1][0]+m2[0][4]*m1[2][6]*m0[1][3]+m2[0][4]*m1[2][3]*m0[1][6]+m2[0][4]*m1[2][0]*m0[1][8]-m2[0][4]*m1[1][8]*m0[2][0]-m2[0][4]*m1[1][6]*m0[2][3]-m2[0][4]*m1[1][3]*m0[2][6]-m2[0][4]*m1[1][0]*m0[2][8]+m2[0][3]*m1[2][8]*m0[1][1]+m2[0][3]*m1[2][7]*m0[1][3]+m2[0][3]*m1[2][6]*m0[1][4]+m2[0][3]*m1[2][4]*m0[1][6]+m2[0][3]*m1[2][3]*m0[1][7]+m2[0][3]*m1[2][1]*m0[1][8]-m2[0][3]*m1[1][8]*m0[2][1]-m2[0][3]*m1[1][7]*m0[2][3]-m2[0][3]*m1[1][6]*m0[2][4]-m2[0][3]*m1[1][4]*m0[2][6]-m2[0][3]*m1[1][3]*m0[2][7]-m2[0][3]*m1[1][1]*m0[2][8]+m2[0][1]*m1[2][8]*m0[1][3]+m2[0][1]*m1[2][6]*m0[1][5]+m2[0][1]*m1[2][5]*m0[1][6]+m2[0][1]*m1[2][3]*m0[1][8]-m2[0][1]*m1[1][8]*m0[2][3]-m2[0][1]*m1[1][6]*m0[2][5]-m2[0][1]*m1[1][5]*m0[2][6]-m2[0][1]*m1[1][3]*m0[2][8]+m2[0][0]*m1[2][8]*m0[1][4]+m2[0][0]*m1[2][7]*m0[1][5]+m2[0][0]*m1[2][5]*m0[1][7]+m2[0][0]*m1[2][4]*m0[1][8]-m2[0][0]*m1[1][8]*m0[2][4]-m2[0][0]*m1[1][7]*m0[2][5]-m2[0][0]*m1[1][5]*m0[2][7]-m2[0][0]*m1[1][4]*m0[2][8]; 
  M1(row,41) = m2[2][8]*m1[1][4]*m0[0][1]+m2[2][8]*m1[1][3]*m0[0][2]+m2[2][8]*m1[1][2]*m0[0][3]+m2[2][8]*m1[1][1]*m0[0][4]-m2[2][8]*m1[0][4]*m0[1][1]-m2[2][8]*m1[0][3]*m0[1][2]-m2[2][8]*m1[0][2]*m0[1][3]-m2[2][8]*m1[0][1]*m0[1][4]+m2[2][7]*m1[1][5]*m0[0][1]+m2[2][7]*m1[1][4]*m0[0][3]+m2[2][7]*m1[1][3]*m0[0][4]+m2[2][7]*m1[1][1]*m0[0][5]-m2[2][7]*m1[0][5]*m0[1][1]-m2[2][7]*m1[0][4]*m0[1][3]-m2[2][7]*m1[0][3]*m0[1][4]-m2[2][7]*m1[0][1]*m0[1][5]+m2[2][6]*m1[1][5]*m0[0][2]+m2[2][6]*m1[1][4]*m0[0][4]+m2[2][6]*m1[1][2]*m0[0][5]-m2[2][6]*m1[0][5]*m0[1][2]-m2[2][6]*m1[0][4]*m0[1][4]-m2[2][6]*m1[0][2]*m0[1][5]+m2[2][5]*m1[1][7]*m0[0][1]+m2[2][5]*m1[1][6]*m0[0][2]+m2[2][5]*m1[1][2]*m0[0][6]+m2[2][5]*m1[1][1]*m0[0][7]-m2[2][5]*m1[0][7]*m0[1][1]-m2[2][5]*m1[0][6]*m0[1][2]-m2[2][5]*m1[0][2]*m0[1][6]-m2[2][5]*m1[0][1]*m0[1][7]+m2[2][4]*m1[1][8]*m0[0][1]+m2[2][4]*m1[1][7]*m0[0][3]+m2[2][4]*m1[1][6]*m0[0][4]+m2[2][4]*m1[1][4]*m0[0][6]+m2[2][4]*m1[1][3]*m0[0][7]+m2[2][4]*m1[1][1]*m0[0][8]-m2[2][4]*m1[0][8]*m0[1][1]-m2[2][4]*m1[0][7]*m0[1][3]-m2[2][4]*m1[0][6]*m0[1][4]-m2[2][4]*m1[0][4]*m0[1][6]-m2[2][4]*m1[0][3]*m0[1][7]-m2[2][4]*m1[0][1]*m0[1][8]+m2[2][3]*m1[1][8]*m0[0][2]+m2[2][3]*m1[1][7]*m0[0][4]+m2[2][3]*m1[1][4]*m0[0][7]+m2[2][3]*m1[1][2]*m0[0][8]-m2[2][3]*m1[0][8]*m0[1][2]-m2[2][3]*m1[0][7]*m0[1][4]-m2[2][3]*m1[0][4]*m0[1][7]-m2[2][3]*m1[0][2]*m0[1][8]+m2[2][2]*m1[1][8]*m0[0][3]+m2[2][2]*m1[1][6]*m0[0][5]+m2[2][2]*m1[1][5]*m0[0][6]+m2[2][2]*m1[1][3]*m0[0][8]-m2[2][2]*m1[0][8]*m0[1][3]-m2[2][2]*m1[0][6]*m0[1][5]-m2[2][2]*m1[0][5]*m0[1][6]-m2[2][2]*m1[0][3]*m0[1][8]+m2[2][1]*m1[1][8]*m0[0][4]+m2[2][1]*m1[1][7]*m0[0][5]+m2[2][1]*m1[1][5]*m0[0][7]+m2[2][1]*m1[1][4]*m0[0][8]-m2[2][1]*m1[0][8]*m0[1][4]-m2[2][1]*m1[0][7]*m0[1][5]-m2[2][1]*m1[0][5]*m0[1][7]-m2[2][1]*m1[0][4]*m0[1][8]-m2[1][8]*m1[2][4]*m0[0][1]-m2[1][8]*m1[2][3]*m0[0][2]-m2[1][8]*m1[2][2]*m0[0][3]-m2[1][8]*m1[2][1]*m0[0][4]+m2[1][8]*m1[0][4]*m0[2][1]+m2[1][8]*m1[0][3]*m0[2][2]+m2[1][8]*m1[0][2]*m0[2][3]+m2[1][8]*m1[0][1]*m0[2][4]-m2[1][7]*m1[2][5]*m0[0][1]-m2[1][7]*m1[2][4]*m0[0][3]-m2[1][7]*m1[2][3]*m0[0][4]-m2[1][7]*m1[2][1]*m0[0][5]+m2[1][7]*m1[0][5]*m0[2][1]+m2[1][7]*m1[0][4]*m0[2][3]+m2[1][7]*m1[0][3]*m0[2][4]+m2[1][7]*m1[0][1]*m0[2][5]-m2[1][6]*m1[2][5]*m0[0][2]-m2[1][6]*m1[2][4]*m0[0][4]-m2[1][6]*m1[2][2]*m0[0][5]+m2[1][6]*m1[0][5]*m0[2][2]+m2[1][6]*m1[0][4]*m0[2][4]+m2[1][6]*m1[0][2]*m0[2][5]-m2[1][5]*m1[2][7]*m0[0][1]-m2[1][5]*m1[2][6]*m0[0][2]-m2[1][5]*m1[2][2]*m0[0][6]-m2[1][5]*m1[2][1]*m0[0][7]+m2[1][5]*m1[0][7]*m0[2][1]+m2[1][5]*m1[0][6]*m0[2][2]+m2[1][5]*m1[0][2]*m0[2][6]+m2[1][5]*m1[0][1]*m0[2][7]-m2[1][4]*m1[2][8]*m0[0][1]-m2[1][4]*m1[2][7]*m0[0][3]-m2[1][4]*m1[2][6]*m0[0][4]-m2[1][4]*m1[2][4]*m0[0][6]-m2[1][4]*m1[2][3]*m0[0][7]-m2[1][4]*m1[2][1]*m0[0][8]+m2[1][4]*m1[0][8]*m0[2][1]+m2[1][4]*m1[0][7]*m0[2][3]+m2[1][4]*m1[0][6]*m0[2][4]+m2[1][4]*m1[0][4]*m0[2][6]+m2[1][4]*m1[0][3]*m0[2][7]+m2[1][4]*m1[0][1]*m0[2][8]-m2[1][3]*m1[2][8]*m0[0][2]-m2[1][3]*m1[2][7]*m0[0][4]-m2[1][3]*m1[2][4]*m0[0][7]-m2[1][3]*m1[2][2]*m0[0][8]+m2[1][3]*m1[0][8]*m0[2][2]+m2[1][3]*m1[0][7]*m0[2][4]+m2[1][3]*m1[0][4]*m0[2][7]+m2[1][3]*m1[0][2]*m0[2][8]-m2[1][2]*m1[2][8]*m0[0][3]-m2[1][2]*m1[2][6]*m0[0][5]-m2[1][2]*m1[2][5]*m0[0][6]-m2[1][2]*m1[2][3]*m0[0][8]+m2[1][2]*m1[0][8]*m0[2][3]+m2[1][2]*m1[0][6]*m0[2][5]+m2[1][2]*m1[0][5]*m0[2][6]+m2[1][2]*m1[0][3]*m0[2][8]-m2[1][1]*m1[2][8]*m0[0][4]-m2[1][1]*m1[2][7]*m0[0][5]-m2[1][1]*m1[2][5]*m0[0][7]-m2[1][1]*m1[2][4]*m0[0][8]+m2[1][1]*m1[0][8]*m0[2][4]+m2[1][1]*m1[0][7]*m0[2][5]+m2[1][1]*m1[0][5]*m0[2][7]+m2[1][1]*m1[0][4]*m0[2][8]+m2[0][8]*m1[2][4]*m0[1][1]+m2[0][8]*m1[2][3]*m0[1][2]+m2[0][8]*m1[2][2]*m0[1][3]+m2[0][8]*m1[2][1]*m0[1][4]-m2[0][8]*m1[1][4]*m0[2][1]-m2[0][8]*m1[1][3]*m0[2][2]-m2[0][8]*m1[1][2]*m0[2][3]-m2[0][8]*m1[1][1]*m0[2][4]+m2[0][7]*m1[2][5]*m0[1][1]+m2[0][7]*m1[2][4]*m0[1][3]+m2[0][7]*m1[2][3]*m0[1][4]+m2[0][7]*m1[2][1]*m0[1][5]-m2[0][7]*m1[1][5]*m0[2][1]-m2[0][7]*m1[1][4]*m0[2][3]-m2[0][7]*m1[1][3]*m0[2][4]-m2[0][7]*m1[1][1]*m0[2][5]+m2[0][6]*m1[2][5]*m0[1][2]+m2[0][6]*m1[2][4]*m0[1][4]+m2[0][6]*m1[2][2]*m0[1][5]-m2[0][6]*m1[1][5]*m0[2][2]-m2[0][6]*m1[1][4]*m0[2][4]-m2[0][6]*m1[1][2]*m0[2][5]+m2[0][5]*m1[2][7]*m0[1][1]+m2[0][5]*m1[2][6]*m0[1][2]+m2[0][5]*m1[2][2]*m0[1][6]+m2[0][5]*m1[2][1]*m0[1][7]-m2[0][5]*m1[1][7]*m0[2][1]-m2[0][5]*m1[1][6]*m0[2][2]-m2[0][5]*m1[1][2]*m0[2][6]-m2[0][5]*m1[1][1]*m0[2][7]+m2[0][4]*m1[2][8]*m0[1][1]+m2[0][4]*m1[2][7]*m0[1][3]+m2[0][4]*m1[2][6]*m0[1][4]+m2[0][4]*m1[2][4]*m0[1][6]+m2[0][4]*m1[2][3]*m0[1][7]+m2[0][4]*m1[2][1]*m0[1][8]-m2[0][4]*m1[1][8]*m0[2][1]-m2[0][4]*m1[1][7]*m0[2][3]-m2[0][4]*m1[1][6]*m0[2][4]-m2[0][4]*m1[1][4]*m0[2][6]-m2[0][4]*m1[1][3]*m0[2][7]-m2[0][4]*m1[1][1]*m0[2][8]+m2[0][3]*m1[2][8]*m0[1][2]+m2[0][3]*m1[2][7]*m0[1][4]+m2[0][3]*m1[2][4]*m0[1][7]+m2[0][3]*m1[2][2]*m0[1][8]-m2[0][3]*m1[1][8]*m0[2][2]-m2[0][3]*m1[1][7]*m0[2][4]-m2[0][3]*m1[1][4]*m0[2][7]-m2[0][3]*m1[1][2]*m0[2][8]+m2[0][2]*m1[2][8]*m0[1][3]+m2[0][2]*m1[2][6]*m0[1][5]+m2[0][2]*m1[2][5]*m0[1][6]+m2[0][2]*m1[2][3]*m0[1][8]-m2[0][2]*m1[1][8]*m0[2][3]-m2[0][2]*m1[1][6]*m0[2][5]-m2[0][2]*m1[1][5]*m0[2][6]-m2[0][2]*m1[1][3]*m0[2][8]+m2[0][1]*m1[2][8]*m0[1][4]+m2[0][1]*m1[2][7]*m0[1][5]+m2[0][1]*m1[2][5]*m0[1][7]+m2[0][1]*m1[2][4]*m0[1][8]-m2[0][1]*m1[1][8]*m0[2][4]-m2[0][1]*m1[1][7]*m0[2][5]-m2[0][1]*m1[1][5]*m0[2][7]-m2[0][1]*m1[1][4]*m0[2][8]; 
  M1(row,42) = m2[2][8]*m1[1][4]*m0[0][2]+m2[2][8]*m1[1][2]*m0[0][4]-m2[2][8]*m1[0][4]*m0[1][2]-m2[2][8]*m1[0][2]*m0[1][4]+m2[2][7]*m1[1][5]*m0[0][2]+m2[2][7]*m1[1][4]*m0[0][4]+m2[2][7]*m1[1][2]*m0[0][5]-m2[2][7]*m1[0][5]*m0[1][2]-m2[2][7]*m1[0][4]*m0[1][4]-m2[2][7]*m1[0][2]*m0[1][5]+m2[2][5]*m1[1][7]*m0[0][2]+m2[2][5]*m1[1][2]*m0[0][7]-m2[2][5]*m1[0][7]*m0[1][2]-m2[2][5]*m1[0][2]*m0[1][7]+m2[2][4]*m1[1][8]*m0[0][2]+m2[2][4]*m1[1][7]*m0[0][4]+m2[2][4]*m1[1][4]*m0[0][7]+m2[2][4]*m1[1][2]*m0[0][8]-m2[2][4]*m1[0][8]*m0[1][2]-m2[2][4]*m1[0][7]*m0[1][4]-m2[2][4]*m1[0][4]*m0[1][7]-m2[2][4]*m1[0][2]*m0[1][8]+m2[2][2]*m1[1][8]*m0[0][4]+m2[2][2]*m1[1][7]*m0[0][5]+m2[2][2]*m1[1][5]*m0[0][7]+m2[2][2]*m1[1][4]*m0[0][8]-m2[2][2]*m1[0][8]*m0[1][4]-m2[2][2]*m1[0][7]*m0[1][5]-m2[2][2]*m1[0][5]*m0[1][7]-m2[2][2]*m1[0][4]*m0[1][8]-m2[1][8]*m1[2][4]*m0[0][2]-m2[1][8]*m1[2][2]*m0[0][4]+m2[1][8]*m1[0][4]*m0[2][2]+m2[1][8]*m1[0][2]*m0[2][4]-m2[1][7]*m1[2][5]*m0[0][2]-m2[1][7]*m1[2][4]*m0[0][4]-m2[1][7]*m1[2][2]*m0[0][5]+m2[1][7]*m1[0][5]*m0[2][2]+m2[1][7]*m1[0][4]*m0[2][4]+m2[1][7]*m1[0][2]*m0[2][5]-m2[1][5]*m1[2][7]*m0[0][2]-m2[1][5]*m1[2][2]*m0[0][7]+m2[1][5]*m1[0][7]*m0[2][2]+m2[1][5]*m1[0][2]*m0[2][7]-m2[1][4]*m1[2][8]*m0[0][2]-m2[1][4]*m1[2][7]*m0[0][4]-m2[1][4]*m1[2][4]*m0[0][7]-m2[1][4]*m1[2][2]*m0[0][8]+m2[1][4]*m1[0][8]*m0[2][2]+m2[1][4]*m1[0][7]*m0[2][4]+m2[1][4]*m1[0][4]*m0[2][7]+m2[1][4]*m1[0][2]*m0[2][8]-m2[1][2]*m1[2][8]*m0[0][4]-m2[1][2]*m1[2][7]*m0[0][5]-m2[1][2]*m1[2][5]*m0[0][7]-m2[1][2]*m1[2][4]*m0[0][8]+m2[1][2]*m1[0][8]*m0[2][4]+m2[1][2]*m1[0][7]*m0[2][5]+m2[1][2]*m1[0][5]*m0[2][7]+m2[1][2]*m1[0][4]*m0[2][8]+m2[0][8]*m1[2][4]*m0[1][2]+m2[0][8]*m1[2][2]*m0[1][4]-m2[0][8]*m1[1][4]*m0[2][2]-m2[0][8]*m1[1][2]*m0[2][4]+m2[0][7]*m1[2][5]*m0[1][2]+m2[0][7]*m1[2][4]*m0[1][4]+m2[0][7]*m1[2][2]*m0[1][5]-m2[0][7]*m1[1][5]*m0[2][2]-m2[0][7]*m1[1][4]*m0[2][4]-m2[0][7]*m1[1][2]*m0[2][5]+m2[0][5]*m1[2][7]*m0[1][2]+m2[0][5]*m1[2][2]*m0[1][7]-m2[0][5]*m1[1][7]*m0[2][2]-m2[0][5]*m1[1][2]*m0[2][7]+m2[0][4]*m1[2][8]*m0[1][2]+m2[0][4]*m1[2][7]*m0[1][4]+m2[0][4]*m1[2][4]*m0[1][7]+m2[0][4]*m1[2][2]*m0[1][8]-m2[0][4]*m1[1][8]*m0[2][2]-m2[0][4]*m1[1][7]*m0[2][4]-m2[0][4]*m1[1][4]*m0[2][7]-m2[0][4]*m1[1][2]*m0[2][8]+m2[0][2]*m1[2][8]*m0[1][4]+m2[0][2]*m1[2][7]*m0[1][5]+m2[0][2]*m1[2][5]*m0[1][7]+m2[0][2]*m1[2][4]*m0[1][8]-m2[0][2]*m1[1][8]*m0[2][4]-m2[0][2]*m1[1][7]*m0[2][5]-m2[0][2]*m1[1][5]*m0[2][7]-m2[0][2]*m1[1][4]*m0[2][8]; 
  M1(row,43) = m2[2][8]*m1[1][5]*m0[0][0]+m2[2][8]*m1[1][3]*m0[0][3]+m2[2][8]*m1[1][0]*m0[0][5]-m2[2][8]*m1[0][5]*m0[1][0]-m2[2][8]*m1[0][3]*m0[1][3]-m2[2][8]*m1[0][0]*m0[1][5]+m2[2][6]*m1[1][5]*m0[0][3]+m2[2][6]*m1[1][3]*m0[0][5]-m2[2][6]*m1[0][5]*m0[1][3]-m2[2][6]*m1[0][3]*m0[1][5]+m2[2][5]*m1[1][8]*m0[0][0]+m2[2][5]*m1[1][6]*m0[0][3]+m2[2][5]*m1[1][3]*m0[0][6]+m2[2][5]*m1[1][0]*m0[0][8]-m2[2][5]*m1[0][8]*m0[1][0]-m2[2][5]*m1[0][6]*m0[1][3]-m2[2][5]*m1[0][3]*m0[1][6]-m2[2][5]*m1[0][0]*m0[1][8]+m2[2][3]*m1[1][8]*m0[0][3]+m2[2][3]*m1[1][6]*m0[0][5]+m2[2][3]*m1[1][5]*m0[0][6]+m2[2][3]*m1[1][3]*m0[0][8]-m2[2][3]*m1[0][8]*m0[1][3]-m2[2][3]*m1[0][6]*m0[1][5]-m2[2][3]*m1[0][5]*m0[1][6]-m2[2][3]*m1[0][3]*m0[1][8]+m2[2][0]*m1[1][8]*m0[0][5]+m2[2][0]*m1[1][5]*m0[0][8]-m2[2][0]*m1[0][8]*m0[1][5]-m2[2][0]*m1[0][5]*m0[1][8]-m2[1][8]*m1[2][5]*m0[0][0]-m2[1][8]*m1[2][3]*m0[0][3]-m2[1][8]*m1[2][0]*m0[0][5]+m2[1][8]*m1[0][5]*m0[2][0]+m2[1][8]*m1[0][3]*m0[2][3]+m2[1][8]*m1[0][0]*m0[2][5]-m2[1][6]*m1[2][5]*m0[0][3]-m2[1][6]*m1[2][3]*m0[0][5]+m2[1][6]*m1[0][5]*m0[2][3]+m2[1][6]*m1[0][3]*m0[2][5]-m2[1][5]*m1[2][8]*m0[0][0]-m2[1][5]*m1[2][6]*m0[0][3]-m2[1][5]*m1[2][3]*m0[0][6]-m2[1][5]*m1[2][0]*m0[0][8]+m2[1][5]*m1[0][8]*m0[2][0]+m2[1][5]*m1[0][6]*m0[2][3]+m2[1][5]*m1[0][3]*m0[2][6]+m2[1][5]*m1[0][0]*m0[2][8]-m2[1][3]*m1[2][8]*m0[0][3]-m2[1][3]*m1[2][6]*m0[0][5]-m2[1][3]*m1[2][5]*m0[0][6]-m2[1][3]*m1[2][3]*m0[0][8]+m2[1][3]*m1[0][8]*m0[2][3]+m2[1][3]*m1[0][6]*m0[2][5]+m2[1][3]*m1[0][5]*m0[2][6]+m2[1][3]*m1[0][3]*m0[2][8]-m2[1][0]*m1[2][8]*m0[0][5]-m2[1][0]*m1[2][5]*m0[0][8]+m2[1][0]*m1[0][8]*m0[2][5]+m2[1][0]*m1[0][5]*m0[2][8]+m2[0][8]*m1[2][5]*m0[1][0]+m2[0][8]*m1[2][3]*m0[1][3]+m2[0][8]*m1[2][0]*m0[1][5]-m2[0][8]*m1[1][5]*m0[2][0]-m2[0][8]*m1[1][3]*m0[2][3]-m2[0][8]*m1[1][0]*m0[2][5]+m2[0][6]*m1[2][5]*m0[1][3]+m2[0][6]*m1[2][3]*m0[1][5]-m2[0][6]*m1[1][5]*m0[2][3]-m2[0][6]*m1[1][3]*m0[2][5]+m2[0][5]*m1[2][8]*m0[1][0]+m2[0][5]*m1[2][6]*m0[1][3]+m2[0][5]*m1[2][3]*m0[1][6]+m2[0][5]*m1[2][0]*m0[1][8]-m2[0][5]*m1[1][8]*m0[2][0]-m2[0][5]*m1[1][6]*m0[2][3]-m2[0][5]*m1[1][3]*m0[2][6]-m2[0][5]*m1[1][0]*m0[2][8]+m2[0][3]*m1[2][8]*m0[1][3]+m2[0][3]*m1[2][6]*m0[1][5]+m2[0][3]*m1[2][5]*m0[1][6]+m2[0][3]*m1[2][3]*m0[1][8]-m2[0][3]*m1[1][8]*m0[2][3]-m2[0][3]*m1[1][6]*m0[2][5]-m2[0][3]*m1[1][5]*m0[2][6]-m2[0][3]*m1[1][3]*m0[2][8]+m2[0][0]*m1[2][8]*m0[1][5]+m2[0][0]*m1[2][5]*m0[1][8]-m2[0][0]*m1[1][8]*m0[2][5]-m2[0][0]*m1[1][5]*m0[2][8]; 
  M1(row,44) = m2[2][8]*m1[1][5]*m0[0][1]+m2[2][8]*m1[1][4]*m0[0][3]+m2[2][8]*m1[1][3]*m0[0][4]+m2[2][8]*m1[1][1]*m0[0][5]-m2[2][8]*m1[0][5]*m0[1][1]-m2[2][8]*m1[0][4]*m0[1][3]-m2[2][8]*m1[0][3]*m0[1][4]-m2[2][8]*m1[0][1]*m0[1][5]+m2[2][7]*m1[1][5]*m0[0][3]+m2[2][7]*m1[1][3]*m0[0][5]-m2[2][7]*m1[0][5]*m0[1][3]-m2[2][7]*m1[0][3]*m0[1][5]+m2[2][6]*m1[1][5]*m0[0][4]+m2[2][6]*m1[1][4]*m0[0][5]-m2[2][6]*m1[0][5]*m0[1][4]-m2[2][6]*m1[0][4]*m0[1][5]+m2[2][5]*m1[1][8]*m0[0][1]+m2[2][5]*m1[1][7]*m0[0][3]+m2[2][5]*m1[1][6]*m0[0][4]+m2[2][5]*m1[1][4]*m0[0][6]+m2[2][5]*m1[1][3]*m0[0][7]+m2[2][5]*m1[1][1]*m0[0][8]-m2[2][5]*m1[0][8]*m0[1][1]-m2[2][5]*m1[0][7]*m0[1][3]-m2[2][5]*m1[0][6]*m0[1][4]-m2[2][5]*m1[0][4]*m0[1][6]-m2[2][5]*m1[0][3]*m0[1][7]-m2[2][5]*m1[0][1]*m0[1][8]+m2[2][4]*m1[1][8]*m0[0][3]+m2[2][4]*m1[1][6]*m0[0][5]+m2[2][4]*m1[1][5]*m0[0][6]+m2[2][4]*m1[1][3]*m0[0][8]-m2[2][4]*m1[0][8]*m0[1][3]-m2[2][4]*m1[0][6]*m0[1][5]-m2[2][4]*m1[0][5]*m0[1][6]-m2[2][4]*m1[0][3]*m0[1][8]+m2[2][3]*m1[1][8]*m0[0][4]+m2[2][3]*m1[1][7]*m0[0][5]+m2[2][3]*m1[1][5]*m0[0][7]+m2[2][3]*m1[1][4]*m0[0][8]-m2[2][3]*m1[0][8]*m0[1][4]-m2[2][3]*m1[0][7]*m0[1][5]-m2[2][3]*m1[0][5]*m0[1][7]-m2[2][3]*m1[0][4]*m0[1][8]+m2[2][1]*m1[1][8]*m0[0][5]+m2[2][1]*m1[1][5]*m0[0][8]-m2[2][1]*m1[0][8]*m0[1][5]-m2[2][1]*m1[0][5]*m0[1][8]-m2[1][8]*m1[2][5]*m0[0][1]-m2[1][8]*m1[2][4]*m0[0][3]-m2[1][8]*m1[2][3]*m0[0][4]-m2[1][8]*m1[2][1]*m0[0][5]+m2[1][8]*m1[0][5]*m0[2][1]+m2[1][8]*m1[0][4]*m0[2][3]+m2[1][8]*m1[0][3]*m0[2][4]+m2[1][8]*m1[0][1]*m0[2][5]-m2[1][7]*m1[2][5]*m0[0][3]-m2[1][7]*m1[2][3]*m0[0][5]+m2[1][7]*m1[0][5]*m0[2][3]+m2[1][7]*m1[0][3]*m0[2][5]-m2[1][6]*m1[2][5]*m0[0][4]-m2[1][6]*m1[2][4]*m0[0][5]+m2[1][6]*m1[0][5]*m0[2][4]+m2[1][6]*m1[0][4]*m0[2][5]-m2[1][5]*m1[2][8]*m0[0][1]-m2[1][5]*m1[2][7]*m0[0][3]-m2[1][5]*m1[2][6]*m0[0][4]-m2[1][5]*m1[2][4]*m0[0][6]-m2[1][5]*m1[2][3]*m0[0][7]-m2[1][5]*m1[2][1]*m0[0][8]+m2[1][5]*m1[0][8]*m0[2][1]+m2[1][5]*m1[0][7]*m0[2][3]+m2[1][5]*m1[0][6]*m0[2][4]+m2[1][5]*m1[0][4]*m0[2][6]+m2[1][5]*m1[0][3]*m0[2][7]+m2[1][5]*m1[0][1]*m0[2][8]-m2[1][4]*m1[2][8]*m0[0][3]-m2[1][4]*m1[2][6]*m0[0][5]-m2[1][4]*m1[2][5]*m0[0][6]-m2[1][4]*m1[2][3]*m0[0][8]+m2[1][4]*m1[0][8]*m0[2][3]+m2[1][4]*m1[0][6]*m0[2][5]+m2[1][4]*m1[0][5]*m0[2][6]+m2[1][4]*m1[0][3]*m0[2][8]-m2[1][3]*m1[2][8]*m0[0][4]-m2[1][3]*m1[2][7]*m0[0][5]-m2[1][3]*m1[2][5]*m0[0][7]-m2[1][3]*m1[2][4]*m0[0][8]+m2[1][3]*m1[0][8]*m0[2][4]+m2[1][3]*m1[0][7]*m0[2][5]+m2[1][3]*m1[0][5]*m0[2][7]+m2[1][3]*m1[0][4]*m0[2][8]-m2[1][1]*m1[2][8]*m0[0][5]-m2[1][1]*m1[2][5]*m0[0][8]+m2[1][1]*m1[0][8]*m0[2][5]+m2[1][1]*m1[0][5]*m0[2][8]+m2[0][8]*m1[2][5]*m0[1][1]+m2[0][8]*m1[2][4]*m0[1][3]+m2[0][8]*m1[2][3]*m0[1][4]+m2[0][8]*m1[2][1]*m0[1][5]-m2[0][8]*m1[1][5]*m0[2][1]-m2[0][8]*m1[1][4]*m0[2][3]-m2[0][8]*m1[1][3]*m0[2][4]-m2[0][8]*m1[1][1]*m0[2][5]+m2[0][7]*m1[2][5]*m0[1][3]+m2[0][7]*m1[2][3]*m0[1][5]-m2[0][7]*m1[1][5]*m0[2][3]-m2[0][7]*m1[1][3]*m0[2][5]+m2[0][6]*m1[2][5]*m0[1][4]+m2[0][6]*m1[2][4]*m0[1][5]-m2[0][6]*m1[1][5]*m0[2][4]-m2[0][6]*m1[1][4]*m0[2][5]+m2[0][5]*m1[2][8]*m0[1][1]+m2[0][5]*m1[2][7]*m0[1][3]+m2[0][5]*m1[2][6]*m0[1][4]+m2[0][5]*m1[2][4]*m0[1][6]+m2[0][5]*m1[2][3]*m0[1][7]+m2[0][5]*m1[2][1]*m0[1][8]-m2[0][5]*m1[1][8]*m0[2][1]-m2[0][5]*m1[1][7]*m0[2][3]-m2[0][5]*m1[1][6]*m0[2][4]-m2[0][5]*m1[1][4]*m0[2][6]-m2[0][5]*m1[1][3]*m0[2][7]-m2[0][5]*m1[1][1]*m0[2][8]+m2[0][4]*m1[2][8]*m0[1][3]+m2[0][4]*m1[2][6]*m0[1][5]+m2[0][4]*m1[2][5]*m0[1][6]+m2[0][4]*m1[2][3]*m0[1][8]-m2[0][4]*m1[1][8]*m0[2][3]-m2[0][4]*m1[1][6]*m0[2][5]-m2[0][4]*m1[1][5]*m0[2][6]-m2[0][4]*m1[1][3]*m0[2][8]+m2[0][3]*m1[2][8]*m0[1][4]+m2[0][3]*m1[2][7]*m0[1][5]+m2[0][3]*m1[2][5]*m0[1][7]+m2[0][3]*m1[2][4]*m0[1][8]-m2[0][3]*m1[1][8]*m0[2][4]-m2[0][3]*m1[1][7]*m0[2][5]-m2[0][3]*m1[1][5]*m0[2][7]-m2[0][3]*m1[1][4]*m0[2][8]+m2[0][1]*m1[2][8]*m0[1][5]+m2[0][1]*m1[2][5]*m0[1][8]-m2[0][1]*m1[1][8]*m0[2][5]-m2[0][1]*m1[1][5]*m0[2][8]; 
  M1(row,45) = m2[2][8]*m1[1][5]*m0[0][2]+m2[2][8]*m1[1][4]*m0[0][4]+m2[2][8]*m1[1][2]*m0[0][5]-m2[2][8]*m1[0][5]*m0[1][2]-m2[2][8]*m1[0][4]*m0[1][4]-m2[2][8]*m1[0][2]*m0[1][5]+m2[2][7]*m1[1][5]*m0[0][4]+m2[2][7]*m1[1][4]*m0[0][5]-m2[2][7]*m1[0][5]*m0[1][4]-m2[2][7]*m1[0][4]*m0[1][5]+m2[2][5]*m1[1][8]*m0[0][2]+m2[2][5]*m1[1][7]*m0[0][4]+m2[2][5]*m1[1][4]*m0[0][7]+m2[2][5]*m1[1][2]*m0[0][8]-m2[2][5]*m1[0][8]*m0[1][2]-m2[2][5]*m1[0][7]*m0[1][4]-m2[2][5]*m1[0][4]*m0[1][7]-m2[2][5]*m1[0][2]*m0[1][8]+m2[2][4]*m1[1][8]*m0[0][4]+m2[2][4]*m1[1][7]*m0[0][5]+m2[2][4]*m1[1][5]*m0[0][7]+m2[2][4]*m1[1][4]*m0[0][8]-m2[2][4]*m1[0][8]*m0[1][4]-m2[2][4]*m1[0][7]*m0[1][5]-m2[2][4]*m1[0][5]*m0[1][7]-m2[2][4]*m1[0][4]*m0[1][8]+m2[2][2]*m1[1][8]*m0[0][5]+m2[2][2]*m1[1][5]*m0[0][8]-m2[2][2]*m1[0][8]*m0[1][5]-m2[2][2]*m1[0][5]*m0[1][8]-m2[1][8]*m1[2][5]*m0[0][2]-m2[1][8]*m1[2][4]*m0[0][4]-m2[1][8]*m1[2][2]*m0[0][5]+m2[1][8]*m1[0][5]*m0[2][2]+m2[1][8]*m1[0][4]*m0[2][4]+m2[1][8]*m1[0][2]*m0[2][5]-m2[1][7]*m1[2][5]*m0[0][4]-m2[1][7]*m1[2][4]*m0[0][5]+m2[1][7]*m1[0][5]*m0[2][4]+m2[1][7]*m1[0][4]*m0[2][5]-m2[1][5]*m1[2][8]*m0[0][2]-m2[1][5]*m1[2][7]*m0[0][4]-m2[1][5]*m1[2][4]*m0[0][7]-m2[1][5]*m1[2][2]*m0[0][8]+m2[1][5]*m1[0][8]*m0[2][2]+m2[1][5]*m1[0][7]*m0[2][4]+m2[1][5]*m1[0][4]*m0[2][7]+m2[1][5]*m1[0][2]*m0[2][8]-m2[1][4]*m1[2][8]*m0[0][4]-m2[1][4]*m1[2][7]*m0[0][5]-m2[1][4]*m1[2][5]*m0[0][7]-m2[1][4]*m1[2][4]*m0[0][8]+m2[1][4]*m1[0][8]*m0[2][4]+m2[1][4]*m1[0][7]*m0[2][5]+m2[1][4]*m1[0][5]*m0[2][7]+m2[1][4]*m1[0][4]*m0[2][8]-m2[1][2]*m1[2][8]*m0[0][5]-m2[1][2]*m1[2][5]*m0[0][8]+m2[1][2]*m1[0][8]*m0[2][5]+m2[1][2]*m1[0][5]*m0[2][8]+m2[0][8]*m1[2][5]*m0[1][2]+m2[0][8]*m1[2][4]*m0[1][4]+m2[0][8]*m1[2][2]*m0[1][5]-m2[0][8]*m1[1][5]*m0[2][2]-m2[0][8]*m1[1][4]*m0[2][4]-m2[0][8]*m1[1][2]*m0[2][5]+m2[0][7]*m1[2][5]*m0[1][4]+m2[0][7]*m1[2][4]*m0[1][5]-m2[0][7]*m1[1][5]*m0[2][4]-m2[0][7]*m1[1][4]*m0[2][5]+m2[0][5]*m1[2][8]*m0[1][2]+m2[0][5]*m1[2][7]*m0[1][4]+m2[0][5]*m1[2][4]*m0[1][7]+m2[0][5]*m1[2][2]*m0[1][8]-m2[0][5]*m1[1][8]*m0[2][2]-m2[0][5]*m1[1][7]*m0[2][4]-m2[0][5]*m1[1][4]*m0[2][7]-m2[0][5]*m1[1][2]*m0[2][8]+m2[0][4]*m1[2][8]*m0[1][4]+m2[0][4]*m1[2][7]*m0[1][5]+m2[0][4]*m1[2][5]*m0[1][7]+m2[0][4]*m1[2][4]*m0[1][8]-m2[0][4]*m1[1][8]*m0[2][4]-m2[0][4]*m1[1][7]*m0[2][5]-m2[0][4]*m1[1][5]*m0[2][7]-m2[0][4]*m1[1][4]*m0[2][8]+m2[0][2]*m1[2][8]*m0[1][5]+m2[0][2]*m1[2][5]*m0[1][8]-m2[0][2]*m1[1][8]*m0[2][5]-m2[0][2]*m1[1][5]*m0[2][8]; 
  M1(row,46) = m2[2][8]*m1[1][5]*m0[0][3]+m2[2][8]*m1[1][3]*m0[0][5]-m2[2][8]*m1[0][5]*m0[1][3]-m2[2][8]*m1[0][3]*m0[1][5]+m2[2][6]*m1[1][5]*m0[0][5]-m2[2][6]*m1[0][5]*m0[1][5]+m2[2][5]*m1[1][8]*m0[0][3]+m2[2][5]*m1[1][6]*m0[0][5]+m2[2][5]*m1[1][5]*m0[0][6]+m2[2][5]*m1[1][3]*m0[0][8]-m2[2][5]*m1[0][8]*m0[1][3]-m2[2][5]*m1[0][6]*m0[1][5]-m2[2][5]*m1[0][5]*m0[1][6]-m2[2][5]*m1[0][3]*m0[1][8]+m2[2][3]*m1[1][8]*m0[0][5]+m2[2][3]*m1[1][5]*m0[0][8]-m2[2][3]*m1[0][8]*m0[1][5]-m2[2][3]*m1[0][5]*m0[1][8]-m2[1][8]*m1[2][5]*m0[0][3]-m2[1][8]*m1[2][3]*m0[0][5]+m2[1][8]*m1[0][5]*m0[2][3]+m2[1][8]*m1[0][3]*m0[2][5]-m2[1][6]*m1[2][5]*m0[0][5]+m2[1][6]*m1[0][5]*m0[2][5]-m2[1][5]*m1[2][8]*m0[0][3]-m2[1][5]*m1[2][6]*m0[0][5]-m2[1][5]*m1[2][5]*m0[0][6]-m2[1][5]*m1[2][3]*m0[0][8]+m2[1][5]*m1[0][8]*m0[2][3]+m2[1][5]*m1[0][6]*m0[2][5]+m2[1][5]*m1[0][5]*m0[2][6]+m2[1][5]*m1[0][3]*m0[2][8]-m2[1][3]*m1[2][8]*m0[0][5]-m2[1][3]*m1[2][5]*m0[0][8]+m2[1][3]*m1[0][8]*m0[2][5]+m2[1][3]*m1[0][5]*m0[2][8]+m2[0][8]*m1[2][5]*m0[1][3]+m2[0][8]*m1[2][3]*m0[1][5]-m2[0][8]*m1[1][5]*m0[2][3]-m2[0][8]*m1[1][3]*m0[2][5]+m2[0][6]*m1[2][5]*m0[1][5]-m2[0][6]*m1[1][5]*m0[2][5]+m2[0][5]*m1[2][8]*m0[1][3]+m2[0][5]*m1[2][6]*m0[1][5]+m2[0][5]*m1[2][5]*m0[1][6]+m2[0][5]*m1[2][3]*m0[1][8]-m2[0][5]*m1[1][8]*m0[2][3]-m2[0][5]*m1[1][6]*m0[2][5]-m2[0][5]*m1[1][5]*m0[2][6]-m2[0][5]*m1[1][3]*m0[2][8]+m2[0][3]*m1[2][8]*m0[1][5]+m2[0][3]*m1[2][5]*m0[1][8]-m2[0][3]*m1[1][8]*m0[2][5]-m2[0][3]*m1[1][5]*m0[2][8]; 
  M1(row,47) = m2[2][8]*m1[1][5]*m0[0][4]+m2[2][8]*m1[1][4]*m0[0][5]-m2[2][8]*m1[0][5]*m0[1][4]-m2[2][8]*m1[0][4]*m0[1][5]+m2[2][7]*m1[1][5]*m0[0][5]-m2[2][7]*m1[0][5]*m0[1][5]+m2[2][5]*m1[1][8]*m0[0][4]+m2[2][5]*m1[1][7]*m0[0][5]+m2[2][5]*m1[1][5]*m0[0][7]+m2[2][5]*m1[1][4]*m0[0][8]-m2[2][5]*m1[0][8]*m0[1][4]-m2[2][5]*m1[0][7]*m0[1][5]-m2[2][5]*m1[0][5]*m0[1][7]-m2[2][5]*m1[0][4]*m0[1][8]+m2[2][4]*m1[1][8]*m0[0][5]+m2[2][4]*m1[1][5]*m0[0][8]-m2[2][4]*m1[0][8]*m0[1][5]-m2[2][4]*m1[0][5]*m0[1][8]-m2[1][8]*m1[2][5]*m0[0][4]-m2[1][8]*m1[2][4]*m0[0][5]+m2[1][8]*m1[0][5]*m0[2][4]+m2[1][8]*m1[0][4]*m0[2][5]-m2[1][7]*m1[2][5]*m0[0][5]+m2[1][7]*m1[0][5]*m0[2][5]-m2[1][5]*m1[2][8]*m0[0][4]-m2[1][5]*m1[2][7]*m0[0][5]-m2[1][5]*m1[2][5]*m0[0][7]-m2[1][5]*m1[2][4]*m0[0][8]+m2[1][5]*m1[0][8]*m0[2][4]+m2[1][5]*m1[0][7]*m0[2][5]+m2[1][5]*m1[0][5]*m0[2][7]+m2[1][5]*m1[0][4]*m0[2][8]-m2[1][4]*m1[2][8]*m0[0][5]-m2[1][4]*m1[2][5]*m0[0][8]+m2[1][4]*m1[0][8]*m0[2][5]+m2[1][4]*m1[0][5]*m0[2][8]+m2[0][8]*m1[2][5]*m0[1][4]+m2[0][8]*m1[2][4]*m0[1][5]-m2[0][8]*m1[1][5]*m0[2][4]-m2[0][8]*m1[1][4]*m0[2][5]+m2[0][7]*m1[2][5]*m0[1][5]-m2[0][7]*m1[1][5]*m0[2][5]+m2[0][5]*m1[2][8]*m0[1][4]+m2[0][5]*m1[2][7]*m0[1][5]+m2[0][5]*m1[2][5]*m0[1][7]+m2[0][5]*m1[2][4]*m0[1][8]-m2[0][5]*m1[1][8]*m0[2][4]-m2[0][5]*m1[1][7]*m0[2][5]-m2[0][5]*m1[1][5]*m0[2][7]-m2[0][5]*m1[1][4]*m0[2][8]+m2[0][4]*m1[2][8]*m0[1][5]+m2[0][4]*m1[2][5]*m0[1][8]-m2[0][4]*m1[1][8]*m0[2][5]-m2[0][4]*m1[1][5]*m0[2][8]; 
  M1(row,48) = m2[2][8]*m1[1][5]*m0[0][5]-m2[2][8]*m1[0][5]*m0[1][5]+m2[2][5]*m1[1][8]*m0[0][5]+m2[2][5]*m1[1][5]*m0[0][8]-m2[2][5]*m1[0][8]*m0[1][5]-m2[2][5]*m1[0][5]*m0[1][8]-m2[1][8]*m1[2][5]*m0[0][5]+m2[1][8]*m1[0][5]*m0[2][5]-m2[1][5]*m1[2][8]*m0[0][5]-m2[1][5]*m1[2][5]*m0[0][8]+m2[1][5]*m1[0][8]*m0[2][5]+m2[1][5]*m1[0][5]*m0[2][8]+m2[0][8]*m1[2][5]*m0[1][5]-m2[0][8]*m1[1][5]*m0[2][5]+m2[0][5]*m1[2][8]*m0[1][5]+m2[0][5]*m1[2][5]*m0[1][8]-m2[0][5]*m1[1][8]*m0[2][5]-m2[0][5]*m1[1][5]*m0[2][8]; 
  M1(row,49) = m2[2][9]*m1[1][0]*m0[0][0]-m2[2][9]*m1[0][0]*m0[1][0]+m2[2][6]*m1[1][6]*m0[0][0]+m2[2][6]*m1[1][0]*m0[0][6]-m2[2][6]*m1[0][6]*m0[1][0]-m2[2][6]*m1[0][0]*m0[1][6]+m2[2][0]*m1[1][9]*m0[0][0]+m2[2][0]*m1[1][6]*m0[0][6]+m2[2][0]*m1[1][0]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][0]-m2[2][0]*m1[0][6]*m0[1][6]-m2[2][0]*m1[0][0]*m0[1][9]-m2[1][9]*m1[2][0]*m0[0][0]+m2[1][9]*m1[0][0]*m0[2][0]-m2[1][6]*m1[2][6]*m0[0][0]-m2[1][6]*m1[2][0]*m0[0][6]+m2[1][6]*m1[0][6]*m0[2][0]+m2[1][6]*m1[0][0]*m0[2][6]-m2[1][0]*m1[2][9]*m0[0][0]-m2[1][0]*m1[2][6]*m0[0][6]-m2[1][0]*m1[2][0]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][0]+m2[1][0]*m1[0][6]*m0[2][6]+m2[1][0]*m1[0][0]*m0[2][9]+m2[0][9]*m1[2][0]*m0[1][0]-m2[0][9]*m1[1][0]*m0[2][0]+m2[0][6]*m1[2][6]*m0[1][0]+m2[0][6]*m1[2][0]*m0[1][6]-m2[0][6]*m1[1][6]*m0[2][0]-m2[0][6]*m1[1][0]*m0[2][6]+m2[0][0]*m1[2][9]*m0[1][0]+m2[0][0]*m1[2][6]*m0[1][6]+m2[0][0]*m1[2][0]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][0]-m2[0][0]*m1[1][6]*m0[2][6]-m2[0][0]*m1[1][0]*m0[2][9]; 
  M1(row,50) = m2[2][9]*m1[1][1]*m0[0][0]+m2[2][9]*m1[1][0]*m0[0][1]-m2[2][9]*m1[0][1]*m0[1][0]-m2[2][9]*m1[0][0]*m0[1][1]+m2[2][7]*m1[1][6]*m0[0][0]+m2[2][7]*m1[1][0]*m0[0][6]-m2[2][7]*m1[0][6]*m0[1][0]-m2[2][7]*m1[0][0]*m0[1][6]+m2[2][6]*m1[1][7]*m0[0][0]+m2[2][6]*m1[1][6]*m0[0][1]+m2[2][6]*m1[1][1]*m0[0][6]+m2[2][6]*m1[1][0]*m0[0][7]-m2[2][6]*m1[0][7]*m0[1][0]-m2[2][6]*m1[0][6]*m0[1][1]-m2[2][6]*m1[0][1]*m0[1][6]-m2[2][6]*m1[0][0]*m0[1][7]+m2[2][1]*m1[1][9]*m0[0][0]+m2[2][1]*m1[1][6]*m0[0][6]+m2[2][1]*m1[1][0]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][0]-m2[2][1]*m1[0][6]*m0[1][6]-m2[2][1]*m1[0][0]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][1]+m2[2][0]*m1[1][7]*m0[0][6]+m2[2][0]*m1[1][6]*m0[0][7]+m2[2][0]*m1[1][1]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][1]-m2[2][0]*m1[0][7]*m0[1][6]-m2[2][0]*m1[0][6]*m0[1][7]-m2[2][0]*m1[0][1]*m0[1][9]-m2[1][9]*m1[2][1]*m0[0][0]-m2[1][9]*m1[2][0]*m0[0][1]+m2[1][9]*m1[0][1]*m0[2][0]+m2[1][9]*m1[0][0]*m0[2][1]-m2[1][7]*m1[2][6]*m0[0][0]-m2[1][7]*m1[2][0]*m0[0][6]+m2[1][7]*m1[0][6]*m0[2][0]+m2[1][7]*m1[0][0]*m0[2][6]-m2[1][6]*m1[2][7]*m0[0][0]-m2[1][6]*m1[2][6]*m0[0][1]-m2[1][6]*m1[2][1]*m0[0][6]-m2[1][6]*m1[2][0]*m0[0][7]+m2[1][6]*m1[0][7]*m0[2][0]+m2[1][6]*m1[0][6]*m0[2][1]+m2[1][6]*m1[0][1]*m0[2][6]+m2[1][6]*m1[0][0]*m0[2][7]-m2[1][1]*m1[2][9]*m0[0][0]-m2[1][1]*m1[2][6]*m0[0][6]-m2[1][1]*m1[2][0]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][0]+m2[1][1]*m1[0][6]*m0[2][6]+m2[1][1]*m1[0][0]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][1]-m2[1][0]*m1[2][7]*m0[0][6]-m2[1][0]*m1[2][6]*m0[0][7]-m2[1][0]*m1[2][1]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][1]+m2[1][0]*m1[0][7]*m0[2][6]+m2[1][0]*m1[0][6]*m0[2][7]+m2[1][0]*m1[0][1]*m0[2][9]+m2[0][9]*m1[2][1]*m0[1][0]+m2[0][9]*m1[2][0]*m0[1][1]-m2[0][9]*m1[1][1]*m0[2][0]-m2[0][9]*m1[1][0]*m0[2][1]+m2[0][7]*m1[2][6]*m0[1][0]+m2[0][7]*m1[2][0]*m0[1][6]-m2[0][7]*m1[1][6]*m0[2][0]-m2[0][7]*m1[1][0]*m0[2][6]+m2[0][6]*m1[2][7]*m0[1][0]+m2[0][6]*m1[2][6]*m0[1][1]+m2[0][6]*m1[2][1]*m0[1][6]+m2[0][6]*m1[2][0]*m0[1][7]-m2[0][6]*m1[1][7]*m0[2][0]-m2[0][6]*m1[1][6]*m0[2][1]-m2[0][6]*m1[1][1]*m0[2][6]-m2[0][6]*m1[1][0]*m0[2][7]+m2[0][1]*m1[2][9]*m0[1][0]+m2[0][1]*m1[2][6]*m0[1][6]+m2[0][1]*m1[2][0]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][0]-m2[0][1]*m1[1][6]*m0[2][6]-m2[0][1]*m1[1][0]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][1]+m2[0][0]*m1[2][7]*m0[1][6]+m2[0][0]*m1[2][6]*m0[1][7]+m2[0][0]*m1[2][1]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][1]-m2[0][0]*m1[1][7]*m0[2][6]-m2[0][0]*m1[1][6]*m0[2][7]-m2[0][0]*m1[1][1]*m0[2][9]; 
  M1(row,51) = m2[2][9]*m1[1][2]*m0[0][0]+m2[2][9]*m1[1][1]*m0[0][1]+m2[2][9]*m1[1][0]*m0[0][2]-m2[2][9]*m1[0][2]*m0[1][0]-m2[2][9]*m1[0][1]*m0[1][1]-m2[2][9]*m1[0][0]*m0[1][2]+m2[2][7]*m1[1][7]*m0[0][0]+m2[2][7]*m1[1][6]*m0[0][1]+m2[2][7]*m1[1][1]*m0[0][6]+m2[2][7]*m1[1][0]*m0[0][7]-m2[2][7]*m1[0][7]*m0[1][0]-m2[2][7]*m1[0][6]*m0[1][1]-m2[2][7]*m1[0][1]*m0[1][6]-m2[2][7]*m1[0][0]*m0[1][7]+m2[2][6]*m1[1][7]*m0[0][1]+m2[2][6]*m1[1][6]*m0[0][2]+m2[2][6]*m1[1][2]*m0[0][6]+m2[2][6]*m1[1][1]*m0[0][7]-m2[2][6]*m1[0][7]*m0[1][1]-m2[2][6]*m1[0][6]*m0[1][2]-m2[2][6]*m1[0][2]*m0[1][6]-m2[2][6]*m1[0][1]*m0[1][7]+m2[2][2]*m1[1][9]*m0[0][0]+m2[2][2]*m1[1][6]*m0[0][6]+m2[2][2]*m1[1][0]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][0]-m2[2][2]*m1[0][6]*m0[1][6]-m2[2][2]*m1[0][0]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][1]+m2[2][1]*m1[1][7]*m0[0][6]+m2[2][1]*m1[1][6]*m0[0][7]+m2[2][1]*m1[1][1]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][1]-m2[2][1]*m1[0][7]*m0[1][6]-m2[2][1]*m1[0][6]*m0[1][7]-m2[2][1]*m1[0][1]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][2]+m2[2][0]*m1[1][7]*m0[0][7]+m2[2][0]*m1[1][2]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][2]-m2[2][0]*m1[0][7]*m0[1][7]-m2[2][0]*m1[0][2]*m0[1][9]-m2[1][9]*m1[2][2]*m0[0][0]-m2[1][9]*m1[2][1]*m0[0][1]-m2[1][9]*m1[2][0]*m0[0][2]+m2[1][9]*m1[0][2]*m0[2][0]+m2[1][9]*m1[0][1]*m0[2][1]+m2[1][9]*m1[0][0]*m0[2][2]-m2[1][7]*m1[2][7]*m0[0][0]-m2[1][7]*m1[2][6]*m0[0][1]-m2[1][7]*m1[2][1]*m0[0][6]-m2[1][7]*m1[2][0]*m0[0][7]+m2[1][7]*m1[0][7]*m0[2][0]+m2[1][7]*m1[0][6]*m0[2][1]+m2[1][7]*m1[0][1]*m0[2][6]+m2[1][7]*m1[0][0]*m0[2][7]-m2[1][6]*m1[2][7]*m0[0][1]-m2[1][6]*m1[2][6]*m0[0][2]-m2[1][6]*m1[2][2]*m0[0][6]-m2[1][6]*m1[2][1]*m0[0][7]+m2[1][6]*m1[0][7]*m0[2][1]+m2[1][6]*m1[0][6]*m0[2][2]+m2[1][6]*m1[0][2]*m0[2][6]+m2[1][6]*m1[0][1]*m0[2][7]-m2[1][2]*m1[2][9]*m0[0][0]-m2[1][2]*m1[2][6]*m0[0][6]-m2[1][2]*m1[2][0]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][0]+m2[1][2]*m1[0][6]*m0[2][6]+m2[1][2]*m1[0][0]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][1]-m2[1][1]*m1[2][7]*m0[0][6]-m2[1][1]*m1[2][6]*m0[0][7]-m2[1][1]*m1[2][1]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][1]+m2[1][1]*m1[0][7]*m0[2][6]+m2[1][1]*m1[0][6]*m0[2][7]+m2[1][1]*m1[0][1]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][2]-m2[1][0]*m1[2][7]*m0[0][7]-m2[1][0]*m1[2][2]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][2]+m2[1][0]*m1[0][7]*m0[2][7]+m2[1][0]*m1[0][2]*m0[2][9]+m2[0][9]*m1[2][2]*m0[1][0]+m2[0][9]*m1[2][1]*m0[1][1]+m2[0][9]*m1[2][0]*m0[1][2]-m2[0][9]*m1[1][2]*m0[2][0]-m2[0][9]*m1[1][1]*m0[2][1]-m2[0][9]*m1[1][0]*m0[2][2]+m2[0][7]*m1[2][7]*m0[1][0]+m2[0][7]*m1[2][6]*m0[1][1]+m2[0][7]*m1[2][1]*m0[1][6]+m2[0][7]*m1[2][0]*m0[1][7]-m2[0][7]*m1[1][7]*m0[2][0]-m2[0][7]*m1[1][6]*m0[2][1]-m2[0][7]*m1[1][1]*m0[2][6]-m2[0][7]*m1[1][0]*m0[2][7]+m2[0][6]*m1[2][7]*m0[1][1]+m2[0][6]*m1[2][6]*m0[1][2]+m2[0][6]*m1[2][2]*m0[1][6]+m2[0][6]*m1[2][1]*m0[1][7]-m2[0][6]*m1[1][7]*m0[2][1]-m2[0][6]*m1[1][6]*m0[2][2]-m2[0][6]*m1[1][2]*m0[2][6]-m2[0][6]*m1[1][1]*m0[2][7]+m2[0][2]*m1[2][9]*m0[1][0]+m2[0][2]*m1[2][6]*m0[1][6]+m2[0][2]*m1[2][0]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][0]-m2[0][2]*m1[1][6]*m0[2][6]-m2[0][2]*m1[1][0]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][1]+m2[0][1]*m1[2][7]*m0[1][6]+m2[0][1]*m1[2][6]*m0[1][7]+m2[0][1]*m1[2][1]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][1]-m2[0][1]*m1[1][7]*m0[2][6]-m2[0][1]*m1[1][6]*m0[2][7]-m2[0][1]*m1[1][1]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][2]+m2[0][0]*m1[2][7]*m0[1][7]+m2[0][0]*m1[2][2]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][2]-m2[0][0]*m1[1][7]*m0[2][7]-m2[0][0]*m1[1][2]*m0[2][9]; 
  M1(row,52) = m2[2][9]*m1[1][2]*m0[0][1]+m2[2][9]*m1[1][1]*m0[0][2]-m2[2][9]*m1[0][2]*m0[1][1]-m2[2][9]*m1[0][1]*m0[1][2]+m2[2][7]*m1[1][7]*m0[0][1]+m2[2][7]*m1[1][6]*m0[0][2]+m2[2][7]*m1[1][2]*m0[0][6]+m2[2][7]*m1[1][1]*m0[0][7]-m2[2][7]*m1[0][7]*m0[1][1]-m2[2][7]*m1[0][6]*m0[1][2]-m2[2][7]*m1[0][2]*m0[1][6]-m2[2][7]*m1[0][1]*m0[1][7]+m2[2][6]*m1[1][7]*m0[0][2]+m2[2][6]*m1[1][2]*m0[0][7]-m2[2][6]*m1[0][7]*m0[1][2]-m2[2][6]*m1[0][2]*m0[1][7]+m2[2][2]*m1[1][9]*m0[0][1]+m2[2][2]*m1[1][7]*m0[0][6]+m2[2][2]*m1[1][6]*m0[0][7]+m2[2][2]*m1[1][1]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][1]-m2[2][2]*m1[0][7]*m0[1][6]-m2[2][2]*m1[0][6]*m0[1][7]-m2[2][2]*m1[0][1]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][2]+m2[2][1]*m1[1][7]*m0[0][7]+m2[2][1]*m1[1][2]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][2]-m2[2][1]*m1[0][7]*m0[1][7]-m2[2][1]*m1[0][2]*m0[1][9]-m2[1][9]*m1[2][2]*m0[0][1]-m2[1][9]*m1[2][1]*m0[0][2]+m2[1][9]*m1[0][2]*m0[2][1]+m2[1][9]*m1[0][1]*m0[2][2]-m2[1][7]*m1[2][7]*m0[0][1]-m2[1][7]*m1[2][6]*m0[0][2]-m2[1][7]*m1[2][2]*m0[0][6]-m2[1][7]*m1[2][1]*m0[0][7]+m2[1][7]*m1[0][7]*m0[2][1]+m2[1][7]*m1[0][6]*m0[2][2]+m2[1][7]*m1[0][2]*m0[2][6]+m2[1][7]*m1[0][1]*m0[2][7]-m2[1][6]*m1[2][7]*m0[0][2]-m2[1][6]*m1[2][2]*m0[0][7]+m2[1][6]*m1[0][7]*m0[2][2]+m2[1][6]*m1[0][2]*m0[2][7]-m2[1][2]*m1[2][9]*m0[0][1]-m2[1][2]*m1[2][7]*m0[0][6]-m2[1][2]*m1[2][6]*m0[0][7]-m2[1][2]*m1[2][1]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][1]+m2[1][2]*m1[0][7]*m0[2][6]+m2[1][2]*m1[0][6]*m0[2][7]+m2[1][2]*m1[0][1]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][2]-m2[1][1]*m1[2][7]*m0[0][7]-m2[1][1]*m1[2][2]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][2]+m2[1][1]*m1[0][7]*m0[2][7]+m2[1][1]*m1[0][2]*m0[2][9]+m2[0][9]*m1[2][2]*m0[1][1]+m2[0][9]*m1[2][1]*m0[1][2]-m2[0][9]*m1[1][2]*m0[2][1]-m2[0][9]*m1[1][1]*m0[2][2]+m2[0][7]*m1[2][7]*m0[1][1]+m2[0][7]*m1[2][6]*m0[1][2]+m2[0][7]*m1[2][2]*m0[1][6]+m2[0][7]*m1[2][1]*m0[1][7]-m2[0][7]*m1[1][7]*m0[2][1]-m2[0][7]*m1[1][6]*m0[2][2]-m2[0][7]*m1[1][2]*m0[2][6]-m2[0][7]*m1[1][1]*m0[2][7]+m2[0][6]*m1[2][7]*m0[1][2]+m2[0][6]*m1[2][2]*m0[1][7]-m2[0][6]*m1[1][7]*m0[2][2]-m2[0][6]*m1[1][2]*m0[2][7]+m2[0][2]*m1[2][9]*m0[1][1]+m2[0][2]*m1[2][7]*m0[1][6]+m2[0][2]*m1[2][6]*m0[1][7]+m2[0][2]*m1[2][1]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][1]-m2[0][2]*m1[1][7]*m0[2][6]-m2[0][2]*m1[1][6]*m0[2][7]-m2[0][2]*m1[1][1]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][2]+m2[0][1]*m1[2][7]*m0[1][7]+m2[0][1]*m1[2][2]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][2]-m2[0][1]*m1[1][7]*m0[2][7]-m2[0][1]*m1[1][2]*m0[2][9]; 
  M1(row,53) = m2[2][9]*m1[1][2]*m0[0][2]-m2[2][9]*m1[0][2]*m0[1][2]+m2[2][7]*m1[1][7]*m0[0][2]+m2[2][7]*m1[1][2]*m0[0][7]-m2[2][7]*m1[0][7]*m0[1][2]-m2[2][7]*m1[0][2]*m0[1][7]+m2[2][2]*m1[1][9]*m0[0][2]+m2[2][2]*m1[1][7]*m0[0][7]+m2[2][2]*m1[1][2]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][2]-m2[2][2]*m1[0][7]*m0[1][7]-m2[2][2]*m1[0][2]*m0[1][9]-m2[1][9]*m1[2][2]*m0[0][2]+m2[1][9]*m1[0][2]*m0[2][2]-m2[1][7]*m1[2][7]*m0[0][2]-m2[1][7]*m1[2][2]*m0[0][7]+m2[1][7]*m1[0][7]*m0[2][2]+m2[1][7]*m1[0][2]*m0[2][7]-m2[1][2]*m1[2][9]*m0[0][2]-m2[1][2]*m1[2][7]*m0[0][7]-m2[1][2]*m1[2][2]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][2]+m2[1][2]*m1[0][7]*m0[2][7]+m2[1][2]*m1[0][2]*m0[2][9]+m2[0][9]*m1[2][2]*m0[1][2]-m2[0][9]*m1[1][2]*m0[2][2]+m2[0][7]*m1[2][7]*m0[1][2]+m2[0][7]*m1[2][2]*m0[1][7]-m2[0][7]*m1[1][7]*m0[2][2]-m2[0][7]*m1[1][2]*m0[2][7]+m2[0][2]*m1[2][9]*m0[1][2]+m2[0][2]*m1[2][7]*m0[1][7]+m2[0][2]*m1[2][2]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][2]-m2[0][2]*m1[1][7]*m0[2][7]-m2[0][2]*m1[1][2]*m0[2][9]; 
  M1(row,54) = m2[2][9]*m1[1][3]*m0[0][0]+m2[2][9]*m1[1][0]*m0[0][3]-m2[2][9]*m1[0][3]*m0[1][0]-m2[2][9]*m1[0][0]*m0[1][3]+m2[2][8]*m1[1][6]*m0[0][0]+m2[2][8]*m1[1][0]*m0[0][6]-m2[2][8]*m1[0][6]*m0[1][0]-m2[2][8]*m1[0][0]*m0[1][6]+m2[2][6]*m1[1][8]*m0[0][0]+m2[2][6]*m1[1][6]*m0[0][3]+m2[2][6]*m1[1][3]*m0[0][6]+m2[2][6]*m1[1][0]*m0[0][8]-m2[2][6]*m1[0][8]*m0[1][0]-m2[2][6]*m1[0][6]*m0[1][3]-m2[2][6]*m1[0][3]*m0[1][6]-m2[2][6]*m1[0][0]*m0[1][8]+m2[2][3]*m1[1][9]*m0[0][0]+m2[2][3]*m1[1][6]*m0[0][6]+m2[2][3]*m1[1][0]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][0]-m2[2][3]*m1[0][6]*m0[1][6]-m2[2][3]*m1[0][0]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][3]+m2[2][0]*m1[1][8]*m0[0][6]+m2[2][0]*m1[1][6]*m0[0][8]+m2[2][0]*m1[1][3]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][3]-m2[2][0]*m1[0][8]*m0[1][6]-m2[2][0]*m1[0][6]*m0[1][8]-m2[2][0]*m1[0][3]*m0[1][9]-m2[1][9]*m1[2][3]*m0[0][0]-m2[1][9]*m1[2][0]*m0[0][3]+m2[1][9]*m1[0][3]*m0[2][0]+m2[1][9]*m1[0][0]*m0[2][3]-m2[1][8]*m1[2][6]*m0[0][0]-m2[1][8]*m1[2][0]*m0[0][6]+m2[1][8]*m1[0][6]*m0[2][0]+m2[1][8]*m1[0][0]*m0[2][6]-m2[1][6]*m1[2][8]*m0[0][0]-m2[1][6]*m1[2][6]*m0[0][3]-m2[1][6]*m1[2][3]*m0[0][6]-m2[1][6]*m1[2][0]*m0[0][8]+m2[1][6]*m1[0][8]*m0[2][0]+m2[1][6]*m1[0][6]*m0[2][3]+m2[1][6]*m1[0][3]*m0[2][6]+m2[1][6]*m1[0][0]*m0[2][8]-m2[1][3]*m1[2][9]*m0[0][0]-m2[1][3]*m1[2][6]*m0[0][6]-m2[1][3]*m1[2][0]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][0]+m2[1][3]*m1[0][6]*m0[2][6]+m2[1][3]*m1[0][0]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][3]-m2[1][0]*m1[2][8]*m0[0][6]-m2[1][0]*m1[2][6]*m0[0][8]-m2[1][0]*m1[2][3]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][3]+m2[1][0]*m1[0][8]*m0[2][6]+m2[1][0]*m1[0][6]*m0[2][8]+m2[1][0]*m1[0][3]*m0[2][9]+m2[0][9]*m1[2][3]*m0[1][0]+m2[0][9]*m1[2][0]*m0[1][3]-m2[0][9]*m1[1][3]*m0[2][0]-m2[0][9]*m1[1][0]*m0[2][3]+m2[0][8]*m1[2][6]*m0[1][0]+m2[0][8]*m1[2][0]*m0[1][6]-m2[0][8]*m1[1][6]*m0[2][0]-m2[0][8]*m1[1][0]*m0[2][6]+m2[0][6]*m1[2][8]*m0[1][0]+m2[0][6]*m1[2][6]*m0[1][3]+m2[0][6]*m1[2][3]*m0[1][6]+m2[0][6]*m1[2][0]*m0[1][8]-m2[0][6]*m1[1][8]*m0[2][0]-m2[0][6]*m1[1][6]*m0[2][3]-m2[0][6]*m1[1][3]*m0[2][6]-m2[0][6]*m1[1][0]*m0[2][8]+m2[0][3]*m1[2][9]*m0[1][0]+m2[0][3]*m1[2][6]*m0[1][6]+m2[0][3]*m1[2][0]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][0]-m2[0][3]*m1[1][6]*m0[2][6]-m2[0][3]*m1[1][0]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][3]+m2[0][0]*m1[2][8]*m0[1][6]+m2[0][0]*m1[2][6]*m0[1][8]+m2[0][0]*m1[2][3]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][3]-m2[0][0]*m1[1][8]*m0[2][6]-m2[0][0]*m1[1][6]*m0[2][8]-m2[0][0]*m1[1][3]*m0[2][9]; 
  M1(row,55) = m2[2][9]*m1[1][4]*m0[0][0]+m2[2][9]*m1[1][3]*m0[0][1]+m2[2][9]*m1[1][1]*m0[0][3]+m2[2][9]*m1[1][0]*m0[0][4]-m2[2][9]*m1[0][4]*m0[1][0]-m2[2][9]*m1[0][3]*m0[1][1]-m2[2][9]*m1[0][1]*m0[1][3]-m2[2][9]*m1[0][0]*m0[1][4]+m2[2][8]*m1[1][7]*m0[0][0]+m2[2][8]*m1[1][6]*m0[0][1]+m2[2][8]*m1[1][1]*m0[0][6]+m2[2][8]*m1[1][0]*m0[0][7]-m2[2][8]*m1[0][7]*m0[1][0]-m2[2][8]*m1[0][6]*m0[1][1]-m2[2][8]*m1[0][1]*m0[1][6]-m2[2][8]*m1[0][0]*m0[1][7]+m2[2][7]*m1[1][8]*m0[0][0]+m2[2][7]*m1[1][6]*m0[0][3]+m2[2][7]*m1[1][3]*m0[0][6]+m2[2][7]*m1[1][0]*m0[0][8]-m2[2][7]*m1[0][8]*m0[1][0]-m2[2][7]*m1[0][6]*m0[1][3]-m2[2][7]*m1[0][3]*m0[1][6]-m2[2][7]*m1[0][0]*m0[1][8]+m2[2][6]*m1[1][8]*m0[0][1]+m2[2][6]*m1[1][7]*m0[0][3]+m2[2][6]*m1[1][6]*m0[0][4]+m2[2][6]*m1[1][4]*m0[0][6]+m2[2][6]*m1[1][3]*m0[0][7]+m2[2][6]*m1[1][1]*m0[0][8]-m2[2][6]*m1[0][8]*m0[1][1]-m2[2][6]*m1[0][7]*m0[1][3]-m2[2][6]*m1[0][6]*m0[1][4]-m2[2][6]*m1[0][4]*m0[1][6]-m2[2][6]*m1[0][3]*m0[1][7]-m2[2][6]*m1[0][1]*m0[1][8]+m2[2][4]*m1[1][9]*m0[0][0]+m2[2][4]*m1[1][6]*m0[0][6]+m2[2][4]*m1[1][0]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][0]-m2[2][4]*m1[0][6]*m0[1][6]-m2[2][4]*m1[0][0]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][1]+m2[2][3]*m1[1][7]*m0[0][6]+m2[2][3]*m1[1][6]*m0[0][7]+m2[2][3]*m1[1][1]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][1]-m2[2][3]*m1[0][7]*m0[1][6]-m2[2][3]*m1[0][6]*m0[1][7]-m2[2][3]*m1[0][1]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][3]+m2[2][1]*m1[1][8]*m0[0][6]+m2[2][1]*m1[1][6]*m0[0][8]+m2[2][1]*m1[1][3]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][3]-m2[2][1]*m1[0][8]*m0[1][6]-m2[2][1]*m1[0][6]*m0[1][8]-m2[2][1]*m1[0][3]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][4]+m2[2][0]*m1[1][8]*m0[0][7]+m2[2][0]*m1[1][7]*m0[0][8]+m2[2][0]*m1[1][4]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][4]-m2[2][0]*m1[0][8]*m0[1][7]-m2[2][0]*m1[0][7]*m0[1][8]-m2[2][0]*m1[0][4]*m0[1][9]-m2[1][9]*m1[2][4]*m0[0][0]-m2[1][9]*m1[2][3]*m0[0][1]-m2[1][9]*m1[2][1]*m0[0][3]-m2[1][9]*m1[2][0]*m0[0][4]+m2[1][9]*m1[0][4]*m0[2][0]+m2[1][9]*m1[0][3]*m0[2][1]+m2[1][9]*m1[0][1]*m0[2][3]+m2[1][9]*m1[0][0]*m0[2][4]-m2[1][8]*m1[2][7]*m0[0][0]-m2[1][8]*m1[2][6]*m0[0][1]-m2[1][8]*m1[2][1]*m0[0][6]-m2[1][8]*m1[2][0]*m0[0][7]+m2[1][8]*m1[0][7]*m0[2][0]+m2[1][8]*m1[0][6]*m0[2][1]+m2[1][8]*m1[0][1]*m0[2][6]+m2[1][8]*m1[0][0]*m0[2][7]-m2[1][7]*m1[2][8]*m0[0][0]-m2[1][7]*m1[2][6]*m0[0][3]-m2[1][7]*m1[2][3]*m0[0][6]-m2[1][7]*m1[2][0]*m0[0][8]+m2[1][7]*m1[0][8]*m0[2][0]+m2[1][7]*m1[0][6]*m0[2][3]+m2[1][7]*m1[0][3]*m0[2][6]+m2[1][7]*m1[0][0]*m0[2][8]-m2[1][6]*m1[2][8]*m0[0][1]-m2[1][6]*m1[2][7]*m0[0][3]-m2[1][6]*m1[2][6]*m0[0][4]-m2[1][6]*m1[2][4]*m0[0][6]-m2[1][6]*m1[2][3]*m0[0][7]-m2[1][6]*m1[2][1]*m0[0][8]+m2[1][6]*m1[0][8]*m0[2][1]+m2[1][6]*m1[0][7]*m0[2][3]+m2[1][6]*m1[0][6]*m0[2][4]+m2[1][6]*m1[0][4]*m0[2][6]+m2[1][6]*m1[0][3]*m0[2][7]+m2[1][6]*m1[0][1]*m0[2][8]-m2[1][4]*m1[2][9]*m0[0][0]-m2[1][4]*m1[2][6]*m0[0][6]-m2[1][4]*m1[2][0]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][0]+m2[1][4]*m1[0][6]*m0[2][6]+m2[1][4]*m1[0][0]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][1]-m2[1][3]*m1[2][7]*m0[0][6]-m2[1][3]*m1[2][6]*m0[0][7]-m2[1][3]*m1[2][1]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][1]+m2[1][3]*m1[0][7]*m0[2][6]+m2[1][3]*m1[0][6]*m0[2][7]+m2[1][3]*m1[0][1]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][3]-m2[1][1]*m1[2][8]*m0[0][6]-m2[1][1]*m1[2][6]*m0[0][8]-m2[1][1]*m1[2][3]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][3]+m2[1][1]*m1[0][8]*m0[2][6]+m2[1][1]*m1[0][6]*m0[2][8]+m2[1][1]*m1[0][3]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][4]-m2[1][0]*m1[2][8]*m0[0][7]-m2[1][0]*m1[2][7]*m0[0][8]-m2[1][0]*m1[2][4]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][4]+m2[1][0]*m1[0][8]*m0[2][7]+m2[1][0]*m1[0][7]*m0[2][8]+m2[1][0]*m1[0][4]*m0[2][9]+m2[0][9]*m1[2][4]*m0[1][0]+m2[0][9]*m1[2][3]*m0[1][1]+m2[0][9]*m1[2][1]*m0[1][3]+m2[0][9]*m1[2][0]*m0[1][4]-m2[0][9]*m1[1][4]*m0[2][0]-m2[0][9]*m1[1][3]*m0[2][1]-m2[0][9]*m1[1][1]*m0[2][3]-m2[0][9]*m1[1][0]*m0[2][4]+m2[0][8]*m1[2][7]*m0[1][0]+m2[0][8]*m1[2][6]*m0[1][1]+m2[0][8]*m1[2][1]*m0[1][6]+m2[0][8]*m1[2][0]*m0[1][7]-m2[0][8]*m1[1][7]*m0[2][0]-m2[0][8]*m1[1][6]*m0[2][1]-m2[0][8]*m1[1][1]*m0[2][6]-m2[0][8]*m1[1][0]*m0[2][7]+m2[0][7]*m1[2][8]*m0[1][0]+m2[0][7]*m1[2][6]*m0[1][3]+m2[0][7]*m1[2][3]*m0[1][6]+m2[0][7]*m1[2][0]*m0[1][8]-m2[0][7]*m1[1][8]*m0[2][0]-m2[0][7]*m1[1][6]*m0[2][3]-m2[0][7]*m1[1][3]*m0[2][6]-m2[0][7]*m1[1][0]*m0[2][8]+m2[0][6]*m1[2][8]*m0[1][1]+m2[0][6]*m1[2][7]*m0[1][3]+m2[0][6]*m1[2][6]*m0[1][4]+m2[0][6]*m1[2][4]*m0[1][6]+m2[0][6]*m1[2][3]*m0[1][7]+m2[0][6]*m1[2][1]*m0[1][8]-m2[0][6]*m1[1][8]*m0[2][1]-m2[0][6]*m1[1][7]*m0[2][3]-m2[0][6]*m1[1][6]*m0[2][4]-m2[0][6]*m1[1][4]*m0[2][6]-m2[0][6]*m1[1][3]*m0[2][7]-m2[0][6]*m1[1][1]*m0[2][8]+m2[0][4]*m1[2][9]*m0[1][0]+m2[0][4]*m1[2][6]*m0[1][6]+m2[0][4]*m1[2][0]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][0]-m2[0][4]*m1[1][6]*m0[2][6]-m2[0][4]*m1[1][0]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][1]+m2[0][3]*m1[2][7]*m0[1][6]+m2[0][3]*m1[2][6]*m0[1][7]+m2[0][3]*m1[2][1]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][1]-m2[0][3]*m1[1][7]*m0[2][6]-m2[0][3]*m1[1][6]*m0[2][7]-m2[0][3]*m1[1][1]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][3]+m2[0][1]*m1[2][8]*m0[1][6]+m2[0][1]*m1[2][6]*m0[1][8]+m2[0][1]*m1[2][3]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][3]-m2[0][1]*m1[1][8]*m0[2][6]-m2[0][1]*m1[1][6]*m0[2][8]-m2[0][1]*m1[1][3]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][4]+m2[0][0]*m1[2][8]*m0[1][7]+m2[0][0]*m1[2][7]*m0[1][8]+m2[0][0]*m1[2][4]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][4]-m2[0][0]*m1[1][8]*m0[2][7]-m2[0][0]*m1[1][7]*m0[2][8]-m2[0][0]*m1[1][4]*m0[2][9]; 
  M1(row,56) = m2[2][9]*m1[1][4]*m0[0][1]+m2[2][9]*m1[1][3]*m0[0][2]+m2[2][9]*m1[1][2]*m0[0][3]+m2[2][9]*m1[1][1]*m0[0][4]-m2[2][9]*m1[0][4]*m0[1][1]-m2[2][9]*m1[0][3]*m0[1][2]-m2[2][9]*m1[0][2]*m0[1][3]-m2[2][9]*m1[0][1]*m0[1][4]+m2[2][8]*m1[1][7]*m0[0][1]+m2[2][8]*m1[1][6]*m0[0][2]+m2[2][8]*m1[1][2]*m0[0][6]+m2[2][8]*m1[1][1]*m0[0][7]-m2[2][8]*m1[0][7]*m0[1][1]-m2[2][8]*m1[0][6]*m0[1][2]-m2[2][8]*m1[0][2]*m0[1][6]-m2[2][8]*m1[0][1]*m0[1][7]+m2[2][7]*m1[1][8]*m0[0][1]+m2[2][7]*m1[1][7]*m0[0][3]+m2[2][7]*m1[1][6]*m0[0][4]+m2[2][7]*m1[1][4]*m0[0][6]+m2[2][7]*m1[1][3]*m0[0][7]+m2[2][7]*m1[1][1]*m0[0][8]-m2[2][7]*m1[0][8]*m0[1][1]-m2[2][7]*m1[0][7]*m0[1][3]-m2[2][7]*m1[0][6]*m0[1][4]-m2[2][7]*m1[0][4]*m0[1][6]-m2[2][7]*m1[0][3]*m0[1][7]-m2[2][7]*m1[0][1]*m0[1][8]+m2[2][6]*m1[1][8]*m0[0][2]+m2[2][6]*m1[1][7]*m0[0][4]+m2[2][6]*m1[1][4]*m0[0][7]+m2[2][6]*m1[1][2]*m0[0][8]-m2[2][6]*m1[0][8]*m0[1][2]-m2[2][6]*m1[0][7]*m0[1][4]-m2[2][6]*m1[0][4]*m0[1][7]-m2[2][6]*m1[0][2]*m0[1][8]+m2[2][4]*m1[1][9]*m0[0][1]+m2[2][4]*m1[1][7]*m0[0][6]+m2[2][4]*m1[1][6]*m0[0][7]+m2[2][4]*m1[1][1]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][1]-m2[2][4]*m1[0][7]*m0[1][6]-m2[2][4]*m1[0][6]*m0[1][7]-m2[2][4]*m1[0][1]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][2]+m2[2][3]*m1[1][7]*m0[0][7]+m2[2][3]*m1[1][2]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][2]-m2[2][3]*m1[0][7]*m0[1][7]-m2[2][3]*m1[0][2]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][3]+m2[2][2]*m1[1][8]*m0[0][6]+m2[2][2]*m1[1][6]*m0[0][8]+m2[2][2]*m1[1][3]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][3]-m2[2][2]*m1[0][8]*m0[1][6]-m2[2][2]*m1[0][6]*m0[1][8]-m2[2][2]*m1[0][3]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][4]+m2[2][1]*m1[1][8]*m0[0][7]+m2[2][1]*m1[1][7]*m0[0][8]+m2[2][1]*m1[1][4]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][4]-m2[2][1]*m1[0][8]*m0[1][7]-m2[2][1]*m1[0][7]*m0[1][8]-m2[2][1]*m1[0][4]*m0[1][9]-m2[1][9]*m1[2][4]*m0[0][1]-m2[1][9]*m1[2][3]*m0[0][2]-m2[1][9]*m1[2][2]*m0[0][3]-m2[1][9]*m1[2][1]*m0[0][4]+m2[1][9]*m1[0][4]*m0[2][1]+m2[1][9]*m1[0][3]*m0[2][2]+m2[1][9]*m1[0][2]*m0[2][3]+m2[1][9]*m1[0][1]*m0[2][4]-m2[1][8]*m1[2][7]*m0[0][1]-m2[1][8]*m1[2][6]*m0[0][2]-m2[1][8]*m1[2][2]*m0[0][6]-m2[1][8]*m1[2][1]*m0[0][7]+m2[1][8]*m1[0][7]*m0[2][1]+m2[1][8]*m1[0][6]*m0[2][2]+m2[1][8]*m1[0][2]*m0[2][6]+m2[1][8]*m1[0][1]*m0[2][7]-m2[1][7]*m1[2][8]*m0[0][1]-m2[1][7]*m1[2][7]*m0[0][3]-m2[1][7]*m1[2][6]*m0[0][4]-m2[1][7]*m1[2][4]*m0[0][6]-m2[1][7]*m1[2][3]*m0[0][7]-m2[1][7]*m1[2][1]*m0[0][8]+m2[1][7]*m1[0][8]*m0[2][1]+m2[1][7]*m1[0][7]*m0[2][3]+m2[1][7]*m1[0][6]*m0[2][4]+m2[1][7]*m1[0][4]*m0[2][6]+m2[1][7]*m1[0][3]*m0[2][7]+m2[1][7]*m1[0][1]*m0[2][8]-m2[1][6]*m1[2][8]*m0[0][2]-m2[1][6]*m1[2][7]*m0[0][4]-m2[1][6]*m1[2][4]*m0[0][7]-m2[1][6]*m1[2][2]*m0[0][8]+m2[1][6]*m1[0][8]*m0[2][2]+m2[1][6]*m1[0][7]*m0[2][4]+m2[1][6]*m1[0][4]*m0[2][7]+m2[1][6]*m1[0][2]*m0[2][8]-m2[1][4]*m1[2][9]*m0[0][1]-m2[1][4]*m1[2][7]*m0[0][6]-m2[1][4]*m1[2][6]*m0[0][7]-m2[1][4]*m1[2][1]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][1]+m2[1][4]*m1[0][7]*m0[2][6]+m2[1][4]*m1[0][6]*m0[2][7]+m2[1][4]*m1[0][1]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][2]-m2[1][3]*m1[2][7]*m0[0][7]-m2[1][3]*m1[2][2]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][2]+m2[1][3]*m1[0][7]*m0[2][7]+m2[1][3]*m1[0][2]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][3]-m2[1][2]*m1[2][8]*m0[0][6]-m2[1][2]*m1[2][6]*m0[0][8]-m2[1][2]*m1[2][3]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][3]+m2[1][2]*m1[0][8]*m0[2][6]+m2[1][2]*m1[0][6]*m0[2][8]+m2[1][2]*m1[0][3]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][4]-m2[1][1]*m1[2][8]*m0[0][7]-m2[1][1]*m1[2][7]*m0[0][8]-m2[1][1]*m1[2][4]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][4]+m2[1][1]*m1[0][8]*m0[2][7]+m2[1][1]*m1[0][7]*m0[2][8]+m2[1][1]*m1[0][4]*m0[2][9]+m2[0][9]*m1[2][4]*m0[1][1]+m2[0][9]*m1[2][3]*m0[1][2]+m2[0][9]*m1[2][2]*m0[1][3]+m2[0][9]*m1[2][1]*m0[1][4]-m2[0][9]*m1[1][4]*m0[2][1]-m2[0][9]*m1[1][3]*m0[2][2]-m2[0][9]*m1[1][2]*m0[2][3]-m2[0][9]*m1[1][1]*m0[2][4]+m2[0][8]*m1[2][7]*m0[1][1]+m2[0][8]*m1[2][6]*m0[1][2]+m2[0][8]*m1[2][2]*m0[1][6]+m2[0][8]*m1[2][1]*m0[1][7]-m2[0][8]*m1[1][7]*m0[2][1]-m2[0][8]*m1[1][6]*m0[2][2]-m2[0][8]*m1[1][2]*m0[2][6]-m2[0][8]*m1[1][1]*m0[2][7]+m2[0][7]*m1[2][8]*m0[1][1]+m2[0][7]*m1[2][7]*m0[1][3]+m2[0][7]*m1[2][6]*m0[1][4]+m2[0][7]*m1[2][4]*m0[1][6]+m2[0][7]*m1[2][3]*m0[1][7]+m2[0][7]*m1[2][1]*m0[1][8]-m2[0][7]*m1[1][8]*m0[2][1]-m2[0][7]*m1[1][7]*m0[2][3]-m2[0][7]*m1[1][6]*m0[2][4]-m2[0][7]*m1[1][4]*m0[2][6]-m2[0][7]*m1[1][3]*m0[2][7]-m2[0][7]*m1[1][1]*m0[2][8]+m2[0][6]*m1[2][8]*m0[1][2]+m2[0][6]*m1[2][7]*m0[1][4]+m2[0][6]*m1[2][4]*m0[1][7]+m2[0][6]*m1[2][2]*m0[1][8]-m2[0][6]*m1[1][8]*m0[2][2]-m2[0][6]*m1[1][7]*m0[2][4]-m2[0][6]*m1[1][4]*m0[2][7]-m2[0][6]*m1[1][2]*m0[2][8]+m2[0][4]*m1[2][9]*m0[1][1]+m2[0][4]*m1[2][7]*m0[1][6]+m2[0][4]*m1[2][6]*m0[1][7]+m2[0][4]*m1[2][1]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][1]-m2[0][4]*m1[1][7]*m0[2][6]-m2[0][4]*m1[1][6]*m0[2][7]-m2[0][4]*m1[1][1]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][2]+m2[0][3]*m1[2][7]*m0[1][7]+m2[0][3]*m1[2][2]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][2]-m2[0][3]*m1[1][7]*m0[2][7]-m2[0][3]*m1[1][2]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][3]+m2[0][2]*m1[2][8]*m0[1][6]+m2[0][2]*m1[2][6]*m0[1][8]+m2[0][2]*m1[2][3]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][3]-m2[0][2]*m1[1][8]*m0[2][6]-m2[0][2]*m1[1][6]*m0[2][8]-m2[0][2]*m1[1][3]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][4]+m2[0][1]*m1[2][8]*m0[1][7]+m2[0][1]*m1[2][7]*m0[1][8]+m2[0][1]*m1[2][4]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][4]-m2[0][1]*m1[1][8]*m0[2][7]-m2[0][1]*m1[1][7]*m0[2][8]-m2[0][1]*m1[1][4]*m0[2][9]; 
  M1(row,57) = m2[2][9]*m1[1][4]*m0[0][2]+m2[2][9]*m1[1][2]*m0[0][4]-m2[2][9]*m1[0][4]*m0[1][2]-m2[2][9]*m1[0][2]*m0[1][4]+m2[2][8]*m1[1][7]*m0[0][2]+m2[2][8]*m1[1][2]*m0[0][7]-m2[2][8]*m1[0][7]*m0[1][2]-m2[2][8]*m1[0][2]*m0[1][7]+m2[2][7]*m1[1][8]*m0[0][2]+m2[2][7]*m1[1][7]*m0[0][4]+m2[2][7]*m1[1][4]*m0[0][7]+m2[2][7]*m1[1][2]*m0[0][8]-m2[2][7]*m1[0][8]*m0[1][2]-m2[2][7]*m1[0][7]*m0[1][4]-m2[2][7]*m1[0][4]*m0[1][7]-m2[2][7]*m1[0][2]*m0[1][8]+m2[2][4]*m1[1][9]*m0[0][2]+m2[2][4]*m1[1][7]*m0[0][7]+m2[2][4]*m1[1][2]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][2]-m2[2][4]*m1[0][7]*m0[1][7]-m2[2][4]*m1[0][2]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][4]+m2[2][2]*m1[1][8]*m0[0][7]+m2[2][2]*m1[1][7]*m0[0][8]+m2[2][2]*m1[1][4]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][4]-m2[2][2]*m1[0][8]*m0[1][7]-m2[2][2]*m1[0][7]*m0[1][8]-m2[2][2]*m1[0][4]*m0[1][9]-m2[1][9]*m1[2][4]*m0[0][2]-m2[1][9]*m1[2][2]*m0[0][4]+m2[1][9]*m1[0][4]*m0[2][2]+m2[1][9]*m1[0][2]*m0[2][4]-m2[1][8]*m1[2][7]*m0[0][2]-m2[1][8]*m1[2][2]*m0[0][7]+m2[1][8]*m1[0][7]*m0[2][2]+m2[1][8]*m1[0][2]*m0[2][7]-m2[1][7]*m1[2][8]*m0[0][2]-m2[1][7]*m1[2][7]*m0[0][4]-m2[1][7]*m1[2][4]*m0[0][7]-m2[1][7]*m1[2][2]*m0[0][8]+m2[1][7]*m1[0][8]*m0[2][2]+m2[1][7]*m1[0][7]*m0[2][4]+m2[1][7]*m1[0][4]*m0[2][7]+m2[1][7]*m1[0][2]*m0[2][8]-m2[1][4]*m1[2][9]*m0[0][2]-m2[1][4]*m1[2][7]*m0[0][7]-m2[1][4]*m1[2][2]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][2]+m2[1][4]*m1[0][7]*m0[2][7]+m2[1][4]*m1[0][2]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][4]-m2[1][2]*m1[2][8]*m0[0][7]-m2[1][2]*m1[2][7]*m0[0][8]-m2[1][2]*m1[2][4]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][4]+m2[1][2]*m1[0][8]*m0[2][7]+m2[1][2]*m1[0][7]*m0[2][8]+m2[1][2]*m1[0][4]*m0[2][9]+m2[0][9]*m1[2][4]*m0[1][2]+m2[0][9]*m1[2][2]*m0[1][4]-m2[0][9]*m1[1][4]*m0[2][2]-m2[0][9]*m1[1][2]*m0[2][4]+m2[0][8]*m1[2][7]*m0[1][2]+m2[0][8]*m1[2][2]*m0[1][7]-m2[0][8]*m1[1][7]*m0[2][2]-m2[0][8]*m1[1][2]*m0[2][7]+m2[0][7]*m1[2][8]*m0[1][2]+m2[0][7]*m1[2][7]*m0[1][4]+m2[0][7]*m1[2][4]*m0[1][7]+m2[0][7]*m1[2][2]*m0[1][8]-m2[0][7]*m1[1][8]*m0[2][2]-m2[0][7]*m1[1][7]*m0[2][4]-m2[0][7]*m1[1][4]*m0[2][7]-m2[0][7]*m1[1][2]*m0[2][8]+m2[0][4]*m1[2][9]*m0[1][2]+m2[0][4]*m1[2][7]*m0[1][7]+m2[0][4]*m1[2][2]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][2]-m2[0][4]*m1[1][7]*m0[2][7]-m2[0][4]*m1[1][2]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][4]+m2[0][2]*m1[2][8]*m0[1][7]+m2[0][2]*m1[2][7]*m0[1][8]+m2[0][2]*m1[2][4]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][4]-m2[0][2]*m1[1][8]*m0[2][7]-m2[0][2]*m1[1][7]*m0[2][8]-m2[0][2]*m1[1][4]*m0[2][9]; 
  M1(row,58) = m2[2][9]*m1[1][5]*m0[0][0]+m2[2][9]*m1[1][3]*m0[0][3]+m2[2][9]*m1[1][0]*m0[0][5]-m2[2][9]*m1[0][5]*m0[1][0]-m2[2][9]*m1[0][3]*m0[1][3]-m2[2][9]*m1[0][0]*m0[1][5]+m2[2][8]*m1[1][8]*m0[0][0]+m2[2][8]*m1[1][6]*m0[0][3]+m2[2][8]*m1[1][3]*m0[0][6]+m2[2][8]*m1[1][0]*m0[0][8]-m2[2][8]*m1[0][8]*m0[1][0]-m2[2][8]*m1[0][6]*m0[1][3]-m2[2][8]*m1[0][3]*m0[1][6]-m2[2][8]*m1[0][0]*m0[1][8]+m2[2][6]*m1[1][8]*m0[0][3]+m2[2][6]*m1[1][6]*m0[0][5]+m2[2][6]*m1[1][5]*m0[0][6]+m2[2][6]*m1[1][3]*m0[0][8]-m2[2][6]*m1[0][8]*m0[1][3]-m2[2][6]*m1[0][6]*m0[1][5]-m2[2][6]*m1[0][5]*m0[1][6]-m2[2][6]*m1[0][3]*m0[1][8]+m2[2][5]*m1[1][9]*m0[0][0]+m2[2][5]*m1[1][6]*m0[0][6]+m2[2][5]*m1[1][0]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][0]-m2[2][5]*m1[0][6]*m0[1][6]-m2[2][5]*m1[0][0]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][3]+m2[2][3]*m1[1][8]*m0[0][6]+m2[2][3]*m1[1][6]*m0[0][8]+m2[2][3]*m1[1][3]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][3]-m2[2][3]*m1[0][8]*m0[1][6]-m2[2][3]*m1[0][6]*m0[1][8]-m2[2][3]*m1[0][3]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][5]+m2[2][0]*m1[1][8]*m0[0][8]+m2[2][0]*m1[1][5]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][5]-m2[2][0]*m1[0][8]*m0[1][8]-m2[2][0]*m1[0][5]*m0[1][9]-m2[1][9]*m1[2][5]*m0[0][0]-m2[1][9]*m1[2][3]*m0[0][3]-m2[1][9]*m1[2][0]*m0[0][5]+m2[1][9]*m1[0][5]*m0[2][0]+m2[1][9]*m1[0][3]*m0[2][3]+m2[1][9]*m1[0][0]*m0[2][5]-m2[1][8]*m1[2][8]*m0[0][0]-m2[1][8]*m1[2][6]*m0[0][3]-m2[1][8]*m1[2][3]*m0[0][6]-m2[1][8]*m1[2][0]*m0[0][8]+m2[1][8]*m1[0][8]*m0[2][0]+m2[1][8]*m1[0][6]*m0[2][3]+m2[1][8]*m1[0][3]*m0[2][6]+m2[1][8]*m1[0][0]*m0[2][8]-m2[1][6]*m1[2][8]*m0[0][3]-m2[1][6]*m1[2][6]*m0[0][5]-m2[1][6]*m1[2][5]*m0[0][6]-m2[1][6]*m1[2][3]*m0[0][8]+m2[1][6]*m1[0][8]*m0[2][3]+m2[1][6]*m1[0][6]*m0[2][5]+m2[1][6]*m1[0][5]*m0[2][6]+m2[1][6]*m1[0][3]*m0[2][8]-m2[1][5]*m1[2][9]*m0[0][0]-m2[1][5]*m1[2][6]*m0[0][6]-m2[1][5]*m1[2][0]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][0]+m2[1][5]*m1[0][6]*m0[2][6]+m2[1][5]*m1[0][0]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][3]-m2[1][3]*m1[2][8]*m0[0][6]-m2[1][3]*m1[2][6]*m0[0][8]-m2[1][3]*m1[2][3]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][3]+m2[1][3]*m1[0][8]*m0[2][6]+m2[1][3]*m1[0][6]*m0[2][8]+m2[1][3]*m1[0][3]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][5]-m2[1][0]*m1[2][8]*m0[0][8]-m2[1][0]*m1[2][5]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][5]+m2[1][0]*m1[0][8]*m0[2][8]+m2[1][0]*m1[0][5]*m0[2][9]+m2[0][9]*m1[2][5]*m0[1][0]+m2[0][9]*m1[2][3]*m0[1][3]+m2[0][9]*m1[2][0]*m0[1][5]-m2[0][9]*m1[1][5]*m0[2][0]-m2[0][9]*m1[1][3]*m0[2][3]-m2[0][9]*m1[1][0]*m0[2][5]+m2[0][8]*m1[2][8]*m0[1][0]+m2[0][8]*m1[2][6]*m0[1][3]+m2[0][8]*m1[2][3]*m0[1][6]+m2[0][8]*m1[2][0]*m0[1][8]-m2[0][8]*m1[1][8]*m0[2][0]-m2[0][8]*m1[1][6]*m0[2][3]-m2[0][8]*m1[1][3]*m0[2][6]-m2[0][8]*m1[1][0]*m0[2][8]+m2[0][6]*m1[2][8]*m0[1][3]+m2[0][6]*m1[2][6]*m0[1][5]+m2[0][6]*m1[2][5]*m0[1][6]+m2[0][6]*m1[2][3]*m0[1][8]-m2[0][6]*m1[1][8]*m0[2][3]-m2[0][6]*m1[1][6]*m0[2][5]-m2[0][6]*m1[1][5]*m0[2][6]-m2[0][6]*m1[1][3]*m0[2][8]+m2[0][5]*m1[2][9]*m0[1][0]+m2[0][5]*m1[2][6]*m0[1][6]+m2[0][5]*m1[2][0]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][0]-m2[0][5]*m1[1][6]*m0[2][6]-m2[0][5]*m1[1][0]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][3]+m2[0][3]*m1[2][8]*m0[1][6]+m2[0][3]*m1[2][6]*m0[1][8]+m2[0][3]*m1[2][3]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][3]-m2[0][3]*m1[1][8]*m0[2][6]-m2[0][3]*m1[1][6]*m0[2][8]-m2[0][3]*m1[1][3]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][5]+m2[0][0]*m1[2][8]*m0[1][8]+m2[0][0]*m1[2][5]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][5]-m2[0][0]*m1[1][8]*m0[2][8]-m2[0][0]*m1[1][5]*m0[2][9]; 
  M1(row,59) = m2[2][9]*m1[1][5]*m0[0][1]+m2[2][9]*m1[1][4]*m0[0][3]+m2[2][9]*m1[1][3]*m0[0][4]+m2[2][9]*m1[1][1]*m0[0][5]-m2[2][9]*m1[0][5]*m0[1][1]-m2[2][9]*m1[0][4]*m0[1][3]-m2[2][9]*m1[0][3]*m0[1][4]-m2[2][9]*m1[0][1]*m0[1][5]+m2[2][8]*m1[1][8]*m0[0][1]+m2[2][8]*m1[1][7]*m0[0][3]+m2[2][8]*m1[1][6]*m0[0][4]+m2[2][8]*m1[1][4]*m0[0][6]+m2[2][8]*m1[1][3]*m0[0][7]+m2[2][8]*m1[1][1]*m0[0][8]-m2[2][8]*m1[0][8]*m0[1][1]-m2[2][8]*m1[0][7]*m0[1][3]-m2[2][8]*m1[0][6]*m0[1][4]-m2[2][8]*m1[0][4]*m0[1][6]-m2[2][8]*m1[0][3]*m0[1][7]-m2[2][8]*m1[0][1]*m0[1][8]+m2[2][7]*m1[1][8]*m0[0][3]+m2[2][7]*m1[1][6]*m0[0][5]+m2[2][7]*m1[1][5]*m0[0][6]+m2[2][7]*m1[1][3]*m0[0][8]-m2[2][7]*m1[0][8]*m0[1][3]-m2[2][7]*m1[0][6]*m0[1][5]-m2[2][7]*m1[0][5]*m0[1][6]-m2[2][7]*m1[0][3]*m0[1][8]+m2[2][6]*m1[1][8]*m0[0][4]+m2[2][6]*m1[1][7]*m0[0][5]+m2[2][6]*m1[1][5]*m0[0][7]+m2[2][6]*m1[1][4]*m0[0][8]-m2[2][6]*m1[0][8]*m0[1][4]-m2[2][6]*m1[0][7]*m0[1][5]-m2[2][6]*m1[0][5]*m0[1][7]-m2[2][6]*m1[0][4]*m0[1][8]+m2[2][5]*m1[1][9]*m0[0][1]+m2[2][5]*m1[1][7]*m0[0][6]+m2[2][5]*m1[1][6]*m0[0][7]+m2[2][5]*m1[1][1]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][1]-m2[2][5]*m1[0][7]*m0[1][6]-m2[2][5]*m1[0][6]*m0[1][7]-m2[2][5]*m1[0][1]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][3]+m2[2][4]*m1[1][8]*m0[0][6]+m2[2][4]*m1[1][6]*m0[0][8]+m2[2][4]*m1[1][3]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][3]-m2[2][4]*m1[0][8]*m0[1][6]-m2[2][4]*m1[0][6]*m0[1][8]-m2[2][4]*m1[0][3]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][4]+m2[2][3]*m1[1][8]*m0[0][7]+m2[2][3]*m1[1][7]*m0[0][8]+m2[2][3]*m1[1][4]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][4]-m2[2][3]*m1[0][8]*m0[1][7]-m2[2][3]*m1[0][7]*m0[1][8]-m2[2][3]*m1[0][4]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][5]+m2[2][1]*m1[1][8]*m0[0][8]+m2[2][1]*m1[1][5]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][5]-m2[2][1]*m1[0][8]*m0[1][8]-m2[2][1]*m1[0][5]*m0[1][9]-m2[1][9]*m1[2][5]*m0[0][1]-m2[1][9]*m1[2][4]*m0[0][3]-m2[1][9]*m1[2][3]*m0[0][4]-m2[1][9]*m1[2][1]*m0[0][5]+m2[1][9]*m1[0][5]*m0[2][1]+m2[1][9]*m1[0][4]*m0[2][3]+m2[1][9]*m1[0][3]*m0[2][4]+m2[1][9]*m1[0][1]*m0[2][5]-m2[1][8]*m1[2][8]*m0[0][1]-m2[1][8]*m1[2][7]*m0[0][3]-m2[1][8]*m1[2][6]*m0[0][4]-m2[1][8]*m1[2][4]*m0[0][6]-m2[1][8]*m1[2][3]*m0[0][7]-m2[1][8]*m1[2][1]*m0[0][8]+m2[1][8]*m1[0][8]*m0[2][1]+m2[1][8]*m1[0][7]*m0[2][3]+m2[1][8]*m1[0][6]*m0[2][4]+m2[1][8]*m1[0][4]*m0[2][6]+m2[1][8]*m1[0][3]*m0[2][7]+m2[1][8]*m1[0][1]*m0[2][8]-m2[1][7]*m1[2][8]*m0[0][3]-m2[1][7]*m1[2][6]*m0[0][5]-m2[1][7]*m1[2][5]*m0[0][6]-m2[1][7]*m1[2][3]*m0[0][8]+m2[1][7]*m1[0][8]*m0[2][3]+m2[1][7]*m1[0][6]*m0[2][5]+m2[1][7]*m1[0][5]*m0[2][6]+m2[1][7]*m1[0][3]*m0[2][8]-m2[1][6]*m1[2][8]*m0[0][4]-m2[1][6]*m1[2][7]*m0[0][5]-m2[1][6]*m1[2][5]*m0[0][7]-m2[1][6]*m1[2][4]*m0[0][8]+m2[1][6]*m1[0][8]*m0[2][4]+m2[1][6]*m1[0][7]*m0[2][5]+m2[1][6]*m1[0][5]*m0[2][7]+m2[1][6]*m1[0][4]*m0[2][8]-m2[1][5]*m1[2][9]*m0[0][1]-m2[1][5]*m1[2][7]*m0[0][6]-m2[1][5]*m1[2][6]*m0[0][7]-m2[1][5]*m1[2][1]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][1]+m2[1][5]*m1[0][7]*m0[2][6]+m2[1][5]*m1[0][6]*m0[2][7]+m2[1][5]*m1[0][1]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][3]-m2[1][4]*m1[2][8]*m0[0][6]-m2[1][4]*m1[2][6]*m0[0][8]-m2[1][4]*m1[2][3]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][3]+m2[1][4]*m1[0][8]*m0[2][6]+m2[1][4]*m1[0][6]*m0[2][8]+m2[1][4]*m1[0][3]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][4]-m2[1][3]*m1[2][8]*m0[0][7]-m2[1][3]*m1[2][7]*m0[0][8]-m2[1][3]*m1[2][4]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][4]+m2[1][3]*m1[0][8]*m0[2][7]+m2[1][3]*m1[0][7]*m0[2][8]+m2[1][3]*m1[0][4]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][5]-m2[1][1]*m1[2][8]*m0[0][8]-m2[1][1]*m1[2][5]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][5]+m2[1][1]*m1[0][8]*m0[2][8]+m2[1][1]*m1[0][5]*m0[2][9]+m2[0][9]*m1[2][5]*m0[1][1]+m2[0][9]*m1[2][4]*m0[1][3]+m2[0][9]*m1[2][3]*m0[1][4]+m2[0][9]*m1[2][1]*m0[1][5]-m2[0][9]*m1[1][5]*m0[2][1]-m2[0][9]*m1[1][4]*m0[2][3]-m2[0][9]*m1[1][3]*m0[2][4]-m2[0][9]*m1[1][1]*m0[2][5]+m2[0][8]*m1[2][8]*m0[1][1]+m2[0][8]*m1[2][7]*m0[1][3]+m2[0][8]*m1[2][6]*m0[1][4]+m2[0][8]*m1[2][4]*m0[1][6]+m2[0][8]*m1[2][3]*m0[1][7]+m2[0][8]*m1[2][1]*m0[1][8]-m2[0][8]*m1[1][8]*m0[2][1]-m2[0][8]*m1[1][7]*m0[2][3]-m2[0][8]*m1[1][6]*m0[2][4]-m2[0][8]*m1[1][4]*m0[2][6]-m2[0][8]*m1[1][3]*m0[2][7]-m2[0][8]*m1[1][1]*m0[2][8]+m2[0][7]*m1[2][8]*m0[1][3]+m2[0][7]*m1[2][6]*m0[1][5]+m2[0][7]*m1[2][5]*m0[1][6]+m2[0][7]*m1[2][3]*m0[1][8]-m2[0][7]*m1[1][8]*m0[2][3]-m2[0][7]*m1[1][6]*m0[2][5]-m2[0][7]*m1[1][5]*m0[2][6]-m2[0][7]*m1[1][3]*m0[2][8]+m2[0][6]*m1[2][8]*m0[1][4]+m2[0][6]*m1[2][7]*m0[1][5]+m2[0][6]*m1[2][5]*m0[1][7]+m2[0][6]*m1[2][4]*m0[1][8]-m2[0][6]*m1[1][8]*m0[2][4]-m2[0][6]*m1[1][7]*m0[2][5]-m2[0][6]*m1[1][5]*m0[2][7]-m2[0][6]*m1[1][4]*m0[2][8]+m2[0][5]*m1[2][9]*m0[1][1]+m2[0][5]*m1[2][7]*m0[1][6]+m2[0][5]*m1[2][6]*m0[1][7]+m2[0][5]*m1[2][1]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][1]-m2[0][5]*m1[1][7]*m0[2][6]-m2[0][5]*m1[1][6]*m0[2][7]-m2[0][5]*m1[1][1]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][3]+m2[0][4]*m1[2][8]*m0[1][6]+m2[0][4]*m1[2][6]*m0[1][8]+m2[0][4]*m1[2][3]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][3]-m2[0][4]*m1[1][8]*m0[2][6]-m2[0][4]*m1[1][6]*m0[2][8]-m2[0][4]*m1[1][3]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][4]+m2[0][3]*m1[2][8]*m0[1][7]+m2[0][3]*m1[2][7]*m0[1][8]+m2[0][3]*m1[2][4]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][4]-m2[0][3]*m1[1][8]*m0[2][7]-m2[0][3]*m1[1][7]*m0[2][8]-m2[0][3]*m1[1][4]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][5]+m2[0][1]*m1[2][8]*m0[1][8]+m2[0][1]*m1[2][5]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][5]-m2[0][1]*m1[1][8]*m0[2][8]-m2[0][1]*m1[1][5]*m0[2][9]; 
  M1(row,60) = m2[2][9]*m1[1][5]*m0[0][2]+m2[2][9]*m1[1][4]*m0[0][4]+m2[2][9]*m1[1][2]*m0[0][5]-m2[2][9]*m1[0][5]*m0[1][2]-m2[2][9]*m1[0][4]*m0[1][4]-m2[2][9]*m1[0][2]*m0[1][5]+m2[2][8]*m1[1][8]*m0[0][2]+m2[2][8]*m1[1][7]*m0[0][4]+m2[2][8]*m1[1][4]*m0[0][7]+m2[2][8]*m1[1][2]*m0[0][8]-m2[2][8]*m1[0][8]*m0[1][2]-m2[2][8]*m1[0][7]*m0[1][4]-m2[2][8]*m1[0][4]*m0[1][7]-m2[2][8]*m1[0][2]*m0[1][8]+m2[2][7]*m1[1][8]*m0[0][4]+m2[2][7]*m1[1][7]*m0[0][5]+m2[2][7]*m1[1][5]*m0[0][7]+m2[2][7]*m1[1][4]*m0[0][8]-m2[2][7]*m1[0][8]*m0[1][4]-m2[2][7]*m1[0][7]*m0[1][5]-m2[2][7]*m1[0][5]*m0[1][7]-m2[2][7]*m1[0][4]*m0[1][8]+m2[2][5]*m1[1][9]*m0[0][2]+m2[2][5]*m1[1][7]*m0[0][7]+m2[2][5]*m1[1][2]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][2]-m2[2][5]*m1[0][7]*m0[1][7]-m2[2][5]*m1[0][2]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][4]+m2[2][4]*m1[1][8]*m0[0][7]+m2[2][4]*m1[1][7]*m0[0][8]+m2[2][4]*m1[1][4]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][4]-m2[2][4]*m1[0][8]*m0[1][7]-m2[2][4]*m1[0][7]*m0[1][8]-m2[2][4]*m1[0][4]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][5]+m2[2][2]*m1[1][8]*m0[0][8]+m2[2][2]*m1[1][5]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][5]-m2[2][2]*m1[0][8]*m0[1][8]-m2[2][2]*m1[0][5]*m0[1][9]-m2[1][9]*m1[2][5]*m0[0][2]-m2[1][9]*m1[2][4]*m0[0][4]-m2[1][9]*m1[2][2]*m0[0][5]+m2[1][9]*m1[0][5]*m0[2][2]+m2[1][9]*m1[0][4]*m0[2][4]+m2[1][9]*m1[0][2]*m0[2][5]-m2[1][8]*m1[2][8]*m0[0][2]-m2[1][8]*m1[2][7]*m0[0][4]-m2[1][8]*m1[2][4]*m0[0][7]-m2[1][8]*m1[2][2]*m0[0][8]+m2[1][8]*m1[0][8]*m0[2][2]+m2[1][8]*m1[0][7]*m0[2][4]+m2[1][8]*m1[0][4]*m0[2][7]+m2[1][8]*m1[0][2]*m0[2][8]-m2[1][7]*m1[2][8]*m0[0][4]-m2[1][7]*m1[2][7]*m0[0][5]-m2[1][7]*m1[2][5]*m0[0][7]-m2[1][7]*m1[2][4]*m0[0][8]+m2[1][7]*m1[0][8]*m0[2][4]+m2[1][7]*m1[0][7]*m0[2][5]+m2[1][7]*m1[0][5]*m0[2][7]+m2[1][7]*m1[0][4]*m0[2][8]-m2[1][5]*m1[2][9]*m0[0][2]-m2[1][5]*m1[2][7]*m0[0][7]-m2[1][5]*m1[2][2]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][2]+m2[1][5]*m1[0][7]*m0[2][7]+m2[1][5]*m1[0][2]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][4]-m2[1][4]*m1[2][8]*m0[0][7]-m2[1][4]*m1[2][7]*m0[0][8]-m2[1][4]*m1[2][4]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][4]+m2[1][4]*m1[0][8]*m0[2][7]+m2[1][4]*m1[0][7]*m0[2][8]+m2[1][4]*m1[0][4]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][5]-m2[1][2]*m1[2][8]*m0[0][8]-m2[1][2]*m1[2][5]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][5]+m2[1][2]*m1[0][8]*m0[2][8]+m2[1][2]*m1[0][5]*m0[2][9]+m2[0][9]*m1[2][5]*m0[1][2]+m2[0][9]*m1[2][4]*m0[1][4]+m2[0][9]*m1[2][2]*m0[1][5]-m2[0][9]*m1[1][5]*m0[2][2]-m2[0][9]*m1[1][4]*m0[2][4]-m2[0][9]*m1[1][2]*m0[2][5]+m2[0][8]*m1[2][8]*m0[1][2]+m2[0][8]*m1[2][7]*m0[1][4]+m2[0][8]*m1[2][4]*m0[1][7]+m2[0][8]*m1[2][2]*m0[1][8]-m2[0][8]*m1[1][8]*m0[2][2]-m2[0][8]*m1[1][7]*m0[2][4]-m2[0][8]*m1[1][4]*m0[2][7]-m2[0][8]*m1[1][2]*m0[2][8]+m2[0][7]*m1[2][8]*m0[1][4]+m2[0][7]*m1[2][7]*m0[1][5]+m2[0][7]*m1[2][5]*m0[1][7]+m2[0][7]*m1[2][4]*m0[1][8]-m2[0][7]*m1[1][8]*m0[2][4]-m2[0][7]*m1[1][7]*m0[2][5]-m2[0][7]*m1[1][5]*m0[2][7]-m2[0][7]*m1[1][4]*m0[2][8]+m2[0][5]*m1[2][9]*m0[1][2]+m2[0][5]*m1[2][7]*m0[1][7]+m2[0][5]*m1[2][2]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][2]-m2[0][5]*m1[1][7]*m0[2][7]-m2[0][5]*m1[1][2]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][4]+m2[0][4]*m1[2][8]*m0[1][7]+m2[0][4]*m1[2][7]*m0[1][8]+m2[0][4]*m1[2][4]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][4]-m2[0][4]*m1[1][8]*m0[2][7]-m2[0][4]*m1[1][7]*m0[2][8]-m2[0][4]*m1[1][4]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][5]+m2[0][2]*m1[2][8]*m0[1][8]+m2[0][2]*m1[2][5]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][5]-m2[0][2]*m1[1][8]*m0[2][8]-m2[0][2]*m1[1][5]*m0[2][9]; 
  M1(row,61) = m2[2][9]*m1[1][5]*m0[0][3]+m2[2][9]*m1[1][3]*m0[0][5]-m2[2][9]*m1[0][5]*m0[1][3]-m2[2][9]*m1[0][3]*m0[1][5]+m2[2][8]*m1[1][8]*m0[0][3]+m2[2][8]*m1[1][6]*m0[0][5]+m2[2][8]*m1[1][5]*m0[0][6]+m2[2][8]*m1[1][3]*m0[0][8]-m2[2][8]*m1[0][8]*m0[1][3]-m2[2][8]*m1[0][6]*m0[1][5]-m2[2][8]*m1[0][5]*m0[1][6]-m2[2][8]*m1[0][3]*m0[1][8]+m2[2][6]*m1[1][8]*m0[0][5]+m2[2][6]*m1[1][5]*m0[0][8]-m2[2][6]*m1[0][8]*m0[1][5]-m2[2][6]*m1[0][5]*m0[1][8]+m2[2][5]*m1[1][9]*m0[0][3]+m2[2][5]*m1[1][8]*m0[0][6]+m2[2][5]*m1[1][6]*m0[0][8]+m2[2][5]*m1[1][3]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][3]-m2[2][5]*m1[0][8]*m0[1][6]-m2[2][5]*m1[0][6]*m0[1][8]-m2[2][5]*m1[0][3]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][5]+m2[2][3]*m1[1][8]*m0[0][8]+m2[2][3]*m1[1][5]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][5]-m2[2][3]*m1[0][8]*m0[1][8]-m2[2][3]*m1[0][5]*m0[1][9]-m2[1][9]*m1[2][5]*m0[0][3]-m2[1][9]*m1[2][3]*m0[0][5]+m2[1][9]*m1[0][5]*m0[2][3]+m2[1][9]*m1[0][3]*m0[2][5]-m2[1][8]*m1[2][8]*m0[0][3]-m2[1][8]*m1[2][6]*m0[0][5]-m2[1][8]*m1[2][5]*m0[0][6]-m2[1][8]*m1[2][3]*m0[0][8]+m2[1][8]*m1[0][8]*m0[2][3]+m2[1][8]*m1[0][6]*m0[2][5]+m2[1][8]*m1[0][5]*m0[2][6]+m2[1][8]*m1[0][3]*m0[2][8]-m2[1][6]*m1[2][8]*m0[0][5]-m2[1][6]*m1[2][5]*m0[0][8]+m2[1][6]*m1[0][8]*m0[2][5]+m2[1][6]*m1[0][5]*m0[2][8]-m2[1][5]*m1[2][9]*m0[0][3]-m2[1][5]*m1[2][8]*m0[0][6]-m2[1][5]*m1[2][6]*m0[0][8]-m2[1][5]*m1[2][3]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][3]+m2[1][5]*m1[0][8]*m0[2][6]+m2[1][5]*m1[0][6]*m0[2][8]+m2[1][5]*m1[0][3]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][5]-m2[1][3]*m1[2][8]*m0[0][8]-m2[1][3]*m1[2][5]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][5]+m2[1][3]*m1[0][8]*m0[2][8]+m2[1][3]*m1[0][5]*m0[2][9]+m2[0][9]*m1[2][5]*m0[1][3]+m2[0][9]*m1[2][3]*m0[1][5]-m2[0][9]*m1[1][5]*m0[2][3]-m2[0][9]*m1[1][3]*m0[2][5]+m2[0][8]*m1[2][8]*m0[1][3]+m2[0][8]*m1[2][6]*m0[1][5]+m2[0][8]*m1[2][5]*m0[1][6]+m2[0][8]*m1[2][3]*m0[1][8]-m2[0][8]*m1[1][8]*m0[2][3]-m2[0][8]*m1[1][6]*m0[2][5]-m2[0][8]*m1[1][5]*m0[2][6]-m2[0][8]*m1[1][3]*m0[2][8]+m2[0][6]*m1[2][8]*m0[1][5]+m2[0][6]*m1[2][5]*m0[1][8]-m2[0][6]*m1[1][8]*m0[2][5]-m2[0][6]*m1[1][5]*m0[2][8]+m2[0][5]*m1[2][9]*m0[1][3]+m2[0][5]*m1[2][8]*m0[1][6]+m2[0][5]*m1[2][6]*m0[1][8]+m2[0][5]*m1[2][3]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][3]-m2[0][5]*m1[1][8]*m0[2][6]-m2[0][5]*m1[1][6]*m0[2][8]-m2[0][5]*m1[1][3]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][5]+m2[0][3]*m1[2][8]*m0[1][8]+m2[0][3]*m1[2][5]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][5]-m2[0][3]*m1[1][8]*m0[2][8]-m2[0][3]*m1[1][5]*m0[2][9]; 
  M1(row,62) = m2[2][9]*m1[1][5]*m0[0][4]+m2[2][9]*m1[1][4]*m0[0][5]-m2[2][9]*m1[0][5]*m0[1][4]-m2[2][9]*m1[0][4]*m0[1][5]+m2[2][8]*m1[1][8]*m0[0][4]+m2[2][8]*m1[1][7]*m0[0][5]+m2[2][8]*m1[1][5]*m0[0][7]+m2[2][8]*m1[1][4]*m0[0][8]-m2[2][8]*m1[0][8]*m0[1][4]-m2[2][8]*m1[0][7]*m0[1][5]-m2[2][8]*m1[0][5]*m0[1][7]-m2[2][8]*m1[0][4]*m0[1][8]+m2[2][7]*m1[1][8]*m0[0][5]+m2[2][7]*m1[1][5]*m0[0][8]-m2[2][7]*m1[0][8]*m0[1][5]-m2[2][7]*m1[0][5]*m0[1][8]+m2[2][5]*m1[1][9]*m0[0][4]+m2[2][5]*m1[1][8]*m0[0][7]+m2[2][5]*m1[1][7]*m0[0][8]+m2[2][5]*m1[1][4]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][4]-m2[2][5]*m1[0][8]*m0[1][7]-m2[2][5]*m1[0][7]*m0[1][8]-m2[2][5]*m1[0][4]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][5]+m2[2][4]*m1[1][8]*m0[0][8]+m2[2][4]*m1[1][5]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][5]-m2[2][4]*m1[0][8]*m0[1][8]-m2[2][4]*m1[0][5]*m0[1][9]-m2[1][9]*m1[2][5]*m0[0][4]-m2[1][9]*m1[2][4]*m0[0][5]+m2[1][9]*m1[0][5]*m0[2][4]+m2[1][9]*m1[0][4]*m0[2][5]-m2[1][8]*m1[2][8]*m0[0][4]-m2[1][8]*m1[2][7]*m0[0][5]-m2[1][8]*m1[2][5]*m0[0][7]-m2[1][8]*m1[2][4]*m0[0][8]+m2[1][8]*m1[0][8]*m0[2][4]+m2[1][8]*m1[0][7]*m0[2][5]+m2[1][8]*m1[0][5]*m0[2][7]+m2[1][8]*m1[0][4]*m0[2][8]-m2[1][7]*m1[2][8]*m0[0][5]-m2[1][7]*m1[2][5]*m0[0][8]+m2[1][7]*m1[0][8]*m0[2][5]+m2[1][7]*m1[0][5]*m0[2][8]-m2[1][5]*m1[2][9]*m0[0][4]-m2[1][5]*m1[2][8]*m0[0][7]-m2[1][5]*m1[2][7]*m0[0][8]-m2[1][5]*m1[2][4]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][4]+m2[1][5]*m1[0][8]*m0[2][7]+m2[1][5]*m1[0][7]*m0[2][8]+m2[1][5]*m1[0][4]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][5]-m2[1][4]*m1[2][8]*m0[0][8]-m2[1][4]*m1[2][5]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][5]+m2[1][4]*m1[0][8]*m0[2][8]+m2[1][4]*m1[0][5]*m0[2][9]+m2[0][9]*m1[2][5]*m0[1][4]+m2[0][9]*m1[2][4]*m0[1][5]-m2[0][9]*m1[1][5]*m0[2][4]-m2[0][9]*m1[1][4]*m0[2][5]+m2[0][8]*m1[2][8]*m0[1][4]+m2[0][8]*m1[2][7]*m0[1][5]+m2[0][8]*m1[2][5]*m0[1][7]+m2[0][8]*m1[2][4]*m0[1][8]-m2[0][8]*m1[1][8]*m0[2][4]-m2[0][8]*m1[1][7]*m0[2][5]-m2[0][8]*m1[1][5]*m0[2][7]-m2[0][8]*m1[1][4]*m0[2][8]+m2[0][7]*m1[2][8]*m0[1][5]+m2[0][7]*m1[2][5]*m0[1][8]-m2[0][7]*m1[1][8]*m0[2][5]-m2[0][7]*m1[1][5]*m0[2][8]+m2[0][5]*m1[2][9]*m0[1][4]+m2[0][5]*m1[2][8]*m0[1][7]+m2[0][5]*m1[2][7]*m0[1][8]+m2[0][5]*m1[2][4]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][4]-m2[0][5]*m1[1][8]*m0[2][7]-m2[0][5]*m1[1][7]*m0[2][8]-m2[0][5]*m1[1][4]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][5]+m2[0][4]*m1[2][8]*m0[1][8]+m2[0][4]*m1[2][5]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][5]-m2[0][4]*m1[1][8]*m0[2][8]-m2[0][4]*m1[1][5]*m0[2][9]; 
  M1(row,63) = m2[2][9]*m1[1][5]*m0[0][5]-m2[2][9]*m1[0][5]*m0[1][5]+m2[2][8]*m1[1][8]*m0[0][5]+m2[2][8]*m1[1][5]*m0[0][8]-m2[2][8]*m1[0][8]*m0[1][5]-m2[2][8]*m1[0][5]*m0[1][8]+m2[2][5]*m1[1][9]*m0[0][5]+m2[2][5]*m1[1][8]*m0[0][8]+m2[2][5]*m1[1][5]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][5]-m2[2][5]*m1[0][8]*m0[1][8]-m2[2][5]*m1[0][5]*m0[1][9]-m2[1][9]*m1[2][5]*m0[0][5]+m2[1][9]*m1[0][5]*m0[2][5]-m2[1][8]*m1[2][8]*m0[0][5]-m2[1][8]*m1[2][5]*m0[0][8]+m2[1][8]*m1[0][8]*m0[2][5]+m2[1][8]*m1[0][5]*m0[2][8]-m2[1][5]*m1[2][9]*m0[0][5]-m2[1][5]*m1[2][8]*m0[0][8]-m2[1][5]*m1[2][5]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][5]+m2[1][5]*m1[0][8]*m0[2][8]+m2[1][5]*m1[0][5]*m0[2][9]+m2[0][9]*m1[2][5]*m0[1][5]-m2[0][9]*m1[1][5]*m0[2][5]+m2[0][8]*m1[2][8]*m0[1][5]+m2[0][8]*m1[2][5]*m0[1][8]-m2[0][8]*m1[1][8]*m0[2][5]-m2[0][8]*m1[1][5]*m0[2][8]+m2[0][5]*m1[2][9]*m0[1][5]+m2[0][5]*m1[2][8]*m0[1][8]+m2[0][5]*m1[2][5]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][5]-m2[0][5]*m1[1][8]*m0[2][8]-m2[0][5]*m1[1][5]*m0[2][9]; 
  M1(row,64) = m2[2][9]*m1[1][6]*m0[0][0]+m2[2][9]*m1[1][0]*m0[0][6]-m2[2][9]*m1[0][6]*m0[1][0]-m2[2][9]*m1[0][0]*m0[1][6]+m2[2][6]*m1[1][9]*m0[0][0]+m2[2][6]*m1[1][6]*m0[0][6]+m2[2][6]*m1[1][0]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][0]-m2[2][6]*m1[0][6]*m0[1][6]-m2[2][6]*m1[0][0]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][6]+m2[2][0]*m1[1][6]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][6]-m2[2][0]*m1[0][6]*m0[1][9]-m2[1][9]*m1[2][6]*m0[0][0]-m2[1][9]*m1[2][0]*m0[0][6]+m2[1][9]*m1[0][6]*m0[2][0]+m2[1][9]*m1[0][0]*m0[2][6]-m2[1][6]*m1[2][9]*m0[0][0]-m2[1][6]*m1[2][6]*m0[0][6]-m2[1][6]*m1[2][0]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][0]+m2[1][6]*m1[0][6]*m0[2][6]+m2[1][6]*m1[0][0]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][6]-m2[1][0]*m1[2][6]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][6]+m2[1][0]*m1[0][6]*m0[2][9]+m2[0][9]*m1[2][6]*m0[1][0]+m2[0][9]*m1[2][0]*m0[1][6]-m2[0][9]*m1[1][6]*m0[2][0]-m2[0][9]*m1[1][0]*m0[2][6]+m2[0][6]*m1[2][9]*m0[1][0]+m2[0][6]*m1[2][6]*m0[1][6]+m2[0][6]*m1[2][0]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][0]-m2[0][6]*m1[1][6]*m0[2][6]-m2[0][6]*m1[1][0]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][6]+m2[0][0]*m1[2][6]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][6]-m2[0][0]*m1[1][6]*m0[2][9]; 
  M1(row,65) = m2[2][9]*m1[1][7]*m0[0][0]+m2[2][9]*m1[1][6]*m0[0][1]+m2[2][9]*m1[1][1]*m0[0][6]+m2[2][9]*m1[1][0]*m0[0][7]-m2[2][9]*m1[0][7]*m0[1][0]-m2[2][9]*m1[0][6]*m0[1][1]-m2[2][9]*m1[0][1]*m0[1][6]-m2[2][9]*m1[0][0]*m0[1][7]+m2[2][7]*m1[1][9]*m0[0][0]+m2[2][7]*m1[1][6]*m0[0][6]+m2[2][7]*m1[1][0]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][0]-m2[2][7]*m1[0][6]*m0[1][6]-m2[2][7]*m1[0][0]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][1]+m2[2][6]*m1[1][7]*m0[0][6]+m2[2][6]*m1[1][6]*m0[0][7]+m2[2][6]*m1[1][1]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][1]-m2[2][6]*m1[0][7]*m0[1][6]-m2[2][6]*m1[0][6]*m0[1][7]-m2[2][6]*m1[0][1]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][6]+m2[2][1]*m1[1][6]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][6]-m2[2][1]*m1[0][6]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][7]+m2[2][0]*m1[1][7]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][7]-m2[2][0]*m1[0][7]*m0[1][9]-m2[1][9]*m1[2][7]*m0[0][0]-m2[1][9]*m1[2][6]*m0[0][1]-m2[1][9]*m1[2][1]*m0[0][6]-m2[1][9]*m1[2][0]*m0[0][7]+m2[1][9]*m1[0][7]*m0[2][0]+m2[1][9]*m1[0][6]*m0[2][1]+m2[1][9]*m1[0][1]*m0[2][6]+m2[1][9]*m1[0][0]*m0[2][7]-m2[1][7]*m1[2][9]*m0[0][0]-m2[1][7]*m1[2][6]*m0[0][6]-m2[1][7]*m1[2][0]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][0]+m2[1][7]*m1[0][6]*m0[2][6]+m2[1][7]*m1[0][0]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][1]-m2[1][6]*m1[2][7]*m0[0][6]-m2[1][6]*m1[2][6]*m0[0][7]-m2[1][6]*m1[2][1]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][1]+m2[1][6]*m1[0][7]*m0[2][6]+m2[1][6]*m1[0][6]*m0[2][7]+m2[1][6]*m1[0][1]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][6]-m2[1][1]*m1[2][6]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][6]+m2[1][1]*m1[0][6]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][7]-m2[1][0]*m1[2][7]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][7]+m2[1][0]*m1[0][7]*m0[2][9]+m2[0][9]*m1[2][7]*m0[1][0]+m2[0][9]*m1[2][6]*m0[1][1]+m2[0][9]*m1[2][1]*m0[1][6]+m2[0][9]*m1[2][0]*m0[1][7]-m2[0][9]*m1[1][7]*m0[2][0]-m2[0][9]*m1[1][6]*m0[2][1]-m2[0][9]*m1[1][1]*m0[2][6]-m2[0][9]*m1[1][0]*m0[2][7]+m2[0][7]*m1[2][9]*m0[1][0]+m2[0][7]*m1[2][6]*m0[1][6]+m2[0][7]*m1[2][0]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][0]-m2[0][7]*m1[1][6]*m0[2][6]-m2[0][7]*m1[1][0]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][1]+m2[0][6]*m1[2][7]*m0[1][6]+m2[0][6]*m1[2][6]*m0[1][7]+m2[0][6]*m1[2][1]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][1]-m2[0][6]*m1[1][7]*m0[2][6]-m2[0][6]*m1[1][6]*m0[2][7]-m2[0][6]*m1[1][1]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][6]+m2[0][1]*m1[2][6]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][6]-m2[0][1]*m1[1][6]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][7]+m2[0][0]*m1[2][7]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][7]-m2[0][0]*m1[1][7]*m0[2][9]; 
  M1(row,66) = m2[2][9]*m1[1][7]*m0[0][1]+m2[2][9]*m1[1][6]*m0[0][2]+m2[2][9]*m1[1][2]*m0[0][6]+m2[2][9]*m1[1][1]*m0[0][7]-m2[2][9]*m1[0][7]*m0[1][1]-m2[2][9]*m1[0][6]*m0[1][2]-m2[2][9]*m1[0][2]*m0[1][6]-m2[2][9]*m1[0][1]*m0[1][7]+m2[2][7]*m1[1][9]*m0[0][1]+m2[2][7]*m1[1][7]*m0[0][6]+m2[2][7]*m1[1][6]*m0[0][7]+m2[2][7]*m1[1][1]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][1]-m2[2][7]*m1[0][7]*m0[1][6]-m2[2][7]*m1[0][6]*m0[1][7]-m2[2][7]*m1[0][1]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][2]+m2[2][6]*m1[1][7]*m0[0][7]+m2[2][6]*m1[1][2]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][2]-m2[2][6]*m1[0][7]*m0[1][7]-m2[2][6]*m1[0][2]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][6]+m2[2][2]*m1[1][6]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][6]-m2[2][2]*m1[0][6]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][7]+m2[2][1]*m1[1][7]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][7]-m2[2][1]*m1[0][7]*m0[1][9]-m2[1][9]*m1[2][7]*m0[0][1]-m2[1][9]*m1[2][6]*m0[0][2]-m2[1][9]*m1[2][2]*m0[0][6]-m2[1][9]*m1[2][1]*m0[0][7]+m2[1][9]*m1[0][7]*m0[2][1]+m2[1][9]*m1[0][6]*m0[2][2]+m2[1][9]*m1[0][2]*m0[2][6]+m2[1][9]*m1[0][1]*m0[2][7]-m2[1][7]*m1[2][9]*m0[0][1]-m2[1][7]*m1[2][7]*m0[0][6]-m2[1][7]*m1[2][6]*m0[0][7]-m2[1][7]*m1[2][1]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][1]+m2[1][7]*m1[0][7]*m0[2][6]+m2[1][7]*m1[0][6]*m0[2][7]+m2[1][7]*m1[0][1]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][2]-m2[1][6]*m1[2][7]*m0[0][7]-m2[1][6]*m1[2][2]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][2]+m2[1][6]*m1[0][7]*m0[2][7]+m2[1][6]*m1[0][2]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][6]-m2[1][2]*m1[2][6]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][6]+m2[1][2]*m1[0][6]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][7]-m2[1][1]*m1[2][7]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][7]+m2[1][1]*m1[0][7]*m0[2][9]+m2[0][9]*m1[2][7]*m0[1][1]+m2[0][9]*m1[2][6]*m0[1][2]+m2[0][9]*m1[2][2]*m0[1][6]+m2[0][9]*m1[2][1]*m0[1][7]-m2[0][9]*m1[1][7]*m0[2][1]-m2[0][9]*m1[1][6]*m0[2][2]-m2[0][9]*m1[1][2]*m0[2][6]-m2[0][9]*m1[1][1]*m0[2][7]+m2[0][7]*m1[2][9]*m0[1][1]+m2[0][7]*m1[2][7]*m0[1][6]+m2[0][7]*m1[2][6]*m0[1][7]+m2[0][7]*m1[2][1]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][1]-m2[0][7]*m1[1][7]*m0[2][6]-m2[0][7]*m1[1][6]*m0[2][7]-m2[0][7]*m1[1][1]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][2]+m2[0][6]*m1[2][7]*m0[1][7]+m2[0][6]*m1[2][2]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][2]-m2[0][6]*m1[1][7]*m0[2][7]-m2[0][6]*m1[1][2]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][6]+m2[0][2]*m1[2][6]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][6]-m2[0][2]*m1[1][6]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][7]+m2[0][1]*m1[2][7]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][7]-m2[0][1]*m1[1][7]*m0[2][9]; 
  M1(row,67) = m2[2][9]*m1[1][7]*m0[0][2]+m2[2][9]*m1[1][2]*m0[0][7]-m2[2][9]*m1[0][7]*m0[1][2]-m2[2][9]*m1[0][2]*m0[1][7]+m2[2][7]*m1[1][9]*m0[0][2]+m2[2][7]*m1[1][7]*m0[0][7]+m2[2][7]*m1[1][2]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][2]-m2[2][7]*m1[0][7]*m0[1][7]-m2[2][7]*m1[0][2]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][7]+m2[2][2]*m1[1][7]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][7]-m2[2][2]*m1[0][7]*m0[1][9]-m2[1][9]*m1[2][7]*m0[0][2]-m2[1][9]*m1[2][2]*m0[0][7]+m2[1][9]*m1[0][7]*m0[2][2]+m2[1][9]*m1[0][2]*m0[2][7]-m2[1][7]*m1[2][9]*m0[0][2]-m2[1][7]*m1[2][7]*m0[0][7]-m2[1][7]*m1[2][2]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][2]+m2[1][7]*m1[0][7]*m0[2][7]+m2[1][7]*m1[0][2]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][7]-m2[1][2]*m1[2][7]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][7]+m2[1][2]*m1[0][7]*m0[2][9]+m2[0][9]*m1[2][7]*m0[1][2]+m2[0][9]*m1[2][2]*m0[1][7]-m2[0][9]*m1[1][7]*m0[2][2]-m2[0][9]*m1[1][2]*m0[2][7]+m2[0][7]*m1[2][9]*m0[1][2]+m2[0][7]*m1[2][7]*m0[1][7]+m2[0][7]*m1[2][2]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][2]-m2[0][7]*m1[1][7]*m0[2][7]-m2[0][7]*m1[1][2]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][7]+m2[0][2]*m1[2][7]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][7]-m2[0][2]*m1[1][7]*m0[2][9]; 
  M1(row,68) = m2[2][9]*m1[1][8]*m0[0][0]+m2[2][9]*m1[1][6]*m0[0][3]+m2[2][9]*m1[1][3]*m0[0][6]+m2[2][9]*m1[1][0]*m0[0][8]-m2[2][9]*m1[0][8]*m0[1][0]-m2[2][9]*m1[0][6]*m0[1][3]-m2[2][9]*m1[0][3]*m0[1][6]-m2[2][9]*m1[0][0]*m0[1][8]+m2[2][8]*m1[1][9]*m0[0][0]+m2[2][8]*m1[1][6]*m0[0][6]+m2[2][8]*m1[1][0]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][0]-m2[2][8]*m1[0][6]*m0[1][6]-m2[2][8]*m1[0][0]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][3]+m2[2][6]*m1[1][8]*m0[0][6]+m2[2][6]*m1[1][6]*m0[0][8]+m2[2][6]*m1[1][3]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][3]-m2[2][6]*m1[0][8]*m0[1][6]-m2[2][6]*m1[0][6]*m0[1][8]-m2[2][6]*m1[0][3]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][6]+m2[2][3]*m1[1][6]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][6]-m2[2][3]*m1[0][6]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][8]+m2[2][0]*m1[1][8]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][8]-m2[2][0]*m1[0][8]*m0[1][9]-m2[1][9]*m1[2][8]*m0[0][0]-m2[1][9]*m1[2][6]*m0[0][3]-m2[1][9]*m1[2][3]*m0[0][6]-m2[1][9]*m1[2][0]*m0[0][8]+m2[1][9]*m1[0][8]*m0[2][0]+m2[1][9]*m1[0][6]*m0[2][3]+m2[1][9]*m1[0][3]*m0[2][6]+m2[1][9]*m1[0][0]*m0[2][8]-m2[1][8]*m1[2][9]*m0[0][0]-m2[1][8]*m1[2][6]*m0[0][6]-m2[1][8]*m1[2][0]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][0]+m2[1][8]*m1[0][6]*m0[2][6]+m2[1][8]*m1[0][0]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][3]-m2[1][6]*m1[2][8]*m0[0][6]-m2[1][6]*m1[2][6]*m0[0][8]-m2[1][6]*m1[2][3]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][3]+m2[1][6]*m1[0][8]*m0[2][6]+m2[1][6]*m1[0][6]*m0[2][8]+m2[1][6]*m1[0][3]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][6]-m2[1][3]*m1[2][6]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][6]+m2[1][3]*m1[0][6]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][8]-m2[1][0]*m1[2][8]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][8]+m2[1][0]*m1[0][8]*m0[2][9]+m2[0][9]*m1[2][8]*m0[1][0]+m2[0][9]*m1[2][6]*m0[1][3]+m2[0][9]*m1[2][3]*m0[1][6]+m2[0][9]*m1[2][0]*m0[1][8]-m2[0][9]*m1[1][8]*m0[2][0]-m2[0][9]*m1[1][6]*m0[2][3]-m2[0][9]*m1[1][3]*m0[2][6]-m2[0][9]*m1[1][0]*m0[2][8]+m2[0][8]*m1[2][9]*m0[1][0]+m2[0][8]*m1[2][6]*m0[1][6]+m2[0][8]*m1[2][0]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][0]-m2[0][8]*m1[1][6]*m0[2][6]-m2[0][8]*m1[1][0]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][3]+m2[0][6]*m1[2][8]*m0[1][6]+m2[0][6]*m1[2][6]*m0[1][8]+m2[0][6]*m1[2][3]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][3]-m2[0][6]*m1[1][8]*m0[2][6]-m2[0][6]*m1[1][6]*m0[2][8]-m2[0][6]*m1[1][3]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][6]+m2[0][3]*m1[2][6]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][6]-m2[0][3]*m1[1][6]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][8]+m2[0][0]*m1[2][8]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][8]-m2[0][0]*m1[1][8]*m0[2][9]; 
  M1(row,69) = m2[2][9]*m1[1][8]*m0[0][1]+m2[2][9]*m1[1][7]*m0[0][3]+m2[2][9]*m1[1][6]*m0[0][4]+m2[2][9]*m1[1][4]*m0[0][6]+m2[2][9]*m1[1][3]*m0[0][7]+m2[2][9]*m1[1][1]*m0[0][8]-m2[2][9]*m1[0][8]*m0[1][1]-m2[2][9]*m1[0][7]*m0[1][3]-m2[2][9]*m1[0][6]*m0[1][4]-m2[2][9]*m1[0][4]*m0[1][6]-m2[2][9]*m1[0][3]*m0[1][7]-m2[2][9]*m1[0][1]*m0[1][8]+m2[2][8]*m1[1][9]*m0[0][1]+m2[2][8]*m1[1][7]*m0[0][6]+m2[2][8]*m1[1][6]*m0[0][7]+m2[2][8]*m1[1][1]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][1]-m2[2][8]*m1[0][7]*m0[1][6]-m2[2][8]*m1[0][6]*m0[1][7]-m2[2][8]*m1[0][1]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][3]+m2[2][7]*m1[1][8]*m0[0][6]+m2[2][7]*m1[1][6]*m0[0][8]+m2[2][7]*m1[1][3]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][3]-m2[2][7]*m1[0][8]*m0[1][6]-m2[2][7]*m1[0][6]*m0[1][8]-m2[2][7]*m1[0][3]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][4]+m2[2][6]*m1[1][8]*m0[0][7]+m2[2][6]*m1[1][7]*m0[0][8]+m2[2][6]*m1[1][4]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][4]-m2[2][6]*m1[0][8]*m0[1][7]-m2[2][6]*m1[0][7]*m0[1][8]-m2[2][6]*m1[0][4]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][6]+m2[2][4]*m1[1][6]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][6]-m2[2][4]*m1[0][6]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][7]+m2[2][3]*m1[1][7]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][7]-m2[2][3]*m1[0][7]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][8]+m2[2][1]*m1[1][8]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][8]-m2[2][1]*m1[0][8]*m0[1][9]-m2[1][9]*m1[2][8]*m0[0][1]-m2[1][9]*m1[2][7]*m0[0][3]-m2[1][9]*m1[2][6]*m0[0][4]-m2[1][9]*m1[2][4]*m0[0][6]-m2[1][9]*m1[2][3]*m0[0][7]-m2[1][9]*m1[2][1]*m0[0][8]+m2[1][9]*m1[0][8]*m0[2][1]+m2[1][9]*m1[0][7]*m0[2][3]+m2[1][9]*m1[0][6]*m0[2][4]+m2[1][9]*m1[0][4]*m0[2][6]+m2[1][9]*m1[0][3]*m0[2][7]+m2[1][9]*m1[0][1]*m0[2][8]-m2[1][8]*m1[2][9]*m0[0][1]-m2[1][8]*m1[2][7]*m0[0][6]-m2[1][8]*m1[2][6]*m0[0][7]-m2[1][8]*m1[2][1]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][1]+m2[1][8]*m1[0][7]*m0[2][6]+m2[1][8]*m1[0][6]*m0[2][7]+m2[1][8]*m1[0][1]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][3]-m2[1][7]*m1[2][8]*m0[0][6]-m2[1][7]*m1[2][6]*m0[0][8]-m2[1][7]*m1[2][3]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][3]+m2[1][7]*m1[0][8]*m0[2][6]+m2[1][7]*m1[0][6]*m0[2][8]+m2[1][7]*m1[0][3]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][4]-m2[1][6]*m1[2][8]*m0[0][7]-m2[1][6]*m1[2][7]*m0[0][8]-m2[1][6]*m1[2][4]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][4]+m2[1][6]*m1[0][8]*m0[2][7]+m2[1][6]*m1[0][7]*m0[2][8]+m2[1][6]*m1[0][4]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][6]-m2[1][4]*m1[2][6]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][6]+m2[1][4]*m1[0][6]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][7]-m2[1][3]*m1[2][7]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][7]+m2[1][3]*m1[0][7]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][8]-m2[1][1]*m1[2][8]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][8]+m2[1][1]*m1[0][8]*m0[2][9]+m2[0][9]*m1[2][8]*m0[1][1]+m2[0][9]*m1[2][7]*m0[1][3]+m2[0][9]*m1[2][6]*m0[1][4]+m2[0][9]*m1[2][4]*m0[1][6]+m2[0][9]*m1[2][3]*m0[1][7]+m2[0][9]*m1[2][1]*m0[1][8]-m2[0][9]*m1[1][8]*m0[2][1]-m2[0][9]*m1[1][7]*m0[2][3]-m2[0][9]*m1[1][6]*m0[2][4]-m2[0][9]*m1[1][4]*m0[2][6]-m2[0][9]*m1[1][3]*m0[2][7]-m2[0][9]*m1[1][1]*m0[2][8]+m2[0][8]*m1[2][9]*m0[1][1]+m2[0][8]*m1[2][7]*m0[1][6]+m2[0][8]*m1[2][6]*m0[1][7]+m2[0][8]*m1[2][1]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][1]-m2[0][8]*m1[1][7]*m0[2][6]-m2[0][8]*m1[1][6]*m0[2][7]-m2[0][8]*m1[1][1]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][3]+m2[0][7]*m1[2][8]*m0[1][6]+m2[0][7]*m1[2][6]*m0[1][8]+m2[0][7]*m1[2][3]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][3]-m2[0][7]*m1[1][8]*m0[2][6]-m2[0][7]*m1[1][6]*m0[2][8]-m2[0][7]*m1[1][3]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][4]+m2[0][6]*m1[2][8]*m0[1][7]+m2[0][6]*m1[2][7]*m0[1][8]+m2[0][6]*m1[2][4]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][4]-m2[0][6]*m1[1][8]*m0[2][7]-m2[0][6]*m1[1][7]*m0[2][8]-m2[0][6]*m1[1][4]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][6]+m2[0][4]*m1[2][6]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][6]-m2[0][4]*m1[1][6]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][7]+m2[0][3]*m1[2][7]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][7]-m2[0][3]*m1[1][7]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][8]+m2[0][1]*m1[2][8]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][8]-m2[0][1]*m1[1][8]*m0[2][9]; 
  M1(row,70) = m2[2][9]*m1[1][8]*m0[0][2]+m2[2][9]*m1[1][7]*m0[0][4]+m2[2][9]*m1[1][4]*m0[0][7]+m2[2][9]*m1[1][2]*m0[0][8]-m2[2][9]*m1[0][8]*m0[1][2]-m2[2][9]*m1[0][7]*m0[1][4]-m2[2][9]*m1[0][4]*m0[1][7]-m2[2][9]*m1[0][2]*m0[1][8]+m2[2][8]*m1[1][9]*m0[0][2]+m2[2][8]*m1[1][7]*m0[0][7]+m2[2][8]*m1[1][2]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][2]-m2[2][8]*m1[0][7]*m0[1][7]-m2[2][8]*m1[0][2]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][4]+m2[2][7]*m1[1][8]*m0[0][7]+m2[2][7]*m1[1][7]*m0[0][8]+m2[2][7]*m1[1][4]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][4]-m2[2][7]*m1[0][8]*m0[1][7]-m2[2][7]*m1[0][7]*m0[1][8]-m2[2][7]*m1[0][4]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][7]+m2[2][4]*m1[1][7]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][7]-m2[2][4]*m1[0][7]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][8]+m2[2][2]*m1[1][8]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][8]-m2[2][2]*m1[0][8]*m0[1][9]-m2[1][9]*m1[2][8]*m0[0][2]-m2[1][9]*m1[2][7]*m0[0][4]-m2[1][9]*m1[2][4]*m0[0][7]-m2[1][9]*m1[2][2]*m0[0][8]+m2[1][9]*m1[0][8]*m0[2][2]+m2[1][9]*m1[0][7]*m0[2][4]+m2[1][9]*m1[0][4]*m0[2][7]+m2[1][9]*m1[0][2]*m0[2][8]-m2[1][8]*m1[2][9]*m0[0][2]-m2[1][8]*m1[2][7]*m0[0][7]-m2[1][8]*m1[2][2]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][2]+m2[1][8]*m1[0][7]*m0[2][7]+m2[1][8]*m1[0][2]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][4]-m2[1][7]*m1[2][8]*m0[0][7]-m2[1][7]*m1[2][7]*m0[0][8]-m2[1][7]*m1[2][4]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][4]+m2[1][7]*m1[0][8]*m0[2][7]+m2[1][7]*m1[0][7]*m0[2][8]+m2[1][7]*m1[0][4]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][7]-m2[1][4]*m1[2][7]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][7]+m2[1][4]*m1[0][7]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][8]-m2[1][2]*m1[2][8]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][8]+m2[1][2]*m1[0][8]*m0[2][9]+m2[0][9]*m1[2][8]*m0[1][2]+m2[0][9]*m1[2][7]*m0[1][4]+m2[0][9]*m1[2][4]*m0[1][7]+m2[0][9]*m1[2][2]*m0[1][8]-m2[0][9]*m1[1][8]*m0[2][2]-m2[0][9]*m1[1][7]*m0[2][4]-m2[0][9]*m1[1][4]*m0[2][7]-m2[0][9]*m1[1][2]*m0[2][8]+m2[0][8]*m1[2][9]*m0[1][2]+m2[0][8]*m1[2][7]*m0[1][7]+m2[0][8]*m1[2][2]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][2]-m2[0][8]*m1[1][7]*m0[2][7]-m2[0][8]*m1[1][2]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][4]+m2[0][7]*m1[2][8]*m0[1][7]+m2[0][7]*m1[2][7]*m0[1][8]+m2[0][7]*m1[2][4]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][4]-m2[0][7]*m1[1][8]*m0[2][7]-m2[0][7]*m1[1][7]*m0[2][8]-m2[0][7]*m1[1][4]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][7]+m2[0][4]*m1[2][7]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][7]-m2[0][4]*m1[1][7]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][8]+m2[0][2]*m1[2][8]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][8]-m2[0][2]*m1[1][8]*m0[2][9]; 
  M1(row,71) = m2[2][9]*m1[1][8]*m0[0][3]+m2[2][9]*m1[1][6]*m0[0][5]+m2[2][9]*m1[1][5]*m0[0][6]+m2[2][9]*m1[1][3]*m0[0][8]-m2[2][9]*m1[0][8]*m0[1][3]-m2[2][9]*m1[0][6]*m0[1][5]-m2[2][9]*m1[0][5]*m0[1][6]-m2[2][9]*m1[0][3]*m0[1][8]+m2[2][8]*m1[1][9]*m0[0][3]+m2[2][8]*m1[1][8]*m0[0][6]+m2[2][8]*m1[1][6]*m0[0][8]+m2[2][8]*m1[1][3]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][3]-m2[2][8]*m1[0][8]*m0[1][6]-m2[2][8]*m1[0][6]*m0[1][8]-m2[2][8]*m1[0][3]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][5]+m2[2][6]*m1[1][8]*m0[0][8]+m2[2][6]*m1[1][5]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][5]-m2[2][6]*m1[0][8]*m0[1][8]-m2[2][6]*m1[0][5]*m0[1][9]+m2[2][5]*m1[1][9]*m0[0][6]+m2[2][5]*m1[1][6]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][6]-m2[2][5]*m1[0][6]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][8]+m2[2][3]*m1[1][8]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][8]-m2[2][3]*m1[0][8]*m0[1][9]-m2[1][9]*m1[2][8]*m0[0][3]-m2[1][9]*m1[2][6]*m0[0][5]-m2[1][9]*m1[2][5]*m0[0][6]-m2[1][9]*m1[2][3]*m0[0][8]+m2[1][9]*m1[0][8]*m0[2][3]+m2[1][9]*m1[0][6]*m0[2][5]+m2[1][9]*m1[0][5]*m0[2][6]+m2[1][9]*m1[0][3]*m0[2][8]-m2[1][8]*m1[2][9]*m0[0][3]-m2[1][8]*m1[2][8]*m0[0][6]-m2[1][8]*m1[2][6]*m0[0][8]-m2[1][8]*m1[2][3]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][3]+m2[1][8]*m1[0][8]*m0[2][6]+m2[1][8]*m1[0][6]*m0[2][8]+m2[1][8]*m1[0][3]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][5]-m2[1][6]*m1[2][8]*m0[0][8]-m2[1][6]*m1[2][5]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][5]+m2[1][6]*m1[0][8]*m0[2][8]+m2[1][6]*m1[0][5]*m0[2][9]-m2[1][5]*m1[2][9]*m0[0][6]-m2[1][5]*m1[2][6]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][6]+m2[1][5]*m1[0][6]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][8]-m2[1][3]*m1[2][8]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][8]+m2[1][3]*m1[0][8]*m0[2][9]+m2[0][9]*m1[2][8]*m0[1][3]+m2[0][9]*m1[2][6]*m0[1][5]+m2[0][9]*m1[2][5]*m0[1][6]+m2[0][9]*m1[2][3]*m0[1][8]-m2[0][9]*m1[1][8]*m0[2][3]-m2[0][9]*m1[1][6]*m0[2][5]-m2[0][9]*m1[1][5]*m0[2][6]-m2[0][9]*m1[1][3]*m0[2][8]+m2[0][8]*m1[2][9]*m0[1][3]+m2[0][8]*m1[2][8]*m0[1][6]+m2[0][8]*m1[2][6]*m0[1][8]+m2[0][8]*m1[2][3]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][3]-m2[0][8]*m1[1][8]*m0[2][6]-m2[0][8]*m1[1][6]*m0[2][8]-m2[0][8]*m1[1][3]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][5]+m2[0][6]*m1[2][8]*m0[1][8]+m2[0][6]*m1[2][5]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][5]-m2[0][6]*m1[1][8]*m0[2][8]-m2[0][6]*m1[1][5]*m0[2][9]+m2[0][5]*m1[2][9]*m0[1][6]+m2[0][5]*m1[2][6]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][6]-m2[0][5]*m1[1][6]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][8]+m2[0][3]*m1[2][8]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][8]-m2[0][3]*m1[1][8]*m0[2][9]; 
  M1(row,72) = m2[2][9]*m1[1][8]*m0[0][4]+m2[2][9]*m1[1][7]*m0[0][5]+m2[2][9]*m1[1][5]*m0[0][7]+m2[2][9]*m1[1][4]*m0[0][8]-m2[2][9]*m1[0][8]*m0[1][4]-m2[2][9]*m1[0][7]*m0[1][5]-m2[2][9]*m1[0][5]*m0[1][7]-m2[2][9]*m1[0][4]*m0[1][8]+m2[2][8]*m1[1][9]*m0[0][4]+m2[2][8]*m1[1][8]*m0[0][7]+m2[2][8]*m1[1][7]*m0[0][8]+m2[2][8]*m1[1][4]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][4]-m2[2][8]*m1[0][8]*m0[1][7]-m2[2][8]*m1[0][7]*m0[1][8]-m2[2][8]*m1[0][4]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][5]+m2[2][7]*m1[1][8]*m0[0][8]+m2[2][7]*m1[1][5]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][5]-m2[2][7]*m1[0][8]*m0[1][8]-m2[2][7]*m1[0][5]*m0[1][9]+m2[2][5]*m1[1][9]*m0[0][7]+m2[2][5]*m1[1][7]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][7]-m2[2][5]*m1[0][7]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][8]+m2[2][4]*m1[1][8]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][8]-m2[2][4]*m1[0][8]*m0[1][9]-m2[1][9]*m1[2][8]*m0[0][4]-m2[1][9]*m1[2][7]*m0[0][5]-m2[1][9]*m1[2][5]*m0[0][7]-m2[1][9]*m1[2][4]*m0[0][8]+m2[1][9]*m1[0][8]*m0[2][4]+m2[1][9]*m1[0][7]*m0[2][5]+m2[1][9]*m1[0][5]*m0[2][7]+m2[1][9]*m1[0][4]*m0[2][8]-m2[1][8]*m1[2][9]*m0[0][4]-m2[1][8]*m1[2][8]*m0[0][7]-m2[1][8]*m1[2][7]*m0[0][8]-m2[1][8]*m1[2][4]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][4]+m2[1][8]*m1[0][8]*m0[2][7]+m2[1][8]*m1[0][7]*m0[2][8]+m2[1][8]*m1[0][4]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][5]-m2[1][7]*m1[2][8]*m0[0][8]-m2[1][7]*m1[2][5]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][5]+m2[1][7]*m1[0][8]*m0[2][8]+m2[1][7]*m1[0][5]*m0[2][9]-m2[1][5]*m1[2][9]*m0[0][7]-m2[1][5]*m1[2][7]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][7]+m2[1][5]*m1[0][7]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][8]-m2[1][4]*m1[2][8]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][8]+m2[1][4]*m1[0][8]*m0[2][9]+m2[0][9]*m1[2][8]*m0[1][4]+m2[0][9]*m1[2][7]*m0[1][5]+m2[0][9]*m1[2][5]*m0[1][7]+m2[0][9]*m1[2][4]*m0[1][8]-m2[0][9]*m1[1][8]*m0[2][4]-m2[0][9]*m1[1][7]*m0[2][5]-m2[0][9]*m1[1][5]*m0[2][7]-m2[0][9]*m1[1][4]*m0[2][8]+m2[0][8]*m1[2][9]*m0[1][4]+m2[0][8]*m1[2][8]*m0[1][7]+m2[0][8]*m1[2][7]*m0[1][8]+m2[0][8]*m1[2][4]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][4]-m2[0][8]*m1[1][8]*m0[2][7]-m2[0][8]*m1[1][7]*m0[2][8]-m2[0][8]*m1[1][4]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][5]+m2[0][7]*m1[2][8]*m0[1][8]+m2[0][7]*m1[2][5]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][5]-m2[0][7]*m1[1][8]*m0[2][8]-m2[0][7]*m1[1][5]*m0[2][9]+m2[0][5]*m1[2][9]*m0[1][7]+m2[0][5]*m1[2][7]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][7]-m2[0][5]*m1[1][7]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][8]+m2[0][4]*m1[2][8]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][8]-m2[0][4]*m1[1][8]*m0[2][9]; 
  M1(row,73) = m2[2][9]*m1[1][8]*m0[0][5]+m2[2][9]*m1[1][5]*m0[0][8]-m2[2][9]*m1[0][8]*m0[1][5]-m2[2][9]*m1[0][5]*m0[1][8]+m2[2][8]*m1[1][9]*m0[0][5]+m2[2][8]*m1[1][8]*m0[0][8]+m2[2][8]*m1[1][5]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][5]-m2[2][8]*m1[0][8]*m0[1][8]-m2[2][8]*m1[0][5]*m0[1][9]+m2[2][5]*m1[1][9]*m0[0][8]+m2[2][5]*m1[1][8]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][8]-m2[2][5]*m1[0][8]*m0[1][9]-m2[1][9]*m1[2][8]*m0[0][5]-m2[1][9]*m1[2][5]*m0[0][8]+m2[1][9]*m1[0][8]*m0[2][5]+m2[1][9]*m1[0][5]*m0[2][8]-m2[1][8]*m1[2][9]*m0[0][5]-m2[1][8]*m1[2][8]*m0[0][8]-m2[1][8]*m1[2][5]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][5]+m2[1][8]*m1[0][8]*m0[2][8]+m2[1][8]*m1[0][5]*m0[2][9]-m2[1][5]*m1[2][9]*m0[0][8]-m2[1][5]*m1[2][8]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][8]+m2[1][5]*m1[0][8]*m0[2][9]+m2[0][9]*m1[2][8]*m0[1][5]+m2[0][9]*m1[2][5]*m0[1][8]-m2[0][9]*m1[1][8]*m0[2][5]-m2[0][9]*m1[1][5]*m0[2][8]+m2[0][8]*m1[2][9]*m0[1][5]+m2[0][8]*m1[2][8]*m0[1][8]+m2[0][8]*m1[2][5]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][5]-m2[0][8]*m1[1][8]*m0[2][8]-m2[0][8]*m1[1][5]*m0[2][9]+m2[0][5]*m1[2][9]*m0[1][8]+m2[0][5]*m1[2][8]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][8]-m2[0][5]*m1[1][8]*m0[2][9]; 
  M1(row,74) = m2[2][9]*m1[1][9]*m0[0][0]+m2[2][9]*m1[1][6]*m0[0][6]+m2[2][9]*m1[1][0]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][0]-m2[2][9]*m1[0][6]*m0[1][6]-m2[2][9]*m1[0][0]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][6]+m2[2][6]*m1[1][6]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][6]-m2[2][6]*m1[0][6]*m0[1][9]+m2[2][0]*m1[1][9]*m0[0][9]-m2[2][0]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][0]-m2[1][9]*m1[2][6]*m0[0][6]-m2[1][9]*m1[2][0]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][0]+m2[1][9]*m1[0][6]*m0[2][6]+m2[1][9]*m1[0][0]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][6]-m2[1][6]*m1[2][6]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][6]+m2[1][6]*m1[0][6]*m0[2][9]-m2[1][0]*m1[2][9]*m0[0][9]+m2[1][0]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][0]+m2[0][9]*m1[2][6]*m0[1][6]+m2[0][9]*m1[2][0]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][0]-m2[0][9]*m1[1][6]*m0[2][6]-m2[0][9]*m1[1][0]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][6]+m2[0][6]*m1[2][6]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][6]-m2[0][6]*m1[1][6]*m0[2][9]+m2[0][0]*m1[2][9]*m0[1][9]-m2[0][0]*m1[1][9]*m0[2][9]; 
  M1(row,75) = m2[2][9]*m1[1][9]*m0[0][1]+m2[2][9]*m1[1][7]*m0[0][6]+m2[2][9]*m1[1][6]*m0[0][7]+m2[2][9]*m1[1][1]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][1]-m2[2][9]*m1[0][7]*m0[1][6]-m2[2][9]*m1[0][6]*m0[1][7]-m2[2][9]*m1[0][1]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][6]+m2[2][7]*m1[1][6]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][6]-m2[2][7]*m1[0][6]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][7]+m2[2][6]*m1[1][7]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][7]-m2[2][6]*m1[0][7]*m0[1][9]+m2[2][1]*m1[1][9]*m0[0][9]-m2[2][1]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][1]-m2[1][9]*m1[2][7]*m0[0][6]-m2[1][9]*m1[2][6]*m0[0][7]-m2[1][9]*m1[2][1]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][1]+m2[1][9]*m1[0][7]*m0[2][6]+m2[1][9]*m1[0][6]*m0[2][7]+m2[1][9]*m1[0][1]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][6]-m2[1][7]*m1[2][6]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][6]+m2[1][7]*m1[0][6]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][7]-m2[1][6]*m1[2][7]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][7]+m2[1][6]*m1[0][7]*m0[2][9]-m2[1][1]*m1[2][9]*m0[0][9]+m2[1][1]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][1]+m2[0][9]*m1[2][7]*m0[1][6]+m2[0][9]*m1[2][6]*m0[1][7]+m2[0][9]*m1[2][1]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][1]-m2[0][9]*m1[1][7]*m0[2][6]-m2[0][9]*m1[1][6]*m0[2][7]-m2[0][9]*m1[1][1]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][6]+m2[0][7]*m1[2][6]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][6]-m2[0][7]*m1[1][6]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][7]+m2[0][6]*m1[2][7]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][7]-m2[0][6]*m1[1][7]*m0[2][9]+m2[0][1]*m1[2][9]*m0[1][9]-m2[0][1]*m1[1][9]*m0[2][9]; 
  M1(row,76) = m2[2][9]*m1[1][9]*m0[0][2]+m2[2][9]*m1[1][7]*m0[0][7]+m2[2][9]*m1[1][2]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][2]-m2[2][9]*m1[0][7]*m0[1][7]-m2[2][9]*m1[0][2]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][7]+m2[2][7]*m1[1][7]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][7]-m2[2][7]*m1[0][7]*m0[1][9]+m2[2][2]*m1[1][9]*m0[0][9]-m2[2][2]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][2]-m2[1][9]*m1[2][7]*m0[0][7]-m2[1][9]*m1[2][2]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][2]+m2[1][9]*m1[0][7]*m0[2][7]+m2[1][9]*m1[0][2]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][7]-m2[1][7]*m1[2][7]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][7]+m2[1][7]*m1[0][7]*m0[2][9]-m2[1][2]*m1[2][9]*m0[0][9]+m2[1][2]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][2]+m2[0][9]*m1[2][7]*m0[1][7]+m2[0][9]*m1[2][2]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][2]-m2[0][9]*m1[1][7]*m0[2][7]-m2[0][9]*m1[1][2]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][7]+m2[0][7]*m1[2][7]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][7]-m2[0][7]*m1[1][7]*m0[2][9]+m2[0][2]*m1[2][9]*m0[1][9]-m2[0][2]*m1[1][9]*m0[2][9]; 
  M1(row,77) = m2[2][9]*m1[1][9]*m0[0][3]+m2[2][9]*m1[1][8]*m0[0][6]+m2[2][9]*m1[1][6]*m0[0][8]+m2[2][9]*m1[1][3]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][3]-m2[2][9]*m1[0][8]*m0[1][6]-m2[2][9]*m1[0][6]*m0[1][8]-m2[2][9]*m1[0][3]*m0[1][9]+m2[2][8]*m1[1][9]*m0[0][6]+m2[2][8]*m1[1][6]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][6]-m2[2][8]*m1[0][6]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][8]+m2[2][6]*m1[1][8]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][8]-m2[2][6]*m1[0][8]*m0[1][9]+m2[2][3]*m1[1][9]*m0[0][9]-m2[2][3]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][3]-m2[1][9]*m1[2][8]*m0[0][6]-m2[1][9]*m1[2][6]*m0[0][8]-m2[1][9]*m1[2][3]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][3]+m2[1][9]*m1[0][8]*m0[2][6]+m2[1][9]*m1[0][6]*m0[2][8]+m2[1][9]*m1[0][3]*m0[2][9]-m2[1][8]*m1[2][9]*m0[0][6]-m2[1][8]*m1[2][6]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][6]+m2[1][8]*m1[0][6]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][8]-m2[1][6]*m1[2][8]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][8]+m2[1][6]*m1[0][8]*m0[2][9]-m2[1][3]*m1[2][9]*m0[0][9]+m2[1][3]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][3]+m2[0][9]*m1[2][8]*m0[1][6]+m2[0][9]*m1[2][6]*m0[1][8]+m2[0][9]*m1[2][3]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][3]-m2[0][9]*m1[1][8]*m0[2][6]-m2[0][9]*m1[1][6]*m0[2][8]-m2[0][9]*m1[1][3]*m0[2][9]+m2[0][8]*m1[2][9]*m0[1][6]+m2[0][8]*m1[2][6]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][6]-m2[0][8]*m1[1][6]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][8]+m2[0][6]*m1[2][8]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][8]-m2[0][6]*m1[1][8]*m0[2][9]+m2[0][3]*m1[2][9]*m0[1][9]-m2[0][3]*m1[1][9]*m0[2][9]; 
  M1(row,78) = m2[2][9]*m1[1][9]*m0[0][4]+m2[2][9]*m1[1][8]*m0[0][7]+m2[2][9]*m1[1][7]*m0[0][8]+m2[2][9]*m1[1][4]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][4]-m2[2][9]*m1[0][8]*m0[1][7]-m2[2][9]*m1[0][7]*m0[1][8]-m2[2][9]*m1[0][4]*m0[1][9]+m2[2][8]*m1[1][9]*m0[0][7]+m2[2][8]*m1[1][7]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][7]-m2[2][8]*m1[0][7]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][8]+m2[2][7]*m1[1][8]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][8]-m2[2][7]*m1[0][8]*m0[1][9]+m2[2][4]*m1[1][9]*m0[0][9]-m2[2][4]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][4]-m2[1][9]*m1[2][8]*m0[0][7]-m2[1][9]*m1[2][7]*m0[0][8]-m2[1][9]*m1[2][4]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][4]+m2[1][9]*m1[0][8]*m0[2][7]+m2[1][9]*m1[0][7]*m0[2][8]+m2[1][9]*m1[0][4]*m0[2][9]-m2[1][8]*m1[2][9]*m0[0][7]-m2[1][8]*m1[2][7]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][7]+m2[1][8]*m1[0][7]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][8]-m2[1][7]*m1[2][8]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][8]+m2[1][7]*m1[0][8]*m0[2][9]-m2[1][4]*m1[2][9]*m0[0][9]+m2[1][4]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][4]+m2[0][9]*m1[2][8]*m0[1][7]+m2[0][9]*m1[2][7]*m0[1][8]+m2[0][9]*m1[2][4]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][4]-m2[0][9]*m1[1][8]*m0[2][7]-m2[0][9]*m1[1][7]*m0[2][8]-m2[0][9]*m1[1][4]*m0[2][9]+m2[0][8]*m1[2][9]*m0[1][7]+m2[0][8]*m1[2][7]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][7]-m2[0][8]*m1[1][7]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][8]+m2[0][7]*m1[2][8]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][8]-m2[0][7]*m1[1][8]*m0[2][9]+m2[0][4]*m1[2][9]*m0[1][9]-m2[0][4]*m1[1][9]*m0[2][9]; 
  M1(row,79) = m2[2][9]*m1[1][9]*m0[0][5]+m2[2][9]*m1[1][8]*m0[0][8]+m2[2][9]*m1[1][5]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][5]-m2[2][9]*m1[0][8]*m0[1][8]-m2[2][9]*m1[0][5]*m0[1][9]+m2[2][8]*m1[1][9]*m0[0][8]+m2[2][8]*m1[1][8]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][8]-m2[2][8]*m1[0][8]*m0[1][9]+m2[2][5]*m1[1][9]*m0[0][9]-m2[2][5]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][5]-m2[1][9]*m1[2][8]*m0[0][8]-m2[1][9]*m1[2][5]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][5]+m2[1][9]*m1[0][8]*m0[2][8]+m2[1][9]*m1[0][5]*m0[2][9]-m2[1][8]*m1[2][9]*m0[0][8]-m2[1][8]*m1[2][8]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][8]+m2[1][8]*m1[0][8]*m0[2][9]-m2[1][5]*m1[2][9]*m0[0][9]+m2[1][5]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][5]+m2[0][9]*m1[2][8]*m0[1][8]+m2[0][9]*m1[2][5]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][5]-m2[0][9]*m1[1][8]*m0[2][8]-m2[0][9]*m1[1][5]*m0[2][9]+m2[0][8]*m1[2][9]*m0[1][8]+m2[0][8]*m1[2][8]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][8]-m2[0][8]*m1[1][8]*m0[2][9]+m2[0][5]*m1[2][9]*m0[1][9]-m2[0][5]*m1[1][9]*m0[2][9]; 
  M1(row,80) = m2[2][9]*m1[1][9]*m0[0][6]+m2[2][9]*m1[1][6]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][6]-m2[2][9]*m1[0][6]*m0[1][9]+m2[2][6]*m1[1][9]*m0[0][9]-m2[2][6]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][6]-m2[1][9]*m1[2][6]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][6]+m2[1][9]*m1[0][6]*m0[2][9]-m2[1][6]*m1[2][9]*m0[0][9]+m2[1][6]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][6]+m2[0][9]*m1[2][6]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][6]-m2[0][9]*m1[1][6]*m0[2][9]+m2[0][6]*m1[2][9]*m0[1][9]-m2[0][6]*m1[1][9]*m0[2][9]; 
  M1(row,81) = m2[2][9]*m1[1][9]*m0[0][7]+m2[2][9]*m1[1][7]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][7]-m2[2][9]*m1[0][7]*m0[1][9]+m2[2][7]*m1[1][9]*m0[0][9]-m2[2][7]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][7]-m2[1][9]*m1[2][7]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][7]+m2[1][9]*m1[0][7]*m0[2][9]-m2[1][7]*m1[2][9]*m0[0][9]+m2[1][7]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][7]+m2[0][9]*m1[2][7]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][7]-m2[0][9]*m1[1][7]*m0[2][9]+m2[0][7]*m1[2][9]*m0[1][9]-m2[0][7]*m1[1][9]*m0[2][9]; 
  M1(row,82) = m2[2][9]*m1[1][9]*m0[0][8]+m2[2][9]*m1[1][8]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][8]-m2[2][9]*m1[0][8]*m0[1][9]+m2[2][8]*m1[1][9]*m0[0][9]-m2[2][8]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][8]-m2[1][9]*m1[2][8]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][8]+m2[1][9]*m1[0][8]*m0[2][9]-m2[1][8]*m1[2][9]*m0[0][9]+m2[1][8]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][8]+m2[0][9]*m1[2][8]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][8]-m2[0][9]*m1[1][8]*m0[2][9]+m2[0][8]*m1[2][9]*m0[1][9]-m2[0][8]*m1[1][9]*m0[2][9]; 
  M1(row,83) = m2[2][9]*m1[1][9]*m0[0][9]-m2[2][9]*m1[0][9]*m0[1][9]-m2[1][9]*m1[2][9]*m0[0][9]+m2[1][9]*m1[0][9]*m0[2][9]+m2[0][9]*m1[2][9]*m0[1][9]-m2[0][9]*m1[1][9]*m0[2][9];
}